

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Deconvolution_x86_avx512::forward
          (Deconvolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  undefined4 uVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  undefined4 uVar13;
  int *piVar14;
  void *pvVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  float *pfVar20;
  _func_int **pp_Var21;
  _func_int **pp_Var22;
  byte bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  byte bVar32;
  byte bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  ulong uVar41;
  undefined8 uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  float afVar133 [16];
  float afVar134 [16];
  float afVar135 [16];
  float afVar136 [16];
  float afVar137 [16];
  float afVar138 [16];
  float afVar139 [16];
  float afVar140 [16];
  float afVar141 [16];
  float afVar142 [16];
  float afVar143 [16];
  float afVar144 [16];
  float afVar145 [16];
  float afVar146 [16];
  float afVar147 [16];
  float afVar148 [16];
  float afVar149 [16];
  Mat *pMVar150;
  int iVar151;
  int iVar152;
  int iVar153;
  int iVar154;
  int iVar155;
  int iVar156;
  int iVar157;
  int iVar158;
  long lVar159;
  ulong uVar160;
  _func_int *p_Var161;
  uint uVar162;
  uint uVar163;
  uint uVar164;
  undefined8 uVar165;
  uint uVar166;
  long lVar167;
  _func_int **pp_Var168;
  int y_3;
  _func_int *p_Var169;
  _func_int ***ppp_Var170;
  int y_2;
  ulong uVar171;
  ulong uVar172;
  void *pvVar173;
  int iVar174;
  long lVar175;
  ulong uVar176;
  int y;
  ulong uVar177;
  int w;
  void *pvVar178;
  void *pvVar179;
  int w_1;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  int iVar180;
  int iVar181;
  int iVar182;
  ushort uVar183;
  ulong uVar184;
  ulong uVar185;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar186 [16];
  undefined1 auVar292 [64];
  undefined1 auVar293 [64];
  undefined1 auVar294 [64];
  undefined1 auVar295 [64];
  undefined1 auVar296 [64];
  undefined1 auVar297 [64];
  undefined1 auVar298 [64];
  undefined1 auVar299 [64];
  undefined1 auVar300 [64];
  undefined1 auVar301 [64];
  undefined1 auVar302 [64];
  undefined1 auVar303 [64];
  undefined1 auVar304 [64];
  undefined1 auVar305 [64];
  undefined1 auVar306 [64];
  undefined1 auVar307 [64];
  undefined1 auVar308 [64];
  undefined1 auVar309 [64];
  undefined1 auVar310 [64];
  undefined1 auVar311 [64];
  undefined1 auVar312 [64];
  undefined1 auVar313 [64];
  undefined1 auVar314 [64];
  undefined1 auVar315 [64];
  undefined1 auVar316 [64];
  undefined1 auVar317 [64];
  undefined1 auVar318 [64];
  undefined1 auVar319 [64];
  undefined1 auVar320 [64];
  undefined1 auVar321 [64];
  undefined1 auVar322 [64];
  undefined1 auVar323 [64];
  undefined1 auVar324 [64];
  undefined1 auVar325 [64];
  undefined1 auVar326 [64];
  undefined1 auVar327 [64];
  undefined1 auVar328 [64];
  undefined1 auVar329 [64];
  undefined1 auVar330 [64];
  undefined1 auVar331 [64];
  undefined1 auVar332 [64];
  undefined1 auVar333 [64];
  undefined1 auVar334 [64];
  undefined1 auVar335 [64];
  undefined1 auVar336 [64];
  undefined1 auVar337 [64];
  undefined1 auVar338 [64];
  undefined1 auVar339 [64];
  undefined1 auVar340 [64];
  undefined1 auVar341 [64];
  undefined1 auVar342 [64];
  undefined1 auVar343 [64];
  undefined1 auVar344 [64];
  undefined1 auVar345 [64];
  undefined1 auVar346 [64];
  undefined1 auVar347 [64];
  undefined1 auVar348 [64];
  undefined1 auVar349 [64];
  undefined1 auVar350 [64];
  int iVar351;
  int iVar352;
  int iVar353;
  int iVar354;
  int iVar355;
  int iVar356;
  int iVar357;
  int iVar358;
  int iVar359;
  int iVar360;
  int iVar361;
  float fVar362;
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  float fVar377;
  undefined1 auVar371 [64];
  undefined1 auVar372 [64];
  undefined1 auVar373 [64];
  undefined1 auVar374 [64];
  undefined1 auVar375 [64];
  undefined1 auVar376 [64];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  float fVar384;
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  v4sf one;
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [16];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar415 [64];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  undefined1 auVar457 [32];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  undefined1 auVar439 [32];
  undefined1 auVar440 [32];
  undefined1 auVar441 [32];
  undefined1 auVar442 [32];
  undefined1 auVar443 [32];
  undefined1 auVar444 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar458 [32];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 auVar461 [32];
  undefined1 auVar462 [32];
  undefined1 auVar463 [32];
  undefined1 auVar464 [32];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar465 [32];
  undefined1 auVar466 [32];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar467 [64];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [32];
  undefined1 auVar472 [32];
  undefined1 auVar473 [32];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [32];
  undefined1 auVar478 [32];
  undefined1 auVar479 [32];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [32];
  undefined1 auVar484 [32];
  undefined1 auVar485 [32];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [32];
  undefined1 auVar490 [32];
  undefined1 auVar491 [32];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [32];
  undefined1 auVar496 [32];
  undefined1 auVar497 [32];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [32];
  undefined1 auVar502 [32];
  undefined1 auVar503 [32];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM29 [64];
  int outw;
  int h;
  int outw_1;
  int outh_1;
  int outh_3;
  int h_1;
  int outh;
  long local_228;
  int local_214;
  _func_int ***local_200;
  long local_1d0;
  _func_int ***local_1c8;
  long local_198;
  uint local_170;
  Mat local_158;
  int local_10c;
  undefined1 local_108 [16];
  _func_int *local_f0;
  undefined1 local_e8 [64];
  long local_a8;
  uint local_a0;
  int local_9c;
  undefined1 local_98 [64];
  Allocator *local_50;
  Option *local_48;
  long local_40;
  Mat *local_38;
  
  iVar8 = bottom_blob->w;
  iVar9 = bottom_blob->h;
  uVar160 = bottom_blob->elemsize;
  p_Var161 = this->_vptr_Deconvolution_x86_avx512[-3];
  local_10c = (*(int *)(&this->field_0xd4 + (long)p_Var161) + -1) *
              *(int *)(&this->field_0xdc + (long)p_Var161);
  uVar10 = bottom_blob->elempack;
  iVar182 = *(int *)(&this->field_0xe4 + (long)p_Var161);
  local_9c = (*(int *)(&this->field_0xd8 + (long)p_Var161) + -1) *
             *(int *)(&this->field_0xe0 + (long)p_Var161);
  iVar11 = *(int *)(&this->field_0xe8 + (long)p_Var161);
  iVar158 = *(int *)(&this->field_0xfc + (long)p_Var161);
  iVar181 = *(int *)(&this->field_0x100 + (long)p_Var161);
  uVar162 = 1;
  if (opt->use_packing_layout == true) {
    uVar162 = *(uint *)(&this->field_0xd0 + (long)p_Var161);
    if ((uVar162 & 0xf) == 0) {
      uVar162 = 0x10;
    }
    else if ((uVar162 & 7) == 0) {
      uVar162 = 8;
    }
    else {
      uVar162 = (uint)((uVar162 & 3) == 0) * 3 + 1;
    }
  }
  local_158.cstep = 0;
  local_158.data = (Allocator *)0x0;
  local_158.refcount._0_4_ = 0;
  local_158.refcount._4_4_ = 0;
  local_158.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_158.elempack = 0;
  local_158.h = 0;
  p_Var169 = this->_vptr_Deconvolution_x86_avx512[-3];
  p_Var161 = (_func_int *)((long)&this->_vptr_Deconvolution_x86_avx512 + (long)p_Var169);
  lVar175 = 0x10;
  local_158.allocator = (Allocator *)local_158.data;
  local_158.dims = (int)local_158.refcount;
  local_158.w = local_158.refcount._4_4_;
  local_158.d = (int)local_158.refcount;
  local_158.c = local_158.elempack;
  if (((((*(int *)(&this->field_0xec + (long)p_Var169) < 1) && (*(int *)(p_Var161 + 0xf0) < 1)) &&
       (*(int *)(p_Var161 + 0xf4) < 1)) && (*(int *)(p_Var161 + 0xf8) < 1)) &&
     ((*(int *)(p_Var161 + 0x104) < 1 || (*(int *)(p_Var161 + 0x108) < 1)))) {
    if (&local_158 != top_blob) {
      piVar14 = top_blob->refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      local_158.data = top_blob->data;
      local_158.refcount._0_4_ = (int)top_blob->refcount;
      local_158.refcount._4_4_ = (uint)((ulong)top_blob->refcount >> 0x20);
      local_158.elemsize = top_blob->elemsize;
      local_158.elempack = top_blob->elempack;
      local_158.allocator = top_blob->allocator;
      uVar4 = top_blob->dims;
      uVar5 = top_blob->w;
      uVar6 = top_blob->h;
      uVar7 = top_blob->d;
      local_158.c = top_blob->c;
      local_158.cstep = top_blob->cstep;
      p_Var169 = this->_vptr_Deconvolution_x86_avx512[-3];
      local_158.dims = uVar4;
      local_158.w = uVar5;
      local_158.h = uVar6;
      local_158.d = uVar7;
    }
    p_Var161 = (_func_int *)((long)&this->_vptr_Deconvolution_x86_avx512 + (long)p_Var169);
    lVar175 = 8;
  }
  local_48 = opt;
  Mat::create(&local_158,iVar158 + (iVar8 + -1) * iVar182 + local_10c + 1,
              iVar181 + (iVar9 + -1) * iVar11 + local_9c + 1,
              *(int *)(p_Var161 + 0xd0) / (int)uVar162,
              (uVar160 / (ulong)(long)(int)uVar10) * (ulong)uVar162,uVar162,
              *(Allocator **)(&opt->lightmode + lVar175));
  iVar9 = local_158.h;
  iVar8 = local_158.w;
  pvVar179 = local_158.data;
  afVar142 = _ps512_cephes_exp_p5;
  afVar141 = _ps512_cephes_exp_p4;
  afVar140 = _ps512_cephes_exp_p3;
  afVar139 = _ps512_cephes_exp_p2;
  afVar138 = _ps512_cephes_exp_p1;
  afVar137 = _ps512_cephes_exp_p0;
  afVar136 = _ps512_cephes_LOG2EF;
  afVar135 = _ps512_exp_lo;
  afVar134 = _ps512_exp_hi;
  afVar133 = _ps512_1;
  iVar182 = -100;
  if (((Allocator *)local_158.data == (Allocator *)0x0) ||
     (local_158.cstep * (long)local_158.c == 0)) goto LAB_002a2e9c;
  pp_Var168 = this->_vptr_Deconvolution_x86_avx512;
  p_Var161 = pp_Var168[-3];
  uVar12 = *(uint *)(&this->field_0xd4 + (long)p_Var161);
  local_f0 = (_func_int *)(ulong)uVar12;
  uVar163 = *(uint *)(&this->field_0xd8 + (long)p_Var161);
  local_108._0_8_ = CONCAT44(0,uVar163);
  local_38 = top_blob;
  if ((uVar10 == 0x10) && (uVar162 == 0x10)) {
    if (0 < local_158.c) {
      iVar182 = *(int *)(&this->field_0xdc + (long)p_Var161);
      iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var161);
      iVar158 = *(int *)(&this->field_0xe4 + (long)p_Var161);
      iVar181 = *(int *)(&this->field_0xe8 + (long)p_Var161);
      uVar13 = *(undefined4 *)(&this->field_0x114 + (long)p_Var161);
      lVar175 = *(long *)(&this->field_0x1a8 + (long)p_Var161);
      auVar292 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar293 = vxorps_avx512dq(auVar292,(undefined1  [64])_ps512_cephes_log_q2);
      in_ZMM9 = vxorps_avx512dq(auVar292,(undefined1  [64])_ps512_cephes_log_q1);
      auVar294 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      local_98 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar292);
      local_1d0 = 0;
      auVar186 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
      in_ZMM29 = ZEXT1664(auVar186);
      auVar292 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      do {
        local_e8._0_4_ = local_158.h;
        if (0 < local_158.h) {
          iVar174 = bottom_blob->w;
          iVar155 = bottom_blob->h;
          ppp_Var170 = (_func_int ***)
                       ((long)(_func_int ***)local_158.data +
                       local_158.cstep * local_1d0 * local_158.elemsize);
          uVar164 = bottom_blob->c;
          iVar180 = 0;
          do {
            if (0 < local_158.w) {
              uVar166 = 0;
              local_214 = (1 - uVar12) * iVar182;
              do {
                if (lVar175 == 0) {
                  auVar309 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar309 = *(undefined1 (*) [64])(lVar175 + local_1d0 * 0x40);
                }
                if (0 < (int)uVar164) {
                  pvVar178 = (void *)((this->weight_data_tm).cstep * local_1d0 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar15 = bottom_blob->data;
                  uVar160 = 0;
                  do {
                    if (0 < (int)uVar163) {
                      uVar176 = 0;
                      uVar177 = 0;
                      do {
                        iVar151 = (((int)uVar177 - uVar163) + 1) * iVar11 + iVar180;
                        if ((((-1 < iVar151) &&
                             (iVar152 = iVar151 / iVar181, iVar151 % iVar181 == 0)) &&
                            (0 < (int)uVar12)) && (iVar152 < iVar155)) {
                          lVar167 = (long)iVar152 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar160;
                          p_Var169 = local_f0;
                          uVar171 = uVar176;
                          iVar151 = local_214;
                          do {
                            if (((-1 < iVar151) &&
                                (iVar152 = iVar151 / iVar158, iVar151 % iVar158 == 0)) &&
                               (iVar152 < iVar174)) {
                              lVar159 = (long)(iVar152 << 4);
                              auVar295 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167)));
                              auVar296 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 4)));
                              in_ZMM16 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 8)));
                              in_ZMM17 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0xc)));
                              auVar297 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x10)))
                              ;
                              auVar298 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x14)))
                              ;
                              auVar299 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x18)))
                              ;
                              auVar300 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x1c)))
                              ;
                              auVar301 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x20)))
                              ;
                              auVar302 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x24)))
                              ;
                              auVar303 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x28)))
                              ;
                              auVar304 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x2c)))
                              ;
                              auVar305 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x30)))
                              ;
                              auVar306 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x34)))
                              ;
                              auVar307 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x38)))
                              ;
                              auVar308 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x3c)))
                              ;
                              uVar172 = uVar171 & 0xffffffff;
                              auVar309 = vfmadd231ps_avx512f(auVar309,auVar295,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar172 * 4));
                              auVar309 = vfmadd231ps_avx512f(auVar309,auVar296,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar172 * 4 + 0x40))
                              ;
                              auVar309 = vfmadd231ps_avx512f(auVar309,in_ZMM16,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar172 * 4 + 0x80))
                              ;
                              auVar309 = vfmadd231ps_avx512f(auVar309,in_ZMM17,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar172 * 4 + 0xc0))
                              ;
                              auVar309 = vfmadd231ps_avx512f(auVar309,auVar297,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar172 * 4 + 0x100)
                                                            );
                              auVar309 = vfmadd231ps_avx512f(auVar309,auVar298,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar172 * 4 + 0x140)
                                                            );
                              auVar309 = vfmadd231ps_avx512f(auVar309,auVar299,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar172 * 4 + 0x180)
                                                            );
                              auVar309 = vfmadd231ps_avx512f(auVar309,auVar300,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar172 * 4 + 0x1c0)
                                                            );
                              auVar309 = vfmadd231ps_avx512f(auVar309,auVar301,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar172 * 4 + 0x200)
                                                            );
                              auVar309 = vfmadd231ps_avx512f(auVar309,auVar302,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar172 * 4 + 0x240)
                                                            );
                              auVar309 = vfmadd231ps_avx512f(auVar309,auVar303,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar172 * 4 + 0x280)
                                                            );
                              auVar309 = vfmadd231ps_avx512f(auVar309,auVar304,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar172 * 4 + 0x2c0)
                                                            );
                              auVar309 = vfmadd231ps_avx512f(auVar309,auVar305,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar172 * 4 + 0x300)
                                                            );
                              auVar309 = vfmadd231ps_avx512f(auVar309,auVar306,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar172 * 4 + 0x340)
                                                            );
                              auVar309 = vfmadd231ps_avx512f(auVar309,auVar307,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar172 * 4 + 0x380)
                                                            );
                              auVar309 = vfmadd231ps_avx512f(auVar309,auVar308,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar172 * 4 + 0x3c0)
                                                            );
                            }
                            uVar171 = uVar171 + 0x100;
                            iVar151 = iVar151 + iVar182;
                            p_Var169 = p_Var169 + -1;
                          } while (p_Var169 != (_func_int *)0x0);
                        }
                        uVar177 = uVar177 + 1;
                        uVar176 = uVar176 + (long)local_f0 * 0x100;
                      } while (uVar177 != CONCAT44(0,uVar163));
                    }
                    pvVar178 = (void *)((long)pvVar178 + (long)(int)(uVar12 * uVar163 * 0x100) * 4);
                    uVar160 = uVar160 + 1;
                  } while (uVar160 != uVar164);
                }
                switch(uVar13) {
                case 1:
                  auVar309 = vmaxps_avx512f(auVar309,in_ZMM29);
                  break;
                case 2:
                  uVar160 = vcmpps_avx512f(auVar309,in_ZMM29,1);
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                  auVar303._4_4_ = uVar2;
                  auVar303._0_4_ = uVar2;
                  auVar303._8_4_ = uVar2;
                  auVar303._12_4_ = uVar2;
                  auVar303._16_4_ = uVar2;
                  auVar303._20_4_ = uVar2;
                  auVar303._24_4_ = uVar2;
                  auVar303._28_4_ = uVar2;
                  auVar303._32_4_ = uVar2;
                  auVar303._36_4_ = uVar2;
                  auVar303._40_4_ = uVar2;
                  auVar303._44_4_ = uVar2;
                  auVar303._48_4_ = uVar2;
                  auVar303._52_4_ = uVar2;
                  auVar303._56_4_ = uVar2;
                  auVar303._60_4_ = uVar2;
                  auVar295 = vmulps_avx512f(auVar309,auVar303);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar304._0_4_ = (uint)bVar24 * auVar295._0_4_ | (uint)!bVar24 * auVar309._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar304._4_4_ = (uint)bVar24 * auVar295._4_4_ | (uint)!bVar24 * auVar309._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar304._8_4_ = (uint)bVar24 * auVar295._8_4_ | (uint)!bVar24 * auVar309._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar304._12_4_ = (uint)bVar24 * auVar295._12_4_ | (uint)!bVar24 * auVar309._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  auVar304._16_4_ = (uint)bVar24 * auVar295._16_4_ | (uint)!bVar24 * auVar309._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  auVar304._20_4_ = (uint)bVar24 * auVar295._20_4_ | (uint)!bVar24 * auVar309._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  auVar304._24_4_ = (uint)bVar24 * auVar295._24_4_ | (uint)!bVar24 * auVar309._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  auVar304._28_4_ = (uint)bVar24 * auVar295._28_4_ | (uint)!bVar24 * auVar309._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 8) & 1);
                  auVar304._32_4_ = (uint)bVar24 * auVar295._32_4_ | (uint)!bVar24 * auVar309._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  auVar304._36_4_ = (uint)bVar24 * auVar295._36_4_ | (uint)!bVar24 * auVar309._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  auVar304._40_4_ = (uint)bVar24 * auVar295._40_4_ | (uint)!bVar24 * auVar309._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  auVar304._44_4_ = (uint)bVar24 * auVar295._44_4_ | (uint)!bVar24 * auVar309._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  auVar304._48_4_ = (uint)bVar24 * auVar295._48_4_ | (uint)!bVar24 * auVar309._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  auVar304._52_4_ = (uint)bVar24 * auVar295._52_4_ | (uint)!bVar24 * auVar309._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  auVar304._56_4_ = (uint)bVar24 * auVar295._56_4_ | (uint)!bVar24 * auVar309._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  auVar304._60_4_ = (uint)bVar24 * auVar295._60_4_ | (uint)!bVar24 * auVar309._60_4_
                  ;
                  auVar309 = auVar304;
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                  auVar302._4_4_ = uVar2;
                  auVar302._0_4_ = uVar2;
                  auVar302._8_4_ = uVar2;
                  auVar302._12_4_ = uVar2;
                  auVar302._16_4_ = uVar2;
                  auVar302._20_4_ = uVar2;
                  auVar302._24_4_ = uVar2;
                  auVar302._28_4_ = uVar2;
                  auVar302._32_4_ = uVar2;
                  auVar302._36_4_ = uVar2;
                  auVar302._40_4_ = uVar2;
                  auVar302._44_4_ = uVar2;
                  auVar302._48_4_ = uVar2;
                  auVar302._52_4_ = uVar2;
                  auVar302._56_4_ = uVar2;
                  auVar302._60_4_ = uVar2;
                  auVar295 = vmaxps_avx512f(auVar309,auVar302);
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var161))[1];
                  auVar309._4_4_ = uVar2;
                  auVar309._0_4_ = uVar2;
                  auVar309._8_4_ = uVar2;
                  auVar309._12_4_ = uVar2;
                  auVar309._16_4_ = uVar2;
                  auVar309._20_4_ = uVar2;
                  auVar309._24_4_ = uVar2;
                  auVar309._28_4_ = uVar2;
                  auVar309._32_4_ = uVar2;
                  auVar309._36_4_ = uVar2;
                  auVar309._40_4_ = uVar2;
                  auVar309._44_4_ = uVar2;
                  auVar309._48_4_ = uVar2;
                  auVar309._52_4_ = uVar2;
                  auVar309._56_4_ = uVar2;
                  auVar309._60_4_ = uVar2;
                  auVar309 = vminps_avx512f(auVar295,auVar309);
                  break;
                case 4:
                  auVar296._8_4_ = 0x80000000;
                  auVar296._0_8_ = 0x8000000080000000;
                  auVar296._12_4_ = 0x80000000;
                  auVar296._16_4_ = 0x80000000;
                  auVar296._20_4_ = 0x80000000;
                  auVar296._24_4_ = 0x80000000;
                  auVar296._28_4_ = 0x80000000;
                  auVar296._32_4_ = 0x80000000;
                  auVar296._36_4_ = 0x80000000;
                  auVar296._40_4_ = 0x80000000;
                  auVar296._44_4_ = 0x80000000;
                  auVar296._48_4_ = 0x80000000;
                  auVar296._52_4_ = 0x80000000;
                  auVar296._56_4_ = 0x80000000;
                  auVar296._60_4_ = 0x80000000;
                  auVar309 = vxorps_avx512dq(auVar309,auVar296);
                  auVar309 = vminps_avx512f(auVar309,(undefined1  [64])afVar134);
                  auVar309 = vmaxps_avx512f(auVar309,(undefined1  [64])afVar135);
                  auVar295 = vfmadd213ps_avx512f((undefined1  [64])afVar136,auVar309,
                                                 (undefined1  [64])afVar142);
                  auVar296 = vrndscaleps_avx512f(auVar295,1);
                  uVar160 = vcmpps_avx512f(auVar295,auVar296,1);
                  auVar295 = vsubps_avx512f(auVar296,(undefined1  [64])afVar133);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar297._0_4_ = (uint)bVar24 * auVar295._0_4_ | (uint)!bVar24 * auVar296._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar297._4_4_ = (uint)bVar24 * auVar295._4_4_ | (uint)!bVar24 * auVar296._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar297._8_4_ = (uint)bVar24 * auVar295._8_4_ | (uint)!bVar24 * auVar296._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar297._12_4_ = (uint)bVar24 * auVar295._12_4_ | (uint)!bVar24 * auVar296._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  auVar297._16_4_ = (uint)bVar24 * auVar295._16_4_ | (uint)!bVar24 * auVar296._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  auVar297._20_4_ = (uint)bVar24 * auVar295._20_4_ | (uint)!bVar24 * auVar296._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  auVar297._24_4_ = (uint)bVar24 * auVar295._24_4_ | (uint)!bVar24 * auVar296._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  auVar297._28_4_ = (uint)bVar24 * auVar295._28_4_ | (uint)!bVar24 * auVar296._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 8) & 1);
                  auVar297._32_4_ = (uint)bVar24 * auVar295._32_4_ | (uint)!bVar24 * auVar296._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  auVar297._36_4_ = (uint)bVar24 * auVar295._36_4_ | (uint)!bVar24 * auVar296._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  auVar297._40_4_ = (uint)bVar24 * auVar295._40_4_ | (uint)!bVar24 * auVar296._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  auVar297._44_4_ = (uint)bVar24 * auVar295._44_4_ | (uint)!bVar24 * auVar296._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  auVar297._48_4_ = (uint)bVar24 * auVar295._48_4_ | (uint)!bVar24 * auVar296._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  auVar297._52_4_ = (uint)bVar24 * auVar295._52_4_ | (uint)!bVar24 * auVar296._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  auVar297._56_4_ = (uint)bVar24 * auVar295._56_4_ | (uint)!bVar24 * auVar296._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  auVar297._60_4_ = (uint)bVar24 * auVar295._60_4_ | (uint)!bVar24 * auVar296._60_4_
                  ;
                  auVar309 = vfmadd231ps_avx512f(auVar309,auVar297,auVar293);
                  in_ZMM16 = vfmadd231ps_avx512f(auVar309,auVar297,in_ZMM9);
                  auVar309 = vmulps_avx512f(in_ZMM16,in_ZMM16);
                  auVar295 = vfmadd213ps_avx512f(in_ZMM16,(undefined1  [64])afVar137,
                                                 (undefined1  [64])afVar138);
                  auVar295 = vfmadd213ps_avx512f(auVar295,in_ZMM16,(undefined1  [64])afVar139);
                  auVar295 = vfmadd213ps_avx512f(auVar295,in_ZMM16,(undefined1  [64])afVar140);
                  auVar295 = vfmadd213ps_avx512f(auVar295,in_ZMM16,(undefined1  [64])afVar141);
                  auVar295 = vfmadd213ps_avx512f(auVar295,in_ZMM16,(undefined1  [64])afVar142);
                  auVar309 = vfmadd213ps_avx512f(auVar295,auVar309,in_ZMM16);
                  auVar309 = vaddps_avx512f(auVar309,(undefined1  [64])afVar133);
                  auVar295 = vcvttps2dq_avx512f(auVar297);
                  auVar295 = vpaddd_avx512f(auVar295,auVar294);
                  auVar295 = vpslld_avx512f(auVar295,0x17);
                  auVar309 = vfmadd213ps_avx512f(auVar295,auVar309,auVar292);
                  auVar295 = vrcp14ps_avx512f(auVar309);
                  auVar309 = vfmsub213ps_avx512f(auVar309,auVar295,auVar292);
                  auVar309 = vfnmadd132ps_avx512vl(auVar309,auVar295,auVar295);
                  break;
                case 5:
                  auVar295 = vminps_avx512f(auVar309,(undefined1  [64])afVar134);
                  auVar295 = vmaxps_avx512f(auVar295,(undefined1  [64])afVar135);
                  auVar296 = vfmadd213ps_avx512f((undefined1  [64])afVar136,auVar295,
                                                 (undefined1  [64])afVar142);
                  auVar297 = vrndscaleps_avx512f(auVar296,1);
                  uVar160 = vcmpps_avx512f(auVar296,auVar297,1);
                  auVar296 = vsubps_avx512f(auVar297,(undefined1  [64])afVar133);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar298._0_4_ = (uint)bVar24 * auVar296._0_4_ | (uint)!bVar24 * auVar297._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar298._4_4_ = (uint)bVar24 * auVar296._4_4_ | (uint)!bVar24 * auVar297._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar298._8_4_ = (uint)bVar24 * auVar296._8_4_ | (uint)!bVar24 * auVar297._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar298._12_4_ = (uint)bVar24 * auVar296._12_4_ | (uint)!bVar24 * auVar297._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  auVar298._16_4_ = (uint)bVar24 * auVar296._16_4_ | (uint)!bVar24 * auVar297._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  auVar298._20_4_ = (uint)bVar24 * auVar296._20_4_ | (uint)!bVar24 * auVar297._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  auVar298._24_4_ = (uint)bVar24 * auVar296._24_4_ | (uint)!bVar24 * auVar297._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  auVar298._28_4_ = (uint)bVar24 * auVar296._28_4_ | (uint)!bVar24 * auVar297._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 8) & 1);
                  auVar298._32_4_ = (uint)bVar24 * auVar296._32_4_ | (uint)!bVar24 * auVar297._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  auVar298._36_4_ = (uint)bVar24 * auVar296._36_4_ | (uint)!bVar24 * auVar297._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  auVar298._40_4_ = (uint)bVar24 * auVar296._40_4_ | (uint)!bVar24 * auVar297._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  auVar298._44_4_ = (uint)bVar24 * auVar296._44_4_ | (uint)!bVar24 * auVar297._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  auVar298._48_4_ = (uint)bVar24 * auVar296._48_4_ | (uint)!bVar24 * auVar297._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  auVar298._52_4_ = (uint)bVar24 * auVar296._52_4_ | (uint)!bVar24 * auVar297._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  auVar298._56_4_ = (uint)bVar24 * auVar296._56_4_ | (uint)!bVar24 * auVar297._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  auVar298._60_4_ = (uint)bVar24 * auVar296._60_4_ | (uint)!bVar24 * auVar297._60_4_
                  ;
                  auVar295 = vfmadd231ps_avx512f(auVar295,auVar298,auVar293);
                  auVar295 = vfmadd231ps_avx512f(auVar295,auVar298,in_ZMM9);
                  auVar296 = vmulps_avx512f(auVar295,auVar295);
                  auVar297 = vfmadd213ps_avx512f(auVar295,(undefined1  [64])afVar137,
                                                 (undefined1  [64])afVar138);
                  auVar297 = vfmadd213ps_avx512f(auVar297,auVar295,(undefined1  [64])afVar139);
                  auVar297 = vfmadd213ps_avx512f(auVar297,auVar295,(undefined1  [64])afVar140);
                  auVar297 = vfmadd213ps_avx512f(auVar297,auVar295,(undefined1  [64])afVar141);
                  auVar297 = vfmadd213ps_avx512f(auVar297,auVar295,(undefined1  [64])afVar142);
                  auVar295 = vfmadd213ps_avx512f(auVar297,auVar296,auVar295);
                  auVar295 = vaddps_avx512f(auVar295,(undefined1  [64])afVar133);
                  auVar296 = vcvttps2dq_avx512f(auVar298);
                  auVar296 = vpaddd_avx512f(auVar296,auVar294);
                  auVar296 = vpslld_avx512f(auVar296,0x17);
                  auVar295 = vfmadd213ps_avx512f(auVar296,auVar295,auVar292);
                  auVar296 = vmaxps_avx512f(auVar295,(undefined1  [64])_ps512_min_norm_pos);
                  auVar297 = vpsrld_avx512f(auVar296,0x17);
                  auVar296 = vpternlogd_avx512f(auVar296,(undefined1  [64])afVar142,
                                                (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar160 = vcmpps_avx512f(auVar296,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar298 = vsubps_avx512f(auVar296,(undefined1  [64])afVar133);
                  auVar296 = vaddps_avx512f(auVar298,auVar296);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar299._0_4_ = (uint)bVar24 * auVar296._0_4_ | (uint)!bVar24 * auVar298._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar299._4_4_ = (uint)bVar24 * auVar296._4_4_ | (uint)!bVar24 * auVar298._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar299._8_4_ = (uint)bVar24 * auVar296._8_4_ | (uint)!bVar24 * auVar298._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar299._12_4_ = (uint)bVar24 * auVar296._12_4_ | (uint)!bVar24 * auVar298._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  auVar299._16_4_ = (uint)bVar24 * auVar296._16_4_ | (uint)!bVar24 * auVar298._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  auVar299._20_4_ = (uint)bVar24 * auVar296._20_4_ | (uint)!bVar24 * auVar298._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  auVar299._24_4_ = (uint)bVar24 * auVar296._24_4_ | (uint)!bVar24 * auVar298._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  auVar299._28_4_ = (uint)bVar24 * auVar296._28_4_ | (uint)!bVar24 * auVar298._28_4_
                  ;
                  bVar32 = (byte)(uVar160 >> 8);
                  bVar24 = (bool)(bVar32 & 1);
                  auVar299._32_4_ = (uint)bVar24 * auVar296._32_4_ | (uint)!bVar24 * auVar298._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  auVar299._36_4_ = (uint)bVar24 * auVar296._36_4_ | (uint)!bVar24 * auVar298._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  auVar299._40_4_ = (uint)bVar24 * auVar296._40_4_ | (uint)!bVar24 * auVar298._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  auVar299._44_4_ = (uint)bVar24 * auVar296._44_4_ | (uint)!bVar24 * auVar298._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  auVar299._48_4_ = (uint)bVar24 * auVar296._48_4_ | (uint)!bVar24 * auVar298._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  auVar299._52_4_ = (uint)bVar24 * auVar296._52_4_ | (uint)!bVar24 * auVar298._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  auVar299._56_4_ = (uint)bVar24 * auVar296._56_4_ | (uint)!bVar24 * auVar298._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  auVar299._60_4_ = (uint)bVar24 * auVar296._60_4_ | (uint)!bVar24 * auVar298._60_4_
                  ;
                  auVar296 = vmulps_avx512f(auVar299,auVar299);
                  auVar298 = vfmadd132ps_avx512f(auVar299,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar298 = vfmadd213ps_avx512f(auVar298,auVar299,
                                                 (undefined1  [64])_ps512_cephes_log_p2);
                  auVar298 = vfmadd213ps_avx512f(auVar298,auVar299,
                                                 (undefined1  [64])_ps512_cephes_log_p3);
                  auVar298 = vfmadd213ps_avx512f(auVar298,auVar299,
                                                 (undefined1  [64])_ps512_cephes_log_p4);
                  auVar298 = vfmadd213ps_avx512f(auVar298,auVar299,
                                                 (undefined1  [64])_ps512_cephes_log_p5);
                  auVar298 = vfmadd213ps_avx512f(auVar298,auVar299,
                                                 (undefined1  [64])_ps512_cephes_log_p6);
                  auVar298 = vfmadd213ps_avx512f(auVar298,auVar299,
                                                 (undefined1  [64])_ps512_cephes_log_p7);
                  auVar298 = vfmadd213ps_avx512f(auVar298,auVar299,
                                                 (undefined1  [64])_ps512_cephes_log_p8);
                  auVar300 = vmulps_avx512f(auVar296,auVar299);
                  auVar298 = vfmadd213ps_avx512f(auVar300,auVar298,auVar299);
                  uVar176 = vcmpps_avx512f(auVar295,in_ZMM29,2);
                  auVar295 = vpsubd_avx512f(auVar297,auVar294);
                  auVar295 = vcvtdq2ps_avx512f(auVar295);
                  auVar297 = vaddps_avx512f(auVar295,(undefined1  [64])afVar133);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar300._0_4_ = (uint)bVar24 * auVar295._0_4_ | (uint)!bVar24 * auVar297._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar300._4_4_ = (uint)bVar24 * auVar295._4_4_ | (uint)!bVar24 * auVar297._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar300._8_4_ = (uint)bVar24 * auVar295._8_4_ | (uint)!bVar24 * auVar297._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar300._12_4_ = (uint)bVar24 * auVar295._12_4_ | (uint)!bVar24 * auVar297._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  auVar300._16_4_ = (uint)bVar24 * auVar295._16_4_ | (uint)!bVar24 * auVar297._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  auVar300._20_4_ = (uint)bVar24 * auVar295._20_4_ | (uint)!bVar24 * auVar297._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  auVar300._24_4_ = (uint)bVar24 * auVar295._24_4_ | (uint)!bVar24 * auVar297._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  auVar300._28_4_ = (uint)bVar24 * auVar295._28_4_ | (uint)!bVar24 * auVar297._28_4_
                  ;
                  bVar24 = (bool)(bVar32 & 1);
                  auVar300._32_4_ = (uint)bVar24 * auVar295._32_4_ | (uint)!bVar24 * auVar297._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  auVar300._36_4_ = (uint)bVar24 * auVar295._36_4_ | (uint)!bVar24 * auVar297._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  auVar300._40_4_ = (uint)bVar24 * auVar295._40_4_ | (uint)!bVar24 * auVar297._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  auVar300._44_4_ = (uint)bVar24 * auVar295._44_4_ | (uint)!bVar24 * auVar297._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  auVar300._48_4_ = (uint)bVar24 * auVar295._48_4_ | (uint)!bVar24 * auVar297._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  auVar300._52_4_ = (uint)bVar24 * auVar295._52_4_ | (uint)!bVar24 * auVar297._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  auVar300._56_4_ = (uint)bVar24 * auVar295._56_4_ | (uint)!bVar24 * auVar297._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  auVar300._60_4_ = (uint)bVar24 * auVar295._60_4_ | (uint)!bVar24 * auVar297._60_4_
                  ;
                  auVar295 = vfmadd231ps_avx512f(auVar298,auVar300,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar295 = vfmadd231ps_avx512f(auVar295,auVar296,local_98);
                  auVar295 = vfmadd231ps_avx512f(auVar295,auVar300,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar296 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
                  auVar295 = vmulps_avx512f(auVar295,auVar296);
                  auVar297 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar24 = (bool)((byte)uVar176 & 1);
                  auVar301._0_4_ = (uint)bVar24 * auVar297._0_4_ | (uint)!bVar24 * auVar295._0_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 1) & 1);
                  auVar301._4_4_ = (uint)bVar24 * auVar297._4_4_ | (uint)!bVar24 * auVar295._4_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 2) & 1);
                  auVar301._8_4_ = (uint)bVar24 * auVar297._8_4_ | (uint)!bVar24 * auVar295._8_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 3) & 1);
                  auVar301._12_4_ = (uint)bVar24 * auVar297._12_4_ | (uint)!bVar24 * auVar295._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 4) & 1);
                  auVar301._16_4_ = (uint)bVar24 * auVar297._16_4_ | (uint)!bVar24 * auVar295._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 5) & 1);
                  auVar301._20_4_ = (uint)bVar24 * auVar297._20_4_ | (uint)!bVar24 * auVar295._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 6) & 1);
                  auVar301._24_4_ = (uint)bVar24 * auVar297._24_4_ | (uint)!bVar24 * auVar295._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 7) & 1);
                  auVar301._28_4_ = (uint)bVar24 * auVar297._28_4_ | (uint)!bVar24 * auVar295._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 8) & 1);
                  auVar301._32_4_ = (uint)bVar24 * auVar297._32_4_ | (uint)!bVar24 * auVar295._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 9) & 1);
                  auVar301._36_4_ = (uint)bVar24 * auVar297._36_4_ | (uint)!bVar24 * auVar295._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 10) & 1);
                  auVar301._40_4_ = (uint)bVar24 * auVar297._40_4_ | (uint)!bVar24 * auVar295._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 0xb) & 1);
                  auVar301._44_4_ = (uint)bVar24 * auVar297._44_4_ | (uint)!bVar24 * auVar295._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 0xc) & 1);
                  auVar301._48_4_ = (uint)bVar24 * auVar297._48_4_ | (uint)!bVar24 * auVar295._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 0xd) & 1);
                  auVar301._52_4_ = (uint)bVar24 * auVar297._52_4_ | (uint)!bVar24 * auVar295._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 0xe) & 1);
                  auVar301._56_4_ = (uint)bVar24 * auVar297._56_4_ | (uint)!bVar24 * auVar295._56_4_
                  ;
                  bVar24 = SUB81(uVar176 >> 0xf,0);
                  auVar301._60_4_ = (uint)bVar24 * auVar297._60_4_ | (uint)!bVar24 * auVar295._60_4_
                  ;
                  auVar295 = vminps_avx512f(auVar301,(undefined1  [64])afVar134);
                  auVar295 = vmaxps_avx512f(auVar295,(undefined1  [64])afVar135);
                  auVar297 = vfmadd213ps_avx512f((undefined1  [64])afVar136,auVar295,
                                                 (undefined1  [64])afVar142);
                  auVar298 = vrndscaleps_avx512f(auVar297,1);
                  uVar160 = vcmpps_avx512f(auVar297,auVar298,1);
                  auVar297 = vsubps_avx512f(auVar298,(undefined1  [64])afVar133);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  in_ZMM16._0_4_ = (uint)bVar24 * auVar297._0_4_ | (uint)!bVar24 * auVar298._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  in_ZMM16._4_4_ = (uint)bVar24 * auVar297._4_4_ | (uint)!bVar24 * auVar298._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  in_ZMM16._8_4_ = (uint)bVar24 * auVar297._8_4_ | (uint)!bVar24 * auVar298._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  in_ZMM16._12_4_ = (uint)bVar24 * auVar297._12_4_ | (uint)!bVar24 * auVar298._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  in_ZMM16._16_4_ = (uint)bVar24 * auVar297._16_4_ | (uint)!bVar24 * auVar298._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  in_ZMM16._20_4_ = (uint)bVar24 * auVar297._20_4_ | (uint)!bVar24 * auVar298._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  in_ZMM16._24_4_ = (uint)bVar24 * auVar297._24_4_ | (uint)!bVar24 * auVar298._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  in_ZMM16._28_4_ = (uint)bVar24 * auVar297._28_4_ | (uint)!bVar24 * auVar298._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 8) & 1);
                  in_ZMM16._32_4_ = (uint)bVar24 * auVar297._32_4_ | (uint)!bVar24 * auVar298._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  in_ZMM16._36_4_ = (uint)bVar24 * auVar297._36_4_ | (uint)!bVar24 * auVar298._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  in_ZMM16._40_4_ = (uint)bVar24 * auVar297._40_4_ | (uint)!bVar24 * auVar298._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  in_ZMM16._44_4_ = (uint)bVar24 * auVar297._44_4_ | (uint)!bVar24 * auVar298._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  in_ZMM16._48_4_ = (uint)bVar24 * auVar297._48_4_ | (uint)!bVar24 * auVar298._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  in_ZMM16._52_4_ = (uint)bVar24 * auVar297._52_4_ | (uint)!bVar24 * auVar298._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  in_ZMM16._56_4_ = (uint)bVar24 * auVar297._56_4_ | (uint)!bVar24 * auVar298._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  in_ZMM16._60_4_ = (uint)bVar24 * auVar297._60_4_ | (uint)!bVar24 * auVar298._60_4_
                  ;
                  auVar295 = vfmadd231ps_avx512f(auVar295,in_ZMM16,auVar293);
                  auVar295 = vfmadd231ps_avx512f(auVar295,in_ZMM16,in_ZMM9);
                  auVar297 = vmulps_avx512f(auVar295,auVar295);
                  auVar298 = vfmadd213ps_avx512f(auVar295,(undefined1  [64])afVar137,
                                                 (undefined1  [64])afVar138);
                  auVar298 = vfmadd213ps_avx512f(auVar298,auVar295,(undefined1  [64])afVar139);
                  auVar298 = vfmadd213ps_avx512f(auVar298,auVar295,(undefined1  [64])afVar140);
                  auVar298 = vfmadd213ps_avx512f(auVar298,auVar295,(undefined1  [64])afVar141);
                  auVar298 = vfmadd213ps_avx512f(auVar298,auVar295,(undefined1  [64])afVar142);
                  in_ZMM17 = vfmadd213ps_avx512f(auVar298,auVar297,auVar295);
                  auVar295 = vaddps_avx512f(in_ZMM17,(undefined1  [64])afVar133);
                  auVar297 = vcvttps2dq_avx512f(in_ZMM16);
                  auVar297 = vpaddd_avx512f(auVar297,auVar294);
                  auVar297 = vpslld_avx512f(auVar297,0x17);
                  auVar295 = vfmadd213ps_avx512f(auVar297,auVar295,auVar292);
                  auVar297 = vrcp14ps_avx512f(auVar295);
                  auVar295 = vfmsub213ps_avx512f(auVar295,auVar297,auVar292);
                  auVar295 = vfnmadd132ps_avx512vl(auVar295,auVar297,auVar297);
                  auVar295 = vfnmsub213ps_avx512f(auVar295,auVar296,auVar292);
                  auVar309 = vmulps_avx512f(auVar295,auVar309);
                  break;
                case 6:
                  auVar296 = vbroadcastss_avx512f
                                       (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var161)));
                  uVar1 = (*(uint **)(&this->field_0x118 + (long)p_Var161))[1];
                  auVar295._4_4_ = uVar1;
                  auVar295._0_4_ = uVar1;
                  auVar295._8_4_ = uVar1;
                  auVar295._12_4_ = uVar1;
                  auVar295._16_4_ = uVar1;
                  auVar295._20_4_ = uVar1;
                  auVar295._24_4_ = uVar1;
                  auVar295._28_4_ = uVar1;
                  auVar295._32_4_ = uVar1;
                  auVar295._36_4_ = uVar1;
                  auVar295._40_4_ = uVar1;
                  auVar295._44_4_ = uVar1;
                  auVar295._48_4_ = uVar1;
                  auVar295._52_4_ = uVar1;
                  auVar295._56_4_ = uVar1;
                  auVar295._60_4_ = uVar1;
                  auVar295 = vfmadd213ps_avx512f(auVar296,auVar309,auVar295);
                  auVar295 = vmaxps_avx512f(auVar295,in_ZMM29);
                  auVar295 = vminps_avx512f(auVar295,auVar292);
                  auVar309 = vmulps_avx512f(auVar295,auVar309);
                }
                *(undefined1 (*) [64])ppp_Var170 = auVar309;
                ppp_Var170 = ppp_Var170 + 8;
                uVar166 = uVar166 + 1;
                local_214 = local_214 + 1;
              } while (uVar166 != local_158.w);
            }
            iVar180 = iVar180 + 1;
          } while (iVar180 != local_158.h);
        }
        local_1d0 = local_1d0 + 1;
      } while (local_1d0 != local_158.c);
      goto LAB_0029c062;
    }
LAB_002a2e50:
    pp_Var168 = this->_vptr_Deconvolution_x86_avx512;
  }
  else {
LAB_0029c062:
    afVar147 = _ps512_cephes_log_p8;
    afVar146 = _ps512_cephes_log_p7;
    afVar145 = _ps512_cephes_log_p6;
    afVar144 = _ps512_cephes_log_p5;
    afVar143 = _ps512_cephes_log_p4;
    afVar142 = _ps512_cephes_exp_p5;
    afVar141 = _ps512_cephes_exp_p4;
    afVar140 = _ps512_cephes_exp_p3;
    afVar139 = _ps512_cephes_exp_p2;
    afVar138 = _ps512_cephes_exp_p1;
    afVar137 = _ps512_cephes_exp_p0;
    afVar136 = _ps512_cephes_LOG2EF;
    afVar135 = _ps512_exp_lo;
    afVar134 = _ps512_exp_hi;
    afVar133 = _ps512_1;
    if ((uVar10 == 8) && (uVar162 == 0x10)) {
      if ((long)local_158.c < 1) goto LAB_002a2e50;
      p_Var161 = pp_Var168[-3];
      iVar182 = *(int *)(&this->field_0xdc + (long)p_Var161);
      iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var161);
      iVar158 = *(int *)(&this->field_0xe4 + (long)p_Var161);
      iVar181 = *(int *)(&this->field_0xe8 + (long)p_Var161);
      uVar13 = *(undefined4 *)(&this->field_0x114 + (long)p_Var161);
      lVar175 = *(long *)(&this->field_0x1a8 + (long)p_Var161);
      uVar12 = *(uint *)(&this->field_0xd4 + (long)p_Var161);
      local_e8._0_8_ = p_Var161;
      uVar163 = *(uint *)(&this->field_0xd8 + (long)p_Var161);
      auVar292 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar293 = vxorps_avx512dq(auVar292,(undefined1  [64])_ps512_cephes_log_q2);
      in_ZMM9 = vxorps_avx512dq(auVar292,(undefined1  [64])_ps512_cephes_log_q1);
      auVar294 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar309 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar292);
      local_228 = 0;
      auVar186 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
      in_ZMM29 = ZEXT1664(auVar186);
      auVar295 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar296 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      do {
        if (0 < local_158.h) {
          iVar174 = bottom_blob->w;
          iVar155 = bottom_blob->h;
          ppp_Var170 = (_func_int ***)
                       ((long)(_func_int ***)local_158.data +
                       local_158.cstep * local_228 * local_158.elemsize);
          uVar164 = bottom_blob->c;
          local_98._0_8_ = local_228 * 0x40;
          iVar180 = 0;
          do {
            if (0 < local_158.w) {
              uVar166 = 0;
              iVar151 = (1 - uVar12) * iVar182;
              do {
                if (lVar175 == 0) {
                  auVar297 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar297 = *(undefined1 (*) [64])(lVar175 + local_228 * 0x40);
                }
                if (0 < (int)uVar164) {
                  pvVar178 = (void *)((this->weight_data_tm).cstep * local_228 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar15 = bottom_blob->data;
                  uVar160 = 0;
                  do {
                    if (0 < (int)uVar163) {
                      uVar177 = 0;
                      uVar176 = 0;
                      do {
                        iVar152 = (((int)uVar176 - uVar163) + 1) * iVar11 + iVar180;
                        if ((((-1 < iVar152) &&
                             (iVar153 = iVar152 / iVar181, iVar152 % iVar181 == 0)) &&
                            (0 < (int)uVar12)) && (iVar153 < iVar155)) {
                          lVar167 = (long)iVar153 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar160;
                          uVar171 = (ulong)uVar12;
                          uVar172 = uVar177;
                          iVar152 = iVar151;
                          do {
                            if (((-1 < iVar152) &&
                                (iVar153 = iVar152 / iVar158, iVar152 % iVar158 == 0)) &&
                               (iVar153 < iVar174)) {
                              lVar159 = (long)(iVar153 << 3);
                              auVar298 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167)));
                              auVar299 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 4)));
                              in_ZMM16 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 8)));
                              in_ZMM17 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0xc)));
                              auVar300 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x10)))
                              ;
                              auVar301 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x14)))
                              ;
                              auVar302 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x18)))
                              ;
                              auVar303 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x1c)))
                              ;
                              uVar184 = uVar172 & 0xffffffff;
                              auVar297 = vfmadd231ps_avx512f(auVar297,auVar298,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar184 * 4));
                              auVar297 = vfmadd231ps_avx512f(auVar297,auVar299,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar184 * 4 + 0x40))
                              ;
                              auVar297 = vfmadd231ps_avx512f(auVar297,in_ZMM16,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar184 * 4 + 0x80))
                              ;
                              auVar297 = vfmadd231ps_avx512f(auVar297,in_ZMM17,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar184 * 4 + 0xc0))
                              ;
                              auVar297 = vfmadd231ps_avx512f(auVar297,auVar300,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar184 * 4 + 0x100)
                                                            );
                              auVar297 = vfmadd231ps_avx512f(auVar297,auVar301,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar184 * 4 + 0x140)
                                                            );
                              auVar297 = vfmadd231ps_avx512f(auVar297,auVar302,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar184 * 4 + 0x180)
                                                            );
                              auVar297 = vfmadd231ps_avx512f(auVar297,auVar303,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar184 * 4 + 0x1c0)
                                                            );
                            }
                            uVar172 = uVar172 + 0x80;
                            iVar152 = iVar152 + iVar182;
                            uVar171 = uVar171 - 1;
                          } while (uVar171 != 0);
                        }
                        uVar176 = uVar176 + 1;
                        uVar177 = uVar177 + (ulong)uVar12 * 0x80;
                      } while (uVar176 != uVar163);
                    }
                    pvVar178 = (void *)((long)pvVar178 + (long)(int)(uVar12 * uVar163 * 0x80) * 4);
                    uVar160 = uVar160 + 1;
                  } while (uVar160 != uVar164);
                }
                switch(uVar13) {
                case 1:
                  auVar297 = vmaxps_avx512f(auVar297,in_ZMM29);
                  break;
                case 2:
                  uVar160 = vcmpps_avx512f(auVar297,in_ZMM29,1);
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                  auVar124._4_4_ = uVar2;
                  auVar124._0_4_ = uVar2;
                  auVar124._8_4_ = uVar2;
                  auVar124._12_4_ = uVar2;
                  auVar124._16_4_ = uVar2;
                  auVar124._20_4_ = uVar2;
                  auVar124._24_4_ = uVar2;
                  auVar124._28_4_ = uVar2;
                  auVar124._32_4_ = uVar2;
                  auVar124._36_4_ = uVar2;
                  auVar124._40_4_ = uVar2;
                  auVar124._44_4_ = uVar2;
                  auVar124._48_4_ = uVar2;
                  auVar124._52_4_ = uVar2;
                  auVar124._56_4_ = uVar2;
                  auVar124._60_4_ = uVar2;
                  auVar298 = vmulps_avx512f(auVar297,auVar124);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar312._0_4_ = (uint)bVar24 * auVar298._0_4_ | (uint)!bVar24 * auVar297._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar312._4_4_ = (uint)bVar24 * auVar298._4_4_ | (uint)!bVar24 * auVar297._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar312._8_4_ = (uint)bVar24 * auVar298._8_4_ | (uint)!bVar24 * auVar297._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar312._12_4_ = (uint)bVar24 * auVar298._12_4_ | (uint)!bVar24 * auVar297._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  auVar312._16_4_ = (uint)bVar24 * auVar298._16_4_ | (uint)!bVar24 * auVar297._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  auVar312._20_4_ = (uint)bVar24 * auVar298._20_4_ | (uint)!bVar24 * auVar297._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  auVar312._24_4_ = (uint)bVar24 * auVar298._24_4_ | (uint)!bVar24 * auVar297._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  auVar312._28_4_ = (uint)bVar24 * auVar298._28_4_ | (uint)!bVar24 * auVar297._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 8) & 1);
                  auVar312._32_4_ = (uint)bVar24 * auVar298._32_4_ | (uint)!bVar24 * auVar297._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  auVar312._36_4_ = (uint)bVar24 * auVar298._36_4_ | (uint)!bVar24 * auVar297._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  auVar312._40_4_ = (uint)bVar24 * auVar298._40_4_ | (uint)!bVar24 * auVar297._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  auVar312._44_4_ = (uint)bVar24 * auVar298._44_4_ | (uint)!bVar24 * auVar297._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  auVar312._48_4_ = (uint)bVar24 * auVar298._48_4_ | (uint)!bVar24 * auVar297._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  auVar312._52_4_ = (uint)bVar24 * auVar298._52_4_ | (uint)!bVar24 * auVar297._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  auVar312._56_4_ = (uint)bVar24 * auVar298._56_4_ | (uint)!bVar24 * auVar297._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  auVar312._60_4_ = (uint)bVar24 * auVar298._60_4_ | (uint)!bVar24 * auVar297._60_4_
                  ;
                  auVar297 = auVar312;
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                  auVar122._4_4_ = uVar2;
                  auVar122._0_4_ = uVar2;
                  auVar122._8_4_ = uVar2;
                  auVar122._12_4_ = uVar2;
                  auVar122._16_4_ = uVar2;
                  auVar122._20_4_ = uVar2;
                  auVar122._24_4_ = uVar2;
                  auVar122._28_4_ = uVar2;
                  auVar122._32_4_ = uVar2;
                  auVar122._36_4_ = uVar2;
                  auVar122._40_4_ = uVar2;
                  auVar122._44_4_ = uVar2;
                  auVar122._48_4_ = uVar2;
                  auVar122._52_4_ = uVar2;
                  auVar122._56_4_ = uVar2;
                  auVar122._60_4_ = uVar2;
                  auVar297 = vmaxps_avx512f(auVar297,auVar122);
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var161))[1];
                  auVar123._4_4_ = uVar2;
                  auVar123._0_4_ = uVar2;
                  auVar123._8_4_ = uVar2;
                  auVar123._12_4_ = uVar2;
                  auVar123._16_4_ = uVar2;
                  auVar123._20_4_ = uVar2;
                  auVar123._24_4_ = uVar2;
                  auVar123._28_4_ = uVar2;
                  auVar123._32_4_ = uVar2;
                  auVar123._36_4_ = uVar2;
                  auVar123._40_4_ = uVar2;
                  auVar123._44_4_ = uVar2;
                  auVar123._48_4_ = uVar2;
                  auVar123._52_4_ = uVar2;
                  auVar123._56_4_ = uVar2;
                  auVar123._60_4_ = uVar2;
                  auVar297 = vminps_avx512f(auVar297,auVar123);
                  break;
                case 4:
                  auVar297 = vxorps_avx512dq(auVar297,auVar292);
                  auVar297 = vminps_avx512f(auVar297,(undefined1  [64])afVar134);
                  auVar297 = vmaxps_avx512f(auVar297,(undefined1  [64])afVar135);
                  auVar298 = vfmadd213ps_avx512f((undefined1  [64])afVar136,auVar297,
                                                 (undefined1  [64])afVar142);
                  auVar299 = vrndscaleps_avx512f(auVar298,1);
                  uVar160 = vcmpps_avx512f(auVar298,auVar299,1);
                  auVar298 = vsubps_avx512f(auVar299,(undefined1  [64])afVar133);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar311._0_4_ = (uint)bVar24 * auVar298._0_4_ | (uint)!bVar24 * auVar299._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar311._4_4_ = (uint)bVar24 * auVar298._4_4_ | (uint)!bVar24 * auVar299._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar311._8_4_ = (uint)bVar24 * auVar298._8_4_ | (uint)!bVar24 * auVar299._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar311._12_4_ = (uint)bVar24 * auVar298._12_4_ | (uint)!bVar24 * auVar299._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  auVar311._16_4_ = (uint)bVar24 * auVar298._16_4_ | (uint)!bVar24 * auVar299._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  auVar311._20_4_ = (uint)bVar24 * auVar298._20_4_ | (uint)!bVar24 * auVar299._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  auVar311._24_4_ = (uint)bVar24 * auVar298._24_4_ | (uint)!bVar24 * auVar299._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  auVar311._28_4_ = (uint)bVar24 * auVar298._28_4_ | (uint)!bVar24 * auVar299._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 8) & 1);
                  auVar311._32_4_ = (uint)bVar24 * auVar298._32_4_ | (uint)!bVar24 * auVar299._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  auVar311._36_4_ = (uint)bVar24 * auVar298._36_4_ | (uint)!bVar24 * auVar299._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  auVar311._40_4_ = (uint)bVar24 * auVar298._40_4_ | (uint)!bVar24 * auVar299._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  auVar311._44_4_ = (uint)bVar24 * auVar298._44_4_ | (uint)!bVar24 * auVar299._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  auVar311._48_4_ = (uint)bVar24 * auVar298._48_4_ | (uint)!bVar24 * auVar299._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  auVar311._52_4_ = (uint)bVar24 * auVar298._52_4_ | (uint)!bVar24 * auVar299._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  auVar311._56_4_ = (uint)bVar24 * auVar298._56_4_ | (uint)!bVar24 * auVar299._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  auVar311._60_4_ = (uint)bVar24 * auVar298._60_4_ | (uint)!bVar24 * auVar299._60_4_
                  ;
                  auVar297 = vfmadd231ps_avx512f(auVar297,auVar311,auVar293);
                  in_ZMM16 = vfmadd231ps_avx512f(auVar297,auVar311,in_ZMM9);
                  auVar297 = vmulps_avx512f(in_ZMM16,in_ZMM16);
                  auVar298 = vfmadd213ps_avx512f(in_ZMM16,(undefined1  [64])afVar137,
                                                 (undefined1  [64])afVar138);
                  auVar298 = vfmadd213ps_avx512f(auVar298,in_ZMM16,(undefined1  [64])afVar139);
                  auVar298 = vfmadd213ps_avx512f(auVar298,in_ZMM16,(undefined1  [64])afVar140);
                  auVar298 = vfmadd213ps_avx512f(auVar298,in_ZMM16,(undefined1  [64])afVar141);
                  auVar298 = vfmadd213ps_avx512f(auVar298,in_ZMM16,(undefined1  [64])afVar142);
                  auVar297 = vfmadd213ps_avx512f(auVar298,auVar297,in_ZMM16);
                  auVar297 = vaddps_avx512f(auVar297,(undefined1  [64])afVar133);
                  auVar298 = vcvttps2dq_avx512f(auVar311);
                  auVar298 = vpaddd_avx512f(auVar298,auVar294);
                  auVar298 = vpslld_avx512f(auVar298,0x17);
                  auVar297 = vfmadd213ps_avx512f(auVar298,auVar297,auVar295);
                  auVar298 = vrcp14ps_avx512f(auVar297);
                  auVar297 = vfmsub213ps_avx512f(auVar297,auVar298,auVar295);
                  auVar297 = vfnmadd132ps_avx512vl(auVar297,auVar298,auVar298);
                  break;
                case 5:
                  auVar298 = vminps_avx512f(auVar297,(undefined1  [64])afVar134);
                  auVar298 = vmaxps_avx512f(auVar298,(undefined1  [64])afVar135);
                  auVar299 = vfmadd213ps_avx512f((undefined1  [64])afVar136,auVar298,
                                                 (undefined1  [64])afVar142);
                  auVar300 = vrndscaleps_avx512f(auVar299,1);
                  uVar160 = vcmpps_avx512f(auVar299,auVar300,1);
                  auVar299 = vsubps_avx512f(auVar300,(undefined1  [64])afVar133);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar306._0_4_ = (uint)bVar24 * auVar299._0_4_ | (uint)!bVar24 * auVar300._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar306._4_4_ = (uint)bVar24 * auVar299._4_4_ | (uint)!bVar24 * auVar300._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar306._8_4_ = (uint)bVar24 * auVar299._8_4_ | (uint)!bVar24 * auVar300._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar306._12_4_ = (uint)bVar24 * auVar299._12_4_ | (uint)!bVar24 * auVar300._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  auVar306._16_4_ = (uint)bVar24 * auVar299._16_4_ | (uint)!bVar24 * auVar300._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  auVar306._20_4_ = (uint)bVar24 * auVar299._20_4_ | (uint)!bVar24 * auVar300._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  auVar306._24_4_ = (uint)bVar24 * auVar299._24_4_ | (uint)!bVar24 * auVar300._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  auVar306._28_4_ = (uint)bVar24 * auVar299._28_4_ | (uint)!bVar24 * auVar300._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 8) & 1);
                  auVar306._32_4_ = (uint)bVar24 * auVar299._32_4_ | (uint)!bVar24 * auVar300._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  auVar306._36_4_ = (uint)bVar24 * auVar299._36_4_ | (uint)!bVar24 * auVar300._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  auVar306._40_4_ = (uint)bVar24 * auVar299._40_4_ | (uint)!bVar24 * auVar300._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  auVar306._44_4_ = (uint)bVar24 * auVar299._44_4_ | (uint)!bVar24 * auVar300._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  auVar306._48_4_ = (uint)bVar24 * auVar299._48_4_ | (uint)!bVar24 * auVar300._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  auVar306._52_4_ = (uint)bVar24 * auVar299._52_4_ | (uint)!bVar24 * auVar300._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  auVar306._56_4_ = (uint)bVar24 * auVar299._56_4_ | (uint)!bVar24 * auVar300._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  auVar306._60_4_ = (uint)bVar24 * auVar299._60_4_ | (uint)!bVar24 * auVar300._60_4_
                  ;
                  auVar298 = vfmadd231ps_avx512f(auVar298,auVar306,auVar293);
                  auVar298 = vfmadd231ps_avx512f(auVar298,auVar306,in_ZMM9);
                  auVar299 = vmulps_avx512f(auVar298,auVar298);
                  auVar300 = vfmadd213ps_avx512f(auVar298,(undefined1  [64])afVar137,
                                                 (undefined1  [64])afVar138);
                  auVar300 = vfmadd213ps_avx512f(auVar300,auVar298,(undefined1  [64])afVar139);
                  auVar300 = vfmadd213ps_avx512f(auVar300,auVar298,(undefined1  [64])afVar140);
                  auVar300 = vfmadd213ps_avx512f(auVar300,auVar298,(undefined1  [64])afVar141);
                  auVar300 = vfmadd213ps_avx512f(auVar300,auVar298,(undefined1  [64])afVar142);
                  auVar298 = vfmadd213ps_avx512f(auVar300,auVar299,auVar298);
                  auVar298 = vaddps_avx512f(auVar298,(undefined1  [64])afVar133);
                  auVar299 = vcvttps2dq_avx512f(auVar306);
                  auVar299 = vpaddd_avx512f(auVar299,auVar294);
                  auVar299 = vpslld_avx512f(auVar299,0x17);
                  auVar298 = vfmadd213ps_avx512f(auVar299,auVar298,auVar295);
                  auVar299 = vmaxps_avx512f(auVar298,(undefined1  [64])_ps512_min_norm_pos);
                  auVar300 = vpsrld_avx512f(auVar299,0x17);
                  auVar299 = vpternlogd_avx512f(auVar299,(undefined1  [64])afVar142,
                                                (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar160 = vcmpps_avx512f(auVar299,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar301 = vsubps_avx512f(auVar299,(undefined1  [64])afVar133);
                  auVar299 = vaddps_avx512f(auVar301,auVar299);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar307._0_4_ = (uint)bVar24 * auVar299._0_4_ | (uint)!bVar24 * auVar301._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar307._4_4_ = (uint)bVar24 * auVar299._4_4_ | (uint)!bVar24 * auVar301._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar307._8_4_ = (uint)bVar24 * auVar299._8_4_ | (uint)!bVar24 * auVar301._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar307._12_4_ = (uint)bVar24 * auVar299._12_4_ | (uint)!bVar24 * auVar301._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  auVar307._16_4_ = (uint)bVar24 * auVar299._16_4_ | (uint)!bVar24 * auVar301._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  auVar307._20_4_ = (uint)bVar24 * auVar299._20_4_ | (uint)!bVar24 * auVar301._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  auVar307._24_4_ = (uint)bVar24 * auVar299._24_4_ | (uint)!bVar24 * auVar301._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  auVar307._28_4_ = (uint)bVar24 * auVar299._28_4_ | (uint)!bVar24 * auVar301._28_4_
                  ;
                  bVar32 = (byte)(uVar160 >> 8);
                  bVar24 = (bool)(bVar32 & 1);
                  auVar307._32_4_ = (uint)bVar24 * auVar299._32_4_ | (uint)!bVar24 * auVar301._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  auVar307._36_4_ = (uint)bVar24 * auVar299._36_4_ | (uint)!bVar24 * auVar301._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  auVar307._40_4_ = (uint)bVar24 * auVar299._40_4_ | (uint)!bVar24 * auVar301._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  auVar307._44_4_ = (uint)bVar24 * auVar299._44_4_ | (uint)!bVar24 * auVar301._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  auVar307._48_4_ = (uint)bVar24 * auVar299._48_4_ | (uint)!bVar24 * auVar301._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  auVar307._52_4_ = (uint)bVar24 * auVar299._52_4_ | (uint)!bVar24 * auVar301._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  auVar307._56_4_ = (uint)bVar24 * auVar299._56_4_ | (uint)!bVar24 * auVar301._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  auVar307._60_4_ = (uint)bVar24 * auVar299._60_4_ | (uint)!bVar24 * auVar301._60_4_
                  ;
                  auVar299 = vmulps_avx512f(auVar307,auVar307);
                  auVar301 = vfmadd132ps_avx512f(auVar307,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar301 = vfmadd213ps_avx512f(auVar301,auVar307,
                                                 (undefined1  [64])_ps512_cephes_log_p2);
                  auVar301 = vfmadd213ps_avx512f(auVar301,auVar307,
                                                 (undefined1  [64])_ps512_cephes_log_p3);
                  auVar301 = vfmadd213ps_avx512f(auVar301,auVar307,(undefined1  [64])afVar143);
                  auVar301 = vfmadd213ps_avx512f(auVar301,auVar307,(undefined1  [64])afVar144);
                  auVar301 = vfmadd213ps_avx512f(auVar301,auVar307,(undefined1  [64])afVar145);
                  auVar301 = vfmadd213ps_avx512f(auVar301,auVar307,(undefined1  [64])afVar146);
                  auVar301 = vfmadd213ps_avx512f(auVar301,auVar307,(undefined1  [64])afVar147);
                  auVar302 = vmulps_avx512f(auVar299,auVar307);
                  auVar301 = vfmadd213ps_avx512f(auVar302,auVar301,auVar307);
                  uVar176 = vcmpps_avx512f(auVar298,in_ZMM29,2);
                  auVar298 = vpsubd_avx512f(auVar300,auVar294);
                  auVar298 = vcvtdq2ps_avx512f(auVar298);
                  auVar300 = vaddps_avx512f(auVar298,(undefined1  [64])afVar133);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar308._0_4_ = (uint)bVar24 * auVar298._0_4_ | (uint)!bVar24 * auVar300._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar308._4_4_ = (uint)bVar24 * auVar298._4_4_ | (uint)!bVar24 * auVar300._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar308._8_4_ = (uint)bVar24 * auVar298._8_4_ | (uint)!bVar24 * auVar300._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar308._12_4_ = (uint)bVar24 * auVar298._12_4_ | (uint)!bVar24 * auVar300._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  auVar308._16_4_ = (uint)bVar24 * auVar298._16_4_ | (uint)!bVar24 * auVar300._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  auVar308._20_4_ = (uint)bVar24 * auVar298._20_4_ | (uint)!bVar24 * auVar300._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  auVar308._24_4_ = (uint)bVar24 * auVar298._24_4_ | (uint)!bVar24 * auVar300._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  auVar308._28_4_ = (uint)bVar24 * auVar298._28_4_ | (uint)!bVar24 * auVar300._28_4_
                  ;
                  bVar24 = (bool)(bVar32 & 1);
                  auVar308._32_4_ = (uint)bVar24 * auVar298._32_4_ | (uint)!bVar24 * auVar300._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  auVar308._36_4_ = (uint)bVar24 * auVar298._36_4_ | (uint)!bVar24 * auVar300._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  auVar308._40_4_ = (uint)bVar24 * auVar298._40_4_ | (uint)!bVar24 * auVar300._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  auVar308._44_4_ = (uint)bVar24 * auVar298._44_4_ | (uint)!bVar24 * auVar300._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  auVar308._48_4_ = (uint)bVar24 * auVar298._48_4_ | (uint)!bVar24 * auVar300._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  auVar308._52_4_ = (uint)bVar24 * auVar298._52_4_ | (uint)!bVar24 * auVar300._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  auVar308._56_4_ = (uint)bVar24 * auVar298._56_4_ | (uint)!bVar24 * auVar300._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  auVar308._60_4_ = (uint)bVar24 * auVar298._60_4_ | (uint)!bVar24 * auVar300._60_4_
                  ;
                  auVar298 = vfmadd231ps_avx512f(auVar301,auVar308,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar298 = vfmadd231ps_avx512f(auVar298,auVar309,auVar299);
                  auVar298 = vfmadd231ps_avx512f(auVar298,auVar308,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar298 = vmulps_avx512f(auVar298,auVar296);
                  auVar299 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar24 = (bool)((byte)uVar176 & 1);
                  auVar310._0_4_ = (uint)bVar24 * auVar299._0_4_ | (uint)!bVar24 * auVar298._0_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 1) & 1);
                  auVar310._4_4_ = (uint)bVar24 * auVar299._4_4_ | (uint)!bVar24 * auVar298._4_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 2) & 1);
                  auVar310._8_4_ = (uint)bVar24 * auVar299._8_4_ | (uint)!bVar24 * auVar298._8_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 3) & 1);
                  auVar310._12_4_ = (uint)bVar24 * auVar299._12_4_ | (uint)!bVar24 * auVar298._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 4) & 1);
                  auVar310._16_4_ = (uint)bVar24 * auVar299._16_4_ | (uint)!bVar24 * auVar298._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 5) & 1);
                  auVar310._20_4_ = (uint)bVar24 * auVar299._20_4_ | (uint)!bVar24 * auVar298._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 6) & 1);
                  auVar310._24_4_ = (uint)bVar24 * auVar299._24_4_ | (uint)!bVar24 * auVar298._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 7) & 1);
                  auVar310._28_4_ = (uint)bVar24 * auVar299._28_4_ | (uint)!bVar24 * auVar298._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 8) & 1);
                  auVar310._32_4_ = (uint)bVar24 * auVar299._32_4_ | (uint)!bVar24 * auVar298._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 9) & 1);
                  auVar310._36_4_ = (uint)bVar24 * auVar299._36_4_ | (uint)!bVar24 * auVar298._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 10) & 1);
                  auVar310._40_4_ = (uint)bVar24 * auVar299._40_4_ | (uint)!bVar24 * auVar298._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 0xb) & 1);
                  auVar310._44_4_ = (uint)bVar24 * auVar299._44_4_ | (uint)!bVar24 * auVar298._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 0xc) & 1);
                  auVar310._48_4_ = (uint)bVar24 * auVar299._48_4_ | (uint)!bVar24 * auVar298._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 0xd) & 1);
                  auVar310._52_4_ = (uint)bVar24 * auVar299._52_4_ | (uint)!bVar24 * auVar298._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 0xe) & 1);
                  auVar310._56_4_ = (uint)bVar24 * auVar299._56_4_ | (uint)!bVar24 * auVar298._56_4_
                  ;
                  bVar24 = SUB81(uVar176 >> 0xf,0);
                  auVar310._60_4_ = (uint)bVar24 * auVar299._60_4_ | (uint)!bVar24 * auVar298._60_4_
                  ;
                  auVar298 = vminps_avx512f(auVar310,(undefined1  [64])afVar134);
                  auVar298 = vmaxps_avx512f(auVar298,(undefined1  [64])afVar135);
                  auVar299 = vfmadd213ps_avx512f((undefined1  [64])afVar136,auVar298,
                                                 (undefined1  [64])afVar142);
                  auVar300 = vrndscaleps_avx512f(auVar299,1);
                  uVar160 = vcmpps_avx512f(auVar299,auVar300,1);
                  auVar299 = vsubps_avx512f(auVar300,(undefined1  [64])afVar133);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  in_ZMM16._0_4_ = (uint)bVar24 * auVar299._0_4_ | (uint)!bVar24 * auVar300._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  in_ZMM16._4_4_ = (uint)bVar24 * auVar299._4_4_ | (uint)!bVar24 * auVar300._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  in_ZMM16._8_4_ = (uint)bVar24 * auVar299._8_4_ | (uint)!bVar24 * auVar300._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  in_ZMM16._12_4_ = (uint)bVar24 * auVar299._12_4_ | (uint)!bVar24 * auVar300._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  in_ZMM16._16_4_ = (uint)bVar24 * auVar299._16_4_ | (uint)!bVar24 * auVar300._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  in_ZMM16._20_4_ = (uint)bVar24 * auVar299._20_4_ | (uint)!bVar24 * auVar300._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  in_ZMM16._24_4_ = (uint)bVar24 * auVar299._24_4_ | (uint)!bVar24 * auVar300._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  in_ZMM16._28_4_ = (uint)bVar24 * auVar299._28_4_ | (uint)!bVar24 * auVar300._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 8) & 1);
                  in_ZMM16._32_4_ = (uint)bVar24 * auVar299._32_4_ | (uint)!bVar24 * auVar300._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  in_ZMM16._36_4_ = (uint)bVar24 * auVar299._36_4_ | (uint)!bVar24 * auVar300._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  in_ZMM16._40_4_ = (uint)bVar24 * auVar299._40_4_ | (uint)!bVar24 * auVar300._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  in_ZMM16._44_4_ = (uint)bVar24 * auVar299._44_4_ | (uint)!bVar24 * auVar300._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  in_ZMM16._48_4_ = (uint)bVar24 * auVar299._48_4_ | (uint)!bVar24 * auVar300._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  in_ZMM16._52_4_ = (uint)bVar24 * auVar299._52_4_ | (uint)!bVar24 * auVar300._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  in_ZMM16._56_4_ = (uint)bVar24 * auVar299._56_4_ | (uint)!bVar24 * auVar300._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  in_ZMM16._60_4_ = (uint)bVar24 * auVar299._60_4_ | (uint)!bVar24 * auVar300._60_4_
                  ;
                  auVar298 = vfmadd231ps_avx512f(auVar298,in_ZMM16,auVar293);
                  auVar298 = vfmadd231ps_avx512f(auVar298,in_ZMM16,in_ZMM9);
                  auVar299 = vmulps_avx512f(auVar298,auVar298);
                  auVar300 = vfmadd213ps_avx512f(auVar298,(undefined1  [64])afVar137,
                                                 (undefined1  [64])afVar138);
                  auVar300 = vfmadd213ps_avx512f(auVar300,auVar298,(undefined1  [64])afVar139);
                  auVar300 = vfmadd213ps_avx512f(auVar300,auVar298,(undefined1  [64])afVar140);
                  auVar300 = vfmadd213ps_avx512f(auVar300,auVar298,(undefined1  [64])afVar141);
                  auVar300 = vfmadd213ps_avx512f(auVar300,auVar298,(undefined1  [64])afVar142);
                  in_ZMM17 = vfmadd213ps_avx512f(auVar300,auVar299,auVar298);
                  auVar298 = vaddps_avx512f(in_ZMM17,(undefined1  [64])afVar133);
                  auVar299 = vcvttps2dq_avx512f(in_ZMM16);
                  auVar299 = vpaddd_avx512f(auVar299,auVar294);
                  auVar299 = vpslld_avx512f(auVar299,0x17);
                  auVar298 = vfmadd213ps_avx512f(auVar299,auVar298,auVar295);
                  auVar299 = vrcp14ps_avx512f(auVar298);
                  auVar298 = vfmsub213ps_avx512f(auVar298,auVar299,auVar295);
                  auVar298 = vfnmadd132ps_avx512vl(auVar298,auVar299,auVar299);
                  auVar298 = vfnmsub213ps_avx512f(auVar298,auVar296,auVar295);
                  auVar297 = vmulps_avx512f(auVar298,auVar297);
                  break;
                case 6:
                  auVar298 = vbroadcastss_avx512f
                                       (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var161)));
                  uVar1 = (*(uint **)(&this->field_0x118 + (long)p_Var161))[1];
                  auVar305._4_4_ = uVar1;
                  auVar305._0_4_ = uVar1;
                  auVar305._8_4_ = uVar1;
                  auVar305._12_4_ = uVar1;
                  auVar305._16_4_ = uVar1;
                  auVar305._20_4_ = uVar1;
                  auVar305._24_4_ = uVar1;
                  auVar305._28_4_ = uVar1;
                  auVar305._32_4_ = uVar1;
                  auVar305._36_4_ = uVar1;
                  auVar305._40_4_ = uVar1;
                  auVar305._44_4_ = uVar1;
                  auVar305._48_4_ = uVar1;
                  auVar305._52_4_ = uVar1;
                  auVar305._56_4_ = uVar1;
                  auVar305._60_4_ = uVar1;
                  auVar298 = vfmadd213ps_avx512f(auVar298,auVar297,auVar305);
                  auVar298 = vmaxps_avx512f(auVar298,in_ZMM29);
                  auVar298 = vminps_avx512f(auVar298,auVar295);
                  auVar297 = vmulps_avx512f(auVar298,auVar297);
                }
                *(undefined1 (*) [64])ppp_Var170 = auVar297;
                ppp_Var170 = ppp_Var170 + 8;
                uVar166 = uVar166 + 1;
                iVar151 = iVar151 + 1;
              } while (uVar166 != local_158.w);
            }
            iVar180 = iVar180 + 1;
          } while (iVar180 != local_158.h);
        }
        local_228 = local_228 + 1;
      } while (local_228 != local_158.c);
    }
    if ((uVar10 == 0x10) && (uVar162 == 8)) {
      if ((long)local_158.c < 1) goto LAB_002a2e50;
      p_Var161 = pp_Var168[-3];
      iVar182 = *(int *)(&this->field_0xdc + (long)p_Var161);
      iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var161);
      iVar158 = *(int *)(&this->field_0xe4 + (long)p_Var161);
      iVar181 = *(int *)(&this->field_0xe8 + (long)p_Var161);
      iVar174 = *(int *)(&this->field_0x114 + (long)p_Var161);
      lVar175 = *(long *)(&this->field_0x1a8 + (long)p_Var161);
      uVar12 = *(uint *)(&this->field_0xd4 + (long)p_Var161);
      local_e8._0_8_ = p_Var161;
      uVar163 = *(uint *)(&this->field_0xd8 + (long)p_Var161);
      local_228 = 0;
      auVar262._8_4_ = 0x42b0c0a5;
      auVar262._0_8_ = 0x42b0c0a542b0c0a5;
      auVar262._12_4_ = 0x42b0c0a5;
      auVar262._16_4_ = 0x42b0c0a5;
      auVar262._20_4_ = 0x42b0c0a5;
      auVar262._24_4_ = 0x42b0c0a5;
      auVar262._28_4_ = 0x42b0c0a5;
      auVar263._8_4_ = 0xc2b0c0a5;
      auVar263._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar263._12_4_ = 0xc2b0c0a5;
      auVar263._16_4_ = 0xc2b0c0a5;
      auVar263._20_4_ = 0xc2b0c0a5;
      auVar263._24_4_ = 0xc2b0c0a5;
      auVar263._28_4_ = 0xc2b0c0a5;
      auVar264._8_4_ = 0x3f000000;
      auVar264._0_8_ = 0x3f0000003f000000;
      auVar264._12_4_ = 0x3f000000;
      auVar264._16_4_ = 0x3f000000;
      auVar264._20_4_ = 0x3f000000;
      auVar264._24_4_ = 0x3f000000;
      auVar264._28_4_ = 0x3f000000;
      auVar265._8_4_ = 0x3fb8aa3b;
      auVar265._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar265._12_4_ = 0x3fb8aa3b;
      auVar265._16_4_ = 0x3fb8aa3b;
      auVar265._20_4_ = 0x3fb8aa3b;
      auVar265._24_4_ = 0x3fb8aa3b;
      auVar265._28_4_ = 0x3fb8aa3b;
      auVar266._8_4_ = 0x3f800000;
      auVar266._0_8_ = 0x3f8000003f800000;
      auVar266._12_4_ = 0x3f800000;
      auVar266._16_4_ = 0x3f800000;
      auVar266._20_4_ = 0x3f800000;
      auVar266._24_4_ = 0x3f800000;
      auVar266._28_4_ = 0x3f800000;
      auVar267._8_4_ = 0x3f318000;
      auVar267._0_8_ = 0x3f3180003f318000;
      auVar267._12_4_ = 0x3f318000;
      auVar267._16_4_ = 0x3f318000;
      auVar267._20_4_ = 0x3f318000;
      auVar267._24_4_ = 0x3f318000;
      auVar267._28_4_ = 0x3f318000;
      auVar240 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar268._8_4_ = 0x3ab743ce;
      auVar268._0_8_ = 0x3ab743ce3ab743ce;
      auVar268._12_4_ = 0x3ab743ce;
      auVar268._16_4_ = 0x3ab743ce;
      auVar268._20_4_ = 0x3ab743ce;
      auVar268._24_4_ = 0x3ab743ce;
      auVar268._28_4_ = 0x3ab743ce;
      auVar269._8_4_ = 0x3c088908;
      auVar269._0_8_ = 0x3c0889083c088908;
      auVar269._12_4_ = 0x3c088908;
      auVar269._16_4_ = 0x3c088908;
      auVar269._20_4_ = 0x3c088908;
      auVar269._24_4_ = 0x3c088908;
      auVar269._28_4_ = 0x3c088908;
      auVar270._8_4_ = 0x3d2aa9c1;
      auVar270._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar270._12_4_ = 0x3d2aa9c1;
      auVar270._16_4_ = 0x3d2aa9c1;
      auVar270._20_4_ = 0x3d2aa9c1;
      auVar270._24_4_ = 0x3d2aa9c1;
      auVar270._28_4_ = 0x3d2aa9c1;
      auVar271._8_4_ = 0x3e2aaaaa;
      auVar271._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar271._12_4_ = 0x3e2aaaaa;
      auVar271._16_4_ = 0x3e2aaaaa;
      auVar271._20_4_ = 0x3e2aaaaa;
      auVar271._24_4_ = 0x3e2aaaaa;
      auVar271._28_4_ = 0x3e2aaaaa;
      auVar272._8_4_ = 0x3f800000;
      auVar272._0_8_ = 0x3f8000003f800000;
      auVar272._12_4_ = 0x3f800000;
      auVar272._16_4_ = 0x3f800000;
      auVar272._20_4_ = 0x3f800000;
      auVar272._24_4_ = 0x3f800000;
      auVar272._28_4_ = 0x3f800000;
      auVar273._8_4_ = 0xb95e8083;
      auVar273._0_8_ = 0xb95e8083b95e8083;
      auVar273._12_4_ = 0xb95e8083;
      auVar273._16_4_ = 0xb95e8083;
      auVar273._20_4_ = 0xb95e8083;
      auVar273._24_4_ = 0xb95e8083;
      auVar273._28_4_ = 0xb95e8083;
      auVar241 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      do {
        if (0 < local_158.h) {
          iVar155 = bottom_blob->w;
          iVar180 = bottom_blob->h;
          ppp_Var170 = (_func_int ***)
                       ((long)(_func_int ***)local_158.data +
                       local_158.cstep * local_228 * local_158.elemsize);
          uVar164 = bottom_blob->c;
          local_98._0_8_ = local_228 * 0x20;
          iVar151 = 0;
          do {
            if (0 < local_158.w) {
              uVar166 = 0;
              iVar152 = (1 - uVar12) * iVar182;
              do {
                if (lVar175 == 0) {
                  auVar292 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar292 = ZEXT3264(*(undefined1 (*) [32])(lVar175 + local_228 * 0x20));
                }
                if (0 < (int)uVar164) {
                  pvVar178 = (void *)((this->weight_data_tm).cstep * local_228 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar15 = bottom_blob->data;
                  uVar160 = 0;
                  do {
                    if (0 < (int)uVar163) {
                      uVar177 = 0;
                      uVar176 = 0;
                      do {
                        iVar153 = (((int)uVar176 - uVar163) + 1) * iVar11 + iVar151;
                        if ((((-1 < iVar153) &&
                             (iVar154 = iVar153 / iVar181, iVar153 % iVar181 == 0)) &&
                            (0 < (int)uVar12)) && (iVar154 < iVar180)) {
                          lVar167 = (long)iVar154 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar160;
                          uVar171 = uVar177;
                          uVar172 = (ulong)uVar12;
                          iVar153 = iVar152;
                          do {
                            if (((-1 < iVar153) &&
                                (iVar154 = iVar153 / iVar158, iVar153 % iVar158 == 0)) &&
                               (iVar154 < iVar155)) {
                              lVar159 = (long)(iVar154 << 4);
                              uVar13 = *(undefined4 *)((long)pvVar15 + lVar159 * 4 + lVar167);
                              auVar457._4_4_ = uVar13;
                              auVar457._0_4_ = uVar13;
                              auVar457._8_4_ = uVar13;
                              auVar457._12_4_ = uVar13;
                              auVar457._16_4_ = uVar13;
                              auVar457._20_4_ = uVar13;
                              auVar457._24_4_ = uVar13;
                              auVar457._28_4_ = uVar13;
                              uVar13 = *(undefined4 *)((long)pvVar15 + lVar159 * 4 + lVar167 + 4);
                              auVar455._4_4_ = uVar13;
                              auVar455._0_4_ = uVar13;
                              auVar455._8_4_ = uVar13;
                              auVar455._12_4_ = uVar13;
                              auVar455._16_4_ = uVar13;
                              auVar455._20_4_ = uVar13;
                              auVar455._24_4_ = uVar13;
                              auVar455._28_4_ = uVar13;
                              in_ZMM9 = ZEXT3264(auVar455);
                              auVar242 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 8)));
                              in_ZMM16 = ZEXT3264(auVar242);
                              auVar243 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0xc)));
                              in_ZMM17 = ZEXT3264(auVar243);
                              auVar244 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x10)))
                              ;
                              auVar245 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x14)))
                              ;
                              auVar246 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x18)))
                              ;
                              auVar247 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x1c)))
                              ;
                              auVar248 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x20)))
                              ;
                              auVar249 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x24)))
                              ;
                              auVar250 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x28)))
                              ;
                              auVar251 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x2c)))
                              ;
                              auVar252 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x30)))
                              ;
                              auVar253 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x34)))
                              ;
                              in_ZMM29 = ZEXT3264(auVar253);
                              auVar254 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x38)))
                              ;
                              auVar255 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x3c)))
                              ;
                              uVar184 = uVar171 & 0xffffffff;
                              auVar186 = vfmadd231ps_fma(auVar292._0_32_,auVar457,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar178 + uVar184 * 4));
                              auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar455,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar178 + uVar184 * 4 + 0x20));
                              auVar242 = vfmadd231ps_avx512vl
                                                   (ZEXT1632(auVar186),auVar242,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar178 + uVar184 * 4 + 0x40));
                              auVar242 = vfmadd231ps_avx512vl
                                                   (auVar242,auVar243,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar178 + uVar184 * 4 + 0x60));
                              auVar242 = vfmadd231ps_avx512vl
                                                   (auVar242,auVar244,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar178 + uVar184 * 4 + 0x80));
                              auVar242 = vfmadd231ps_avx512vl
                                                   (auVar242,auVar245,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar178 + uVar184 * 4 + 0xa0));
                              auVar242 = vfmadd231ps_avx512vl
                                                   (auVar242,auVar246,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar178 + uVar184 * 4 + 0xc0));
                              auVar242 = vfmadd231ps_avx512vl
                                                   (auVar242,auVar247,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar178 + uVar184 * 4 + 0xe0));
                              auVar242 = vfmadd231ps_avx512vl
                                                   (auVar242,auVar248,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar178 + uVar184 * 4 + 0x100));
                              auVar242 = vfmadd231ps_avx512vl
                                                   (auVar242,auVar249,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar178 + uVar184 * 4 + 0x120));
                              auVar242 = vfmadd231ps_avx512vl
                                                   (auVar242,auVar250,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar178 + uVar184 * 4 + 0x140));
                              auVar242 = vfmadd231ps_avx512vl
                                                   (auVar242,auVar251,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar178 + uVar184 * 4 + 0x160));
                              auVar242 = vfmadd231ps_avx512vl
                                                   (auVar242,auVar252,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar178 + uVar184 * 4 + 0x180));
                              auVar242 = vfmadd231ps_avx512vl
                                                   (auVar242,auVar253,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar178 + uVar184 * 4 + 0x1a0));
                              auVar242 = vfmadd231ps_avx512vl
                                                   (auVar242,auVar254,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar178 + uVar184 * 4 + 0x1c0));
                              auVar242 = vfmadd231ps_avx512vl
                                                   (auVar242,auVar255,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar178 + uVar184 * 4 + 0x1e0));
                              auVar292 = ZEXT3264(auVar242);
                            }
                            uVar171 = uVar171 + 0x80;
                            iVar153 = iVar153 + iVar182;
                            uVar172 = uVar172 - 1;
                          } while (uVar172 != 0);
                        }
                        uVar176 = uVar176 + 1;
                        uVar177 = uVar177 + (ulong)uVar12 * 0x80;
                      } while (uVar176 != uVar163);
                    }
                    pvVar178 = (void *)((long)pvVar178 + (long)(int)(uVar12 * uVar163 * 0x80) * 4);
                    uVar160 = uVar160 + 1;
                  } while (uVar160 != uVar164);
                }
                auVar242 = auVar292._0_32_;
                if (iVar174 - 1U < 6) {
                  auVar243 = ZEXT1632(ZEXT816(0) << 0x40);
                  auVar293._28_36_ = auVar292._28_36_;
                  switch(iVar174) {
                  case 1:
                    auVar242 = vmaxps_avx(auVar242,ZEXT1632(ZEXT816(0) << 0x40));
                    break;
                  case 2:
                    auVar244 = vmaxps_avx(auVar242,auVar243);
                    auVar242 = vminps_avx(auVar242,auVar243);
                    uVar13 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                    auVar91._4_4_ = uVar13;
                    auVar91._0_4_ = uVar13;
                    auVar91._8_4_ = uVar13;
                    auVar91._12_4_ = uVar13;
                    auVar91._16_4_ = uVar13;
                    auVar91._20_4_ = uVar13;
                    auVar91._24_4_ = uVar13;
                    auVar91._28_4_ = uVar13;
                    auVar242 = vfmadd132ps_avx512vl(auVar242,auVar244,auVar91);
                    break;
                  case 3:
                    uVar13 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                    auVar89._4_4_ = uVar13;
                    auVar89._0_4_ = uVar13;
                    auVar89._8_4_ = uVar13;
                    auVar89._12_4_ = uVar13;
                    auVar89._16_4_ = uVar13;
                    auVar89._20_4_ = uVar13;
                    auVar89._24_4_ = uVar13;
                    auVar89._28_4_ = uVar13;
                    auVar242 = vmaxps_avx512vl(auVar242,auVar89);
                    uVar13 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var161))[1];
                    auVar90._4_4_ = uVar13;
                    auVar90._0_4_ = uVar13;
                    auVar90._8_4_ = uVar13;
                    auVar90._12_4_ = uVar13;
                    auVar90._16_4_ = uVar13;
                    auVar90._20_4_ = uVar13;
                    auVar90._24_4_ = uVar13;
                    auVar90._28_4_ = uVar13;
                    auVar242 = vminps_avx512vl(auVar242,auVar90);
                    break;
                  case 4:
                    auVar87._8_4_ = 0x80000000;
                    auVar87._0_8_ = 0x8000000080000000;
                    auVar87._12_4_ = 0x80000000;
                    auVar87._16_4_ = 0x80000000;
                    auVar87._20_4_ = 0x80000000;
                    auVar87._24_4_ = 0x80000000;
                    auVar87._28_4_ = 0x80000000;
                    auVar242 = vxorps_avx512vl(auVar242,auVar87);
                    auVar242 = vminps_avx(auVar242,auVar262);
                    auVar242 = vmaxps_avx(auVar242,auVar263);
                    auVar186 = vfmadd231ps_fma(auVar264,auVar242,auVar265);
                    auVar243 = vrndscaleps_avx512vl(ZEXT1632(auVar186),1);
                    uVar160 = vcmpps_avx512vl(ZEXT1632(auVar186),auVar243,1);
                    auVar244 = vsubps_avx512vl(auVar243,auVar266);
                    bVar24 = (bool)((byte)uVar160 & 1);
                    auVar261._0_4_ = (uint)bVar24 * auVar244._0_4_ | (uint)!bVar24 * auVar243._0_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                    auVar261._4_4_ = (uint)bVar24 * auVar244._4_4_ | (uint)!bVar24 * auVar243._4_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                    auVar261._8_4_ = (uint)bVar24 * auVar244._8_4_ | (uint)!bVar24 * auVar243._8_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                    auVar261._12_4_ =
                         (uint)bVar24 * auVar244._12_4_ | (uint)!bVar24 * auVar243._12_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                    auVar261._16_4_ =
                         (uint)bVar24 * auVar244._16_4_ | (uint)!bVar24 * auVar243._16_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                    auVar261._20_4_ =
                         (uint)bVar24 * auVar244._20_4_ | (uint)!bVar24 * auVar243._20_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                    auVar261._24_4_ =
                         (uint)bVar24 * auVar244._24_4_ | (uint)!bVar24 * auVar243._24_4_;
                    bVar24 = SUB81(uVar160 >> 7,0);
                    auVar261._28_4_ =
                         (uint)bVar24 * auVar244._28_4_ | (uint)!bVar24 * auVar243._28_4_;
                    in_ZMM16 = ZEXT3264(auVar261);
                    auVar242 = vfmsub231ps_avx512vl(auVar242,auVar261,auVar267);
                    auVar88._8_4_ = 0x395e8083;
                    auVar88._0_8_ = 0x395e8083395e8083;
                    auVar88._12_4_ = 0x395e8083;
                    auVar88._16_4_ = 0x395e8083;
                    auVar88._20_4_ = 0x395e8083;
                    auVar88._24_4_ = 0x395e8083;
                    auVar88._28_4_ = 0x395e8083;
                    auVar242 = vfmsub231ps_avx512vl(auVar242,auVar261,auVar88);
                    auVar430._0_4_ = auVar242._0_4_ * auVar242._0_4_;
                    auVar430._4_4_ = auVar242._4_4_ * auVar242._4_4_;
                    auVar430._8_4_ = auVar242._8_4_ * auVar242._8_4_;
                    auVar430._12_4_ = auVar242._12_4_ * auVar242._12_4_;
                    auVar430._16_4_ = auVar242._16_4_ * auVar242._16_4_;
                    auVar430._20_4_ = auVar242._20_4_ * auVar242._20_4_;
                    auVar430._24_4_ = auVar242._24_4_ * auVar242._24_4_;
                    auVar430._28_4_ = 0;
                    auVar186 = vfmadd213ps_fma(auVar240,auVar242,auVar268);
                    auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),auVar242,auVar269);
                    auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),auVar242,auVar270);
                    auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),auVar242,auVar271);
                    auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),auVar242,auVar264);
                    auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),auVar430,auVar242);
                    in_ZMM9 = ZEXT1664(auVar186);
                    auVar431._0_4_ = auVar186._0_4_ + 1.0;
                    auVar431._4_4_ = auVar186._4_4_ + 1.0;
                    auVar431._8_4_ = auVar186._8_4_ + 1.0;
                    auVar431._12_4_ = auVar186._12_4_ + 1.0;
                    auVar431._16_4_ = 0x3f800000;
                    auVar431._20_4_ = 0x3f800000;
                    auVar431._24_4_ = 0x3f800000;
                    auVar431._28_4_ = 0x3f800000;
                    auVar242 = vcvttps2dq_avx512vl(auVar261);
                    auVar242 = vpslld_avx2(auVar242,0x17);
                    auVar242 = vpaddd_avx2(auVar272,auVar242);
                    auVar186 = vfmadd213ps_fma(auVar242,auVar431,auVar266);
                    auVar242 = vrcpps_avx(ZEXT1632(auVar186));
                    auVar186 = vfmsub213ps_fma(ZEXT1632(auVar186),auVar242,auVar266);
                    auVar186 = vfnmadd132ps_fma(ZEXT1632(auVar186),auVar242,auVar242);
                    auVar242 = ZEXT1632(auVar186);
                    break;
                  case 5:
                    auVar242 = vminps_avx(auVar242,auVar262);
                    auVar242 = vmaxps_avx(auVar242,auVar263);
                    auVar186 = vfmadd213ps_fma(auVar265,auVar242,auVar264);
                    auVar244 = vrndscaleps_avx512vl(ZEXT1632(auVar186),1);
                    uVar160 = vcmpps_avx512vl(ZEXT1632(auVar186),auVar244,1);
                    auVar245 = vsubps_avx512vl(auVar244,auVar266);
                    bVar24 = (bool)((byte)uVar160 & 1);
                    auVar256._0_4_ = (uint)bVar24 * auVar245._0_4_ | (uint)!bVar24 * auVar244._0_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                    auVar256._4_4_ = (uint)bVar24 * auVar245._4_4_ | (uint)!bVar24 * auVar244._4_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                    auVar256._8_4_ = (uint)bVar24 * auVar245._8_4_ | (uint)!bVar24 * auVar244._8_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                    auVar256._12_4_ =
                         (uint)bVar24 * auVar245._12_4_ | (uint)!bVar24 * auVar244._12_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                    auVar256._16_4_ =
                         (uint)bVar24 * auVar245._16_4_ | (uint)!bVar24 * auVar244._16_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                    auVar256._20_4_ =
                         (uint)bVar24 * auVar245._20_4_ | (uint)!bVar24 * auVar244._20_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                    auVar256._24_4_ =
                         (uint)bVar24 * auVar245._24_4_ | (uint)!bVar24 * auVar244._24_4_;
                    bVar24 = SUB81(uVar160 >> 7,0);
                    auVar256._28_4_ =
                         (uint)bVar24 * auVar245._28_4_ | (uint)!bVar24 * auVar244._28_4_;
                    auVar242 = vfmsub231ps_avx512vl(auVar242,auVar256,auVar267);
                    auVar242 = vfnmsub231ps_avx512vl(auVar242,auVar256,auVar273);
                    auVar456._0_4_ = auVar242._0_4_ * auVar242._0_4_;
                    auVar456._4_4_ = auVar242._4_4_ * auVar242._4_4_;
                    auVar456._8_4_ = auVar242._8_4_ * auVar242._8_4_;
                    auVar456._12_4_ = auVar242._12_4_ * auVar242._12_4_;
                    auVar456._16_4_ = auVar242._16_4_ * auVar242._16_4_;
                    auVar456._20_4_ = auVar242._20_4_ * auVar242._20_4_;
                    auVar456._24_4_ = auVar242._24_4_ * auVar242._24_4_;
                    auVar456._28_4_ = 0;
                    auVar244 = vfmadd213ps_avx512vl(auVar240,auVar242,auVar268);
                    auVar244 = vfmadd213ps_avx512vl(auVar244,auVar242,auVar269);
                    auVar244 = vfmadd213ps_avx512vl(auVar244,auVar242,auVar270);
                    auVar244 = vfmadd213ps_avx512vl(auVar244,auVar242,auVar271);
                    auVar244 = vfmadd213ps_avx512vl(auVar244,auVar242,auVar264);
                    auVar242 = vfmadd213ps_avx512vl(auVar244,auVar456,auVar242);
                    auVar244 = vaddps_avx512vl(auVar242,auVar266);
                    auVar242 = vcvttps2dq_avx512vl(auVar256);
                    auVar242 = vpslld_avx2(auVar242,0x17);
                    auVar242 = vpaddd_avx2(auVar242,auVar272);
                    auVar186 = vfmadd213ps_fma(auVar242,auVar244,auVar266);
                    uVar160 = vcmpps_avx512vl(ZEXT1632(auVar186),auVar243,2);
                    auVar242._8_4_ = 0x800000;
                    auVar242._0_8_ = 0x80000000800000;
                    auVar242._12_4_ = 0x800000;
                    auVar242._16_4_ = 0x800000;
                    auVar242._20_4_ = 0x800000;
                    auVar242._24_4_ = 0x800000;
                    auVar242._28_4_ = 0x800000;
                    auVar242 = vmaxps_avx512vl(ZEXT1632(auVar186),auVar242);
                    auVar457 = vpsrld_avx2(auVar242,0x17);
                    auVar244 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar243._8_4_ = 0x3f000000;
                    auVar243._0_8_ = 0x3f0000003f000000;
                    auVar243._12_4_ = 0x3f000000;
                    auVar243._16_4_ = 0x3f000000;
                    auVar243._20_4_ = 0x3f000000;
                    auVar243._24_4_ = 0x3f000000;
                    auVar243._28_4_ = 0x3f000000;
                    auVar242 = vpternlogd_avx512vl(auVar242,auVar244,auVar243,0xea);
                    auVar246._8_4_ = 0x3f3504f3;
                    auVar246._0_8_ = 0x3f3504f33f3504f3;
                    auVar246._12_4_ = 0x3f3504f3;
                    auVar246._16_4_ = 0x3f3504f3;
                    auVar246._20_4_ = 0x3f3504f3;
                    auVar246._24_4_ = 0x3f3504f3;
                    auVar246._28_4_ = 0x3f3504f3;
                    uVar176 = vcmpps_avx512vl(auVar242,auVar246,1);
                    auVar243 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
                    auVar244 = vaddps_avx512vl(auVar242,auVar243);
                    auVar242 = vaddps_avx512vl(auVar244,auVar242);
                    bVar24 = (bool)((byte)uVar176 & 1);
                    auVar257._0_4_ = (uint)bVar24 * auVar242._0_4_ | (uint)!bVar24 * auVar244._0_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 1) & 1);
                    auVar257._4_4_ = (uint)bVar24 * auVar242._4_4_ | (uint)!bVar24 * auVar244._4_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 2) & 1);
                    auVar257._8_4_ = (uint)bVar24 * auVar242._8_4_ | (uint)!bVar24 * auVar244._8_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 3) & 1);
                    auVar257._12_4_ =
                         (uint)bVar24 * auVar242._12_4_ | (uint)!bVar24 * auVar244._12_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 4) & 1);
                    auVar257._16_4_ =
                         (uint)bVar24 * auVar242._16_4_ | (uint)!bVar24 * auVar244._16_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 5) & 1);
                    auVar257._20_4_ =
                         (uint)bVar24 * auVar242._20_4_ | (uint)!bVar24 * auVar244._20_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 6) & 1);
                    auVar257._24_4_ =
                         (uint)bVar24 * auVar242._24_4_ | (uint)!bVar24 * auVar244._24_4_;
                    bVar24 = SUB81(uVar176 >> 7,0);
                    auVar257._28_4_ =
                         (uint)bVar24 * auVar242._28_4_ | (uint)!bVar24 * auVar244._28_4_;
                    auVar244 = vmulps_avx512vl(auVar257,auVar257);
                    auVar242 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
                    auVar247._8_4_ = 0xbdebd1b8;
                    auVar247._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar247._12_4_ = 0xbdebd1b8;
                    auVar247._16_4_ = 0xbdebd1b8;
                    auVar247._20_4_ = 0xbdebd1b8;
                    auVar247._24_4_ = 0xbdebd1b8;
                    auVar247._28_4_ = 0xbdebd1b8;
                    auVar242 = vfmadd213ps_avx512vl(auVar242,auVar257,auVar247);
                    auVar248._8_4_ = 0x3def251a;
                    auVar248._0_8_ = 0x3def251a3def251a;
                    auVar248._12_4_ = 0x3def251a;
                    auVar248._16_4_ = 0x3def251a;
                    auVar248._20_4_ = 0x3def251a;
                    auVar248._24_4_ = 0x3def251a;
                    auVar248._28_4_ = 0x3def251a;
                    auVar242 = vfmadd213ps_avx512vl(auVar242,auVar257,auVar248);
                    auVar249._8_4_ = 0xbdfe5d4f;
                    auVar249._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar249._12_4_ = 0xbdfe5d4f;
                    auVar249._16_4_ = 0xbdfe5d4f;
                    auVar249._20_4_ = 0xbdfe5d4f;
                    auVar249._24_4_ = 0xbdfe5d4f;
                    auVar249._28_4_ = 0xbdfe5d4f;
                    auVar242 = vfmadd213ps_avx512vl(auVar242,auVar257,auVar249);
                    auVar250._8_4_ = 0x3e11e9bf;
                    auVar250._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar250._12_4_ = 0x3e11e9bf;
                    auVar250._16_4_ = 0x3e11e9bf;
                    auVar250._20_4_ = 0x3e11e9bf;
                    auVar250._24_4_ = 0x3e11e9bf;
                    auVar250._28_4_ = 0x3e11e9bf;
                    auVar242 = vfmadd213ps_avx512vl(auVar242,auVar257,auVar250);
                    auVar251._8_4_ = 0xbe2aae50;
                    auVar251._0_8_ = 0xbe2aae50be2aae50;
                    auVar251._12_4_ = 0xbe2aae50;
                    auVar251._16_4_ = 0xbe2aae50;
                    auVar251._20_4_ = 0xbe2aae50;
                    auVar251._24_4_ = 0xbe2aae50;
                    auVar251._28_4_ = 0xbe2aae50;
                    auVar242 = vfmadd213ps_avx512vl(auVar242,auVar257,auVar251);
                    auVar252._8_4_ = 0x3e4cceac;
                    auVar252._0_8_ = 0x3e4cceac3e4cceac;
                    auVar252._12_4_ = 0x3e4cceac;
                    auVar252._16_4_ = 0x3e4cceac;
                    auVar252._20_4_ = 0x3e4cceac;
                    auVar252._24_4_ = 0x3e4cceac;
                    auVar252._28_4_ = 0x3e4cceac;
                    auVar242 = vfmadd213ps_avx512vl(auVar242,auVar257,auVar252);
                    auVar253._8_4_ = 0xbe7ffffc;
                    auVar253._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar253._12_4_ = 0xbe7ffffc;
                    auVar253._16_4_ = 0xbe7ffffc;
                    auVar253._20_4_ = 0xbe7ffffc;
                    auVar253._24_4_ = 0xbe7ffffc;
                    auVar253._28_4_ = 0xbe7ffffc;
                    auVar242 = vfmadd213ps_avx512vl(auVar242,auVar257,auVar253);
                    auVar254._8_4_ = 0x3eaaaaaa;
                    auVar254._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar254._12_4_ = 0x3eaaaaaa;
                    auVar254._16_4_ = 0x3eaaaaaa;
                    auVar254._20_4_ = 0x3eaaaaaa;
                    auVar254._24_4_ = 0x3eaaaaaa;
                    auVar254._28_4_ = 0x3eaaaaaa;
                    auVar242 = vfmadd213ps_avx512vl(auVar242,auVar257,auVar254);
                    auVar245 = vmulps_avx512vl(auVar244,auVar257);
                    auVar245 = vmulps_avx512vl(auVar245,auVar242);
                    auVar255._8_4_ = 0xffffff82;
                    auVar255._0_8_ = 0xffffff82ffffff82;
                    auVar255._12_4_ = 0xffffff82;
                    auVar255._16_4_ = 0xffffff82;
                    auVar255._20_4_ = 0xffffff82;
                    auVar255._24_4_ = 0xffffff82;
                    auVar255._28_4_ = 0xffffff82;
                    auVar242 = vpaddd_avx512vl(auVar457,auVar255);
                    auVar242 = vcvtdq2ps_avx(auVar242);
                    auVar246 = vsubps_avx512vl(auVar242,auVar266);
                    bVar24 = (bool)((byte)uVar176 & 1);
                    auVar258._0_4_ = (uint)bVar24 * auVar246._0_4_ | (uint)!bVar24 * auVar242._0_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 1) & 1);
                    auVar258._4_4_ = (uint)bVar24 * auVar246._4_4_ | (uint)!bVar24 * auVar242._4_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 2) & 1);
                    auVar258._8_4_ = (uint)bVar24 * auVar246._8_4_ | (uint)!bVar24 * auVar242._8_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 3) & 1);
                    auVar258._12_4_ =
                         (uint)bVar24 * auVar246._12_4_ | (uint)!bVar24 * auVar242._12_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 4) & 1);
                    auVar258._16_4_ =
                         (uint)bVar24 * auVar246._16_4_ | (uint)!bVar24 * auVar242._16_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 5) & 1);
                    auVar258._20_4_ =
                         (uint)bVar24 * auVar246._20_4_ | (uint)!bVar24 * auVar242._20_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 6) & 1);
                    auVar258._24_4_ =
                         (uint)bVar24 * auVar246._24_4_ | (uint)!bVar24 * auVar242._24_4_;
                    bVar24 = SUB81(uVar176 >> 7,0);
                    auVar258._28_4_ =
                         (uint)bVar24 * auVar246._28_4_ | (uint)!bVar24 * auVar242._28_4_;
                    auVar242 = vfmadd231ps_avx512vl(auVar245,auVar258,auVar273);
                    auVar242 = vfmsub231ps_avx512vl(auVar242,auVar264,auVar244);
                    auVar242 = vsubps_avx512vl(auVar242,auVar257);
                    auVar186 = vfmsub231ps_fma(auVar242,auVar267,auVar258);
                    auVar242 = vmulps_avx512vl(ZEXT1632(auVar186),auVar241);
                    auVar244 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar24 = (bool)((byte)uVar160 & 1);
                    auVar259._0_4_ = (uint)bVar24 * auVar244._0_4_ | (uint)!bVar24 * auVar242._0_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                    auVar259._4_4_ = (uint)bVar24 * auVar244._4_4_ | (uint)!bVar24 * auVar242._4_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                    auVar259._8_4_ = (uint)bVar24 * auVar244._8_4_ | (uint)!bVar24 * auVar242._8_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                    auVar259._12_4_ =
                         (uint)bVar24 * auVar244._12_4_ | (uint)!bVar24 * auVar242._12_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                    auVar259._16_4_ =
                         (uint)bVar24 * auVar244._16_4_ | (uint)!bVar24 * auVar242._16_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                    auVar259._20_4_ =
                         (uint)bVar24 * auVar244._20_4_ | (uint)!bVar24 * auVar242._20_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                    auVar259._24_4_ =
                         (uint)bVar24 * auVar244._24_4_ | (uint)!bVar24 * auVar242._24_4_;
                    bVar24 = SUB81(uVar160 >> 7,0);
                    auVar259._28_4_ =
                         (uint)bVar24 * auVar244._28_4_ | (uint)!bVar24 * auVar242._28_4_;
                    auVar242 = vminps_avx(auVar259,auVar262);
                    auVar242 = vmaxps_avx(auVar242,auVar263);
                    auVar186 = vfmadd213ps_fma(auVar265,auVar242,auVar264);
                    auVar244 = vrndscaleps_avx512vl(ZEXT1632(auVar186),1);
                    uVar160 = vcmpps_avx512vl(ZEXT1632(auVar186),auVar244,1);
                    auVar245 = vsubps_avx512vl(auVar244,auVar266);
                    bVar24 = (bool)((byte)uVar160 & 1);
                    auVar260._0_4_ = (uint)bVar24 * auVar245._0_4_ | (uint)!bVar24 * auVar244._0_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                    auVar260._4_4_ = (uint)bVar24 * auVar245._4_4_ | (uint)!bVar24 * auVar244._4_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                    auVar260._8_4_ = (uint)bVar24 * auVar245._8_4_ | (uint)!bVar24 * auVar244._8_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                    auVar260._12_4_ =
                         (uint)bVar24 * auVar245._12_4_ | (uint)!bVar24 * auVar244._12_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                    auVar260._16_4_ =
                         (uint)bVar24 * auVar245._16_4_ | (uint)!bVar24 * auVar244._16_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                    auVar260._20_4_ =
                         (uint)bVar24 * auVar245._20_4_ | (uint)!bVar24 * auVar244._20_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                    auVar260._24_4_ =
                         (uint)bVar24 * auVar245._24_4_ | (uint)!bVar24 * auVar244._24_4_;
                    bVar24 = SUB81(uVar160 >> 7,0);
                    auVar260._28_4_ =
                         (uint)bVar24 * auVar245._28_4_ | (uint)!bVar24 * auVar244._28_4_;
                    in_ZMM16 = ZEXT3264(auVar260);
                    auVar242 = vfmsub231ps_avx512vl(auVar242,auVar260,auVar267);
                    auVar242 = vfnmsub231ps_avx512vl(auVar242,auVar260,auVar273);
                    auVar458._0_4_ = auVar242._0_4_ * auVar242._0_4_;
                    auVar458._4_4_ = auVar242._4_4_ * auVar242._4_4_;
                    auVar458._8_4_ = auVar242._8_4_ * auVar242._8_4_;
                    auVar458._12_4_ = auVar242._12_4_ * auVar242._12_4_;
                    auVar458._16_4_ = auVar242._16_4_ * auVar242._16_4_;
                    auVar458._20_4_ = auVar242._20_4_ * auVar242._20_4_;
                    auVar458._24_4_ = auVar242._24_4_ * auVar242._24_4_;
                    auVar458._28_4_ = 0;
                    auVar244 = vfmadd213ps_avx512vl(auVar240,auVar242,auVar268);
                    auVar244 = vfmadd213ps_avx512vl(auVar244,auVar242,auVar269);
                    auVar244 = vfmadd213ps_avx512vl(auVar244,auVar242,auVar270);
                    auVar244 = vfmadd213ps_avx512vl(auVar244,auVar242,auVar271);
                    auVar244 = vfmadd213ps_avx512vl(auVar244,auVar242,auVar264);
                    auVar242 = vfmadd213ps_avx512vl(auVar244,auVar458,auVar242);
                    in_ZMM17 = ZEXT3264(auVar242);
                    auVar244 = vaddps_avx512vl(auVar242,auVar266);
                    auVar242 = vcvttps2dq_avx512vl(auVar260);
                    auVar242 = vpslld_avx2(auVar242,0x17);
                    auVar242 = vpaddd_avx2(auVar242,auVar272);
                    auVar186 = vfmadd213ps_fma(auVar242,auVar244,auVar266);
                    auVar242 = vrcpps_avx(ZEXT1632(auVar186));
                    auVar186 = vfmsub213ps_fma(ZEXT1632(auVar186),auVar242,auVar266);
                    auVar186 = vfnmadd132ps_fma(ZEXT1632(auVar186),auVar242,auVar242);
                    auVar242 = vfnmadd213ps_avx512vl(ZEXT1632(auVar186),auVar241,auVar243);
                    in_ZMM9 = ZEXT3264(auVar242);
                    auVar293._0_4_ = auVar242._0_4_ * auVar292._0_4_;
                    auVar293._4_4_ = auVar242._4_4_ * auVar292._4_4_;
                    auVar293._8_4_ = auVar242._8_4_ * auVar292._8_4_;
                    auVar293._12_4_ = auVar242._12_4_ * auVar292._12_4_;
                    auVar293._16_4_ = auVar242._16_4_ * auVar292._16_4_;
                    auVar293._20_4_ = auVar242._20_4_ * auVar292._20_4_;
                    auVar293._24_4_ = auVar242._24_4_ * auVar292._24_4_;
                    auVar242 = auVar293._0_32_;
                    break;
                  case 6:
                    uVar13 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                    auVar245._4_4_ = uVar13;
                    auVar245._0_4_ = uVar13;
                    auVar245._8_4_ = uVar13;
                    auVar245._12_4_ = uVar13;
                    auVar245._16_4_ = uVar13;
                    auVar245._20_4_ = uVar13;
                    auVar245._24_4_ = uVar13;
                    auVar245._28_4_ = uVar13;
                    uVar13 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var161))[1];
                    auVar244._4_4_ = uVar13;
                    auVar244._0_4_ = uVar13;
                    auVar244._8_4_ = uVar13;
                    auVar244._12_4_ = uVar13;
                    auVar244._16_4_ = uVar13;
                    auVar244._20_4_ = uVar13;
                    auVar244._24_4_ = uVar13;
                    auVar244._28_4_ = uVar13;
                    auVar242 = vfmadd213ps_avx512vl(auVar245,auVar242,auVar244);
                    auVar242 = vmaxps_avx(auVar242,auVar243);
                    auVar242 = vminps_avx(auVar242,auVar266);
                    auVar294._0_4_ = auVar242._0_4_ * auVar292._0_4_;
                    auVar294._4_4_ = auVar242._4_4_ * auVar292._4_4_;
                    auVar294._8_4_ = auVar242._8_4_ * auVar292._8_4_;
                    auVar294._12_4_ = auVar242._12_4_ * auVar292._12_4_;
                    auVar294._16_4_ = auVar242._16_4_ * auVar292._16_4_;
                    auVar294._20_4_ = auVar242._20_4_ * auVar292._20_4_;
                    auVar294._24_4_ = auVar242._24_4_ * auVar292._24_4_;
                    auVar294._28_36_ = auVar293._28_36_;
                    auVar242 = auVar294._0_32_;
                  }
                }
                *(undefined1 (*) [32])ppp_Var170 = auVar242;
                ppp_Var170 = ppp_Var170 + 4;
                uVar166 = uVar166 + 1;
                iVar152 = iVar152 + 1;
              } while (uVar166 != local_158.w);
            }
            iVar151 = iVar151 + 1;
          } while (iVar151 != local_158.h);
        }
        local_228 = local_228 + 1;
      } while (local_228 != local_158.c);
    }
    afVar149 = _ps512_cephes_log_p8;
    afVar148 = _ps512_cephes_log_p7;
    afVar147 = _ps512_cephes_log_p6;
    afVar146 = _ps512_cephes_log_p5;
    afVar145 = _ps512_cephes_log_p4;
    afVar144 = _ps512_cephes_log_p3;
    afVar143 = _ps512_cephes_log_p2;
    afVar142 = _ps512_cephes_exp_p5;
    afVar141 = _ps512_cephes_exp_p4;
    afVar140 = _ps512_cephes_exp_p3;
    afVar139 = _ps512_cephes_exp_p2;
    afVar138 = _ps512_cephes_exp_p1;
    afVar137 = _ps512_cephes_exp_p0;
    afVar136 = _ps512_cephes_LOG2EF;
    afVar135 = _ps512_exp_lo;
    afVar134 = _ps512_exp_hi;
    afVar133 = _ps512_1;
    if ((uVar10 == 4) && (uVar162 == 0x10)) {
      if ((long)local_158.c < 1) goto LAB_002a2e50;
      p_Var161 = pp_Var168[-3];
      iVar182 = *(int *)(&this->field_0xdc + (long)p_Var161);
      iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var161);
      iVar158 = *(int *)(&this->field_0xe4 + (long)p_Var161);
      iVar181 = *(int *)(&this->field_0xe8 + (long)p_Var161);
      uVar13 = *(undefined4 *)(&this->field_0x114 + (long)p_Var161);
      lVar175 = *(long *)(&this->field_0x1a8 + (long)p_Var161);
      uVar12 = *(uint *)(&this->field_0xd4 + (long)p_Var161);
      local_e8._0_8_ = p_Var161;
      uVar163 = *(uint *)(&this->field_0xd8 + (long)p_Var161);
      auVar292 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar293 = vxorps_avx512dq(auVar292,(undefined1  [64])_ps512_cephes_log_q2);
      in_ZMM9 = vxorps_avx512dq(auVar292,(undefined1  [64])_ps512_cephes_log_q1);
      auVar294 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar309 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar292);
      local_228 = 0;
      auVar186 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
      in_ZMM29 = ZEXT1664(auVar186);
      auVar295 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar296 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      do {
        if (0 < local_158.h) {
          iVar174 = bottom_blob->w;
          iVar155 = bottom_blob->h;
          ppp_Var170 = (_func_int ***)
                       ((long)(_func_int ***)local_158.data +
                       local_158.cstep * local_228 * local_158.elemsize);
          uVar164 = bottom_blob->c;
          local_98._0_8_ = local_228 * 0x40;
          iVar180 = 0;
          do {
            if (0 < local_158.w) {
              uVar166 = 0;
              iVar151 = (1 - uVar12) * iVar182;
              do {
                if (lVar175 == 0) {
                  auVar297 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar297 = *(undefined1 (*) [64])(lVar175 + local_228 * 0x40);
                }
                if (0 < (int)uVar164) {
                  pvVar178 = (void *)((this->weight_data_tm).cstep * local_228 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar15 = bottom_blob->data;
                  uVar160 = 0;
                  do {
                    if (0 < (int)uVar163) {
                      uVar177 = 0;
                      uVar176 = 0;
                      do {
                        iVar152 = (((int)uVar176 - uVar163) + 1) * iVar11 + iVar180;
                        if ((((-1 < iVar152) &&
                             (iVar153 = iVar152 / iVar181, iVar152 % iVar181 == 0)) &&
                            (0 < (int)uVar12)) && (iVar153 < iVar155)) {
                          lVar167 = (long)iVar153 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar160;
                          uVar171 = uVar177;
                          uVar172 = (ulong)uVar12;
                          iVar152 = iVar151;
                          do {
                            if (((-1 < iVar152) &&
                                (iVar153 = iVar152 / iVar158, iVar152 % iVar158 == 0)) &&
                               (iVar153 < iVar174)) {
                              lVar159 = (long)(iVar153 << 2);
                              auVar298 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167)));
                              auVar299 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 4)));
                              in_ZMM16 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 8)));
                              in_ZMM17 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0xc)));
                              uVar184 = uVar171 & 0xffffffff;
                              auVar297 = vfmadd231ps_avx512f(auVar297,auVar298,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar184 * 4));
                              auVar297 = vfmadd231ps_avx512f(auVar297,auVar299,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar184 * 4 + 0x40))
                              ;
                              auVar297 = vfmadd231ps_avx512f(auVar297,in_ZMM16,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar184 * 4 + 0x80))
                              ;
                              auVar297 = vfmadd231ps_avx512f(auVar297,in_ZMM17,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 + uVar184 * 4 + 0xc0))
                              ;
                            }
                            uVar171 = uVar171 + 0x40;
                            iVar152 = iVar152 + iVar182;
                            uVar172 = uVar172 - 1;
                          } while (uVar172 != 0);
                        }
                        uVar176 = uVar176 + 1;
                        uVar177 = uVar177 + (ulong)uVar12 * 0x40;
                      } while (uVar176 != uVar163);
                    }
                    pvVar178 = (void *)((long)pvVar178 + (long)(int)(uVar12 * uVar163 * 0x40) * 4);
                    uVar160 = uVar160 + 1;
                  } while (uVar160 != uVar164);
                }
                switch(uVar13) {
                case 1:
                  auVar297 = vmaxps_avx512f(auVar297,in_ZMM29);
                  break;
                case 2:
                  uVar160 = vcmpps_avx512f(auVar297,in_ZMM29,1);
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                  auVar128._4_4_ = uVar2;
                  auVar128._0_4_ = uVar2;
                  auVar128._8_4_ = uVar2;
                  auVar128._12_4_ = uVar2;
                  auVar128._16_4_ = uVar2;
                  auVar128._20_4_ = uVar2;
                  auVar128._24_4_ = uVar2;
                  auVar128._28_4_ = uVar2;
                  auVar128._32_4_ = uVar2;
                  auVar128._36_4_ = uVar2;
                  auVar128._40_4_ = uVar2;
                  auVar128._44_4_ = uVar2;
                  auVar128._48_4_ = uVar2;
                  auVar128._52_4_ = uVar2;
                  auVar128._56_4_ = uVar2;
                  auVar128._60_4_ = uVar2;
                  auVar298 = vmulps_avx512f(auVar297,auVar128);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar318._0_4_ = (uint)bVar24 * auVar298._0_4_ | (uint)!bVar24 * auVar297._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar318._4_4_ = (uint)bVar24 * auVar298._4_4_ | (uint)!bVar24 * auVar297._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar318._8_4_ = (uint)bVar24 * auVar298._8_4_ | (uint)!bVar24 * auVar297._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar318._12_4_ = (uint)bVar24 * auVar298._12_4_ | (uint)!bVar24 * auVar297._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  auVar318._16_4_ = (uint)bVar24 * auVar298._16_4_ | (uint)!bVar24 * auVar297._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  auVar318._20_4_ = (uint)bVar24 * auVar298._20_4_ | (uint)!bVar24 * auVar297._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  auVar318._24_4_ = (uint)bVar24 * auVar298._24_4_ | (uint)!bVar24 * auVar297._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  auVar318._28_4_ = (uint)bVar24 * auVar298._28_4_ | (uint)!bVar24 * auVar297._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 8) & 1);
                  auVar318._32_4_ = (uint)bVar24 * auVar298._32_4_ | (uint)!bVar24 * auVar297._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  auVar318._36_4_ = (uint)bVar24 * auVar298._36_4_ | (uint)!bVar24 * auVar297._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  auVar318._40_4_ = (uint)bVar24 * auVar298._40_4_ | (uint)!bVar24 * auVar297._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  auVar318._44_4_ = (uint)bVar24 * auVar298._44_4_ | (uint)!bVar24 * auVar297._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  auVar318._48_4_ = (uint)bVar24 * auVar298._48_4_ | (uint)!bVar24 * auVar297._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  auVar318._52_4_ = (uint)bVar24 * auVar298._52_4_ | (uint)!bVar24 * auVar297._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  auVar318._56_4_ = (uint)bVar24 * auVar298._56_4_ | (uint)!bVar24 * auVar297._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  auVar318._60_4_ = (uint)bVar24 * auVar298._60_4_ | (uint)!bVar24 * auVar297._60_4_
                  ;
                  auVar297 = auVar318;
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                  auVar126._4_4_ = uVar2;
                  auVar126._0_4_ = uVar2;
                  auVar126._8_4_ = uVar2;
                  auVar126._12_4_ = uVar2;
                  auVar126._16_4_ = uVar2;
                  auVar126._20_4_ = uVar2;
                  auVar126._24_4_ = uVar2;
                  auVar126._28_4_ = uVar2;
                  auVar126._32_4_ = uVar2;
                  auVar126._36_4_ = uVar2;
                  auVar126._40_4_ = uVar2;
                  auVar126._44_4_ = uVar2;
                  auVar126._48_4_ = uVar2;
                  auVar126._52_4_ = uVar2;
                  auVar126._56_4_ = uVar2;
                  auVar126._60_4_ = uVar2;
                  auVar297 = vmaxps_avx512f(auVar297,auVar126);
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var161))[1];
                  auVar127._4_4_ = uVar2;
                  auVar127._0_4_ = uVar2;
                  auVar127._8_4_ = uVar2;
                  auVar127._12_4_ = uVar2;
                  auVar127._16_4_ = uVar2;
                  auVar127._20_4_ = uVar2;
                  auVar127._24_4_ = uVar2;
                  auVar127._28_4_ = uVar2;
                  auVar127._32_4_ = uVar2;
                  auVar127._36_4_ = uVar2;
                  auVar127._40_4_ = uVar2;
                  auVar127._44_4_ = uVar2;
                  auVar127._48_4_ = uVar2;
                  auVar127._52_4_ = uVar2;
                  auVar127._56_4_ = uVar2;
                  auVar127._60_4_ = uVar2;
                  auVar297 = vminps_avx512f(auVar297,auVar127);
                  break;
                case 4:
                  auVar297 = vxorps_avx512dq(auVar297,auVar292);
                  auVar297 = vminps_avx512f(auVar297,(undefined1  [64])afVar134);
                  auVar297 = vmaxps_avx512f(auVar297,(undefined1  [64])afVar135);
                  auVar298 = vfmadd213ps_avx512f((undefined1  [64])afVar136,auVar297,
                                                 (undefined1  [64])afVar142);
                  auVar299 = vrndscaleps_avx512f(auVar298,1);
                  uVar160 = vcmpps_avx512f(auVar298,auVar299,1);
                  auVar298 = vsubps_avx512f(auVar299,(undefined1  [64])afVar133);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar317._0_4_ = (uint)bVar24 * auVar298._0_4_ | (uint)!bVar24 * auVar299._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar317._4_4_ = (uint)bVar24 * auVar298._4_4_ | (uint)!bVar24 * auVar299._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar317._8_4_ = (uint)bVar24 * auVar298._8_4_ | (uint)!bVar24 * auVar299._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar317._12_4_ = (uint)bVar24 * auVar298._12_4_ | (uint)!bVar24 * auVar299._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  auVar317._16_4_ = (uint)bVar24 * auVar298._16_4_ | (uint)!bVar24 * auVar299._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  auVar317._20_4_ = (uint)bVar24 * auVar298._20_4_ | (uint)!bVar24 * auVar299._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  auVar317._24_4_ = (uint)bVar24 * auVar298._24_4_ | (uint)!bVar24 * auVar299._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  auVar317._28_4_ = (uint)bVar24 * auVar298._28_4_ | (uint)!bVar24 * auVar299._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 8) & 1);
                  auVar317._32_4_ = (uint)bVar24 * auVar298._32_4_ | (uint)!bVar24 * auVar299._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  auVar317._36_4_ = (uint)bVar24 * auVar298._36_4_ | (uint)!bVar24 * auVar299._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  auVar317._40_4_ = (uint)bVar24 * auVar298._40_4_ | (uint)!bVar24 * auVar299._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  auVar317._44_4_ = (uint)bVar24 * auVar298._44_4_ | (uint)!bVar24 * auVar299._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  auVar317._48_4_ = (uint)bVar24 * auVar298._48_4_ | (uint)!bVar24 * auVar299._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  auVar317._52_4_ = (uint)bVar24 * auVar298._52_4_ | (uint)!bVar24 * auVar299._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  auVar317._56_4_ = (uint)bVar24 * auVar298._56_4_ | (uint)!bVar24 * auVar299._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  auVar317._60_4_ = (uint)bVar24 * auVar298._60_4_ | (uint)!bVar24 * auVar299._60_4_
                  ;
                  auVar297 = vfmadd231ps_avx512f(auVar297,auVar317,auVar293);
                  in_ZMM16 = vfmadd231ps_avx512f(auVar297,auVar317,in_ZMM9);
                  auVar297 = vmulps_avx512f(in_ZMM16,in_ZMM16);
                  auVar298 = vfmadd213ps_avx512f(in_ZMM16,(undefined1  [64])afVar137,
                                                 (undefined1  [64])afVar138);
                  auVar298 = vfmadd213ps_avx512f(auVar298,in_ZMM16,(undefined1  [64])afVar139);
                  auVar298 = vfmadd213ps_avx512f(auVar298,in_ZMM16,(undefined1  [64])afVar140);
                  auVar298 = vfmadd213ps_avx512f(auVar298,in_ZMM16,(undefined1  [64])afVar141);
                  auVar298 = vfmadd213ps_avx512f(auVar298,in_ZMM16,(undefined1  [64])afVar142);
                  auVar297 = vfmadd213ps_avx512f(auVar298,auVar297,in_ZMM16);
                  auVar297 = vaddps_avx512f(auVar297,(undefined1  [64])afVar133);
                  auVar298 = vcvttps2dq_avx512f(auVar317);
                  auVar298 = vpaddd_avx512f(auVar298,auVar294);
                  auVar298 = vpslld_avx512f(auVar298,0x17);
                  auVar297 = vfmadd213ps_avx512f(auVar298,auVar297,auVar295);
                  auVar298 = vrcp14ps_avx512f(auVar297);
                  auVar297 = vfmsub213ps_avx512f(auVar297,auVar298,auVar295);
                  auVar297 = vfnmadd132ps_avx512vl(auVar297,auVar298,auVar298);
                  break;
                case 5:
                  auVar298 = vminps_avx512f(auVar297,(undefined1  [64])afVar134);
                  auVar298 = vmaxps_avx512f(auVar298,(undefined1  [64])afVar135);
                  auVar299 = vfmadd213ps_avx512f((undefined1  [64])afVar136,auVar298,
                                                 (undefined1  [64])afVar142);
                  auVar300 = vrndscaleps_avx512f(auVar299,1);
                  uVar160 = vcmpps_avx512f(auVar299,auVar300,1);
                  auVar299 = vsubps_avx512f(auVar300,(undefined1  [64])afVar133);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar313._0_4_ = (uint)bVar24 * auVar299._0_4_ | (uint)!bVar24 * auVar300._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar313._4_4_ = (uint)bVar24 * auVar299._4_4_ | (uint)!bVar24 * auVar300._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar313._8_4_ = (uint)bVar24 * auVar299._8_4_ | (uint)!bVar24 * auVar300._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar313._12_4_ = (uint)bVar24 * auVar299._12_4_ | (uint)!bVar24 * auVar300._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  auVar313._16_4_ = (uint)bVar24 * auVar299._16_4_ | (uint)!bVar24 * auVar300._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  auVar313._20_4_ = (uint)bVar24 * auVar299._20_4_ | (uint)!bVar24 * auVar300._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  auVar313._24_4_ = (uint)bVar24 * auVar299._24_4_ | (uint)!bVar24 * auVar300._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  auVar313._28_4_ = (uint)bVar24 * auVar299._28_4_ | (uint)!bVar24 * auVar300._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 8) & 1);
                  auVar313._32_4_ = (uint)bVar24 * auVar299._32_4_ | (uint)!bVar24 * auVar300._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  auVar313._36_4_ = (uint)bVar24 * auVar299._36_4_ | (uint)!bVar24 * auVar300._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  auVar313._40_4_ = (uint)bVar24 * auVar299._40_4_ | (uint)!bVar24 * auVar300._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  auVar313._44_4_ = (uint)bVar24 * auVar299._44_4_ | (uint)!bVar24 * auVar300._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  auVar313._48_4_ = (uint)bVar24 * auVar299._48_4_ | (uint)!bVar24 * auVar300._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  auVar313._52_4_ = (uint)bVar24 * auVar299._52_4_ | (uint)!bVar24 * auVar300._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  auVar313._56_4_ = (uint)bVar24 * auVar299._56_4_ | (uint)!bVar24 * auVar300._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  auVar313._60_4_ = (uint)bVar24 * auVar299._60_4_ | (uint)!bVar24 * auVar300._60_4_
                  ;
                  auVar298 = vfmadd231ps_avx512f(auVar298,auVar313,auVar293);
                  auVar298 = vfmadd231ps_avx512f(auVar298,auVar313,in_ZMM9);
                  auVar299 = vmulps_avx512f(auVar298,auVar298);
                  auVar300 = vfmadd213ps_avx512f(auVar298,(undefined1  [64])afVar137,
                                                 (undefined1  [64])afVar138);
                  auVar300 = vfmadd213ps_avx512f(auVar300,auVar298,(undefined1  [64])afVar139);
                  auVar300 = vfmadd213ps_avx512f(auVar300,auVar298,(undefined1  [64])afVar140);
                  auVar300 = vfmadd213ps_avx512f(auVar300,auVar298,(undefined1  [64])afVar141);
                  auVar300 = vfmadd213ps_avx512f(auVar300,auVar298,(undefined1  [64])afVar142);
                  auVar298 = vfmadd213ps_avx512f(auVar300,auVar299,auVar298);
                  auVar298 = vaddps_avx512f(auVar298,(undefined1  [64])afVar133);
                  auVar299 = vcvttps2dq_avx512f(auVar313);
                  auVar299 = vpaddd_avx512f(auVar299,auVar294);
                  auVar299 = vpslld_avx512f(auVar299,0x17);
                  auVar298 = vfmadd213ps_avx512f(auVar299,auVar298,auVar295);
                  auVar299 = vmaxps_avx512f(auVar298,(undefined1  [64])_ps512_min_norm_pos);
                  auVar300 = vpsrld_avx512f(auVar299,0x17);
                  auVar299 = vpternlogd_avx512f(auVar299,(undefined1  [64])afVar142,
                                                (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar160 = vcmpps_avx512f(auVar299,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar301 = vsubps_avx512f(auVar299,(undefined1  [64])afVar133);
                  auVar299 = vaddps_avx512f(auVar301,auVar299);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar314._0_4_ = (uint)bVar24 * auVar299._0_4_ | (uint)!bVar24 * auVar301._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar314._4_4_ = (uint)bVar24 * auVar299._4_4_ | (uint)!bVar24 * auVar301._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar314._8_4_ = (uint)bVar24 * auVar299._8_4_ | (uint)!bVar24 * auVar301._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar314._12_4_ = (uint)bVar24 * auVar299._12_4_ | (uint)!bVar24 * auVar301._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  auVar314._16_4_ = (uint)bVar24 * auVar299._16_4_ | (uint)!bVar24 * auVar301._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  auVar314._20_4_ = (uint)bVar24 * auVar299._20_4_ | (uint)!bVar24 * auVar301._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  auVar314._24_4_ = (uint)bVar24 * auVar299._24_4_ | (uint)!bVar24 * auVar301._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  auVar314._28_4_ = (uint)bVar24 * auVar299._28_4_ | (uint)!bVar24 * auVar301._28_4_
                  ;
                  bVar32 = (byte)(uVar160 >> 8);
                  bVar24 = (bool)(bVar32 & 1);
                  auVar314._32_4_ = (uint)bVar24 * auVar299._32_4_ | (uint)!bVar24 * auVar301._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  auVar314._36_4_ = (uint)bVar24 * auVar299._36_4_ | (uint)!bVar24 * auVar301._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  auVar314._40_4_ = (uint)bVar24 * auVar299._40_4_ | (uint)!bVar24 * auVar301._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  auVar314._44_4_ = (uint)bVar24 * auVar299._44_4_ | (uint)!bVar24 * auVar301._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  auVar314._48_4_ = (uint)bVar24 * auVar299._48_4_ | (uint)!bVar24 * auVar301._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  auVar314._52_4_ = (uint)bVar24 * auVar299._52_4_ | (uint)!bVar24 * auVar301._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  auVar314._56_4_ = (uint)bVar24 * auVar299._56_4_ | (uint)!bVar24 * auVar301._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  auVar314._60_4_ = (uint)bVar24 * auVar299._60_4_ | (uint)!bVar24 * auVar301._60_4_
                  ;
                  auVar299 = vmulps_avx512f(auVar314,auVar314);
                  auVar301 = vfmadd132ps_avx512f(auVar314,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar301 = vfmadd213ps_avx512f(auVar301,auVar314,(undefined1  [64])afVar143);
                  auVar301 = vfmadd213ps_avx512f(auVar301,auVar314,(undefined1  [64])afVar144);
                  auVar301 = vfmadd213ps_avx512f(auVar301,auVar314,(undefined1  [64])afVar145);
                  auVar301 = vfmadd213ps_avx512f(auVar301,auVar314,(undefined1  [64])afVar146);
                  auVar301 = vfmadd213ps_avx512f(auVar301,auVar314,(undefined1  [64])afVar147);
                  auVar301 = vfmadd213ps_avx512f(auVar301,auVar314,(undefined1  [64])afVar148);
                  auVar301 = vfmadd213ps_avx512f(auVar301,auVar314,(undefined1  [64])afVar149);
                  auVar302 = vmulps_avx512f(auVar299,auVar314);
                  auVar301 = vfmadd213ps_avx512f(auVar302,auVar301,auVar314);
                  uVar176 = vcmpps_avx512f(auVar298,in_ZMM29,2);
                  auVar298 = vpsubd_avx512f(auVar300,auVar294);
                  auVar298 = vcvtdq2ps_avx512f(auVar298);
                  auVar300 = vaddps_avx512f(auVar298,(undefined1  [64])afVar133);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar315._0_4_ = (uint)bVar24 * auVar298._0_4_ | (uint)!bVar24 * auVar300._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar315._4_4_ = (uint)bVar24 * auVar298._4_4_ | (uint)!bVar24 * auVar300._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar315._8_4_ = (uint)bVar24 * auVar298._8_4_ | (uint)!bVar24 * auVar300._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar315._12_4_ = (uint)bVar24 * auVar298._12_4_ | (uint)!bVar24 * auVar300._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  auVar315._16_4_ = (uint)bVar24 * auVar298._16_4_ | (uint)!bVar24 * auVar300._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  auVar315._20_4_ = (uint)bVar24 * auVar298._20_4_ | (uint)!bVar24 * auVar300._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  auVar315._24_4_ = (uint)bVar24 * auVar298._24_4_ | (uint)!bVar24 * auVar300._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  auVar315._28_4_ = (uint)bVar24 * auVar298._28_4_ | (uint)!bVar24 * auVar300._28_4_
                  ;
                  bVar24 = (bool)(bVar32 & 1);
                  auVar315._32_4_ = (uint)bVar24 * auVar298._32_4_ | (uint)!bVar24 * auVar300._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  auVar315._36_4_ = (uint)bVar24 * auVar298._36_4_ | (uint)!bVar24 * auVar300._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  auVar315._40_4_ = (uint)bVar24 * auVar298._40_4_ | (uint)!bVar24 * auVar300._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  auVar315._44_4_ = (uint)bVar24 * auVar298._44_4_ | (uint)!bVar24 * auVar300._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  auVar315._48_4_ = (uint)bVar24 * auVar298._48_4_ | (uint)!bVar24 * auVar300._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  auVar315._52_4_ = (uint)bVar24 * auVar298._52_4_ | (uint)!bVar24 * auVar300._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  auVar315._56_4_ = (uint)bVar24 * auVar298._56_4_ | (uint)!bVar24 * auVar300._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  auVar315._60_4_ = (uint)bVar24 * auVar298._60_4_ | (uint)!bVar24 * auVar300._60_4_
                  ;
                  auVar298 = vfmadd231ps_avx512f(auVar301,auVar315,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar298 = vfmadd231ps_avx512f(auVar298,auVar309,auVar299);
                  auVar298 = vfmadd231ps_avx512f(auVar298,auVar315,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar298 = vmulps_avx512f(auVar298,auVar296);
                  auVar299 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar24 = (bool)((byte)uVar176 & 1);
                  auVar316._0_4_ = (uint)bVar24 * auVar299._0_4_ | (uint)!bVar24 * auVar298._0_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 1) & 1);
                  auVar316._4_4_ = (uint)bVar24 * auVar299._4_4_ | (uint)!bVar24 * auVar298._4_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 2) & 1);
                  auVar316._8_4_ = (uint)bVar24 * auVar299._8_4_ | (uint)!bVar24 * auVar298._8_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 3) & 1);
                  auVar316._12_4_ = (uint)bVar24 * auVar299._12_4_ | (uint)!bVar24 * auVar298._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 4) & 1);
                  auVar316._16_4_ = (uint)bVar24 * auVar299._16_4_ | (uint)!bVar24 * auVar298._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 5) & 1);
                  auVar316._20_4_ = (uint)bVar24 * auVar299._20_4_ | (uint)!bVar24 * auVar298._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 6) & 1);
                  auVar316._24_4_ = (uint)bVar24 * auVar299._24_4_ | (uint)!bVar24 * auVar298._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 7) & 1);
                  auVar316._28_4_ = (uint)bVar24 * auVar299._28_4_ | (uint)!bVar24 * auVar298._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 8) & 1);
                  auVar316._32_4_ = (uint)bVar24 * auVar299._32_4_ | (uint)!bVar24 * auVar298._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 9) & 1);
                  auVar316._36_4_ = (uint)bVar24 * auVar299._36_4_ | (uint)!bVar24 * auVar298._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 10) & 1);
                  auVar316._40_4_ = (uint)bVar24 * auVar299._40_4_ | (uint)!bVar24 * auVar298._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 0xb) & 1);
                  auVar316._44_4_ = (uint)bVar24 * auVar299._44_4_ | (uint)!bVar24 * auVar298._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 0xc) & 1);
                  auVar316._48_4_ = (uint)bVar24 * auVar299._48_4_ | (uint)!bVar24 * auVar298._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 0xd) & 1);
                  auVar316._52_4_ = (uint)bVar24 * auVar299._52_4_ | (uint)!bVar24 * auVar298._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 0xe) & 1);
                  auVar316._56_4_ = (uint)bVar24 * auVar299._56_4_ | (uint)!bVar24 * auVar298._56_4_
                  ;
                  bVar24 = SUB81(uVar176 >> 0xf,0);
                  auVar316._60_4_ = (uint)bVar24 * auVar299._60_4_ | (uint)!bVar24 * auVar298._60_4_
                  ;
                  auVar298 = vminps_avx512f(auVar316,(undefined1  [64])afVar134);
                  auVar298 = vmaxps_avx512f(auVar298,(undefined1  [64])afVar135);
                  auVar299 = vfmadd213ps_avx512f((undefined1  [64])afVar136,auVar298,
                                                 (undefined1  [64])afVar142);
                  auVar300 = vrndscaleps_avx512f(auVar299,1);
                  uVar160 = vcmpps_avx512f(auVar299,auVar300,1);
                  auVar299 = vsubps_avx512f(auVar300,(undefined1  [64])afVar133);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  in_ZMM16._0_4_ = (uint)bVar24 * auVar299._0_4_ | (uint)!bVar24 * auVar300._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  in_ZMM16._4_4_ = (uint)bVar24 * auVar299._4_4_ | (uint)!bVar24 * auVar300._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  in_ZMM16._8_4_ = (uint)bVar24 * auVar299._8_4_ | (uint)!bVar24 * auVar300._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  in_ZMM16._12_4_ = (uint)bVar24 * auVar299._12_4_ | (uint)!bVar24 * auVar300._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  in_ZMM16._16_4_ = (uint)bVar24 * auVar299._16_4_ | (uint)!bVar24 * auVar300._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  in_ZMM16._20_4_ = (uint)bVar24 * auVar299._20_4_ | (uint)!bVar24 * auVar300._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  in_ZMM16._24_4_ = (uint)bVar24 * auVar299._24_4_ | (uint)!bVar24 * auVar300._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  in_ZMM16._28_4_ = (uint)bVar24 * auVar299._28_4_ | (uint)!bVar24 * auVar300._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 8) & 1);
                  in_ZMM16._32_4_ = (uint)bVar24 * auVar299._32_4_ | (uint)!bVar24 * auVar300._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  in_ZMM16._36_4_ = (uint)bVar24 * auVar299._36_4_ | (uint)!bVar24 * auVar300._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  in_ZMM16._40_4_ = (uint)bVar24 * auVar299._40_4_ | (uint)!bVar24 * auVar300._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  in_ZMM16._44_4_ = (uint)bVar24 * auVar299._44_4_ | (uint)!bVar24 * auVar300._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  in_ZMM16._48_4_ = (uint)bVar24 * auVar299._48_4_ | (uint)!bVar24 * auVar300._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  in_ZMM16._52_4_ = (uint)bVar24 * auVar299._52_4_ | (uint)!bVar24 * auVar300._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  in_ZMM16._56_4_ = (uint)bVar24 * auVar299._56_4_ | (uint)!bVar24 * auVar300._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  in_ZMM16._60_4_ = (uint)bVar24 * auVar299._60_4_ | (uint)!bVar24 * auVar300._60_4_
                  ;
                  auVar298 = vfmadd231ps_avx512f(auVar298,in_ZMM16,auVar293);
                  auVar298 = vfmadd231ps_avx512f(auVar298,in_ZMM16,in_ZMM9);
                  auVar299 = vmulps_avx512f(auVar298,auVar298);
                  auVar300 = vfmadd213ps_avx512f(auVar298,(undefined1  [64])afVar137,
                                                 (undefined1  [64])afVar138);
                  auVar300 = vfmadd213ps_avx512f(auVar300,auVar298,(undefined1  [64])afVar139);
                  auVar300 = vfmadd213ps_avx512f(auVar300,auVar298,(undefined1  [64])afVar140);
                  auVar300 = vfmadd213ps_avx512f(auVar300,auVar298,(undefined1  [64])afVar141);
                  auVar300 = vfmadd213ps_avx512f(auVar300,auVar298,(undefined1  [64])afVar142);
                  in_ZMM17 = vfmadd213ps_avx512f(auVar300,auVar299,auVar298);
                  auVar298 = vaddps_avx512f(in_ZMM17,(undefined1  [64])afVar133);
                  auVar299 = vcvttps2dq_avx512f(in_ZMM16);
                  auVar299 = vpaddd_avx512f(auVar299,auVar294);
                  auVar299 = vpslld_avx512f(auVar299,0x17);
                  auVar298 = vfmadd213ps_avx512f(auVar299,auVar298,auVar295);
                  auVar299 = vrcp14ps_avx512f(auVar298);
                  auVar298 = vfmsub213ps_avx512f(auVar298,auVar299,auVar295);
                  auVar298 = vfnmadd132ps_avx512vl(auVar298,auVar299,auVar299);
                  auVar298 = vfnmsub213ps_avx512f(auVar298,auVar296,auVar295);
                  auVar297 = vmulps_avx512f(auVar298,auVar297);
                  break;
                case 6:
                  auVar298 = vbroadcastss_avx512f
                                       (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var161)));
                  uVar1 = (*(uint **)(&this->field_0x118 + (long)p_Var161))[1];
                  auVar125._4_4_ = uVar1;
                  auVar125._0_4_ = uVar1;
                  auVar125._8_4_ = uVar1;
                  auVar125._12_4_ = uVar1;
                  auVar125._16_4_ = uVar1;
                  auVar125._20_4_ = uVar1;
                  auVar125._24_4_ = uVar1;
                  auVar125._28_4_ = uVar1;
                  auVar125._32_4_ = uVar1;
                  auVar125._36_4_ = uVar1;
                  auVar125._40_4_ = uVar1;
                  auVar125._44_4_ = uVar1;
                  auVar125._48_4_ = uVar1;
                  auVar125._52_4_ = uVar1;
                  auVar125._56_4_ = uVar1;
                  auVar125._60_4_ = uVar1;
                  auVar298 = vfmadd213ps_avx512f(auVar298,auVar297,auVar125);
                  auVar298 = vmaxps_avx512f(auVar298,in_ZMM29);
                  auVar298 = vminps_avx512f(auVar298,auVar295);
                  auVar297 = vmulps_avx512f(auVar298,auVar297);
                }
                *(undefined1 (*) [64])ppp_Var170 = auVar297;
                ppp_Var170 = ppp_Var170 + 8;
                uVar166 = uVar166 + 1;
                iVar151 = iVar151 + 1;
              } while (uVar166 != local_158.w);
            }
            iVar180 = iVar180 + 1;
          } while (iVar180 != local_158.h);
        }
        local_228 = local_228 + 1;
      } while (local_228 != local_158.c);
    }
    auVar186 = in_ZMM29._0_16_;
    if ((uVar10 == 0x10) && (uVar162 == 4)) {
      if ((long)local_158.c < 1) goto LAB_002a2e50;
      p_Var161 = pp_Var168[-3];
      iVar182 = *(int *)(&this->field_0xdc + (long)p_Var161);
      iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var161);
      iVar158 = *(int *)(&this->field_0xe4 + (long)p_Var161);
      iVar181 = *(int *)(&this->field_0xe8 + (long)p_Var161);
      uVar13 = *(undefined4 *)(&this->field_0x114 + (long)p_Var161);
      lVar175 = *(long *)(&this->field_0x1a8 + (long)p_Var161);
      uVar12 = *(uint *)(&this->field_0xd4 + (long)p_Var161);
      local_e8._0_8_ = p_Var161;
      uVar163 = *(uint *)(&this->field_0xd8 + (long)p_Var161);
      local_228 = 0;
      auVar209 = ZEXT816(0) << 0x40;
      auVar210._8_4_ = 0x42b0c0a5;
      auVar210._0_8_ = 0x42b0c0a542b0c0a5;
      auVar210._12_4_ = 0x42b0c0a5;
      auVar211._8_4_ = 0xc2b0c0a5;
      auVar211._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar211._12_4_ = 0xc2b0c0a5;
      auVar212._8_4_ = 0x3f000000;
      auVar212._0_8_ = 0x3f0000003f000000;
      auVar212._12_4_ = 0x3f000000;
      auVar213._8_4_ = 0x3fb8aa3b;
      auVar213._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar213._12_4_ = 0x3fb8aa3b;
      auVar214._8_4_ = 0x3f800000;
      auVar214._0_8_ = 0x3f8000003f800000;
      auVar214._12_4_ = 0x3f800000;
      auVar215._8_4_ = 0x3f318000;
      auVar215._0_8_ = 0x3f3180003f318000;
      auVar215._12_4_ = 0x3f318000;
      auVar187 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar227._8_4_ = 0x3ab743ce;
      auVar227._0_8_ = 0x3ab743ce3ab743ce;
      auVar227._12_4_ = 0x3ab743ce;
      auVar220._8_4_ = 0x3c088908;
      auVar220._0_8_ = 0x3c0889083c088908;
      auVar220._12_4_ = 0x3c088908;
      auVar216._8_4_ = 0x3d2aa9c1;
      auVar216._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar216._12_4_ = 0x3d2aa9c1;
      auVar217._8_4_ = 0x3e2aaaaa;
      auVar217._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar217._12_4_ = 0x3e2aaaaa;
      auVar218._8_4_ = 0x3f800000;
      auVar218._0_8_ = 0x3f8000003f800000;
      auVar218._12_4_ = 0x3f800000;
      auVar219._8_4_ = 0xb95e8083;
      auVar219._0_8_ = 0xb95e8083b95e8083;
      auVar219._12_4_ = 0xb95e8083;
      auVar188 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        if (0 < local_158.h) {
          iVar174 = bottom_blob->w;
          iVar155 = bottom_blob->h;
          ppp_Var170 = (_func_int ***)
                       ((long)(_func_int ***)local_158.data +
                       local_158.cstep * local_228 * local_158.elemsize);
          uVar164 = bottom_blob->c;
          local_98._0_8_ = local_228 * 0x10;
          iVar180 = 0;
          do {
            if (0 < local_158.w) {
              uVar166 = 0;
              iVar151 = (1 - uVar12) * iVar182;
              do {
                if (lVar175 == 0) {
                  auVar186 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar186 = *(undefined1 (*) [16])(lVar175 + local_228 * 0x10);
                }
                auVar292 = ZEXT1664(auVar186);
                if (0 < (int)uVar164) {
                  pvVar178 = (void *)((this->weight_data_tm).cstep * local_228 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar15 = bottom_blob->data;
                  uVar160 = 0;
                  do {
                    if (0 < (int)uVar163) {
                      uVar177 = 0;
                      uVar176 = 0;
                      do {
                        iVar152 = (((int)uVar176 - uVar163) + 1) * iVar11 + iVar180;
                        if ((((-1 < iVar152) &&
                             (iVar153 = iVar152 / iVar181, iVar152 % iVar181 == 0)) &&
                            (0 < (int)uVar12)) && (iVar153 < iVar155)) {
                          lVar167 = (long)iVar153 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar160;
                          uVar171 = (ulong)uVar12;
                          uVar172 = uVar177;
                          iVar152 = iVar151;
                          do {
                            if (((-1 < iVar152) &&
                                (iVar153 = iVar152 / iVar158, iVar152 % iVar158 == 0)) &&
                               (iVar153 < iVar174)) {
                              lVar159 = (long)(iVar153 << 4);
                              uVar2 = *(undefined4 *)((long)pvVar15 + lVar159 * 4 + lVar167);
                              auVar186._4_4_ = uVar2;
                              auVar186._0_4_ = uVar2;
                              auVar186._8_4_ = uVar2;
                              auVar186._12_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar15 + lVar159 * 4 + lVar167 + 4);
                              auVar444._4_4_ = uVar2;
                              auVar444._0_4_ = uVar2;
                              auVar444._8_4_ = uVar2;
                              auVar444._12_4_ = uVar2;
                              in_ZMM9 = ZEXT1664(auVar444);
                              auVar189 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 8)));
                              in_ZMM16 = ZEXT1664(auVar189);
                              auVar190 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0xc)));
                              in_ZMM17 = ZEXT1664(auVar190);
                              auVar191 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x10)))
                              ;
                              auVar192 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x14)))
                              ;
                              auVar193 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x18)))
                              ;
                              auVar194 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x1c)))
                              ;
                              auVar195 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x20)))
                              ;
                              auVar196 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x24)))
                              ;
                              auVar197 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x28)))
                              ;
                              auVar198 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x2c)))
                              ;
                              auVar199 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x30)))
                              ;
                              auVar200 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x34)))
                              ;
                              auVar201 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x38)))
                              ;
                              in_ZMM29 = ZEXT1664(auVar201);
                              auVar202 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0x3c)))
                              ;
                              uVar184 = uVar172 & 0xffffffff;
                              auVar186 = vfmadd231ps_fma(auVar292._0_16_,auVar186,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar178 + uVar184 * 4));
                              auVar186 = vfmadd231ps_fma(auVar186,auVar444,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar178 + uVar184 * 4 + 0x10));
                              auVar186 = vfmadd231ps_avx512vl
                                                   (auVar186,auVar189,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar178 + uVar184 * 4 + 0x20));
                              auVar186 = vfmadd231ps_avx512vl
                                                   (auVar186,auVar190,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar178 + uVar184 * 4 + 0x30));
                              auVar186 = vfmadd231ps_avx512vl
                                                   (auVar186,auVar191,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar178 + uVar184 * 4 + 0x40));
                              auVar186 = vfmadd231ps_avx512vl
                                                   (auVar186,auVar192,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar178 + uVar184 * 4 + 0x50));
                              auVar186 = vfmadd231ps_avx512vl
                                                   (auVar186,auVar193,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar178 + uVar184 * 4 + 0x60));
                              auVar186 = vfmadd231ps_avx512vl
                                                   (auVar186,auVar194,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar178 + uVar184 * 4 + 0x70));
                              auVar186 = vfmadd231ps_avx512vl
                                                   (auVar186,auVar195,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar178 + uVar184 * 4 + 0x80));
                              auVar186 = vfmadd231ps_avx512vl
                                                   (auVar186,auVar196,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar178 + uVar184 * 4 + 0x90));
                              auVar186 = vfmadd231ps_avx512vl
                                                   (auVar186,auVar197,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar178 + uVar184 * 4 + 0xa0));
                              auVar186 = vfmadd231ps_avx512vl
                                                   (auVar186,auVar198,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar178 + uVar184 * 4 + 0xb0));
                              auVar186 = vfmadd231ps_avx512vl
                                                   (auVar186,auVar199,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar178 + uVar184 * 4 + 0xc0));
                              auVar186 = vfmadd231ps_avx512vl
                                                   (auVar186,auVar200,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar178 + uVar184 * 4 + 0xd0));
                              auVar186 = vfmadd231ps_avx512vl
                                                   (auVar186,auVar201,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar178 + uVar184 * 4 + 0xe0));
                              auVar186 = vfmadd231ps_avx512vl
                                                   (auVar186,auVar202,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar178 + uVar184 * 4 + 0xf0));
                              auVar292 = ZEXT1664(auVar186);
                            }
                            uVar172 = uVar172 + 0x40;
                            iVar152 = iVar152 + iVar182;
                            uVar171 = uVar171 - 1;
                          } while (uVar171 != 0);
                        }
                        uVar176 = uVar176 + 1;
                        uVar177 = uVar177 + (ulong)uVar12 * 0x40;
                      } while (uVar176 != uVar163);
                    }
                    auVar186 = auVar292._0_16_;
                    pvVar178 = (void *)((long)pvVar178 + (long)(int)(uVar12 * uVar163 * 0x40) * 4);
                    uVar160 = uVar160 + 1;
                  } while (uVar160 != uVar164);
                }
                switch(uVar13) {
                case 1:
                  auVar186 = vmaxps_avx(auVar186,auVar209);
                  break;
                case 2:
                  auVar189 = vmaxps_avx(auVar186,auVar209);
                  auVar186 = vminps_avx(auVar186,auVar209);
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                  auVar49._4_4_ = uVar2;
                  auVar49._0_4_ = uVar2;
                  auVar49._8_4_ = uVar2;
                  auVar49._12_4_ = uVar2;
                  auVar186 = vfmadd132ps_avx512vl(auVar186,auVar189,auVar49);
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                  auVar47._4_4_ = uVar2;
                  auVar47._0_4_ = uVar2;
                  auVar47._8_4_ = uVar2;
                  auVar47._12_4_ = uVar2;
                  auVar186 = vmaxps_avx512vl(auVar186,auVar47);
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var161))[1];
                  auVar48._4_4_ = uVar2;
                  auVar48._0_4_ = uVar2;
                  auVar48._8_4_ = uVar2;
                  auVar48._12_4_ = uVar2;
                  auVar186 = vminps_avx512vl(auVar186,auVar48);
                  break;
                case 4:
                  auVar45._8_4_ = 0x80000000;
                  auVar45._0_8_ = 0x8000000080000000;
                  auVar45._12_4_ = 0x80000000;
                  auVar186 = vxorps_avx512vl(auVar186,auVar45);
                  auVar186 = vminps_avx(auVar186,auVar210);
                  auVar186 = vmaxps_avx(auVar186,auVar211);
                  auVar189 = vfmadd231ps_fma(auVar212,auVar186,auVar213);
                  auVar190 = vcvttps2dq_avx512vl(auVar189);
                  auVar190 = vcvtdq2ps_avx512vl(auVar190);
                  uVar160 = vcmpps_avx512vl(auVar189,auVar190,1);
                  auVar189 = vsubps_avx512vl(auVar190,auVar214);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar208._0_4_ = (uint)bVar24 * auVar189._0_4_ | (uint)!bVar24 * auVar190._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar208._4_4_ = (uint)bVar24 * auVar189._4_4_ | (uint)!bVar24 * auVar190._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar208._8_4_ = (uint)bVar24 * auVar189._8_4_ | (uint)!bVar24 * auVar190._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar208._12_4_ = (uint)bVar24 * auVar189._12_4_ | (uint)!bVar24 * auVar190._12_4_
                  ;
                  in_ZMM16 = ZEXT1664(auVar208);
                  auVar186 = vfmsub231ps_avx512vl(auVar186,auVar208,auVar215);
                  auVar46._8_4_ = 0x395e8083;
                  auVar46._0_8_ = 0x395e8083395e8083;
                  auVar46._12_4_ = 0x395e8083;
                  auVar189 = vfmsub231ps_avx512vl(auVar186,auVar208,auVar46);
                  auVar416._0_4_ = auVar189._0_4_ * auVar189._0_4_;
                  auVar416._4_4_ = auVar189._4_4_ * auVar189._4_4_;
                  auVar416._8_4_ = auVar189._8_4_ * auVar189._8_4_;
                  auVar416._12_4_ = auVar189._12_4_ * auVar189._12_4_;
                  auVar186 = vfmadd213ps_fma(auVar187,auVar189,auVar227);
                  auVar186 = vfmadd213ps_fma(auVar186,auVar189,auVar220);
                  auVar186 = vfmadd213ps_fma(auVar186,auVar189,auVar216);
                  auVar186 = vfmadd213ps_fma(auVar186,auVar189,auVar217);
                  auVar186 = vfmadd213ps_fma(auVar186,auVar189,auVar212);
                  auVar186 = vfmadd213ps_fma(auVar186,auVar416,auVar189);
                  in_ZMM9 = ZEXT1664(auVar186);
                  auVar417._0_4_ = auVar186._0_4_ + 1.0;
                  auVar417._4_4_ = auVar186._4_4_ + 1.0;
                  auVar417._8_4_ = auVar186._8_4_ + 1.0;
                  auVar417._12_4_ = auVar186._12_4_ + 1.0;
                  auVar186 = vcvttps2dq_avx512vl(auVar208);
                  auVar186 = vpslld_avx(auVar186,0x17);
                  auVar186 = vpaddd_avx(auVar218,auVar186);
                  auVar189 = vfmadd213ps_fma(auVar186,auVar417,auVar214);
                  auVar186 = vrcpps_avx(auVar189);
                  auVar189 = vfmsub213ps_fma(auVar189,auVar186,auVar214);
                  auVar186 = vfnmadd132ps_fma(auVar189,auVar186,auVar186);
                  break;
                case 5:
                  auVar189 = vminps_avx(auVar186,auVar210);
                  auVar189 = vmaxps_avx(auVar189,auVar211);
                  auVar190 = vfmadd213ps_fma(auVar213,auVar189,auVar212);
                  auVar191 = vcvttps2dq_avx512vl(auVar190);
                  auVar191 = vcvtdq2ps_avx512vl(auVar191);
                  uVar160 = vcmpps_avx512vl(auVar190,auVar191,1);
                  auVar190 = vsubps_avx512vl(auVar191,auVar214);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar203._0_4_ = (uint)bVar24 * auVar190._0_4_ | (uint)!bVar24 * auVar191._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar203._4_4_ = (uint)bVar24 * auVar190._4_4_ | (uint)!bVar24 * auVar191._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar203._8_4_ = (uint)bVar24 * auVar190._8_4_ | (uint)!bVar24 * auVar191._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar203._12_4_ = (uint)bVar24 * auVar190._12_4_ | (uint)!bVar24 * auVar191._12_4_
                  ;
                  auVar189 = vfmsub231ps_avx512vl(auVar189,auVar203,auVar215);
                  auVar189 = vfnmsub231ps_avx512vl(auVar189,auVar203,auVar219);
                  auVar445._0_4_ = auVar189._0_4_ * auVar189._0_4_;
                  auVar445._4_4_ = auVar189._4_4_ * auVar189._4_4_;
                  auVar445._8_4_ = auVar189._8_4_ * auVar189._8_4_;
                  auVar445._12_4_ = auVar189._12_4_ * auVar189._12_4_;
                  auVar190 = vfmadd213ps_avx512vl(auVar187,auVar189,auVar227);
                  auVar190 = vfmadd213ps_avx512vl(auVar190,auVar189,auVar220);
                  auVar190 = vfmadd213ps_avx512vl(auVar190,auVar189,auVar216);
                  auVar190 = vfmadd213ps_avx512vl(auVar190,auVar189,auVar217);
                  auVar190 = vfmadd213ps_avx512vl(auVar190,auVar189,auVar212);
                  auVar189 = vfmadd213ps_avx512vl(auVar190,auVar445,auVar189);
                  auVar190 = vaddps_avx512vl(auVar189,auVar214);
                  auVar189 = vcvttps2dq_avx512vl(auVar203);
                  auVar189 = vpslld_avx(auVar189,0x17);
                  auVar189 = vpaddd_avx(auVar189,auVar218);
                  auVar189 = vfmadd213ps_fma(auVar189,auVar190,auVar214);
                  uVar160 = vcmpps_avx512vl(auVar189,auVar209,2);
                  auVar192._8_4_ = 0x800000;
                  auVar192._0_8_ = 0x80000000800000;
                  auVar192._12_4_ = 0x800000;
                  auVar189 = vmaxps_avx512vl(auVar189,auVar192);
                  auVar192 = vpsrld_avx(auVar189,0x17);
                  auVar190 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar193._8_4_ = 0x3f000000;
                  auVar193._0_8_ = 0x3f0000003f000000;
                  auVar193._12_4_ = 0x3f000000;
                  auVar189 = vpternlogd_avx512vl(auVar189,auVar190,auVar193,0xea);
                  auVar194._8_4_ = 0x3f3504f3;
                  auVar194._0_8_ = 0x3f3504f33f3504f3;
                  auVar194._12_4_ = 0x3f3504f3;
                  uVar176 = vcmpps_avx512vl(auVar189,auVar194,1);
                  auVar195._8_4_ = 0xbf800000;
                  auVar195._0_8_ = 0xbf800000bf800000;
                  auVar195._12_4_ = 0xbf800000;
                  auVar190 = vaddps_avx512vl(auVar189,auVar195);
                  auVar189 = vaddps_avx512vl(auVar190,auVar189);
                  bVar24 = (bool)((byte)uVar176 & 1);
                  auVar204._0_4_ = (uint)bVar24 * auVar189._0_4_ | (uint)!bVar24 * auVar190._0_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 1) & 1);
                  auVar204._4_4_ = (uint)bVar24 * auVar189._4_4_ | (uint)!bVar24 * auVar190._4_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 2) & 1);
                  auVar204._8_4_ = (uint)bVar24 * auVar189._8_4_ | (uint)!bVar24 * auVar190._8_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 3) & 1);
                  auVar204._12_4_ = (uint)bVar24 * auVar189._12_4_ | (uint)!bVar24 * auVar190._12_4_
                  ;
                  auVar190 = vmulps_avx512vl(auVar204,auVar204);
                  auVar189 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
                  auVar196._8_4_ = 0xbdebd1b8;
                  auVar196._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar196._12_4_ = 0xbdebd1b8;
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar204,auVar196);
                  auVar197._8_4_ = 0x3def251a;
                  auVar197._0_8_ = 0x3def251a3def251a;
                  auVar197._12_4_ = 0x3def251a;
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar204,auVar197);
                  auVar198._8_4_ = 0xbdfe5d4f;
                  auVar198._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar198._12_4_ = 0xbdfe5d4f;
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar204,auVar198);
                  auVar199._8_4_ = 0x3e11e9bf;
                  auVar199._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar199._12_4_ = 0x3e11e9bf;
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar204,auVar199);
                  auVar200._8_4_ = 0xbe2aae50;
                  auVar200._0_8_ = 0xbe2aae50be2aae50;
                  auVar200._12_4_ = 0xbe2aae50;
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar204,auVar200);
                  auVar201._8_4_ = 0x3e4cceac;
                  auVar201._0_8_ = 0x3e4cceac3e4cceac;
                  auVar201._12_4_ = 0x3e4cceac;
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar204,auVar201);
                  auVar202._8_4_ = 0xbe7ffffc;
                  auVar202._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar202._12_4_ = 0xbe7ffffc;
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar204,auVar202);
                  auVar43._8_4_ = 0x3eaaaaaa;
                  auVar43._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar43._12_4_ = 0x3eaaaaaa;
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar204,auVar43);
                  auVar191 = vmulps_avx512vl(auVar190,auVar204);
                  auVar191 = vmulps_avx512vl(auVar191,auVar189);
                  auVar44._8_4_ = 0xffffff82;
                  auVar44._0_8_ = 0xffffff82ffffff82;
                  auVar44._12_4_ = 0xffffff82;
                  auVar189 = vpaddd_avx512vl(auVar192,auVar44);
                  auVar189 = vcvtdq2ps_avx(auVar189);
                  auVar192 = vsubps_avx512vl(auVar189,auVar214);
                  bVar24 = (bool)((byte)uVar176 & 1);
                  auVar205._0_4_ = (uint)bVar24 * auVar192._0_4_ | (uint)!bVar24 * auVar189._0_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 1) & 1);
                  auVar205._4_4_ = (uint)bVar24 * auVar192._4_4_ | (uint)!bVar24 * auVar189._4_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 2) & 1);
                  auVar205._8_4_ = (uint)bVar24 * auVar192._8_4_ | (uint)!bVar24 * auVar189._8_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 3) & 1);
                  auVar205._12_4_ = (uint)bVar24 * auVar192._12_4_ | (uint)!bVar24 * auVar189._12_4_
                  ;
                  auVar189 = vfmadd231ps_avx512vl(auVar191,auVar205,auVar219);
                  auVar189 = vfmsub231ps_avx512vl(auVar189,auVar212,auVar190);
                  auVar189 = vsubps_avx512vl(auVar189,auVar204);
                  auVar189 = vfnmadd231ps_fma(auVar189,auVar215,auVar205);
                  auVar190 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar206._0_4_ =
                       (uint)bVar24 * auVar190._0_4_ |
                       (uint)!bVar24 * (int)(auVar189._0_4_ + auVar189._0_4_);
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar206._4_4_ =
                       (uint)bVar24 * auVar190._4_4_ |
                       (uint)!bVar24 * (int)(auVar189._4_4_ + auVar189._4_4_);
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar206._8_4_ =
                       (uint)bVar24 * auVar190._8_4_ |
                       (uint)!bVar24 * (int)(auVar189._8_4_ + auVar189._8_4_);
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar206._12_4_ =
                       (uint)bVar24 * auVar190._12_4_ |
                       (uint)!bVar24 * (int)(auVar189._12_4_ + auVar189._12_4_);
                  auVar189 = vminps_avx(auVar206,auVar210);
                  auVar189 = vmaxps_avx(auVar189,auVar211);
                  auVar190 = vfmadd213ps_fma(auVar213,auVar189,auVar212);
                  auVar191 = vcvttps2dq_avx512vl(auVar190);
                  auVar191 = vcvtdq2ps_avx512vl(auVar191);
                  uVar160 = vcmpps_avx512vl(auVar190,auVar191,1);
                  auVar190 = vsubps_avx512vl(auVar191,auVar214);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar207._0_4_ = (uint)bVar24 * auVar190._0_4_ | (uint)!bVar24 * auVar191._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar207._4_4_ = (uint)bVar24 * auVar190._4_4_ | (uint)!bVar24 * auVar191._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar207._8_4_ = (uint)bVar24 * auVar190._8_4_ | (uint)!bVar24 * auVar191._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar207._12_4_ = (uint)bVar24 * auVar190._12_4_ | (uint)!bVar24 * auVar191._12_4_
                  ;
                  auVar189 = vfmsub231ps_avx512vl(auVar189,auVar207,auVar215);
                  auVar189 = vfnmsub231ps_avx512vl(auVar189,auVar207,auVar219);
                  auVar446._0_4_ = auVar189._0_4_ * auVar189._0_4_;
                  auVar446._4_4_ = auVar189._4_4_ * auVar189._4_4_;
                  auVar446._8_4_ = auVar189._8_4_ * auVar189._8_4_;
                  auVar446._12_4_ = auVar189._12_4_ * auVar189._12_4_;
                  auVar190 = vfmadd213ps_avx512vl(auVar187,auVar189,auVar227);
                  auVar190 = vfmadd213ps_avx512vl(auVar190,auVar189,auVar220);
                  auVar190 = vfmadd213ps_avx512vl(auVar190,auVar189,auVar216);
                  auVar190 = vfmadd213ps_avx512vl(auVar190,auVar189,auVar217);
                  auVar190 = vfmadd213ps_avx512vl(auVar190,auVar189,auVar212);
                  auVar189 = vfmadd213ps_avx512vl(auVar190,auVar446,auVar189);
                  in_ZMM17 = ZEXT1664(auVar189);
                  auVar190 = vaddps_avx512vl(auVar189,auVar214);
                  auVar189 = vcvttps2dq_avx512vl(auVar207);
                  auVar189 = vpslld_avx(auVar189,0x17);
                  auVar189 = vpaddd_avx(auVar189,auVar218);
                  auVar190 = vfmadd213ps_fma(auVar189,auVar190,auVar214);
                  auVar189 = vrcpps_avx(auVar190);
                  auVar191 = vaddps_avx512vl(auVar189,auVar189);
                  in_ZMM16 = ZEXT1664(auVar191);
                  auVar190 = vfmsub213ps_avx512vl(auVar190,auVar191,auVar188);
                  auVar189 = vfnmadd213ps_avx512vl(auVar190,auVar189,auVar191);
                  in_ZMM9 = ZEXT1664(auVar189);
                  auVar186 = vfmsub231ps_fma(auVar186,auVar186,auVar189);
                  break;
                case 6:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                  auVar191._4_4_ = uVar2;
                  auVar191._0_4_ = uVar2;
                  auVar191._8_4_ = uVar2;
                  auVar191._12_4_ = uVar2;
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var161))[1];
                  auVar189._4_4_ = uVar2;
                  auVar189._0_4_ = uVar2;
                  auVar189._8_4_ = uVar2;
                  auVar189._12_4_ = uVar2;
                  auVar189 = vfmadd213ps_avx512vl(auVar191,auVar186,auVar189);
                  auVar189 = vmaxps_avx(auVar189,auVar209);
                  auVar189 = vminps_avx(auVar189,auVar214);
                  auVar190._0_4_ = auVar189._0_4_ * auVar186._0_4_;
                  auVar190._4_4_ = auVar189._4_4_ * auVar186._4_4_;
                  auVar190._8_4_ = auVar189._8_4_ * auVar186._8_4_;
                  auVar190._12_4_ = auVar189._12_4_ * auVar186._12_4_;
                  auVar186 = auVar190;
                }
                *(undefined1 (*) [16])ppp_Var170 = auVar186;
                ppp_Var170 = ppp_Var170 + 2;
                uVar166 = uVar166 + 1;
                iVar151 = iVar151 + 1;
              } while (uVar166 != local_158.w);
            }
            iVar180 = iVar180 + 1;
          } while (iVar180 != local_158.h);
        }
        auVar186 = in_ZMM29._0_16_;
        local_228 = local_228 + 1;
      } while (local_228 != local_158.c);
    }
    afVar149 = _ps512_cephes_log_p8;
    afVar148 = _ps512_cephes_log_p7;
    afVar147 = _ps512_cephes_log_p6;
    afVar146 = _ps512_cephes_log_p5;
    afVar145 = _ps512_cephes_log_p4;
    afVar144 = _ps512_cephes_log_p3;
    afVar143 = _ps512_cephes_log_p2;
    afVar142 = _ps512_cephes_exp_p5;
    afVar141 = _ps512_cephes_exp_p4;
    afVar140 = _ps512_cephes_exp_p3;
    afVar139 = _ps512_cephes_exp_p2;
    afVar138 = _ps512_cephes_exp_p1;
    afVar137 = _ps512_cephes_exp_p0;
    afVar136 = _ps512_cephes_LOG2EF;
    afVar135 = _ps512_exp_lo;
    afVar134 = _ps512_exp_hi;
    afVar133 = _ps512_1;
    if ((uVar10 == 1) && (uVar162 == 0x10)) {
      if ((long)local_158.c < 1) goto LAB_002a2e50;
      p_Var161 = pp_Var168[-3];
      iVar182 = *(int *)(&this->field_0xdc + (long)p_Var161);
      iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var161);
      iVar158 = *(int *)(&this->field_0xe4 + (long)p_Var161);
      iVar181 = *(int *)(&this->field_0xe8 + (long)p_Var161);
      uVar13 = *(undefined4 *)(&this->field_0x114 + (long)p_Var161);
      lVar175 = *(long *)(&this->field_0x1a8 + (long)p_Var161);
      uVar12 = *(uint *)(&this->field_0xd4 + (long)p_Var161);
      local_e8._0_8_ = p_Var161;
      uVar163 = *(uint *)(&this->field_0xd8 + (long)p_Var161);
      auVar292 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar293 = vxorps_avx512dq(auVar292,(undefined1  [64])_ps512_cephes_log_q2);
      in_ZMM9 = vxorps_avx512dq(auVar292,(undefined1  [64])_ps512_cephes_log_q1);
      auVar294 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar309 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar292);
      local_228 = 0;
      auVar186 = vxorps_avx512vl(auVar186,auVar186);
      auVar297 = ZEXT1664(auVar186);
      auVar295 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar296 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      do {
        if (0 < local_158.h) {
          iVar174 = bottom_blob->w;
          iVar155 = bottom_blob->h;
          ppp_Var170 = (_func_int ***)
                       ((long)(_func_int ***)local_158.data +
                       local_158.cstep * local_228 * local_158.elemsize);
          uVar164 = bottom_blob->c;
          local_98._0_8_ = local_228 * 0x40;
          iVar180 = 0;
          do {
            if (0 < local_158.w) {
              uVar166 = 0;
              iVar151 = (1 - uVar12) * iVar182;
              do {
                if (lVar175 == 0) {
                  auVar298 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar298 = *(undefined1 (*) [64])(lVar175 + local_228 * 0x40);
                }
                if (0 < (int)uVar164) {
                  pvVar178 = (void *)((this->weight_data_tm).cstep * local_228 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  uVar160 = 0;
                  do {
                    if (0 < (int)uVar163) {
                      uVar176 = 0;
                      uVar177 = 0;
                      do {
                        iVar152 = (((int)uVar177 - uVar163) + 1) * iVar11 + iVar180;
                        if ((((-1 < iVar152) &&
                             (iVar153 = iVar152 / iVar181, iVar152 % iVar181 == 0)) &&
                            (iVar153 < iVar155)) && (0 < (int)uVar12)) {
                          uVar171 = uVar176;
                          uVar172 = (ulong)uVar12;
                          iVar152 = iVar151;
                          do {
                            if (((-1 < iVar152) &&
                                (iVar154 = iVar152 / iVar158, iVar152 % iVar158 == 0)) &&
                               (iVar154 < iVar174)) {
                              auVar299 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)bottom_blob->data +
                                                                     (long)iVar154 * 4 +
                                                                     (long)iVar153 *
                                                                     (long)bottom_blob->w *
                                                                     bottom_blob->elemsize +
                                                                     bottom_blob->cstep *
                                                                     bottom_blob->elemsize * uVar160
                                                                     )));
                              auVar298 = vfmadd231ps_avx512f(auVar298,auVar299,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar178 +
                                                              (uVar171 & 0xffffffff) * 4));
                            }
                            uVar171 = uVar171 + 0x10;
                            iVar152 = iVar152 + iVar182;
                            uVar172 = uVar172 - 1;
                          } while (uVar172 != 0);
                        }
                        uVar177 = uVar177 + 1;
                        uVar176 = uVar176 + (ulong)uVar12 * 0x10;
                      } while (uVar177 != uVar163);
                    }
                    pvVar178 = (void *)((long)pvVar178 + (long)(int)(uVar12 * uVar163 * 0x10) * 4);
                    uVar160 = uVar160 + 1;
                  } while (uVar160 != uVar164);
                }
                switch(uVar13) {
                case 1:
                  auVar298 = vmaxps_avx512f(auVar298,auVar297);
                  break;
                case 2:
                  uVar160 = vcmpps_avx512f(auVar298,auVar297,1);
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                  auVar132._4_4_ = uVar2;
                  auVar132._0_4_ = uVar2;
                  auVar132._8_4_ = uVar2;
                  auVar132._12_4_ = uVar2;
                  auVar132._16_4_ = uVar2;
                  auVar132._20_4_ = uVar2;
                  auVar132._24_4_ = uVar2;
                  auVar132._28_4_ = uVar2;
                  auVar132._32_4_ = uVar2;
                  auVar132._36_4_ = uVar2;
                  auVar132._40_4_ = uVar2;
                  auVar132._44_4_ = uVar2;
                  auVar132._48_4_ = uVar2;
                  auVar132._52_4_ = uVar2;
                  auVar132._56_4_ = uVar2;
                  auVar132._60_4_ = uVar2;
                  auVar299 = vmulps_avx512f(auVar298,auVar132);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar324._0_4_ = (uint)bVar24 * auVar299._0_4_ | (uint)!bVar24 * auVar298._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar324._4_4_ = (uint)bVar24 * auVar299._4_4_ | (uint)!bVar24 * auVar298._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar324._8_4_ = (uint)bVar24 * auVar299._8_4_ | (uint)!bVar24 * auVar298._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar324._12_4_ = (uint)bVar24 * auVar299._12_4_ | (uint)!bVar24 * auVar298._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  auVar324._16_4_ = (uint)bVar24 * auVar299._16_4_ | (uint)!bVar24 * auVar298._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  auVar324._20_4_ = (uint)bVar24 * auVar299._20_4_ | (uint)!bVar24 * auVar298._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  auVar324._24_4_ = (uint)bVar24 * auVar299._24_4_ | (uint)!bVar24 * auVar298._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  auVar324._28_4_ = (uint)bVar24 * auVar299._28_4_ | (uint)!bVar24 * auVar298._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 8) & 1);
                  auVar324._32_4_ = (uint)bVar24 * auVar299._32_4_ | (uint)!bVar24 * auVar298._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  auVar324._36_4_ = (uint)bVar24 * auVar299._36_4_ | (uint)!bVar24 * auVar298._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  auVar324._40_4_ = (uint)bVar24 * auVar299._40_4_ | (uint)!bVar24 * auVar298._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  auVar324._44_4_ = (uint)bVar24 * auVar299._44_4_ | (uint)!bVar24 * auVar298._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  auVar324._48_4_ = (uint)bVar24 * auVar299._48_4_ | (uint)!bVar24 * auVar298._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  auVar324._52_4_ = (uint)bVar24 * auVar299._52_4_ | (uint)!bVar24 * auVar298._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  auVar324._56_4_ = (uint)bVar24 * auVar299._56_4_ | (uint)!bVar24 * auVar298._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  auVar324._60_4_ = (uint)bVar24 * auVar299._60_4_ | (uint)!bVar24 * auVar298._60_4_
                  ;
                  auVar298 = auVar324;
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                  auVar130._4_4_ = uVar2;
                  auVar130._0_4_ = uVar2;
                  auVar130._8_4_ = uVar2;
                  auVar130._12_4_ = uVar2;
                  auVar130._16_4_ = uVar2;
                  auVar130._20_4_ = uVar2;
                  auVar130._24_4_ = uVar2;
                  auVar130._28_4_ = uVar2;
                  auVar130._32_4_ = uVar2;
                  auVar130._36_4_ = uVar2;
                  auVar130._40_4_ = uVar2;
                  auVar130._44_4_ = uVar2;
                  auVar130._48_4_ = uVar2;
                  auVar130._52_4_ = uVar2;
                  auVar130._56_4_ = uVar2;
                  auVar130._60_4_ = uVar2;
                  auVar298 = vmaxps_avx512f(auVar298,auVar130);
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var161))[1];
                  auVar131._4_4_ = uVar2;
                  auVar131._0_4_ = uVar2;
                  auVar131._8_4_ = uVar2;
                  auVar131._12_4_ = uVar2;
                  auVar131._16_4_ = uVar2;
                  auVar131._20_4_ = uVar2;
                  auVar131._24_4_ = uVar2;
                  auVar131._28_4_ = uVar2;
                  auVar131._32_4_ = uVar2;
                  auVar131._36_4_ = uVar2;
                  auVar131._40_4_ = uVar2;
                  auVar131._44_4_ = uVar2;
                  auVar131._48_4_ = uVar2;
                  auVar131._52_4_ = uVar2;
                  auVar131._56_4_ = uVar2;
                  auVar131._60_4_ = uVar2;
                  auVar298 = vminps_avx512f(auVar298,auVar131);
                  break;
                case 4:
                  auVar298 = vxorps_avx512dq(auVar298,auVar292);
                  auVar298 = vminps_avx512f(auVar298,(undefined1  [64])afVar134);
                  auVar298 = vmaxps_avx512f(auVar298,(undefined1  [64])afVar135);
                  auVar299 = vfmadd213ps_avx512f((undefined1  [64])afVar136,auVar298,
                                                 (undefined1  [64])afVar142);
                  auVar300 = vrndscaleps_avx512f(auVar299,1);
                  uVar160 = vcmpps_avx512f(auVar299,auVar300,1);
                  auVar299 = vsubps_avx512f(auVar300,(undefined1  [64])afVar133);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar323._0_4_ = (uint)bVar24 * auVar299._0_4_ | (uint)!bVar24 * auVar300._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar323._4_4_ = (uint)bVar24 * auVar299._4_4_ | (uint)!bVar24 * auVar300._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar323._8_4_ = (uint)bVar24 * auVar299._8_4_ | (uint)!bVar24 * auVar300._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar323._12_4_ = (uint)bVar24 * auVar299._12_4_ | (uint)!bVar24 * auVar300._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  auVar323._16_4_ = (uint)bVar24 * auVar299._16_4_ | (uint)!bVar24 * auVar300._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  auVar323._20_4_ = (uint)bVar24 * auVar299._20_4_ | (uint)!bVar24 * auVar300._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  auVar323._24_4_ = (uint)bVar24 * auVar299._24_4_ | (uint)!bVar24 * auVar300._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  auVar323._28_4_ = (uint)bVar24 * auVar299._28_4_ | (uint)!bVar24 * auVar300._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 8) & 1);
                  auVar323._32_4_ = (uint)bVar24 * auVar299._32_4_ | (uint)!bVar24 * auVar300._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  auVar323._36_4_ = (uint)bVar24 * auVar299._36_4_ | (uint)!bVar24 * auVar300._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  auVar323._40_4_ = (uint)bVar24 * auVar299._40_4_ | (uint)!bVar24 * auVar300._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  auVar323._44_4_ = (uint)bVar24 * auVar299._44_4_ | (uint)!bVar24 * auVar300._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  auVar323._48_4_ = (uint)bVar24 * auVar299._48_4_ | (uint)!bVar24 * auVar300._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  auVar323._52_4_ = (uint)bVar24 * auVar299._52_4_ | (uint)!bVar24 * auVar300._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  auVar323._56_4_ = (uint)bVar24 * auVar299._56_4_ | (uint)!bVar24 * auVar300._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  auVar323._60_4_ = (uint)bVar24 * auVar299._60_4_ | (uint)!bVar24 * auVar300._60_4_
                  ;
                  auVar298 = vfmadd231ps_avx512f(auVar298,auVar323,auVar293);
                  in_ZMM16 = vfmadd231ps_avx512f(auVar298,auVar323,in_ZMM9);
                  auVar298 = vmulps_avx512f(in_ZMM16,in_ZMM16);
                  auVar299 = vfmadd213ps_avx512f(in_ZMM16,(undefined1  [64])afVar137,
                                                 (undefined1  [64])afVar138);
                  auVar299 = vfmadd213ps_avx512f(auVar299,in_ZMM16,(undefined1  [64])afVar139);
                  auVar299 = vfmadd213ps_avx512f(auVar299,in_ZMM16,(undefined1  [64])afVar140);
                  auVar299 = vfmadd213ps_avx512f(auVar299,in_ZMM16,(undefined1  [64])afVar141);
                  auVar299 = vfmadd213ps_avx512f(auVar299,in_ZMM16,(undefined1  [64])afVar142);
                  auVar298 = vfmadd213ps_avx512f(auVar299,auVar298,in_ZMM16);
                  auVar298 = vaddps_avx512f(auVar298,(undefined1  [64])afVar133);
                  auVar299 = vcvttps2dq_avx512f(auVar323);
                  auVar299 = vpaddd_avx512f(auVar299,auVar294);
                  auVar299 = vpslld_avx512f(auVar299,0x17);
                  auVar298 = vfmadd213ps_avx512f(auVar299,auVar298,auVar295);
                  auVar299 = vrcp14ps_avx512f(auVar298);
                  auVar298 = vfmsub213ps_avx512f(auVar298,auVar299,auVar295);
                  auVar298 = vfnmadd132ps_avx512vl(auVar298,auVar299,auVar299);
                  break;
                case 5:
                  auVar299 = vminps_avx512f(auVar298,(undefined1  [64])afVar134);
                  auVar299 = vmaxps_avx512f(auVar299,(undefined1  [64])afVar135);
                  auVar300 = vfmadd213ps_avx512f((undefined1  [64])afVar136,auVar299,
                                                 (undefined1  [64])afVar142);
                  auVar301 = vrndscaleps_avx512f(auVar300,1);
                  uVar160 = vcmpps_avx512f(auVar300,auVar301,1);
                  auVar300 = vsubps_avx512f(auVar301,(undefined1  [64])afVar133);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar319._0_4_ = (uint)bVar24 * auVar300._0_4_ | (uint)!bVar24 * auVar301._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar319._4_4_ = (uint)bVar24 * auVar300._4_4_ | (uint)!bVar24 * auVar301._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar319._8_4_ = (uint)bVar24 * auVar300._8_4_ | (uint)!bVar24 * auVar301._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar319._12_4_ = (uint)bVar24 * auVar300._12_4_ | (uint)!bVar24 * auVar301._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  auVar319._16_4_ = (uint)bVar24 * auVar300._16_4_ | (uint)!bVar24 * auVar301._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  auVar319._20_4_ = (uint)bVar24 * auVar300._20_4_ | (uint)!bVar24 * auVar301._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  auVar319._24_4_ = (uint)bVar24 * auVar300._24_4_ | (uint)!bVar24 * auVar301._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  auVar319._28_4_ = (uint)bVar24 * auVar300._28_4_ | (uint)!bVar24 * auVar301._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 8) & 1);
                  auVar319._32_4_ = (uint)bVar24 * auVar300._32_4_ | (uint)!bVar24 * auVar301._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  auVar319._36_4_ = (uint)bVar24 * auVar300._36_4_ | (uint)!bVar24 * auVar301._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  auVar319._40_4_ = (uint)bVar24 * auVar300._40_4_ | (uint)!bVar24 * auVar301._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  auVar319._44_4_ = (uint)bVar24 * auVar300._44_4_ | (uint)!bVar24 * auVar301._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  auVar319._48_4_ = (uint)bVar24 * auVar300._48_4_ | (uint)!bVar24 * auVar301._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  auVar319._52_4_ = (uint)bVar24 * auVar300._52_4_ | (uint)!bVar24 * auVar301._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  auVar319._56_4_ = (uint)bVar24 * auVar300._56_4_ | (uint)!bVar24 * auVar301._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  auVar319._60_4_ = (uint)bVar24 * auVar300._60_4_ | (uint)!bVar24 * auVar301._60_4_
                  ;
                  auVar299 = vfmadd231ps_avx512f(auVar299,auVar319,auVar293);
                  auVar299 = vfmadd231ps_avx512f(auVar299,auVar319,in_ZMM9);
                  auVar300 = vmulps_avx512f(auVar299,auVar299);
                  auVar301 = vfmadd213ps_avx512f(auVar299,(undefined1  [64])afVar137,
                                                 (undefined1  [64])afVar138);
                  auVar301 = vfmadd213ps_avx512f(auVar301,auVar299,(undefined1  [64])afVar139);
                  auVar301 = vfmadd213ps_avx512f(auVar301,auVar299,(undefined1  [64])afVar140);
                  auVar301 = vfmadd213ps_avx512f(auVar301,auVar299,(undefined1  [64])afVar141);
                  auVar301 = vfmadd213ps_avx512f(auVar301,auVar299,(undefined1  [64])afVar142);
                  auVar299 = vfmadd213ps_avx512f(auVar301,auVar300,auVar299);
                  auVar299 = vaddps_avx512f(auVar299,(undefined1  [64])afVar133);
                  auVar300 = vcvttps2dq_avx512f(auVar319);
                  auVar300 = vpaddd_avx512f(auVar300,auVar294);
                  auVar300 = vpslld_avx512f(auVar300,0x17);
                  auVar299 = vfmadd213ps_avx512f(auVar300,auVar299,auVar295);
                  auVar300 = vmaxps_avx512f(auVar299,(undefined1  [64])_ps512_min_norm_pos);
                  auVar301 = vpsrld_avx512f(auVar300,0x17);
                  auVar300 = vpternlogd_avx512f(auVar300,(undefined1  [64])afVar142,
                                                (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar160 = vcmpps_avx512f(auVar300,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar302 = vsubps_avx512f(auVar300,(undefined1  [64])afVar133);
                  auVar300 = vaddps_avx512f(auVar302,auVar300);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar320._0_4_ = (uint)bVar24 * auVar300._0_4_ | (uint)!bVar24 * auVar302._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar320._4_4_ = (uint)bVar24 * auVar300._4_4_ | (uint)!bVar24 * auVar302._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar320._8_4_ = (uint)bVar24 * auVar300._8_4_ | (uint)!bVar24 * auVar302._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar320._12_4_ = (uint)bVar24 * auVar300._12_4_ | (uint)!bVar24 * auVar302._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  auVar320._16_4_ = (uint)bVar24 * auVar300._16_4_ | (uint)!bVar24 * auVar302._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  auVar320._20_4_ = (uint)bVar24 * auVar300._20_4_ | (uint)!bVar24 * auVar302._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  auVar320._24_4_ = (uint)bVar24 * auVar300._24_4_ | (uint)!bVar24 * auVar302._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  auVar320._28_4_ = (uint)bVar24 * auVar300._28_4_ | (uint)!bVar24 * auVar302._28_4_
                  ;
                  bVar32 = (byte)(uVar160 >> 8);
                  bVar24 = (bool)(bVar32 & 1);
                  auVar320._32_4_ = (uint)bVar24 * auVar300._32_4_ | (uint)!bVar24 * auVar302._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  auVar320._36_4_ = (uint)bVar24 * auVar300._36_4_ | (uint)!bVar24 * auVar302._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  auVar320._40_4_ = (uint)bVar24 * auVar300._40_4_ | (uint)!bVar24 * auVar302._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  auVar320._44_4_ = (uint)bVar24 * auVar300._44_4_ | (uint)!bVar24 * auVar302._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  auVar320._48_4_ = (uint)bVar24 * auVar300._48_4_ | (uint)!bVar24 * auVar302._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  auVar320._52_4_ = (uint)bVar24 * auVar300._52_4_ | (uint)!bVar24 * auVar302._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  auVar320._56_4_ = (uint)bVar24 * auVar300._56_4_ | (uint)!bVar24 * auVar302._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  auVar320._60_4_ = (uint)bVar24 * auVar300._60_4_ | (uint)!bVar24 * auVar302._60_4_
                  ;
                  auVar300 = vmulps_avx512f(auVar320,auVar320);
                  auVar302 = vfmadd132ps_avx512f(auVar320,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar302 = vfmadd213ps_avx512f(auVar302,auVar320,(undefined1  [64])afVar143);
                  auVar302 = vfmadd213ps_avx512f(auVar302,auVar320,(undefined1  [64])afVar144);
                  auVar302 = vfmadd213ps_avx512f(auVar302,auVar320,(undefined1  [64])afVar145);
                  auVar302 = vfmadd213ps_avx512f(auVar302,auVar320,(undefined1  [64])afVar146);
                  auVar302 = vfmadd213ps_avx512f(auVar302,auVar320,(undefined1  [64])afVar147);
                  auVar302 = vfmadd213ps_avx512f(auVar302,auVar320,(undefined1  [64])afVar148);
                  auVar302 = vfmadd213ps_avx512f(auVar302,auVar320,(undefined1  [64])afVar149);
                  auVar303 = vmulps_avx512f(auVar300,auVar320);
                  auVar302 = vfmadd213ps_avx512f(auVar303,auVar302,auVar320);
                  uVar176 = vcmpps_avx512f(auVar299,auVar297,2);
                  auVar299 = vpsubd_avx512f(auVar301,auVar294);
                  auVar299 = vcvtdq2ps_avx512f(auVar299);
                  auVar301 = vaddps_avx512f(auVar299,(undefined1  [64])afVar133);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar321._0_4_ = (uint)bVar24 * auVar299._0_4_ | (uint)!bVar24 * auVar301._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar321._4_4_ = (uint)bVar24 * auVar299._4_4_ | (uint)!bVar24 * auVar301._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar321._8_4_ = (uint)bVar24 * auVar299._8_4_ | (uint)!bVar24 * auVar301._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar321._12_4_ = (uint)bVar24 * auVar299._12_4_ | (uint)!bVar24 * auVar301._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  auVar321._16_4_ = (uint)bVar24 * auVar299._16_4_ | (uint)!bVar24 * auVar301._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  auVar321._20_4_ = (uint)bVar24 * auVar299._20_4_ | (uint)!bVar24 * auVar301._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  auVar321._24_4_ = (uint)bVar24 * auVar299._24_4_ | (uint)!bVar24 * auVar301._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  auVar321._28_4_ = (uint)bVar24 * auVar299._28_4_ | (uint)!bVar24 * auVar301._28_4_
                  ;
                  bVar24 = (bool)(bVar32 & 1);
                  auVar321._32_4_ = (uint)bVar24 * auVar299._32_4_ | (uint)!bVar24 * auVar301._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  auVar321._36_4_ = (uint)bVar24 * auVar299._36_4_ | (uint)!bVar24 * auVar301._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  auVar321._40_4_ = (uint)bVar24 * auVar299._40_4_ | (uint)!bVar24 * auVar301._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  auVar321._44_4_ = (uint)bVar24 * auVar299._44_4_ | (uint)!bVar24 * auVar301._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  auVar321._48_4_ = (uint)bVar24 * auVar299._48_4_ | (uint)!bVar24 * auVar301._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  auVar321._52_4_ = (uint)bVar24 * auVar299._52_4_ | (uint)!bVar24 * auVar301._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  auVar321._56_4_ = (uint)bVar24 * auVar299._56_4_ | (uint)!bVar24 * auVar301._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  auVar321._60_4_ = (uint)bVar24 * auVar299._60_4_ | (uint)!bVar24 * auVar301._60_4_
                  ;
                  auVar299 = vfmadd231ps_avx512f(auVar302,auVar321,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar299 = vfmadd231ps_avx512f(auVar299,auVar309,auVar300);
                  auVar299 = vfmadd231ps_avx512f(auVar299,auVar321,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar299 = vmulps_avx512f(auVar299,auVar296);
                  auVar300 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar24 = (bool)((byte)uVar176 & 1);
                  auVar322._0_4_ = (uint)bVar24 * auVar300._0_4_ | (uint)!bVar24 * auVar299._0_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 1) & 1);
                  auVar322._4_4_ = (uint)bVar24 * auVar300._4_4_ | (uint)!bVar24 * auVar299._4_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 2) & 1);
                  auVar322._8_4_ = (uint)bVar24 * auVar300._8_4_ | (uint)!bVar24 * auVar299._8_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 3) & 1);
                  auVar322._12_4_ = (uint)bVar24 * auVar300._12_4_ | (uint)!bVar24 * auVar299._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 4) & 1);
                  auVar322._16_4_ = (uint)bVar24 * auVar300._16_4_ | (uint)!bVar24 * auVar299._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 5) & 1);
                  auVar322._20_4_ = (uint)bVar24 * auVar300._20_4_ | (uint)!bVar24 * auVar299._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 6) & 1);
                  auVar322._24_4_ = (uint)bVar24 * auVar300._24_4_ | (uint)!bVar24 * auVar299._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 7) & 1);
                  auVar322._28_4_ = (uint)bVar24 * auVar300._28_4_ | (uint)!bVar24 * auVar299._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 8) & 1);
                  auVar322._32_4_ = (uint)bVar24 * auVar300._32_4_ | (uint)!bVar24 * auVar299._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 9) & 1);
                  auVar322._36_4_ = (uint)bVar24 * auVar300._36_4_ | (uint)!bVar24 * auVar299._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 10) & 1);
                  auVar322._40_4_ = (uint)bVar24 * auVar300._40_4_ | (uint)!bVar24 * auVar299._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 0xb) & 1);
                  auVar322._44_4_ = (uint)bVar24 * auVar300._44_4_ | (uint)!bVar24 * auVar299._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 0xc) & 1);
                  auVar322._48_4_ = (uint)bVar24 * auVar300._48_4_ | (uint)!bVar24 * auVar299._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 0xd) & 1);
                  auVar322._52_4_ = (uint)bVar24 * auVar300._52_4_ | (uint)!bVar24 * auVar299._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar176 >> 0xe) & 1);
                  auVar322._56_4_ = (uint)bVar24 * auVar300._56_4_ | (uint)!bVar24 * auVar299._56_4_
                  ;
                  bVar24 = SUB81(uVar176 >> 0xf,0);
                  auVar322._60_4_ = (uint)bVar24 * auVar300._60_4_ | (uint)!bVar24 * auVar299._60_4_
                  ;
                  auVar299 = vminps_avx512f(auVar322,(undefined1  [64])afVar134);
                  auVar299 = vmaxps_avx512f(auVar299,(undefined1  [64])afVar135);
                  auVar300 = vfmadd213ps_avx512f((undefined1  [64])afVar136,auVar299,
                                                 (undefined1  [64])afVar142);
                  auVar301 = vrndscaleps_avx512f(auVar300,1);
                  uVar160 = vcmpps_avx512f(auVar300,auVar301,1);
                  auVar300 = vsubps_avx512f(auVar301,(undefined1  [64])afVar133);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  in_ZMM16._0_4_ = (uint)bVar24 * auVar300._0_4_ | (uint)!bVar24 * auVar301._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  in_ZMM16._4_4_ = (uint)bVar24 * auVar300._4_4_ | (uint)!bVar24 * auVar301._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  in_ZMM16._8_4_ = (uint)bVar24 * auVar300._8_4_ | (uint)!bVar24 * auVar301._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  in_ZMM16._12_4_ = (uint)bVar24 * auVar300._12_4_ | (uint)!bVar24 * auVar301._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                  in_ZMM16._16_4_ = (uint)bVar24 * auVar300._16_4_ | (uint)!bVar24 * auVar301._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                  in_ZMM16._20_4_ = (uint)bVar24 * auVar300._20_4_ | (uint)!bVar24 * auVar301._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                  in_ZMM16._24_4_ = (uint)bVar24 * auVar300._24_4_ | (uint)!bVar24 * auVar301._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 7) & 1);
                  in_ZMM16._28_4_ = (uint)bVar24 * auVar300._28_4_ | (uint)!bVar24 * auVar301._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 8) & 1);
                  in_ZMM16._32_4_ = (uint)bVar24 * auVar300._32_4_ | (uint)!bVar24 * auVar301._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 9) & 1);
                  in_ZMM16._36_4_ = (uint)bVar24 * auVar300._36_4_ | (uint)!bVar24 * auVar301._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 10) & 1);
                  in_ZMM16._40_4_ = (uint)bVar24 * auVar300._40_4_ | (uint)!bVar24 * auVar301._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xb) & 1);
                  in_ZMM16._44_4_ = (uint)bVar24 * auVar300._44_4_ | (uint)!bVar24 * auVar301._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xc) & 1);
                  in_ZMM16._48_4_ = (uint)bVar24 * auVar300._48_4_ | (uint)!bVar24 * auVar301._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xd) & 1);
                  in_ZMM16._52_4_ = (uint)bVar24 * auVar300._52_4_ | (uint)!bVar24 * auVar301._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar160 >> 0xe) & 1);
                  in_ZMM16._56_4_ = (uint)bVar24 * auVar300._56_4_ | (uint)!bVar24 * auVar301._56_4_
                  ;
                  bVar24 = SUB81(uVar160 >> 0xf,0);
                  in_ZMM16._60_4_ = (uint)bVar24 * auVar300._60_4_ | (uint)!bVar24 * auVar301._60_4_
                  ;
                  auVar299 = vfmadd231ps_avx512f(auVar299,in_ZMM16,auVar293);
                  auVar299 = vfmadd231ps_avx512f(auVar299,in_ZMM16,in_ZMM9);
                  auVar300 = vmulps_avx512f(auVar299,auVar299);
                  auVar301 = vfmadd213ps_avx512f(auVar299,(undefined1  [64])afVar137,
                                                 (undefined1  [64])afVar138);
                  auVar301 = vfmadd213ps_avx512f(auVar301,auVar299,(undefined1  [64])afVar139);
                  auVar301 = vfmadd213ps_avx512f(auVar301,auVar299,(undefined1  [64])afVar140);
                  auVar301 = vfmadd213ps_avx512f(auVar301,auVar299,(undefined1  [64])afVar141);
                  auVar301 = vfmadd213ps_avx512f(auVar301,auVar299,(undefined1  [64])afVar142);
                  in_ZMM17 = vfmadd213ps_avx512f(auVar301,auVar300,auVar299);
                  auVar299 = vaddps_avx512f(in_ZMM17,(undefined1  [64])afVar133);
                  auVar300 = vcvttps2dq_avx512f(in_ZMM16);
                  auVar300 = vpaddd_avx512f(auVar300,auVar294);
                  auVar300 = vpslld_avx512f(auVar300,0x17);
                  auVar299 = vfmadd213ps_avx512f(auVar300,auVar299,auVar295);
                  auVar300 = vrcp14ps_avx512f(auVar299);
                  auVar299 = vfmsub213ps_avx512f(auVar299,auVar300,auVar295);
                  auVar299 = vfnmadd132ps_avx512vl(auVar299,auVar300,auVar300);
                  auVar299 = vfnmsub213ps_avx512f(auVar299,auVar296,auVar295);
                  auVar298 = vmulps_avx512f(auVar299,auVar298);
                  break;
                case 6:
                  auVar299 = vbroadcastss_avx512f
                                       (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var161)));
                  uVar1 = (*(uint **)(&this->field_0x118 + (long)p_Var161))[1];
                  auVar129._4_4_ = uVar1;
                  auVar129._0_4_ = uVar1;
                  auVar129._8_4_ = uVar1;
                  auVar129._12_4_ = uVar1;
                  auVar129._16_4_ = uVar1;
                  auVar129._20_4_ = uVar1;
                  auVar129._24_4_ = uVar1;
                  auVar129._28_4_ = uVar1;
                  auVar129._32_4_ = uVar1;
                  auVar129._36_4_ = uVar1;
                  auVar129._40_4_ = uVar1;
                  auVar129._44_4_ = uVar1;
                  auVar129._48_4_ = uVar1;
                  auVar129._52_4_ = uVar1;
                  auVar129._56_4_ = uVar1;
                  auVar129._60_4_ = uVar1;
                  auVar299 = vfmadd213ps_avx512f(auVar299,auVar298,auVar129);
                  auVar299 = vmaxps_avx512f(auVar299,auVar297);
                  auVar299 = vminps_avx512f(auVar299,auVar295);
                  auVar298 = vmulps_avx512f(auVar299,auVar298);
                }
                *(undefined1 (*) [64])ppp_Var170 = auVar298;
                ppp_Var170 = ppp_Var170 + 8;
                uVar166 = uVar166 + 1;
                iVar151 = iVar151 + 1;
              } while (uVar166 != local_158.w);
            }
            iVar180 = iVar180 + 1;
          } while (iVar180 != local_158.h);
        }
        local_228 = local_228 + 1;
      } while (local_228 != local_158.c);
    }
    if ((uVar10 == 0x10) && (uVar162 == 1)) {
      lVar175 = (long)local_158.c;
      if (0 < lVar175) {
        local_e8._0_8_ = pp_Var168[-3];
        iVar9 = *(int *)(&this->field_0xdc + local_e8._0_8_);
        local_108._0_4_ = *(undefined4 *)(&this->field_0xe0 + local_e8._0_8_);
        iVar182 = *(int *)(&this->field_0xe4 + local_e8._0_8_);
        local_f0 = (_func_int *)(ulong)*(uint *)(&this->field_0xe8 + local_e8._0_8_);
        uVar13 = *(undefined4 *)(&this->field_0x114 + local_e8._0_8_);
        lVar167 = *(long *)(&this->field_0x1a8 + local_e8._0_8_);
        uVar10 = *(uint *)(&this->field_0xd4 + local_e8._0_8_);
        uVar162 = *(uint *)(&this->field_0xd8 + local_e8._0_8_);
        lVar159 = local_158.elemsize * local_158.cstep;
        iVar11 = bottom_blob->w;
        local_10c = (1 - uVar10) * iVar9;
        iVar158 = bottom_blob->h;
        uVar12 = bottom_blob->c;
        local_98._0_4_ = local_158.h;
        local_1d0 = 0;
        do {
          if (0 < (int)local_98._0_4_) {
            sVar16 = (this->weight_data_tm).cstep;
            sVar17 = (this->weight_data_tm).elemsize;
            local_1c8 = (_func_int ***)((long)(_func_int ***)pvVar179 + lVar159 * local_1d0);
            pvVar178 = (this->weight_data_tm).data;
            iVar181 = 0;
            do {
              if (0 < iVar8) {
                iVar174 = bottom_blob->w;
                pvVar15 = bottom_blob->data;
                sVar18 = bottom_blob->elemsize;
                sVar19 = bottom_blob->cstep;
                pfVar20 = *(float **)(&this->field_0x118 + local_e8._0_8_);
                uVar163 = 0;
                local_214 = local_10c;
                do {
                  if (lVar167 == 0) {
                    fVar362 = 0.0;
                  }
                  else {
                    fVar362 = *(float *)(lVar167 + local_1d0 * 4);
                  }
                  if ((int)uVar12 < 1) {
                    auVar292 = ZEXT864(0);
                  }
                  else {
                    auVar292 = ZEXT864(0);
                    uVar160 = 0;
                    pvVar173 = (void *)(sVar16 * local_1d0 * sVar17 + (long)pvVar178);
                    do {
                      if (0 < (int)uVar162) {
                        uVar177 = 0;
                        uVar176 = 0;
                        do {
                          iVar155 = (((int)uVar176 - uVar162) + 1) * local_108._0_4_ + iVar181;
                          if (-1 < iVar155) {
                            if (((iVar155 % (int)local_f0 == 0) && (0 < (int)uVar10)) &&
                               (iVar155 / (int)local_f0 < iVar158)) {
                              uVar171 = (ulong)uVar10;
                              uVar172 = uVar177;
                              iVar180 = local_214;
                              do {
                                if (((-1 < iVar180) &&
                                    (iVar151 = iVar180 / iVar182, iVar180 % iVar182 == 0)) &&
                                   (iVar151 < iVar11)) {
                                  auVar292 = vfmadd231ps_avx512f(auVar292,*(undefined1 (*) [64])
                                                                           ((long)pvVar15 +
                                                                           (long)(iVar151 << 4) * 4
                                                                           + (long)(iVar155 /
                                                                                   (int)local_f0) *
                                                                             (long)iVar174 * sVar18
                                                                             + sVar19 * sVar18 *
                                                                               uVar160),
                                                                 *(undefined1 (*) [64])
                                                                  ((long)pvVar173 +
                                                                  (uVar172 & 0xffffffff) * 4));
                                }
                                uVar172 = uVar172 + 0x10;
                                iVar180 = iVar180 + iVar9;
                                uVar171 = uVar171 - 1;
                              } while (uVar171 != 0);
                            }
                          }
                          uVar176 = uVar176 + 1;
                          uVar177 = uVar177 + (ulong)uVar10 * 0x10;
                        } while (uVar176 != uVar162);
                      }
                      pvVar173 = (void *)((long)pvVar173 + (long)(int)(uVar10 * uVar162 * 0x10) * 4)
                      ;
                      uVar160 = uVar160 + 1;
                    } while (uVar160 != uVar12);
                  }
                  auVar240 = vextractf64x4_avx512f(auVar292,1);
                  fVar377 = auVar292._4_4_ + auVar240._4_4_;
                  auVar187._0_4_ =
                       auVar292._0_4_ + auVar240._0_4_ + auVar292._16_4_ + auVar240._16_4_;
                  auVar187._4_4_ = fVar377 + fVar377;
                  auVar187._8_4_ =
                       auVar292._8_4_ + auVar240._8_4_ + auVar292._24_4_ + auVar240._24_4_;
                  auVar187._12_4_ =
                       auVar292._12_4_ + auVar240._12_4_ + auVar292._28_4_ + auVar240._28_4_;
                  auVar186 = vshufpd_avx(auVar187,auVar187,1);
                  auVar188._0_4_ = auVar186._0_4_ + auVar187._0_4_;
                  auVar188._4_4_ = auVar186._4_4_ + auVar187._4_4_;
                  auVar188._8_4_ = auVar186._8_4_ + auVar187._8_4_;
                  auVar188._12_4_ = auVar186._12_4_ + auVar187._12_4_;
                  auVar186 = vmovshdup_avx(auVar188);
                  fVar362 = auVar186._0_4_ + fVar362 + auVar188._0_4_;
                  auVar186 = ZEXT416((uint)fVar362);
                  fVar377 = fVar362;
                  switch(uVar13) {
                  case 1:
                    auVar186 = vmaxss_avx(auVar186,ZEXT416(0));
                    fVar377 = auVar186._0_4_;
                    break;
                  case 2:
                    uVar165 = vcmpss_avx512f(auVar186,ZEXT416(0),0xe);
                    bVar24 = (bool)((byte)uVar165 & 1);
                    fVar377 = (float)((uint)bVar24 * 0x3f800000 + (uint)!bVar24 * (int)*pfVar20) *
                              fVar362;
                    break;
                  case 3:
                    auVar186 = vmaxss_avx(auVar186,ZEXT416((uint)*pfVar20));
                    fVar377 = auVar186._0_4_;
                    if (pfVar20[1] < auVar186._0_4_) {
                      fVar377 = pfVar20[1];
                    }
                    break;
                  case 4:
                    auVar186 = vminss_avx(auVar186,SUB6416(ZEXT464(0x42b0c0a5),0));
                    auVar50._8_4_ = 0x80000000;
                    auVar50._0_8_ = 0x8000000080000000;
                    auVar50._12_4_ = 0x80000000;
                    auVar187 = vxorps_avx512vl(auVar186,auVar50);
                    uVar165 = vcmpss_avx512f(auVar186,ZEXT416(0xc2b0c0a5),1);
                    bVar24 = (bool)((byte)uVar165 & 1);
                    fVar362 = expf((float)((uint)bVar24 * 0x42b0c0a5 +
                                          (uint)!bVar24 * auVar187._0_4_));
                    fVar377 = 1.0 / (fVar362 + 1.0);
                    break;
                  case 5:
                    fVar377 = expf(fVar362);
                    fVar377 = logf(fVar377 + 1.0);
                    fVar377 = tanhf(fVar377);
                    fVar377 = fVar377 * fVar362;
                    break;
                  case 6:
                    fVar3 = *pfVar20;
                    auVar209._8_4_ = 0x80000000;
                    auVar209._0_8_ = 0x8000000080000000;
                    auVar209._12_4_ = 0x80000000;
                    auVar187 = vxorps_avx512vl(ZEXT416((uint)pfVar20[1]),auVar209);
                    fVar384 = auVar187._0_4_ / fVar3;
                    fVar377 = 0.0;
                    if ((fVar384 <= fVar362) &&
                       (fVar377 = fVar362, fVar362 <= fVar384 + 1.0 / fVar3)) {
                      auVar186 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar186,
                                                 ZEXT416((uint)pfVar20[1]));
                      fVar377 = auVar186._0_4_ * fVar362;
                    }
                  }
                  *(float *)local_1c8 = fVar377;
                  local_1c8 = (_func_int ***)((long)local_1c8 + 4);
                  uVar163 = uVar163 + 1;
                  local_214 = local_214 + 1;
                } while (uVar163 != iVar8);
              }
              iVar181 = iVar181 + 1;
            } while (iVar181 != local_98._0_4_);
          }
          local_1d0 = local_1d0 + 1;
        } while (local_1d0 != lVar175);
      }
      goto LAB_002a2e50;
    }
    local_a8._0_4_ = uVar162 ^ 8;
    if ((uVar10 == 8 && uVar162 == 8) && (0 < (long)local_158.c)) {
      local_e8._0_8_ = pp_Var168[-3];
      iVar182 = *(int *)(&this->field_0xdc + local_e8._0_8_);
      iVar11 = *(int *)(&this->field_0xe0 + local_e8._0_8_);
      iVar158 = *(int *)(&this->field_0xe4 + local_e8._0_8_);
      iVar181 = *(int *)(&this->field_0xe8 + local_e8._0_8_);
      iVar174 = *(int *)(&this->field_0x114 + local_e8._0_8_);
      lVar175 = *(long *)(&this->field_0x1a8 + local_e8._0_8_);
      uVar12 = *(uint *)(&this->field_0xd4 + local_e8._0_8_);
      uVar163 = *(uint *)(&this->field_0xd8 + local_e8._0_8_);
      local_228 = 0;
      auVar381._8_4_ = 0x42b0c0a5;
      auVar381._0_8_ = 0x42b0c0a542b0c0a5;
      auVar381._12_4_ = 0x42b0c0a5;
      auVar381._16_4_ = 0x42b0c0a5;
      auVar381._20_4_ = 0x42b0c0a5;
      auVar381._24_4_ = 0x42b0c0a5;
      auVar381._28_4_ = 0x42b0c0a5;
      auVar388._8_4_ = 0xc2b0c0a5;
      auVar388._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar388._12_4_ = 0xc2b0c0a5;
      auVar388._16_4_ = 0xc2b0c0a5;
      auVar388._20_4_ = 0xc2b0c0a5;
      auVar388._24_4_ = 0xc2b0c0a5;
      auVar388._28_4_ = 0xc2b0c0a5;
      auVar394._8_4_ = 0x3f000000;
      auVar394._0_8_ = 0x3f0000003f000000;
      auVar394._12_4_ = 0x3f000000;
      auVar394._16_4_ = 0x3f000000;
      auVar394._20_4_ = 0x3f000000;
      auVar394._24_4_ = 0x3f000000;
      auVar394._28_4_ = 0x3f000000;
      auVar400._8_4_ = 0x3fb8aa3b;
      auVar400._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar400._12_4_ = 0x3fb8aa3b;
      auVar400._16_4_ = 0x3fb8aa3b;
      auVar400._20_4_ = 0x3fb8aa3b;
      auVar400._24_4_ = 0x3fb8aa3b;
      auVar400._28_4_ = 0x3fb8aa3b;
      auVar406._8_4_ = 0x3f800000;
      auVar406._0_8_ = 0x3f8000003f800000;
      auVar406._12_4_ = 0x3f800000;
      auVar406._16_4_ = 0x3f800000;
      auVar406._20_4_ = 0x3f800000;
      auVar406._24_4_ = 0x3f800000;
      auVar406._28_4_ = 0x3f800000;
      auVar412._8_4_ = 0x3f318000;
      auVar412._0_8_ = 0x3f3180003f318000;
      auVar412._12_4_ = 0x3f318000;
      auVar412._16_4_ = 0x3f318000;
      auVar412._20_4_ = 0x3f318000;
      auVar412._24_4_ = 0x3f318000;
      auVar412._28_4_ = 0x3f318000;
      auVar240 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar471._8_4_ = 0x3ab743ce;
      auVar471._0_8_ = 0x3ab743ce3ab743ce;
      auVar471._12_4_ = 0x3ab743ce;
      auVar471._16_4_ = 0x3ab743ce;
      auVar471._20_4_ = 0x3ab743ce;
      auVar471._24_4_ = 0x3ab743ce;
      auVar471._28_4_ = 0x3ab743ce;
      auVar477._8_4_ = 0x3c088908;
      auVar477._0_8_ = 0x3c0889083c088908;
      auVar477._12_4_ = 0x3c088908;
      auVar477._16_4_ = 0x3c088908;
      auVar477._20_4_ = 0x3c088908;
      auVar477._24_4_ = 0x3c088908;
      auVar477._28_4_ = 0x3c088908;
      auVar483._8_4_ = 0x3d2aa9c1;
      auVar483._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar483._12_4_ = 0x3d2aa9c1;
      auVar483._16_4_ = 0x3d2aa9c1;
      auVar483._20_4_ = 0x3d2aa9c1;
      auVar483._24_4_ = 0x3d2aa9c1;
      auVar483._28_4_ = 0x3d2aa9c1;
      auVar489._8_4_ = 0x3e2aaaaa;
      auVar489._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar489._12_4_ = 0x3e2aaaaa;
      auVar489._16_4_ = 0x3e2aaaaa;
      auVar489._20_4_ = 0x3e2aaaaa;
      auVar489._24_4_ = 0x3e2aaaaa;
      auVar489._28_4_ = 0x3e2aaaaa;
      auVar495._8_4_ = 0x3f800000;
      auVar495._0_8_ = 0x3f8000003f800000;
      auVar495._12_4_ = 0x3f800000;
      auVar495._16_4_ = 0x3f800000;
      auVar495._20_4_ = 0x3f800000;
      auVar495._24_4_ = 0x3f800000;
      auVar495._28_4_ = 0x3f800000;
      auVar501._8_4_ = 0xb95e8083;
      auVar501._0_8_ = 0xb95e8083b95e8083;
      auVar501._12_4_ = 0xb95e8083;
      auVar501._16_4_ = 0xb95e8083;
      auVar501._20_4_ = 0xb95e8083;
      auVar501._24_4_ = 0xb95e8083;
      auVar501._28_4_ = 0xb95e8083;
      auVar241 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar262 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar263 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar264 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar265 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar266 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar267 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar268 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar269 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      do {
        if (0 < local_158.h) {
          iVar155 = bottom_blob->w;
          iVar180 = bottom_blob->h;
          ppp_Var170 = (_func_int ***)
                       ((long)(_func_int ***)local_158.data +
                       local_158.cstep * local_228 * local_158.elemsize);
          uVar164 = bottom_blob->c;
          local_98._0_8_ = local_228 * 0x20;
          iVar151 = 0;
          do {
            if (0 < local_158.w) {
              uVar166 = 0;
              iVar152 = (1 - uVar12) * iVar182;
              do {
                if (lVar175 == 0) {
                  auVar292 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar292 = ZEXT3264(*(undefined1 (*) [32])(lVar175 + local_228 * 0x20));
                }
                if (0 < (int)uVar164) {
                  pvVar179 = (void *)((this->weight_data_tm).cstep * local_228 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar178 = bottom_blob->data;
                  uVar160 = 0;
                  do {
                    if (0 < (int)uVar163) {
                      uVar177 = 0;
                      uVar176 = 0;
                      do {
                        iVar153 = (((int)uVar176 - uVar163) + 1) * iVar11 + iVar151;
                        if ((((-1 < iVar153) &&
                             (iVar154 = iVar153 / iVar181, iVar153 % iVar181 == 0)) &&
                            (0 < (int)uVar12)) && (iVar154 < iVar180)) {
                          lVar167 = (long)iVar154 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar160;
                          uVar171 = uVar177;
                          uVar172 = (ulong)uVar12;
                          iVar153 = iVar152;
                          do {
                            if (((-1 < iVar153) &&
                                (iVar154 = iVar153 / iVar158, iVar153 % iVar158 == 0)) &&
                               (iVar154 < iVar155)) {
                              lVar159 = (long)(iVar154 << 3);
                              uVar13 = *(undefined4 *)((long)pvVar178 + lVar159 * 4 + lVar167);
                              auVar432._4_4_ = uVar13;
                              auVar432._0_4_ = uVar13;
                              auVar432._8_4_ = uVar13;
                              auVar432._12_4_ = uVar13;
                              auVar432._16_4_ = uVar13;
                              auVar432._20_4_ = uVar13;
                              auVar432._24_4_ = uVar13;
                              auVar432._28_4_ = uVar13;
                              uVar13 = *(undefined4 *)((long)pvVar178 + lVar159 * 4 + lVar167 + 4);
                              auVar459._4_4_ = uVar13;
                              auVar459._0_4_ = uVar13;
                              auVar459._8_4_ = uVar13;
                              auVar459._12_4_ = uVar13;
                              auVar459._16_4_ = uVar13;
                              auVar459._20_4_ = uVar13;
                              auVar459._24_4_ = uVar13;
                              auVar459._28_4_ = uVar13;
                              in_ZMM9 = ZEXT3264(auVar459);
                              auVar270 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar178 +
                                                                     lVar159 * 4 + lVar167 + 8)));
                              in_ZMM16 = ZEXT3264(auVar270);
                              auVar271 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar178 +
                                                                     lVar159 * 4 + lVar167 + 0xc)));
                              in_ZMM17 = ZEXT3264(auVar271);
                              auVar272 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar178 +
                                                                     lVar159 * 4 + lVar167 + 0x10)))
                              ;
                              auVar273 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar178 +
                                                                     lVar159 * 4 + lVar167 + 0x14)))
                              ;
                              auVar242 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar178 +
                                                                     lVar159 * 4 + lVar167 + 0x18)))
                              ;
                              auVar243 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar178 +
                                                                     lVar159 * 4 + lVar167 + 0x1c)))
                              ;
                              uVar184 = uVar171 & 0xffffffff;
                              auVar186 = vfmadd231ps_fma(auVar292._0_32_,auVar432,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar179 + uVar184 * 4));
                              auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar459,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar179 + uVar184 * 4 + 0x20));
                              auVar270 = vfmadd231ps_avx512vl
                                                   (ZEXT1632(auVar186),auVar270,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar179 + uVar184 * 4 + 0x40));
                              auVar270 = vfmadd231ps_avx512vl
                                                   (auVar270,auVar271,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar179 + uVar184 * 4 + 0x60));
                              auVar270 = vfmadd231ps_avx512vl
                                                   (auVar270,auVar272,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar179 + uVar184 * 4 + 0x80));
                              auVar270 = vfmadd231ps_avx512vl
                                                   (auVar270,auVar273,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar179 + uVar184 * 4 + 0xa0));
                              auVar270 = vfmadd231ps_avx512vl
                                                   (auVar270,auVar242,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar179 + uVar184 * 4 + 0xc0));
                              auVar270 = vfmadd231ps_avx512vl
                                                   (auVar270,auVar243,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar179 + uVar184 * 4 + 0xe0));
                              auVar292 = ZEXT3264(auVar270);
                            }
                            uVar171 = uVar171 + 0x40;
                            iVar153 = iVar153 + iVar182;
                            uVar172 = uVar172 - 1;
                          } while (uVar172 != 0);
                        }
                        uVar176 = uVar176 + 1;
                        uVar177 = uVar177 + (ulong)uVar12 * 0x40;
                      } while (uVar176 != uVar163);
                    }
                    pvVar179 = (void *)((long)pvVar179 + (long)(int)(uVar12 * uVar163 * 0x40) * 4);
                    uVar160 = uVar160 + 1;
                  } while (uVar160 != uVar164);
                }
                auVar270 = auVar292._0_32_;
                if (iVar174 - 1U < 6) {
                  auVar271 = ZEXT1632(ZEXT816(0) << 0x40);
                  auVar371._28_36_ = auVar292._28_36_;
                  switch(iVar174) {
                  case 1:
                    auVar270 = vmaxps_avx(auVar270,ZEXT1632(ZEXT816(0) << 0x40));
                    break;
                  case 2:
                    auVar272 = vmaxps_avx(auVar270,auVar271);
                    auVar270 = vminps_avx(auVar270,auVar271);
                    uVar13 = **(undefined4 **)(&this->field_0x118 + local_e8._0_8_);
                    auVar103._4_4_ = uVar13;
                    auVar103._0_4_ = uVar13;
                    auVar103._8_4_ = uVar13;
                    auVar103._12_4_ = uVar13;
                    auVar103._16_4_ = uVar13;
                    auVar103._20_4_ = uVar13;
                    auVar103._24_4_ = uVar13;
                    auVar103._28_4_ = uVar13;
                    auVar270 = vfmadd132ps_avx512vl(auVar270,auVar272,auVar103);
                    break;
                  case 3:
                    uVar13 = **(undefined4 **)(&this->field_0x118 + local_e8._0_8_);
                    auVar101._4_4_ = uVar13;
                    auVar101._0_4_ = uVar13;
                    auVar101._8_4_ = uVar13;
                    auVar101._12_4_ = uVar13;
                    auVar101._16_4_ = uVar13;
                    auVar101._20_4_ = uVar13;
                    auVar101._24_4_ = uVar13;
                    auVar101._28_4_ = uVar13;
                    auVar270 = vmaxps_avx512vl(auVar270,auVar101);
                    uVar13 = (*(undefined4 **)(&this->field_0x118 + local_e8._0_8_))[1];
                    auVar102._4_4_ = uVar13;
                    auVar102._0_4_ = uVar13;
                    auVar102._8_4_ = uVar13;
                    auVar102._12_4_ = uVar13;
                    auVar102._16_4_ = uVar13;
                    auVar102._20_4_ = uVar13;
                    auVar102._24_4_ = uVar13;
                    auVar102._28_4_ = uVar13;
                    auVar270 = vminps_avx512vl(auVar270,auVar102);
                    break;
                  case 4:
                    auVar99._8_4_ = 0x80000000;
                    auVar99._0_8_ = 0x8000000080000000;
                    auVar99._12_4_ = 0x80000000;
                    auVar99._16_4_ = 0x80000000;
                    auVar99._20_4_ = 0x80000000;
                    auVar99._24_4_ = 0x80000000;
                    auVar99._28_4_ = 0x80000000;
                    auVar270 = vxorps_avx512vl(auVar270,auVar99);
                    auVar270 = vminps_avx(auVar270,auVar381);
                    auVar270 = vmaxps_avx(auVar270,auVar388);
                    auVar186 = vfmadd231ps_fma(auVar394,auVar270,auVar400);
                    auVar271 = vrndscaleps_avx512vl(ZEXT1632(auVar186),1);
                    uVar160 = vcmpps_avx512vl(ZEXT1632(auVar186),auVar271,1);
                    auVar272 = vsubps_avx512vl(auVar271,auVar406);
                    bVar24 = (bool)((byte)uVar160 & 1);
                    auVar279._0_4_ = (uint)bVar24 * auVar272._0_4_ | (uint)!bVar24 * auVar271._0_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                    auVar279._4_4_ = (uint)bVar24 * auVar272._4_4_ | (uint)!bVar24 * auVar271._4_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                    auVar279._8_4_ = (uint)bVar24 * auVar272._8_4_ | (uint)!bVar24 * auVar271._8_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                    auVar279._12_4_ =
                         (uint)bVar24 * auVar272._12_4_ | (uint)!bVar24 * auVar271._12_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                    auVar279._16_4_ =
                         (uint)bVar24 * auVar272._16_4_ | (uint)!bVar24 * auVar271._16_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                    auVar279._20_4_ =
                         (uint)bVar24 * auVar272._20_4_ | (uint)!bVar24 * auVar271._20_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                    auVar279._24_4_ =
                         (uint)bVar24 * auVar272._24_4_ | (uint)!bVar24 * auVar271._24_4_;
                    bVar24 = SUB81(uVar160 >> 7,0);
                    auVar279._28_4_ =
                         (uint)bVar24 * auVar272._28_4_ | (uint)!bVar24 * auVar271._28_4_;
                    in_ZMM16 = ZEXT3264(auVar279);
                    auVar270 = vfmsub231ps_avx512vl(auVar270,auVar279,auVar412);
                    auVar100._8_4_ = 0x395e8083;
                    auVar100._0_8_ = 0x395e8083395e8083;
                    auVar100._12_4_ = 0x395e8083;
                    auVar100._16_4_ = 0x395e8083;
                    auVar100._20_4_ = 0x395e8083;
                    auVar100._24_4_ = 0x395e8083;
                    auVar100._28_4_ = 0x395e8083;
                    auVar270 = vfmsub231ps_avx512vl(auVar270,auVar279,auVar100);
                    auVar433._0_4_ = auVar270._0_4_ * auVar270._0_4_;
                    auVar433._4_4_ = auVar270._4_4_ * auVar270._4_4_;
                    auVar433._8_4_ = auVar270._8_4_ * auVar270._8_4_;
                    auVar433._12_4_ = auVar270._12_4_ * auVar270._12_4_;
                    auVar433._16_4_ = auVar270._16_4_ * auVar270._16_4_;
                    auVar433._20_4_ = auVar270._20_4_ * auVar270._20_4_;
                    auVar433._24_4_ = auVar270._24_4_ * auVar270._24_4_;
                    auVar433._28_4_ = 0;
                    auVar186 = vfmadd213ps_fma(auVar240,auVar270,auVar471);
                    auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),auVar270,auVar477);
                    auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),auVar270,auVar483);
                    auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),auVar270,auVar489);
                    auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),auVar270,auVar394);
                    auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),auVar433,auVar270);
                    in_ZMM9 = ZEXT1664(auVar186);
                    auVar434._0_4_ = auVar186._0_4_ + 1.0;
                    auVar434._4_4_ = auVar186._4_4_ + 1.0;
                    auVar434._8_4_ = auVar186._8_4_ + 1.0;
                    auVar434._12_4_ = auVar186._12_4_ + 1.0;
                    auVar434._16_4_ = 0x3f800000;
                    auVar434._20_4_ = 0x3f800000;
                    auVar434._24_4_ = 0x3f800000;
                    auVar434._28_4_ = 0x3f800000;
                    auVar270 = vcvttps2dq_avx512vl(auVar279);
                    auVar270 = vpslld_avx2(auVar270,0x17);
                    auVar270 = vpaddd_avx2(auVar495,auVar270);
                    auVar186 = vfmadd213ps_fma(auVar270,auVar434,auVar406);
                    auVar270 = vrcpps_avx(ZEXT1632(auVar186));
                    auVar186 = vfmsub213ps_fma(ZEXT1632(auVar186),auVar270,auVar406);
                    auVar186 = vfnmadd132ps_fma(ZEXT1632(auVar186),auVar270,auVar270);
                    auVar270 = ZEXT1632(auVar186);
                    break;
                  case 5:
                    auVar270 = vminps_avx(auVar270,auVar381);
                    auVar270 = vmaxps_avx(auVar270,auVar388);
                    auVar186 = vfmadd213ps_fma(auVar400,auVar270,auVar394);
                    auVar272 = vrndscaleps_avx512vl(ZEXT1632(auVar186),1);
                    uVar160 = vcmpps_avx512vl(ZEXT1632(auVar186),auVar272,1);
                    auVar273 = vsubps_avx512vl(auVar272,auVar406);
                    bVar24 = (bool)((byte)uVar160 & 1);
                    auVar274._0_4_ = (uint)bVar24 * auVar273._0_4_ | (uint)!bVar24 * auVar272._0_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                    auVar274._4_4_ = (uint)bVar24 * auVar273._4_4_ | (uint)!bVar24 * auVar272._4_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                    auVar274._8_4_ = (uint)bVar24 * auVar273._8_4_ | (uint)!bVar24 * auVar272._8_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                    auVar274._12_4_ =
                         (uint)bVar24 * auVar273._12_4_ | (uint)!bVar24 * auVar272._12_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                    auVar274._16_4_ =
                         (uint)bVar24 * auVar273._16_4_ | (uint)!bVar24 * auVar272._16_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                    auVar274._20_4_ =
                         (uint)bVar24 * auVar273._20_4_ | (uint)!bVar24 * auVar272._20_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                    auVar274._24_4_ =
                         (uint)bVar24 * auVar273._24_4_ | (uint)!bVar24 * auVar272._24_4_;
                    bVar24 = SUB81(uVar160 >> 7,0);
                    auVar274._28_4_ =
                         (uint)bVar24 * auVar273._28_4_ | (uint)!bVar24 * auVar272._28_4_;
                    auVar270 = vfmsub231ps_avx512vl(auVar270,auVar274,auVar412);
                    auVar270 = vfnmsub231ps_avx512vl(auVar270,auVar274,auVar501);
                    auVar460._0_4_ = auVar270._0_4_ * auVar270._0_4_;
                    auVar460._4_4_ = auVar270._4_4_ * auVar270._4_4_;
                    auVar460._8_4_ = auVar270._8_4_ * auVar270._8_4_;
                    auVar460._12_4_ = auVar270._12_4_ * auVar270._12_4_;
                    auVar460._16_4_ = auVar270._16_4_ * auVar270._16_4_;
                    auVar460._20_4_ = auVar270._20_4_ * auVar270._20_4_;
                    auVar460._24_4_ = auVar270._24_4_ * auVar270._24_4_;
                    auVar460._28_4_ = 0;
                    auVar272 = vfmadd213ps_avx512vl(auVar240,auVar270,auVar471);
                    auVar272 = vfmadd213ps_avx512vl(auVar272,auVar270,auVar477);
                    auVar272 = vfmadd213ps_avx512vl(auVar272,auVar270,auVar483);
                    auVar272 = vfmadd213ps_avx512vl(auVar272,auVar270,auVar489);
                    auVar272 = vfmadd213ps_avx512vl(auVar272,auVar270,auVar394);
                    auVar270 = vfmadd213ps_avx512vl(auVar272,auVar460,auVar270);
                    auVar272 = vaddps_avx512vl(auVar270,auVar406);
                    auVar270 = vcvttps2dq_avx512vl(auVar274);
                    auVar270 = vpslld_avx2(auVar270,0x17);
                    auVar270 = vpaddd_avx2(auVar270,auVar495);
                    auVar186 = vfmadd213ps_fma(auVar270,auVar272,auVar406);
                    uVar160 = vcmpps_avx512vl(ZEXT1632(auVar186),auVar271,2);
                    auVar93._8_4_ = 0x800000;
                    auVar93._0_8_ = 0x80000000800000;
                    auVar93._12_4_ = 0x800000;
                    auVar93._16_4_ = 0x800000;
                    auVar93._20_4_ = 0x800000;
                    auVar93._24_4_ = 0x800000;
                    auVar93._28_4_ = 0x800000;
                    auVar270 = vmaxps_avx512vl(ZEXT1632(auVar186),auVar93);
                    auVar273 = vpsrld_avx2(auVar270,0x17);
                    auVar271 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar94._8_4_ = 0x3f000000;
                    auVar94._0_8_ = 0x3f0000003f000000;
                    auVar94._12_4_ = 0x3f000000;
                    auVar94._16_4_ = 0x3f000000;
                    auVar94._20_4_ = 0x3f000000;
                    auVar94._24_4_ = 0x3f000000;
                    auVar94._28_4_ = 0x3f000000;
                    auVar270 = vpternlogd_avx512vl(auVar270,auVar271,auVar94,0xea);
                    auVar95._8_4_ = 0x3f3504f3;
                    auVar95._0_8_ = 0x3f3504f33f3504f3;
                    auVar95._12_4_ = 0x3f3504f3;
                    auVar95._16_4_ = 0x3f3504f3;
                    auVar95._20_4_ = 0x3f3504f3;
                    auVar95._24_4_ = 0x3f3504f3;
                    auVar95._28_4_ = 0x3f3504f3;
                    uVar176 = vcmpps_avx512vl(auVar270,auVar95,1);
                    auVar271 = vaddps_avx512vl(auVar270,auVar241);
                    auVar270 = vaddps_avx512vl(auVar271,auVar270);
                    bVar24 = (bool)((byte)uVar176 & 1);
                    auVar275._0_4_ = (uint)bVar24 * auVar270._0_4_ | (uint)!bVar24 * auVar271._0_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 1) & 1);
                    auVar275._4_4_ = (uint)bVar24 * auVar270._4_4_ | (uint)!bVar24 * auVar271._4_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 2) & 1);
                    auVar275._8_4_ = (uint)bVar24 * auVar270._8_4_ | (uint)!bVar24 * auVar271._8_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 3) & 1);
                    auVar275._12_4_ =
                         (uint)bVar24 * auVar270._12_4_ | (uint)!bVar24 * auVar271._12_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 4) & 1);
                    auVar275._16_4_ =
                         (uint)bVar24 * auVar270._16_4_ | (uint)!bVar24 * auVar271._16_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 5) & 1);
                    auVar275._20_4_ =
                         (uint)bVar24 * auVar270._20_4_ | (uint)!bVar24 * auVar271._20_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 6) & 1);
                    auVar275._24_4_ =
                         (uint)bVar24 * auVar270._24_4_ | (uint)!bVar24 * auVar271._24_4_;
                    bVar24 = SUB81(uVar176 >> 7,0);
                    auVar275._28_4_ =
                         (uint)bVar24 * auVar270._28_4_ | (uint)!bVar24 * auVar271._28_4_;
                    auVar271 = vmulps_avx512vl(auVar275,auVar275);
                    auVar96._8_4_ = 0xbdebd1b8;
                    auVar96._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar96._12_4_ = 0xbdebd1b8;
                    auVar96._16_4_ = 0xbdebd1b8;
                    auVar96._20_4_ = 0xbdebd1b8;
                    auVar96._24_4_ = 0xbdebd1b8;
                    auVar96._28_4_ = 0xbdebd1b8;
                    auVar270 = vfmadd213ps_avx512vl(auVar262,auVar275,auVar96);
                    auVar97._8_4_ = 0x3def251a;
                    auVar97._0_8_ = 0x3def251a3def251a;
                    auVar97._12_4_ = 0x3def251a;
                    auVar97._16_4_ = 0x3def251a;
                    auVar97._20_4_ = 0x3def251a;
                    auVar97._24_4_ = 0x3def251a;
                    auVar97._28_4_ = 0x3def251a;
                    auVar270 = vfmadd213ps_avx512vl(auVar270,auVar275,auVar97);
                    auVar270 = vfmadd213ps_avx512vl(auVar270,auVar275,auVar263);
                    auVar270 = vfmadd213ps_avx512vl(auVar270,auVar275,auVar264);
                    auVar270 = vfmadd213ps_avx512vl(auVar270,auVar275,auVar265);
                    auVar270 = vfmadd213ps_avx512vl(auVar270,auVar275,auVar266);
                    auVar270 = vfmadd213ps_avx512vl(auVar270,auVar275,auVar267);
                    auVar270 = vfmadd213ps_avx512vl(auVar270,auVar275,auVar268);
                    auVar272 = vmulps_avx512vl(auVar271,auVar275);
                    auVar272 = vmulps_avx512vl(auVar272,auVar270);
                    auVar98._8_4_ = 0xffffff82;
                    auVar98._0_8_ = 0xffffff82ffffff82;
                    auVar98._12_4_ = 0xffffff82;
                    auVar98._16_4_ = 0xffffff82;
                    auVar98._20_4_ = 0xffffff82;
                    auVar98._24_4_ = 0xffffff82;
                    auVar98._28_4_ = 0xffffff82;
                    auVar270 = vpaddd_avx512vl(auVar273,auVar98);
                    auVar270 = vcvtdq2ps_avx(auVar270);
                    auVar273 = vsubps_avx512vl(auVar270,auVar406);
                    bVar24 = (bool)((byte)uVar176 & 1);
                    auVar276._0_4_ = (uint)bVar24 * auVar273._0_4_ | (uint)!bVar24 * auVar270._0_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 1) & 1);
                    auVar276._4_4_ = (uint)bVar24 * auVar273._4_4_ | (uint)!bVar24 * auVar270._4_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 2) & 1);
                    auVar276._8_4_ = (uint)bVar24 * auVar273._8_4_ | (uint)!bVar24 * auVar270._8_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 3) & 1);
                    auVar276._12_4_ =
                         (uint)bVar24 * auVar273._12_4_ | (uint)!bVar24 * auVar270._12_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 4) & 1);
                    auVar276._16_4_ =
                         (uint)bVar24 * auVar273._16_4_ | (uint)!bVar24 * auVar270._16_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 5) & 1);
                    auVar276._20_4_ =
                         (uint)bVar24 * auVar273._20_4_ | (uint)!bVar24 * auVar270._20_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 6) & 1);
                    auVar276._24_4_ =
                         (uint)bVar24 * auVar273._24_4_ | (uint)!bVar24 * auVar270._24_4_;
                    bVar24 = SUB81(uVar176 >> 7,0);
                    auVar276._28_4_ =
                         (uint)bVar24 * auVar273._28_4_ | (uint)!bVar24 * auVar270._28_4_;
                    auVar270 = vfmadd231ps_avx512vl(auVar272,auVar276,auVar501);
                    auVar270 = vfmsub231ps_avx512vl(auVar270,auVar394,auVar271);
                    auVar270 = vsubps_avx512vl(auVar270,auVar275);
                    auVar186 = vfmsub231ps_fma(auVar270,auVar412,auVar276);
                    auVar270 = vmulps_avx512vl(ZEXT1632(auVar186),auVar269);
                    auVar271 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar24 = (bool)((byte)uVar160 & 1);
                    auVar277._0_4_ = (uint)bVar24 * auVar271._0_4_ | (uint)!bVar24 * auVar270._0_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                    auVar277._4_4_ = (uint)bVar24 * auVar271._4_4_ | (uint)!bVar24 * auVar270._4_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                    auVar277._8_4_ = (uint)bVar24 * auVar271._8_4_ | (uint)!bVar24 * auVar270._8_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                    auVar277._12_4_ =
                         (uint)bVar24 * auVar271._12_4_ | (uint)!bVar24 * auVar270._12_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                    auVar277._16_4_ =
                         (uint)bVar24 * auVar271._16_4_ | (uint)!bVar24 * auVar270._16_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                    auVar277._20_4_ =
                         (uint)bVar24 * auVar271._20_4_ | (uint)!bVar24 * auVar270._20_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                    auVar277._24_4_ =
                         (uint)bVar24 * auVar271._24_4_ | (uint)!bVar24 * auVar270._24_4_;
                    bVar24 = SUB81(uVar160 >> 7,0);
                    auVar277._28_4_ =
                         (uint)bVar24 * auVar271._28_4_ | (uint)!bVar24 * auVar270._28_4_;
                    auVar270 = vminps_avx(auVar277,auVar381);
                    auVar270 = vmaxps_avx(auVar270,auVar388);
                    auVar186 = vfmadd213ps_fma(auVar400,auVar270,auVar394);
                    auVar271 = vrndscaleps_avx512vl(ZEXT1632(auVar186),1);
                    uVar160 = vcmpps_avx512vl(ZEXT1632(auVar186),auVar271,1);
                    auVar272 = vsubps_avx512vl(auVar271,auVar406);
                    bVar24 = (bool)((byte)uVar160 & 1);
                    auVar278._0_4_ = (uint)bVar24 * auVar272._0_4_ | (uint)!bVar24 * auVar271._0_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                    auVar278._4_4_ = (uint)bVar24 * auVar272._4_4_ | (uint)!bVar24 * auVar271._4_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                    auVar278._8_4_ = (uint)bVar24 * auVar272._8_4_ | (uint)!bVar24 * auVar271._8_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                    auVar278._12_4_ =
                         (uint)bVar24 * auVar272._12_4_ | (uint)!bVar24 * auVar271._12_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                    auVar278._16_4_ =
                         (uint)bVar24 * auVar272._16_4_ | (uint)!bVar24 * auVar271._16_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                    auVar278._20_4_ =
                         (uint)bVar24 * auVar272._20_4_ | (uint)!bVar24 * auVar271._20_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                    auVar278._24_4_ =
                         (uint)bVar24 * auVar272._24_4_ | (uint)!bVar24 * auVar271._24_4_;
                    bVar24 = SUB81(uVar160 >> 7,0);
                    auVar278._28_4_ =
                         (uint)bVar24 * auVar272._28_4_ | (uint)!bVar24 * auVar271._28_4_;
                    in_ZMM16 = ZEXT3264(auVar278);
                    auVar270 = vfmsub231ps_avx512vl(auVar270,auVar278,auVar412);
                    auVar270 = vfnmsub231ps_avx512vl(auVar270,auVar278,auVar501);
                    auVar461._0_4_ = auVar270._0_4_ * auVar270._0_4_;
                    auVar461._4_4_ = auVar270._4_4_ * auVar270._4_4_;
                    auVar461._8_4_ = auVar270._8_4_ * auVar270._8_4_;
                    auVar461._12_4_ = auVar270._12_4_ * auVar270._12_4_;
                    auVar461._16_4_ = auVar270._16_4_ * auVar270._16_4_;
                    auVar461._20_4_ = auVar270._20_4_ * auVar270._20_4_;
                    auVar461._24_4_ = auVar270._24_4_ * auVar270._24_4_;
                    auVar461._28_4_ = 0;
                    auVar271 = vfmadd213ps_avx512vl(auVar240,auVar270,auVar471);
                    auVar271 = vfmadd213ps_avx512vl(auVar271,auVar270,auVar477);
                    auVar271 = vfmadd213ps_avx512vl(auVar271,auVar270,auVar483);
                    auVar271 = vfmadd213ps_avx512vl(auVar271,auVar270,auVar489);
                    auVar271 = vfmadd213ps_avx512vl(auVar271,auVar270,auVar394);
                    auVar270 = vfmadd213ps_avx512vl(auVar271,auVar461,auVar270);
                    in_ZMM17 = ZEXT3264(auVar270);
                    auVar271 = vaddps_avx512vl(auVar270,auVar406);
                    auVar270 = vcvttps2dq_avx512vl(auVar278);
                    auVar270 = vpslld_avx2(auVar270,0x17);
                    auVar270 = vpaddd_avx2(auVar270,auVar495);
                    auVar186 = vfmadd213ps_fma(auVar270,auVar271,auVar406);
                    auVar270 = vrcpps_avx(ZEXT1632(auVar186));
                    auVar186 = vfmsub213ps_fma(ZEXT1632(auVar186),auVar270,auVar406);
                    auVar186 = vfnmadd132ps_fma(ZEXT1632(auVar186),auVar270,auVar270);
                    auVar270 = vfnmadd213ps_avx512vl(ZEXT1632(auVar186),auVar269,auVar241);
                    in_ZMM9 = ZEXT3264(auVar270);
                    auVar371._0_4_ = auVar270._0_4_ * auVar292._0_4_;
                    auVar371._4_4_ = auVar270._4_4_ * auVar292._4_4_;
                    auVar371._8_4_ = auVar270._8_4_ * auVar292._8_4_;
                    auVar371._12_4_ = auVar270._12_4_ * auVar292._12_4_;
                    auVar371._16_4_ = auVar270._16_4_ * auVar292._16_4_;
                    auVar371._20_4_ = auVar270._20_4_ * auVar292._20_4_;
                    auVar371._24_4_ = auVar270._24_4_ * auVar292._24_4_;
                    auVar270 = auVar371._0_32_;
                    break;
                  case 6:
                    uVar13 = **(undefined4 **)(&this->field_0x118 + local_e8._0_8_);
                    auVar435._4_4_ = uVar13;
                    auVar435._0_4_ = uVar13;
                    auVar435._8_4_ = uVar13;
                    auVar435._12_4_ = uVar13;
                    auVar435._16_4_ = uVar13;
                    auVar435._20_4_ = uVar13;
                    auVar435._24_4_ = uVar13;
                    auVar435._28_4_ = uVar13;
                    uVar13 = (*(undefined4 **)(&this->field_0x118 + local_e8._0_8_))[1];
                    auVar92._4_4_ = uVar13;
                    auVar92._0_4_ = uVar13;
                    auVar92._8_4_ = uVar13;
                    auVar92._12_4_ = uVar13;
                    auVar92._16_4_ = uVar13;
                    auVar92._20_4_ = uVar13;
                    auVar92._24_4_ = uVar13;
                    auVar92._28_4_ = uVar13;
                    auVar270 = vfmadd213ps_avx512vl(auVar435,auVar270,auVar92);
                    auVar270 = vmaxps_avx(auVar270,auVar271);
                    auVar270 = vminps_avx(auVar270,auVar406);
                    auVar372._0_4_ = auVar270._0_4_ * auVar292._0_4_;
                    auVar372._4_4_ = auVar270._4_4_ * auVar292._4_4_;
                    auVar372._8_4_ = auVar270._8_4_ * auVar292._8_4_;
                    auVar372._12_4_ = auVar270._12_4_ * auVar292._12_4_;
                    auVar372._16_4_ = auVar270._16_4_ * auVar292._16_4_;
                    auVar372._20_4_ = auVar270._20_4_ * auVar292._20_4_;
                    auVar372._24_4_ = auVar270._24_4_ * auVar292._24_4_;
                    auVar372._28_36_ = auVar371._28_36_;
                    auVar270 = auVar372._0_32_;
                  }
                }
                *(undefined1 (*) [32])ppp_Var170 = auVar270;
                ppp_Var170 = ppp_Var170 + 4;
                uVar166 = uVar166 + 1;
                iVar152 = iVar152 + 1;
              } while (uVar166 != local_158.w);
            }
            iVar151 = iVar151 + 1;
          } while (iVar151 != local_158.h);
        }
        local_228 = local_228 + 1;
      } while (local_228 != local_158.c);
    }
    if ((uVar10 == 4 && (uint)local_a8 == 0) && (0 < (long)local_158.c)) {
      p_Var161 = pp_Var168[-3];
      iVar182 = *(int *)(&this->field_0xdc + (long)p_Var161);
      iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var161);
      iVar158 = *(int *)(&this->field_0xe4 + (long)p_Var161);
      iVar181 = *(int *)(&this->field_0xe8 + (long)p_Var161);
      iVar174 = *(int *)(&this->field_0x114 + (long)p_Var161);
      lVar175 = *(long *)(&this->field_0x1a8 + (long)p_Var161);
      uVar12 = *(uint *)(&this->field_0xd4 + (long)p_Var161);
      local_e8._0_8_ = p_Var161;
      uVar163 = *(uint *)(&this->field_0xd8 + (long)p_Var161);
      local_228 = 0;
      auVar382._8_4_ = 0x42b0c0a5;
      auVar382._0_8_ = 0x42b0c0a542b0c0a5;
      auVar382._12_4_ = 0x42b0c0a5;
      auVar382._16_4_ = 0x42b0c0a5;
      auVar382._20_4_ = 0x42b0c0a5;
      auVar382._24_4_ = 0x42b0c0a5;
      auVar382._28_4_ = 0x42b0c0a5;
      auVar389._8_4_ = 0xc2b0c0a5;
      auVar389._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar389._12_4_ = 0xc2b0c0a5;
      auVar389._16_4_ = 0xc2b0c0a5;
      auVar389._20_4_ = 0xc2b0c0a5;
      auVar389._24_4_ = 0xc2b0c0a5;
      auVar389._28_4_ = 0xc2b0c0a5;
      auVar395._8_4_ = 0x3f000000;
      auVar395._0_8_ = 0x3f0000003f000000;
      auVar395._12_4_ = 0x3f000000;
      auVar395._16_4_ = 0x3f000000;
      auVar395._20_4_ = 0x3f000000;
      auVar395._24_4_ = 0x3f000000;
      auVar395._28_4_ = 0x3f000000;
      auVar401._8_4_ = 0x3fb8aa3b;
      auVar401._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar401._12_4_ = 0x3fb8aa3b;
      auVar401._16_4_ = 0x3fb8aa3b;
      auVar401._20_4_ = 0x3fb8aa3b;
      auVar401._24_4_ = 0x3fb8aa3b;
      auVar401._28_4_ = 0x3fb8aa3b;
      auVar407._8_4_ = 0x3f800000;
      auVar407._0_8_ = 0x3f8000003f800000;
      auVar407._12_4_ = 0x3f800000;
      auVar407._16_4_ = 0x3f800000;
      auVar407._20_4_ = 0x3f800000;
      auVar407._24_4_ = 0x3f800000;
      auVar407._28_4_ = 0x3f800000;
      auVar413._8_4_ = 0x3f318000;
      auVar413._0_8_ = 0x3f3180003f318000;
      auVar413._12_4_ = 0x3f318000;
      auVar413._16_4_ = 0x3f318000;
      auVar413._20_4_ = 0x3f318000;
      auVar413._24_4_ = 0x3f318000;
      auVar413._28_4_ = 0x3f318000;
      auVar240 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar472._8_4_ = 0x3ab743ce;
      auVar472._0_8_ = 0x3ab743ce3ab743ce;
      auVar472._12_4_ = 0x3ab743ce;
      auVar472._16_4_ = 0x3ab743ce;
      auVar472._20_4_ = 0x3ab743ce;
      auVar472._24_4_ = 0x3ab743ce;
      auVar472._28_4_ = 0x3ab743ce;
      auVar478._8_4_ = 0x3c088908;
      auVar478._0_8_ = 0x3c0889083c088908;
      auVar478._12_4_ = 0x3c088908;
      auVar478._16_4_ = 0x3c088908;
      auVar478._20_4_ = 0x3c088908;
      auVar478._24_4_ = 0x3c088908;
      auVar478._28_4_ = 0x3c088908;
      auVar484._8_4_ = 0x3d2aa9c1;
      auVar484._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar484._12_4_ = 0x3d2aa9c1;
      auVar484._16_4_ = 0x3d2aa9c1;
      auVar484._20_4_ = 0x3d2aa9c1;
      auVar484._24_4_ = 0x3d2aa9c1;
      auVar484._28_4_ = 0x3d2aa9c1;
      auVar490._8_4_ = 0x3e2aaaaa;
      auVar490._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar490._12_4_ = 0x3e2aaaaa;
      auVar490._16_4_ = 0x3e2aaaaa;
      auVar490._20_4_ = 0x3e2aaaaa;
      auVar490._24_4_ = 0x3e2aaaaa;
      auVar490._28_4_ = 0x3e2aaaaa;
      auVar496._8_4_ = 0x3f800000;
      auVar496._0_8_ = 0x3f8000003f800000;
      auVar496._12_4_ = 0x3f800000;
      auVar496._16_4_ = 0x3f800000;
      auVar496._20_4_ = 0x3f800000;
      auVar496._24_4_ = 0x3f800000;
      auVar496._28_4_ = 0x3f800000;
      auVar502._8_4_ = 0xb95e8083;
      auVar502._0_8_ = 0xb95e8083b95e8083;
      auVar502._12_4_ = 0xb95e8083;
      auVar502._16_4_ = 0xb95e8083;
      auVar502._20_4_ = 0xb95e8083;
      auVar502._24_4_ = 0xb95e8083;
      auVar502._28_4_ = 0xb95e8083;
      auVar241 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
      auVar262 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar263 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar264 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar265 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar266 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar267 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar268 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar269 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar270 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar271 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar272 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      do {
        if (0 < local_158.h) {
          iVar155 = bottom_blob->w;
          iVar180 = bottom_blob->h;
          ppp_Var170 = (_func_int ***)
                       ((long)(_func_int ***)local_158.data +
                       local_158.cstep * local_228 * local_158.elemsize);
          uVar164 = bottom_blob->c;
          local_98._0_8_ = local_228 * 0x20;
          iVar151 = 0;
          do {
            if (0 < local_158.w) {
              uVar166 = 0;
              iVar152 = (1 - uVar12) * iVar182;
              do {
                if (lVar175 == 0) {
                  auVar292 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar292 = ZEXT3264(*(undefined1 (*) [32])(lVar175 + local_228 * 0x20));
                }
                if (0 < (int)uVar164) {
                  pvVar179 = (void *)((this->weight_data_tm).cstep * local_228 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar178 = bottom_blob->data;
                  uVar160 = 0;
                  do {
                    if (0 < (int)uVar163) {
                      uVar177 = 0;
                      uVar176 = 0;
                      do {
                        iVar153 = (((int)uVar176 - uVar163) + 1) * iVar11 + iVar151;
                        if ((((-1 < iVar153) &&
                             (iVar154 = iVar153 / iVar181, iVar153 % iVar181 == 0)) &&
                            (0 < (int)uVar12)) && (iVar154 < iVar180)) {
                          lVar167 = (long)iVar154 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar160;
                          uVar171 = uVar177;
                          uVar172 = (ulong)uVar12;
                          iVar153 = iVar152;
                          do {
                            if (((-1 < iVar153) &&
                                (iVar154 = iVar153 / iVar158, iVar153 % iVar158 == 0)) &&
                               (iVar154 < iVar155)) {
                              lVar159 = (long)(iVar154 << 2);
                              uVar13 = *(undefined4 *)((long)pvVar178 + lVar159 * 4 + lVar167);
                              auVar436._4_4_ = uVar13;
                              auVar436._0_4_ = uVar13;
                              auVar436._8_4_ = uVar13;
                              auVar436._12_4_ = uVar13;
                              auVar436._16_4_ = uVar13;
                              auVar436._20_4_ = uVar13;
                              auVar436._24_4_ = uVar13;
                              auVar436._28_4_ = uVar13;
                              uVar13 = *(undefined4 *)((long)pvVar178 + lVar159 * 4 + lVar167 + 4);
                              auVar462._4_4_ = uVar13;
                              auVar462._0_4_ = uVar13;
                              auVar462._8_4_ = uVar13;
                              auVar462._12_4_ = uVar13;
                              auVar462._16_4_ = uVar13;
                              auVar462._20_4_ = uVar13;
                              auVar462._24_4_ = uVar13;
                              auVar462._28_4_ = uVar13;
                              in_ZMM9 = ZEXT3264(auVar462);
                              auVar273 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar178 +
                                                                     lVar159 * 4 + lVar167 + 8)));
                              in_ZMM16 = ZEXT3264(auVar273);
                              auVar242 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar178 +
                                                                     lVar159 * 4 + lVar167 + 0xc)));
                              in_ZMM17 = ZEXT3264(auVar242);
                              uVar184 = uVar171 & 0xffffffff;
                              auVar186 = vfmadd231ps_fma(auVar292._0_32_,auVar436,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar179 + uVar184 * 4));
                              auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar462,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar179 + uVar184 * 4 + 0x20));
                              auVar273 = vfmadd231ps_avx512vl
                                                   (ZEXT1632(auVar186),auVar273,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar179 + uVar184 * 4 + 0x40));
                              auVar273 = vfmadd231ps_avx512vl
                                                   (auVar273,auVar242,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar179 + uVar184 * 4 + 0x60));
                              auVar292 = ZEXT3264(auVar273);
                            }
                            uVar171 = uVar171 + 0x20;
                            iVar153 = iVar153 + iVar182;
                            uVar172 = uVar172 - 1;
                          } while (uVar172 != 0);
                        }
                        uVar176 = uVar176 + 1;
                        uVar177 = uVar177 + (ulong)uVar12 * 0x20;
                      } while (uVar176 != uVar163);
                    }
                    pvVar179 = (void *)((long)pvVar179 + (long)(int)(uVar12 * uVar163 * 0x20) * 4);
                    uVar160 = uVar160 + 1;
                  } while (uVar160 != uVar164);
                }
                auVar273 = auVar292._0_32_;
                if (iVar174 - 1U < 6) {
                  auVar242 = ZEXT1632(ZEXT816(0) << 0x40);
                  auVar373._28_36_ = auVar292._28_36_;
                  switch(iVar174) {
                  case 1:
                    auVar273 = vmaxps_avx(auVar273,ZEXT1632(ZEXT816(0) << 0x40));
                    break;
                  case 2:
                    auVar243 = vmaxps_avx(auVar273,auVar242);
                    auVar273 = vminps_avx(auVar273,auVar242);
                    uVar13 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                    auVar112._4_4_ = uVar13;
                    auVar112._0_4_ = uVar13;
                    auVar112._8_4_ = uVar13;
                    auVar112._12_4_ = uVar13;
                    auVar112._16_4_ = uVar13;
                    auVar112._20_4_ = uVar13;
                    auVar112._24_4_ = uVar13;
                    auVar112._28_4_ = uVar13;
                    auVar273 = vfmadd132ps_avx512vl(auVar273,auVar243,auVar112);
                    break;
                  case 3:
                    uVar13 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                    auVar110._4_4_ = uVar13;
                    auVar110._0_4_ = uVar13;
                    auVar110._8_4_ = uVar13;
                    auVar110._12_4_ = uVar13;
                    auVar110._16_4_ = uVar13;
                    auVar110._20_4_ = uVar13;
                    auVar110._24_4_ = uVar13;
                    auVar110._28_4_ = uVar13;
                    auVar273 = vmaxps_avx512vl(auVar273,auVar110);
                    uVar13 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var161))[1];
                    auVar111._4_4_ = uVar13;
                    auVar111._0_4_ = uVar13;
                    auVar111._8_4_ = uVar13;
                    auVar111._12_4_ = uVar13;
                    auVar111._16_4_ = uVar13;
                    auVar111._20_4_ = uVar13;
                    auVar111._24_4_ = uVar13;
                    auVar111._28_4_ = uVar13;
                    auVar273 = vminps_avx512vl(auVar273,auVar111);
                    break;
                  case 4:
                    auVar108._8_4_ = 0x80000000;
                    auVar108._0_8_ = 0x8000000080000000;
                    auVar108._12_4_ = 0x80000000;
                    auVar108._16_4_ = 0x80000000;
                    auVar108._20_4_ = 0x80000000;
                    auVar108._24_4_ = 0x80000000;
                    auVar108._28_4_ = 0x80000000;
                    auVar273 = vxorps_avx512vl(auVar273,auVar108);
                    auVar273 = vminps_avx(auVar273,auVar382);
                    auVar273 = vmaxps_avx(auVar273,auVar389);
                    auVar186 = vfmadd231ps_fma(auVar395,auVar273,auVar401);
                    auVar242 = vrndscaleps_avx512vl(ZEXT1632(auVar186),1);
                    uVar160 = vcmpps_avx512vl(ZEXT1632(auVar186),auVar242,1);
                    auVar243 = vsubps_avx512vl(auVar242,auVar407);
                    bVar24 = (bool)((byte)uVar160 & 1);
                    auVar285._0_4_ = (uint)bVar24 * auVar243._0_4_ | (uint)!bVar24 * auVar242._0_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                    auVar285._4_4_ = (uint)bVar24 * auVar243._4_4_ | (uint)!bVar24 * auVar242._4_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                    auVar285._8_4_ = (uint)bVar24 * auVar243._8_4_ | (uint)!bVar24 * auVar242._8_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                    auVar285._12_4_ =
                         (uint)bVar24 * auVar243._12_4_ | (uint)!bVar24 * auVar242._12_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                    auVar285._16_4_ =
                         (uint)bVar24 * auVar243._16_4_ | (uint)!bVar24 * auVar242._16_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                    auVar285._20_4_ =
                         (uint)bVar24 * auVar243._20_4_ | (uint)!bVar24 * auVar242._20_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                    auVar285._24_4_ =
                         (uint)bVar24 * auVar243._24_4_ | (uint)!bVar24 * auVar242._24_4_;
                    bVar24 = SUB81(uVar160 >> 7,0);
                    auVar285._28_4_ =
                         (uint)bVar24 * auVar243._28_4_ | (uint)!bVar24 * auVar242._28_4_;
                    in_ZMM16 = ZEXT3264(auVar285);
                    auVar273 = vfmsub231ps_avx512vl(auVar273,auVar285,auVar413);
                    auVar109._8_4_ = 0x395e8083;
                    auVar109._0_8_ = 0x395e8083395e8083;
                    auVar109._12_4_ = 0x395e8083;
                    auVar109._16_4_ = 0x395e8083;
                    auVar109._20_4_ = 0x395e8083;
                    auVar109._24_4_ = 0x395e8083;
                    auVar109._28_4_ = 0x395e8083;
                    auVar273 = vfmsub231ps_avx512vl(auVar273,auVar285,auVar109);
                    auVar437._0_4_ = auVar273._0_4_ * auVar273._0_4_;
                    auVar437._4_4_ = auVar273._4_4_ * auVar273._4_4_;
                    auVar437._8_4_ = auVar273._8_4_ * auVar273._8_4_;
                    auVar437._12_4_ = auVar273._12_4_ * auVar273._12_4_;
                    auVar437._16_4_ = auVar273._16_4_ * auVar273._16_4_;
                    auVar437._20_4_ = auVar273._20_4_ * auVar273._20_4_;
                    auVar437._24_4_ = auVar273._24_4_ * auVar273._24_4_;
                    auVar437._28_4_ = 0;
                    auVar186 = vfmadd213ps_fma(auVar240,auVar273,auVar472);
                    auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),auVar273,auVar478);
                    auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),auVar273,auVar484);
                    auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),auVar273,auVar490);
                    auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),auVar273,auVar395);
                    auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),auVar437,auVar273);
                    in_ZMM9 = ZEXT1664(auVar186);
                    auVar438._0_4_ = auVar186._0_4_ + 1.0;
                    auVar438._4_4_ = auVar186._4_4_ + 1.0;
                    auVar438._8_4_ = auVar186._8_4_ + 1.0;
                    auVar438._12_4_ = auVar186._12_4_ + 1.0;
                    auVar438._16_4_ = 0x3f800000;
                    auVar438._20_4_ = 0x3f800000;
                    auVar438._24_4_ = 0x3f800000;
                    auVar438._28_4_ = 0x3f800000;
                    auVar273 = vcvttps2dq_avx512vl(auVar285);
                    auVar273 = vpslld_avx2(auVar273,0x17);
                    auVar273 = vpaddd_avx2(auVar496,auVar273);
                    auVar186 = vfmadd213ps_fma(auVar273,auVar438,auVar407);
                    auVar273 = vrcpps_avx(ZEXT1632(auVar186));
                    auVar186 = vfmsub213ps_fma(ZEXT1632(auVar186),auVar273,auVar407);
                    auVar186 = vfnmadd132ps_fma(ZEXT1632(auVar186),auVar273,auVar273);
                    auVar273 = ZEXT1632(auVar186);
                    break;
                  case 5:
                    auVar273 = vminps_avx(auVar273,auVar382);
                    auVar273 = vmaxps_avx(auVar273,auVar389);
                    auVar186 = vfmadd213ps_fma(auVar401,auVar273,auVar395);
                    auVar243 = vrndscaleps_avx512vl(ZEXT1632(auVar186),1);
                    uVar160 = vcmpps_avx512vl(ZEXT1632(auVar186),auVar243,1);
                    auVar244 = vsubps_avx512vl(auVar243,auVar407);
                    bVar24 = (bool)((byte)uVar160 & 1);
                    auVar280._0_4_ = (uint)bVar24 * auVar244._0_4_ | (uint)!bVar24 * auVar243._0_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                    auVar280._4_4_ = (uint)bVar24 * auVar244._4_4_ | (uint)!bVar24 * auVar243._4_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                    auVar280._8_4_ = (uint)bVar24 * auVar244._8_4_ | (uint)!bVar24 * auVar243._8_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                    auVar280._12_4_ =
                         (uint)bVar24 * auVar244._12_4_ | (uint)!bVar24 * auVar243._12_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                    auVar280._16_4_ =
                         (uint)bVar24 * auVar244._16_4_ | (uint)!bVar24 * auVar243._16_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                    auVar280._20_4_ =
                         (uint)bVar24 * auVar244._20_4_ | (uint)!bVar24 * auVar243._20_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                    auVar280._24_4_ =
                         (uint)bVar24 * auVar244._24_4_ | (uint)!bVar24 * auVar243._24_4_;
                    bVar24 = SUB81(uVar160 >> 7,0);
                    auVar280._28_4_ =
                         (uint)bVar24 * auVar244._28_4_ | (uint)!bVar24 * auVar243._28_4_;
                    auVar273 = vfmsub231ps_avx512vl(auVar273,auVar280,auVar413);
                    auVar273 = vfnmsub231ps_avx512vl(auVar273,auVar280,auVar502);
                    auVar463._0_4_ = auVar273._0_4_ * auVar273._0_4_;
                    auVar463._4_4_ = auVar273._4_4_ * auVar273._4_4_;
                    auVar463._8_4_ = auVar273._8_4_ * auVar273._8_4_;
                    auVar463._12_4_ = auVar273._12_4_ * auVar273._12_4_;
                    auVar463._16_4_ = auVar273._16_4_ * auVar273._16_4_;
                    auVar463._20_4_ = auVar273._20_4_ * auVar273._20_4_;
                    auVar463._24_4_ = auVar273._24_4_ * auVar273._24_4_;
                    auVar463._28_4_ = 0;
                    auVar243 = vfmadd213ps_avx512vl(auVar240,auVar273,auVar472);
                    auVar243 = vfmadd213ps_avx512vl(auVar243,auVar273,auVar478);
                    auVar243 = vfmadd213ps_avx512vl(auVar243,auVar273,auVar484);
                    auVar243 = vfmadd213ps_avx512vl(auVar243,auVar273,auVar490);
                    auVar243 = vfmadd213ps_avx512vl(auVar243,auVar273,auVar395);
                    auVar273 = vfmadd213ps_avx512vl(auVar243,auVar463,auVar273);
                    auVar243 = vaddps_avx512vl(auVar273,auVar407);
                    auVar273 = vcvttps2dq_avx512vl(auVar280);
                    auVar273 = vpslld_avx2(auVar273,0x17);
                    auVar273 = vpaddd_avx2(auVar273,auVar496);
                    auVar186 = vfmadd213ps_fma(auVar273,auVar243,auVar407);
                    uVar160 = vcmpps_avx512vl(ZEXT1632(auVar186),auVar242,2);
                    auVar105._8_4_ = 0x800000;
                    auVar105._0_8_ = 0x80000000800000;
                    auVar105._12_4_ = 0x800000;
                    auVar105._16_4_ = 0x800000;
                    auVar105._20_4_ = 0x800000;
                    auVar105._24_4_ = 0x800000;
                    auVar105._28_4_ = 0x800000;
                    auVar273 = vmaxps_avx512vl(ZEXT1632(auVar186),auVar105);
                    auVar244 = vpsrld_avx2(auVar273,0x17);
                    auVar242 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar106._8_4_ = 0x3f000000;
                    auVar106._0_8_ = 0x3f0000003f000000;
                    auVar106._12_4_ = 0x3f000000;
                    auVar106._16_4_ = 0x3f000000;
                    auVar106._20_4_ = 0x3f000000;
                    auVar106._24_4_ = 0x3f000000;
                    auVar106._28_4_ = 0x3f000000;
                    auVar273 = vpternlogd_avx512vl(auVar273,auVar242,auVar106,0xea);
                    uVar176 = vcmpps_avx512vl(auVar273,auVar241,1);
                    auVar242 = vaddps_avx512vl(auVar273,auVar262);
                    auVar273 = vaddps_avx512vl(auVar242,auVar273);
                    bVar24 = (bool)((byte)uVar176 & 1);
                    auVar281._0_4_ = (uint)bVar24 * auVar273._0_4_ | (uint)!bVar24 * auVar242._0_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 1) & 1);
                    auVar281._4_4_ = (uint)bVar24 * auVar273._4_4_ | (uint)!bVar24 * auVar242._4_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 2) & 1);
                    auVar281._8_4_ = (uint)bVar24 * auVar273._8_4_ | (uint)!bVar24 * auVar242._8_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 3) & 1);
                    auVar281._12_4_ =
                         (uint)bVar24 * auVar273._12_4_ | (uint)!bVar24 * auVar242._12_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 4) & 1);
                    auVar281._16_4_ =
                         (uint)bVar24 * auVar273._16_4_ | (uint)!bVar24 * auVar242._16_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 5) & 1);
                    auVar281._20_4_ =
                         (uint)bVar24 * auVar273._20_4_ | (uint)!bVar24 * auVar242._20_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 6) & 1);
                    auVar281._24_4_ =
                         (uint)bVar24 * auVar273._24_4_ | (uint)!bVar24 * auVar242._24_4_;
                    bVar24 = SUB81(uVar176 >> 7,0);
                    auVar281._28_4_ =
                         (uint)bVar24 * auVar273._28_4_ | (uint)!bVar24 * auVar242._28_4_;
                    auVar242 = vmulps_avx512vl(auVar281,auVar281);
                    auVar273 = vfmadd213ps_avx512vl(auVar263,auVar281,auVar264);
                    auVar273 = vfmadd213ps_avx512vl(auVar273,auVar281,auVar265);
                    auVar273 = vfmadd213ps_avx512vl(auVar273,auVar281,auVar266);
                    auVar273 = vfmadd213ps_avx512vl(auVar273,auVar281,auVar267);
                    auVar273 = vfmadd213ps_avx512vl(auVar273,auVar281,auVar268);
                    auVar273 = vfmadd213ps_avx512vl(auVar273,auVar281,auVar269);
                    auVar273 = vfmadd213ps_avx512vl(auVar273,auVar281,auVar270);
                    auVar273 = vfmadd213ps_avx512vl(auVar273,auVar281,auVar271);
                    auVar243 = vmulps_avx512vl(auVar242,auVar281);
                    auVar243 = vmulps_avx512vl(auVar243,auVar273);
                    auVar107._8_4_ = 0xffffff82;
                    auVar107._0_8_ = 0xffffff82ffffff82;
                    auVar107._12_4_ = 0xffffff82;
                    auVar107._16_4_ = 0xffffff82;
                    auVar107._20_4_ = 0xffffff82;
                    auVar107._24_4_ = 0xffffff82;
                    auVar107._28_4_ = 0xffffff82;
                    auVar273 = vpaddd_avx512vl(auVar244,auVar107);
                    auVar273 = vcvtdq2ps_avx(auVar273);
                    auVar244 = vsubps_avx512vl(auVar273,auVar407);
                    bVar24 = (bool)((byte)uVar176 & 1);
                    auVar282._0_4_ = (uint)bVar24 * auVar244._0_4_ | (uint)!bVar24 * auVar273._0_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 1) & 1);
                    auVar282._4_4_ = (uint)bVar24 * auVar244._4_4_ | (uint)!bVar24 * auVar273._4_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 2) & 1);
                    auVar282._8_4_ = (uint)bVar24 * auVar244._8_4_ | (uint)!bVar24 * auVar273._8_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 3) & 1);
                    auVar282._12_4_ =
                         (uint)bVar24 * auVar244._12_4_ | (uint)!bVar24 * auVar273._12_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 4) & 1);
                    auVar282._16_4_ =
                         (uint)bVar24 * auVar244._16_4_ | (uint)!bVar24 * auVar273._16_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 5) & 1);
                    auVar282._20_4_ =
                         (uint)bVar24 * auVar244._20_4_ | (uint)!bVar24 * auVar273._20_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 6) & 1);
                    auVar282._24_4_ =
                         (uint)bVar24 * auVar244._24_4_ | (uint)!bVar24 * auVar273._24_4_;
                    bVar24 = SUB81(uVar176 >> 7,0);
                    auVar282._28_4_ =
                         (uint)bVar24 * auVar244._28_4_ | (uint)!bVar24 * auVar273._28_4_;
                    auVar273 = vfmadd231ps_avx512vl(auVar243,auVar282,auVar502);
                    auVar273 = vfmsub231ps_avx512vl(auVar273,auVar395,auVar242);
                    auVar273 = vsubps_avx512vl(auVar273,auVar281);
                    auVar186 = vfmsub231ps_fma(auVar273,auVar413,auVar282);
                    auVar273 = vmulps_avx512vl(ZEXT1632(auVar186),auVar272);
                    auVar242 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar24 = (bool)((byte)uVar160 & 1);
                    auVar283._0_4_ = (uint)bVar24 * auVar242._0_4_ | (uint)!bVar24 * auVar273._0_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                    auVar283._4_4_ = (uint)bVar24 * auVar242._4_4_ | (uint)!bVar24 * auVar273._4_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                    auVar283._8_4_ = (uint)bVar24 * auVar242._8_4_ | (uint)!bVar24 * auVar273._8_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                    auVar283._12_4_ =
                         (uint)bVar24 * auVar242._12_4_ | (uint)!bVar24 * auVar273._12_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                    auVar283._16_4_ =
                         (uint)bVar24 * auVar242._16_4_ | (uint)!bVar24 * auVar273._16_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                    auVar283._20_4_ =
                         (uint)bVar24 * auVar242._20_4_ | (uint)!bVar24 * auVar273._20_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                    auVar283._24_4_ =
                         (uint)bVar24 * auVar242._24_4_ | (uint)!bVar24 * auVar273._24_4_;
                    bVar24 = SUB81(uVar160 >> 7,0);
                    auVar283._28_4_ =
                         (uint)bVar24 * auVar242._28_4_ | (uint)!bVar24 * auVar273._28_4_;
                    auVar273 = vminps_avx(auVar283,auVar382);
                    auVar273 = vmaxps_avx(auVar273,auVar389);
                    auVar186 = vfmadd213ps_fma(auVar401,auVar273,auVar395);
                    auVar242 = vrndscaleps_avx512vl(ZEXT1632(auVar186),1);
                    uVar160 = vcmpps_avx512vl(ZEXT1632(auVar186),auVar242,1);
                    auVar243 = vsubps_avx512vl(auVar242,auVar407);
                    bVar24 = (bool)((byte)uVar160 & 1);
                    auVar284._0_4_ = (uint)bVar24 * auVar243._0_4_ | (uint)!bVar24 * auVar242._0_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                    auVar284._4_4_ = (uint)bVar24 * auVar243._4_4_ | (uint)!bVar24 * auVar242._4_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                    auVar284._8_4_ = (uint)bVar24 * auVar243._8_4_ | (uint)!bVar24 * auVar242._8_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                    auVar284._12_4_ =
                         (uint)bVar24 * auVar243._12_4_ | (uint)!bVar24 * auVar242._12_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                    auVar284._16_4_ =
                         (uint)bVar24 * auVar243._16_4_ | (uint)!bVar24 * auVar242._16_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                    auVar284._20_4_ =
                         (uint)bVar24 * auVar243._20_4_ | (uint)!bVar24 * auVar242._20_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                    auVar284._24_4_ =
                         (uint)bVar24 * auVar243._24_4_ | (uint)!bVar24 * auVar242._24_4_;
                    bVar24 = SUB81(uVar160 >> 7,0);
                    auVar284._28_4_ =
                         (uint)bVar24 * auVar243._28_4_ | (uint)!bVar24 * auVar242._28_4_;
                    in_ZMM16 = ZEXT3264(auVar284);
                    auVar273 = vfmsub231ps_avx512vl(auVar273,auVar284,auVar413);
                    auVar273 = vfnmsub231ps_avx512vl(auVar273,auVar284,auVar502);
                    auVar464._0_4_ = auVar273._0_4_ * auVar273._0_4_;
                    auVar464._4_4_ = auVar273._4_4_ * auVar273._4_4_;
                    auVar464._8_4_ = auVar273._8_4_ * auVar273._8_4_;
                    auVar464._12_4_ = auVar273._12_4_ * auVar273._12_4_;
                    auVar464._16_4_ = auVar273._16_4_ * auVar273._16_4_;
                    auVar464._20_4_ = auVar273._20_4_ * auVar273._20_4_;
                    auVar464._24_4_ = auVar273._24_4_ * auVar273._24_4_;
                    auVar464._28_4_ = 0;
                    auVar242 = vfmadd213ps_avx512vl(auVar240,auVar273,auVar472);
                    auVar242 = vfmadd213ps_avx512vl(auVar242,auVar273,auVar478);
                    auVar242 = vfmadd213ps_avx512vl(auVar242,auVar273,auVar484);
                    auVar242 = vfmadd213ps_avx512vl(auVar242,auVar273,auVar490);
                    auVar242 = vfmadd213ps_avx512vl(auVar242,auVar273,auVar395);
                    auVar273 = vfmadd213ps_avx512vl(auVar242,auVar464,auVar273);
                    in_ZMM17 = ZEXT3264(auVar273);
                    auVar242 = vaddps_avx512vl(auVar273,auVar407);
                    auVar273 = vcvttps2dq_avx512vl(auVar284);
                    auVar273 = vpslld_avx2(auVar273,0x17);
                    auVar273 = vpaddd_avx2(auVar273,auVar496);
                    auVar186 = vfmadd213ps_fma(auVar273,auVar242,auVar407);
                    auVar273 = vrcpps_avx(ZEXT1632(auVar186));
                    auVar186 = vfmsub213ps_fma(ZEXT1632(auVar186),auVar273,auVar407);
                    auVar186 = vfnmadd132ps_fma(ZEXT1632(auVar186),auVar273,auVar273);
                    auVar273 = vfnmadd213ps_avx512vl(ZEXT1632(auVar186),auVar272,auVar262);
                    in_ZMM9 = ZEXT3264(auVar273);
                    auVar373._0_4_ = auVar273._0_4_ * auVar292._0_4_;
                    auVar373._4_4_ = auVar273._4_4_ * auVar292._4_4_;
                    auVar373._8_4_ = auVar273._8_4_ * auVar292._8_4_;
                    auVar373._12_4_ = auVar273._12_4_ * auVar292._12_4_;
                    auVar373._16_4_ = auVar273._16_4_ * auVar292._16_4_;
                    auVar373._20_4_ = auVar273._20_4_ * auVar292._20_4_;
                    auVar373._24_4_ = auVar273._24_4_ * auVar292._24_4_;
                    auVar273 = auVar373._0_32_;
                    break;
                  case 6:
                    uVar13 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                    auVar439._4_4_ = uVar13;
                    auVar439._0_4_ = uVar13;
                    auVar439._8_4_ = uVar13;
                    auVar439._12_4_ = uVar13;
                    auVar439._16_4_ = uVar13;
                    auVar439._20_4_ = uVar13;
                    auVar439._24_4_ = uVar13;
                    auVar439._28_4_ = uVar13;
                    uVar13 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var161))[1];
                    auVar104._4_4_ = uVar13;
                    auVar104._0_4_ = uVar13;
                    auVar104._8_4_ = uVar13;
                    auVar104._12_4_ = uVar13;
                    auVar104._16_4_ = uVar13;
                    auVar104._20_4_ = uVar13;
                    auVar104._24_4_ = uVar13;
                    auVar104._28_4_ = uVar13;
                    auVar273 = vfmadd213ps_avx512vl(auVar439,auVar273,auVar104);
                    auVar273 = vmaxps_avx(auVar273,auVar242);
                    auVar273 = vminps_avx(auVar273,auVar407);
                    auVar374._0_4_ = auVar273._0_4_ * auVar292._0_4_;
                    auVar374._4_4_ = auVar273._4_4_ * auVar292._4_4_;
                    auVar374._8_4_ = auVar273._8_4_ * auVar292._8_4_;
                    auVar374._12_4_ = auVar273._12_4_ * auVar292._12_4_;
                    auVar374._16_4_ = auVar273._16_4_ * auVar292._16_4_;
                    auVar374._20_4_ = auVar273._20_4_ * auVar292._20_4_;
                    auVar374._24_4_ = auVar273._24_4_ * auVar292._24_4_;
                    auVar374._28_36_ = auVar373._28_36_;
                    auVar273 = auVar374._0_32_;
                  }
                }
                *(undefined1 (*) [32])ppp_Var170 = auVar273;
                ppp_Var170 = ppp_Var170 + 4;
                uVar166 = uVar166 + 1;
                iVar152 = iVar152 + 1;
              } while (uVar166 != local_158.w);
            }
            iVar151 = iVar151 + 1;
          } while (iVar151 != local_158.h);
        }
        local_228 = local_228 + 1;
      } while (local_228 != local_158.c);
    }
    local_a0 = uVar162 ^ 4;
    if ((uVar10 == 8 && local_a0 == 0) && (0 < (long)local_158.c)) {
      p_Var161 = pp_Var168[-3];
      iVar182 = *(int *)(&this->field_0xdc + (long)p_Var161);
      iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var161);
      iVar158 = *(int *)(&this->field_0xe4 + (long)p_Var161);
      iVar181 = *(int *)(&this->field_0xe8 + (long)p_Var161);
      uVar13 = *(undefined4 *)(&this->field_0x114 + (long)p_Var161);
      lVar175 = *(long *)(&this->field_0x1a8 + (long)p_Var161);
      uVar12 = *(uint *)(&this->field_0xd4 + (long)p_Var161);
      local_e8._0_8_ = p_Var161;
      uVar163 = *(uint *)(&this->field_0xd8 + (long)p_Var161);
      local_228 = 0;
      auVar227 = ZEXT816(0) << 0x40;
      auVar378._8_4_ = 0x42b0c0a5;
      auVar378._0_8_ = 0x42b0c0a542b0c0a5;
      auVar378._12_4_ = 0x42b0c0a5;
      auVar385._8_4_ = 0xc2b0c0a5;
      auVar385._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar385._12_4_ = 0xc2b0c0a5;
      auVar391._8_4_ = 0x3f000000;
      auVar391._0_8_ = 0x3f0000003f000000;
      auVar391._12_4_ = 0x3f000000;
      auVar397._8_4_ = 0x3fb8aa3b;
      auVar397._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar397._12_4_ = 0x3fb8aa3b;
      auVar403._8_4_ = 0x3f800000;
      auVar403._0_8_ = 0x3f8000003f800000;
      auVar403._12_4_ = 0x3f800000;
      auVar409._8_4_ = 0x3f318000;
      auVar409._0_8_ = 0x3f3180003f318000;
      auVar409._12_4_ = 0x3f318000;
      auVar186 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar468._8_4_ = 0x3ab743ce;
      auVar468._0_8_ = 0x3ab743ce3ab743ce;
      auVar468._12_4_ = 0x3ab743ce;
      auVar474._8_4_ = 0x3c088908;
      auVar474._0_8_ = 0x3c0889083c088908;
      auVar474._12_4_ = 0x3c088908;
      auVar480._8_4_ = 0x3d2aa9c1;
      auVar480._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar480._12_4_ = 0x3d2aa9c1;
      auVar486._8_4_ = 0x3e2aaaaa;
      auVar486._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar486._12_4_ = 0x3e2aaaaa;
      auVar492._8_4_ = 0x3f800000;
      auVar492._0_8_ = 0x3f8000003f800000;
      auVar492._12_4_ = 0x3f800000;
      auVar498._8_4_ = 0xb95e8083;
      auVar498._0_8_ = 0xb95e8083b95e8083;
      auVar498._12_4_ = 0xb95e8083;
      auVar187 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar188 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar209 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar210 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar211 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar212 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar213 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar214 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar215 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        if (0 < local_158.h) {
          iVar174 = bottom_blob->w;
          iVar155 = bottom_blob->h;
          ppp_Var170 = (_func_int ***)
                       ((long)(_func_int ***)local_158.data +
                       local_158.cstep * local_228 * local_158.elemsize);
          uVar164 = bottom_blob->c;
          local_98._0_8_ = local_228 * 0x10;
          iVar180 = 0;
          do {
            if (0 < local_158.w) {
              uVar166 = 0;
              iVar151 = (1 - uVar12) * iVar182;
              do {
                if (lVar175 == 0) {
                  auVar220 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar220 = *(undefined1 (*) [16])(lVar175 + local_228 * 0x10);
                }
                auVar292 = ZEXT1664(auVar220);
                if (0 < (int)uVar164) {
                  pvVar179 = (void *)((this->weight_data_tm).cstep * local_228 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar178 = bottom_blob->data;
                  uVar160 = 0;
                  do {
                    if (0 < (int)uVar163) {
                      uVar177 = 0;
                      uVar176 = 0;
                      do {
                        iVar152 = (((int)uVar176 - uVar163) + 1) * iVar11 + iVar180;
                        if ((((-1 < iVar152) &&
                             (iVar153 = iVar152 / iVar181, iVar152 % iVar181 == 0)) &&
                            (0 < (int)uVar12)) && (iVar153 < iVar155)) {
                          lVar167 = (long)iVar153 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar160;
                          uVar171 = uVar177;
                          uVar172 = (ulong)uVar12;
                          iVar152 = iVar151;
                          do {
                            if (((-1 < iVar152) &&
                                (iVar153 = iVar152 / iVar158, iVar152 % iVar158 == 0)) &&
                               (iVar153 < iVar174)) {
                              lVar159 = (long)(iVar153 << 3);
                              uVar2 = *(undefined4 *)((long)pvVar178 + lVar159 * 4 + lVar167);
                              auVar418._4_4_ = uVar2;
                              auVar418._0_4_ = uVar2;
                              auVar418._8_4_ = uVar2;
                              auVar418._12_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar178 + lVar159 * 4 + lVar167 + 4);
                              auVar447._4_4_ = uVar2;
                              auVar447._0_4_ = uVar2;
                              auVar447._8_4_ = uVar2;
                              auVar447._12_4_ = uVar2;
                              in_ZMM9 = ZEXT1664(auVar447);
                              auVar216 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar178 +
                                                                     lVar159 * 4 + lVar167 + 8)));
                              in_ZMM16 = ZEXT1664(auVar216);
                              auVar217 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar178 +
                                                                     lVar159 * 4 + lVar167 + 0xc)));
                              in_ZMM17 = ZEXT1664(auVar217);
                              auVar218 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar178 +
                                                                     lVar159 * 4 + lVar167 + 0x10)))
                              ;
                              auVar219 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar178 +
                                                                     lVar159 * 4 + lVar167 + 0x14)))
                              ;
                              auVar189 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar178 +
                                                                     lVar159 * 4 + lVar167 + 0x18)))
                              ;
                              auVar190 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar178 +
                                                                     lVar159 * 4 + lVar167 + 0x1c)))
                              ;
                              uVar184 = uVar171 & 0xffffffff;
                              auVar220 = vfmadd231ps_fma(auVar292._0_16_,auVar418,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar179 + uVar184 * 4));
                              auVar220 = vfmadd231ps_fma(auVar220,auVar447,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar179 + uVar184 * 4 + 0x10));
                              auVar220 = vfmadd231ps_avx512vl
                                                   (auVar220,auVar216,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar179 + uVar184 * 4 + 0x20));
                              auVar220 = vfmadd231ps_avx512vl
                                                   (auVar220,auVar217,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar179 + uVar184 * 4 + 0x30));
                              auVar220 = vfmadd231ps_avx512vl
                                                   (auVar220,auVar218,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar179 + uVar184 * 4 + 0x40));
                              auVar220 = vfmadd231ps_avx512vl
                                                   (auVar220,auVar219,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar179 + uVar184 * 4 + 0x50));
                              auVar220 = vfmadd231ps_avx512vl
                                                   (auVar220,auVar189,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar179 + uVar184 * 4 + 0x60));
                              auVar220 = vfmadd231ps_avx512vl
                                                   (auVar220,auVar190,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar179 + uVar184 * 4 + 0x70));
                              auVar292 = ZEXT1664(auVar220);
                            }
                            uVar171 = uVar171 + 0x20;
                            iVar152 = iVar152 + iVar182;
                            uVar172 = uVar172 - 1;
                          } while (uVar172 != 0);
                        }
                        uVar176 = uVar176 + 1;
                        uVar177 = uVar177 + (ulong)uVar12 * 0x20;
                      } while (uVar176 != uVar163);
                    }
                    auVar220 = auVar292._0_16_;
                    pvVar179 = (void *)((long)pvVar179 + (long)(int)(uVar12 * uVar163 * 0x20) * 4);
                    uVar160 = uVar160 + 1;
                  } while (uVar160 != uVar164);
                }
                switch(uVar13) {
                case 1:
                  auVar220 = vmaxps_avx(auVar220,auVar227);
                  break;
                case 2:
                  auVar216 = vmaxps_avx(auVar220,auVar227);
                  auVar220 = vminps_avx(auVar220,auVar227);
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                  auVar62._4_4_ = uVar2;
                  auVar62._0_4_ = uVar2;
                  auVar62._8_4_ = uVar2;
                  auVar62._12_4_ = uVar2;
                  auVar220 = vfmadd132ps_avx512vl(auVar220,auVar216,auVar62);
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                  auVar60._4_4_ = uVar2;
                  auVar60._0_4_ = uVar2;
                  auVar60._8_4_ = uVar2;
                  auVar60._12_4_ = uVar2;
                  auVar220 = vmaxps_avx512vl(auVar220,auVar60);
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var161))[1];
                  auVar61._4_4_ = uVar2;
                  auVar61._0_4_ = uVar2;
                  auVar61._8_4_ = uVar2;
                  auVar61._12_4_ = uVar2;
                  auVar220 = vminps_avx512vl(auVar220,auVar61);
                  break;
                case 4:
                  auVar58._8_4_ = 0x80000000;
                  auVar58._0_8_ = 0x8000000080000000;
                  auVar58._12_4_ = 0x80000000;
                  auVar220 = vxorps_avx512vl(auVar220,auVar58);
                  auVar220 = vminps_avx(auVar220,auVar378);
                  auVar220 = vmaxps_avx(auVar220,auVar385);
                  auVar216 = vfmadd231ps_fma(auVar391,auVar220,auVar397);
                  auVar217 = vcvttps2dq_avx512vl(auVar216);
                  auVar217 = vcvtdq2ps_avx512vl(auVar217);
                  uVar160 = vcmpps_avx512vl(auVar216,auVar217,1);
                  auVar216 = vsubps_avx512vl(auVar217,auVar403);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar226._0_4_ = (uint)bVar24 * auVar216._0_4_ | (uint)!bVar24 * auVar217._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar226._4_4_ = (uint)bVar24 * auVar216._4_4_ | (uint)!bVar24 * auVar217._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar226._8_4_ = (uint)bVar24 * auVar216._8_4_ | (uint)!bVar24 * auVar217._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar226._12_4_ = (uint)bVar24 * auVar216._12_4_ | (uint)!bVar24 * auVar217._12_4_
                  ;
                  in_ZMM16 = ZEXT1664(auVar226);
                  auVar220 = vfmsub231ps_avx512vl(auVar220,auVar226,auVar409);
                  auVar59._8_4_ = 0x395e8083;
                  auVar59._0_8_ = 0x395e8083395e8083;
                  auVar59._12_4_ = 0x395e8083;
                  auVar216 = vfmsub231ps_avx512vl(auVar220,auVar226,auVar59);
                  auVar419._0_4_ = auVar216._0_4_ * auVar216._0_4_;
                  auVar419._4_4_ = auVar216._4_4_ * auVar216._4_4_;
                  auVar419._8_4_ = auVar216._8_4_ * auVar216._8_4_;
                  auVar419._12_4_ = auVar216._12_4_ * auVar216._12_4_;
                  auVar220 = vfmadd213ps_fma(auVar186,auVar216,auVar468);
                  auVar220 = vfmadd213ps_fma(auVar220,auVar216,auVar474);
                  auVar220 = vfmadd213ps_fma(auVar220,auVar216,auVar480);
                  auVar220 = vfmadd213ps_fma(auVar220,auVar216,auVar486);
                  auVar220 = vfmadd213ps_fma(auVar220,auVar216,auVar391);
                  auVar220 = vfmadd213ps_fma(auVar220,auVar419,auVar216);
                  in_ZMM9 = ZEXT1664(auVar220);
                  auVar420._0_4_ = auVar220._0_4_ + 1.0;
                  auVar420._4_4_ = auVar220._4_4_ + 1.0;
                  auVar420._8_4_ = auVar220._8_4_ + 1.0;
                  auVar420._12_4_ = auVar220._12_4_ + 1.0;
                  auVar220 = vcvttps2dq_avx512vl(auVar226);
                  auVar220 = vpslld_avx(auVar220,0x17);
                  auVar220 = vpaddd_avx(auVar492,auVar220);
                  auVar216 = vfmadd213ps_fma(auVar220,auVar420,auVar403);
                  auVar220 = vrcpps_avx(auVar216);
                  auVar216 = vfmsub213ps_fma(auVar216,auVar220,auVar403);
                  auVar220 = vfnmadd132ps_fma(auVar216,auVar220,auVar220);
                  break;
                case 5:
                  auVar216 = vminps_avx(auVar220,auVar378);
                  auVar216 = vmaxps_avx(auVar216,auVar385);
                  auVar217 = vfmadd213ps_fma(auVar397,auVar216,auVar391);
                  auVar218 = vcvttps2dq_avx512vl(auVar217);
                  auVar218 = vcvtdq2ps_avx512vl(auVar218);
                  uVar160 = vcmpps_avx512vl(auVar217,auVar218,1);
                  auVar217 = vsubps_avx512vl(auVar218,auVar403);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar221._0_4_ = (uint)bVar24 * auVar217._0_4_ | (uint)!bVar24 * auVar218._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar221._4_4_ = (uint)bVar24 * auVar217._4_4_ | (uint)!bVar24 * auVar218._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar221._8_4_ = (uint)bVar24 * auVar217._8_4_ | (uint)!bVar24 * auVar218._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar221._12_4_ = (uint)bVar24 * auVar217._12_4_ | (uint)!bVar24 * auVar218._12_4_
                  ;
                  auVar216 = vfmsub231ps_avx512vl(auVar216,auVar221,auVar409);
                  auVar216 = vfnmsub231ps_avx512vl(auVar216,auVar221,auVar498);
                  auVar448._0_4_ = auVar216._0_4_ * auVar216._0_4_;
                  auVar448._4_4_ = auVar216._4_4_ * auVar216._4_4_;
                  auVar448._8_4_ = auVar216._8_4_ * auVar216._8_4_;
                  auVar448._12_4_ = auVar216._12_4_ * auVar216._12_4_;
                  auVar217 = vfmadd213ps_avx512vl(auVar186,auVar216,auVar468);
                  auVar217 = vfmadd213ps_avx512vl(auVar217,auVar216,auVar474);
                  auVar217 = vfmadd213ps_avx512vl(auVar217,auVar216,auVar480);
                  auVar217 = vfmadd213ps_avx512vl(auVar217,auVar216,auVar486);
                  auVar217 = vfmadd213ps_avx512vl(auVar217,auVar216,auVar391);
                  auVar216 = vfmadd213ps_avx512vl(auVar217,auVar448,auVar216);
                  auVar217 = vaddps_avx512vl(auVar216,auVar403);
                  auVar216 = vcvttps2dq_avx512vl(auVar221);
                  auVar216 = vpslld_avx(auVar216,0x17);
                  auVar216 = vpaddd_avx(auVar216,auVar492);
                  auVar216 = vfmadd213ps_fma(auVar216,auVar217,auVar403);
                  uVar160 = vcmpps_avx512vl(auVar216,auVar227,2);
                  auVar52._8_4_ = 0x800000;
                  auVar52._0_8_ = 0x80000000800000;
                  auVar52._12_4_ = 0x800000;
                  auVar216 = vmaxps_avx512vl(auVar216,auVar52);
                  auVar219 = vpsrld_avx(auVar216,0x17);
                  auVar217 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar53._8_4_ = 0x3f000000;
                  auVar53._0_8_ = 0x3f0000003f000000;
                  auVar53._12_4_ = 0x3f000000;
                  auVar216 = vpternlogd_avx512vl(auVar216,auVar217,auVar53,0xea);
                  auVar54._8_4_ = 0x3f3504f3;
                  auVar54._0_8_ = 0x3f3504f33f3504f3;
                  auVar54._12_4_ = 0x3f3504f3;
                  uVar176 = vcmpps_avx512vl(auVar216,auVar54,1);
                  auVar55._8_4_ = 0xbf800000;
                  auVar55._0_8_ = 0xbf800000bf800000;
                  auVar55._12_4_ = 0xbf800000;
                  auVar217 = vaddps_avx512vl(auVar216,auVar55);
                  auVar216 = vaddps_avx512vl(auVar217,auVar216);
                  bVar24 = (bool)((byte)uVar176 & 1);
                  auVar222._0_4_ = (uint)bVar24 * auVar216._0_4_ | (uint)!bVar24 * auVar217._0_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 1) & 1);
                  auVar222._4_4_ = (uint)bVar24 * auVar216._4_4_ | (uint)!bVar24 * auVar217._4_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 2) & 1);
                  auVar222._8_4_ = (uint)bVar24 * auVar216._8_4_ | (uint)!bVar24 * auVar217._8_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 3) & 1);
                  auVar222._12_4_ = (uint)bVar24 * auVar216._12_4_ | (uint)!bVar24 * auVar217._12_4_
                  ;
                  auVar217 = vmulps_avx512vl(auVar222,auVar222);
                  auVar56._8_4_ = 0xbdebd1b8;
                  auVar56._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar56._12_4_ = 0xbdebd1b8;
                  auVar216 = vfmadd213ps_avx512vl(auVar187,auVar222,auVar56);
                  auVar216 = vfmadd213ps_avx512vl(auVar216,auVar222,auVar188);
                  auVar216 = vfmadd213ps_avx512vl(auVar216,auVar222,auVar209);
                  auVar216 = vfmadd213ps_avx512vl(auVar216,auVar222,auVar210);
                  auVar216 = vfmadd213ps_avx512vl(auVar216,auVar222,auVar211);
                  auVar216 = vfmadd213ps_avx512vl(auVar216,auVar222,auVar212);
                  auVar216 = vfmadd213ps_avx512vl(auVar216,auVar222,auVar213);
                  auVar216 = vfmadd213ps_avx512vl(auVar216,auVar222,auVar214);
                  auVar218 = vmulps_avx512vl(auVar217,auVar222);
                  auVar218 = vmulps_avx512vl(auVar218,auVar216);
                  auVar57._8_4_ = 0xffffff82;
                  auVar57._0_8_ = 0xffffff82ffffff82;
                  auVar57._12_4_ = 0xffffff82;
                  auVar216 = vpaddd_avx512vl(auVar219,auVar57);
                  auVar216 = vcvtdq2ps_avx(auVar216);
                  auVar219 = vsubps_avx512vl(auVar216,auVar403);
                  bVar24 = (bool)((byte)uVar176 & 1);
                  auVar223._0_4_ = (uint)bVar24 * auVar219._0_4_ | (uint)!bVar24 * auVar216._0_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 1) & 1);
                  auVar223._4_4_ = (uint)bVar24 * auVar219._4_4_ | (uint)!bVar24 * auVar216._4_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 2) & 1);
                  auVar223._8_4_ = (uint)bVar24 * auVar219._8_4_ | (uint)!bVar24 * auVar216._8_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 3) & 1);
                  auVar223._12_4_ = (uint)bVar24 * auVar219._12_4_ | (uint)!bVar24 * auVar216._12_4_
                  ;
                  auVar216 = vfmadd231ps_avx512vl(auVar218,auVar223,auVar498);
                  auVar216 = vfmsub231ps_avx512vl(auVar216,auVar391,auVar217);
                  auVar216 = vsubps_avx512vl(auVar216,auVar222);
                  auVar216 = vfnmadd231ps_fma(auVar216,auVar409,auVar223);
                  auVar217 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar224._0_4_ =
                       (uint)bVar24 * auVar217._0_4_ |
                       (uint)!bVar24 * (int)(auVar216._0_4_ + auVar216._0_4_);
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar224._4_4_ =
                       (uint)bVar24 * auVar217._4_4_ |
                       (uint)!bVar24 * (int)(auVar216._4_4_ + auVar216._4_4_);
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar224._8_4_ =
                       (uint)bVar24 * auVar217._8_4_ |
                       (uint)!bVar24 * (int)(auVar216._8_4_ + auVar216._8_4_);
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar224._12_4_ =
                       (uint)bVar24 * auVar217._12_4_ |
                       (uint)!bVar24 * (int)(auVar216._12_4_ + auVar216._12_4_);
                  auVar216 = vminps_avx(auVar224,auVar378);
                  auVar216 = vmaxps_avx(auVar216,auVar385);
                  auVar217 = vfmadd213ps_fma(auVar397,auVar216,auVar391);
                  auVar218 = vcvttps2dq_avx512vl(auVar217);
                  auVar218 = vcvtdq2ps_avx512vl(auVar218);
                  uVar160 = vcmpps_avx512vl(auVar217,auVar218,1);
                  auVar217 = vsubps_avx512vl(auVar218,auVar403);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar225._0_4_ = (uint)bVar24 * auVar217._0_4_ | (uint)!bVar24 * auVar218._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar225._4_4_ = (uint)bVar24 * auVar217._4_4_ | (uint)!bVar24 * auVar218._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar225._8_4_ = (uint)bVar24 * auVar217._8_4_ | (uint)!bVar24 * auVar218._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar225._12_4_ = (uint)bVar24 * auVar217._12_4_ | (uint)!bVar24 * auVar218._12_4_
                  ;
                  auVar216 = vfmsub231ps_avx512vl(auVar216,auVar225,auVar409);
                  auVar216 = vfnmsub231ps_avx512vl(auVar216,auVar225,auVar498);
                  auVar449._0_4_ = auVar216._0_4_ * auVar216._0_4_;
                  auVar449._4_4_ = auVar216._4_4_ * auVar216._4_4_;
                  auVar449._8_4_ = auVar216._8_4_ * auVar216._8_4_;
                  auVar449._12_4_ = auVar216._12_4_ * auVar216._12_4_;
                  auVar217 = vfmadd213ps_avx512vl(auVar186,auVar216,auVar468);
                  auVar217 = vfmadd213ps_avx512vl(auVar217,auVar216,auVar474);
                  auVar217 = vfmadd213ps_avx512vl(auVar217,auVar216,auVar480);
                  auVar217 = vfmadd213ps_avx512vl(auVar217,auVar216,auVar486);
                  auVar217 = vfmadd213ps_avx512vl(auVar217,auVar216,auVar391);
                  auVar216 = vfmadd213ps_avx512vl(auVar217,auVar449,auVar216);
                  in_ZMM17 = ZEXT1664(auVar216);
                  auVar217 = vaddps_avx512vl(auVar216,auVar403);
                  auVar216 = vcvttps2dq_avx512vl(auVar225);
                  auVar216 = vpslld_avx(auVar216,0x17);
                  auVar216 = vpaddd_avx(auVar216,auVar492);
                  auVar217 = vfmadd213ps_fma(auVar216,auVar217,auVar403);
                  auVar216 = vrcpps_avx(auVar217);
                  auVar218 = vaddps_avx512vl(auVar216,auVar216);
                  in_ZMM16 = ZEXT1664(auVar218);
                  auVar217 = vfmsub213ps_avx512vl(auVar217,auVar218,auVar215);
                  auVar216 = vfnmadd213ps_avx512vl(auVar217,auVar216,auVar218);
                  in_ZMM9 = ZEXT1664(auVar216);
                  auVar220 = vfmsub231ps_fma(auVar220,auVar220,auVar216);
                  break;
                case 6:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                  auVar421._4_4_ = uVar2;
                  auVar421._0_4_ = uVar2;
                  auVar421._8_4_ = uVar2;
                  auVar421._12_4_ = uVar2;
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var161))[1];
                  auVar51._4_4_ = uVar2;
                  auVar51._0_4_ = uVar2;
                  auVar51._8_4_ = uVar2;
                  auVar51._12_4_ = uVar2;
                  auVar216 = vfmadd213ps_avx512vl(auVar421,auVar220,auVar51);
                  auVar216 = vmaxps_avx(auVar216,auVar227);
                  auVar216 = vminps_avx(auVar216,auVar403);
                  auVar363._0_4_ = auVar216._0_4_ * auVar220._0_4_;
                  auVar363._4_4_ = auVar216._4_4_ * auVar220._4_4_;
                  auVar363._8_4_ = auVar216._8_4_ * auVar220._8_4_;
                  auVar363._12_4_ = auVar216._12_4_ * auVar220._12_4_;
                  auVar220 = auVar363;
                }
                *(undefined1 (*) [16])ppp_Var170 = auVar220;
                ppp_Var170 = ppp_Var170 + 2;
                uVar166 = uVar166 + 1;
                iVar151 = iVar151 + 1;
              } while (uVar166 != local_158.w);
            }
            iVar180 = iVar180 + 1;
          } while (iVar180 != local_158.h);
        }
        local_228 = local_228 + 1;
      } while (local_228 != local_158.c);
    }
    local_a8._0_4_ = (uint)local_a8 | uVar10 ^ 1;
    if (((uint)local_a8 == 0) && (0 < (long)local_158.c)) {
      p_Var161 = pp_Var168[-3];
      iVar182 = *(int *)(&this->field_0xdc + (long)p_Var161);
      iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var161);
      iVar158 = *(int *)(&this->field_0xe4 + (long)p_Var161);
      iVar181 = *(int *)(&this->field_0xe8 + (long)p_Var161);
      iVar174 = *(int *)(&this->field_0x114 + (long)p_Var161);
      lVar175 = *(long *)(&this->field_0x1a8 + (long)p_Var161);
      uVar12 = *(uint *)(&this->field_0xd4 + (long)p_Var161);
      local_e8._0_8_ = p_Var161;
      uVar163 = *(uint *)(&this->field_0xd8 + (long)p_Var161);
      local_228 = 0;
      auVar383._8_4_ = 0x42b0c0a5;
      auVar383._0_8_ = 0x42b0c0a542b0c0a5;
      auVar383._12_4_ = 0x42b0c0a5;
      auVar383._16_4_ = 0x42b0c0a5;
      auVar383._20_4_ = 0x42b0c0a5;
      auVar383._24_4_ = 0x42b0c0a5;
      auVar383._28_4_ = 0x42b0c0a5;
      auVar390._8_4_ = 0xc2b0c0a5;
      auVar390._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar390._12_4_ = 0xc2b0c0a5;
      auVar390._16_4_ = 0xc2b0c0a5;
      auVar390._20_4_ = 0xc2b0c0a5;
      auVar390._24_4_ = 0xc2b0c0a5;
      auVar390._28_4_ = 0xc2b0c0a5;
      auVar396._8_4_ = 0x3f000000;
      auVar396._0_8_ = 0x3f0000003f000000;
      auVar396._12_4_ = 0x3f000000;
      auVar396._16_4_ = 0x3f000000;
      auVar396._20_4_ = 0x3f000000;
      auVar396._24_4_ = 0x3f000000;
      auVar396._28_4_ = 0x3f000000;
      auVar402._8_4_ = 0x3fb8aa3b;
      auVar402._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar402._12_4_ = 0x3fb8aa3b;
      auVar402._16_4_ = 0x3fb8aa3b;
      auVar402._20_4_ = 0x3fb8aa3b;
      auVar402._24_4_ = 0x3fb8aa3b;
      auVar402._28_4_ = 0x3fb8aa3b;
      auVar408._8_4_ = 0x3f800000;
      auVar408._0_8_ = 0x3f8000003f800000;
      auVar408._12_4_ = 0x3f800000;
      auVar408._16_4_ = 0x3f800000;
      auVar408._20_4_ = 0x3f800000;
      auVar408._24_4_ = 0x3f800000;
      auVar408._28_4_ = 0x3f800000;
      auVar414._8_4_ = 0x3f318000;
      auVar414._0_8_ = 0x3f3180003f318000;
      auVar414._12_4_ = 0x3f318000;
      auVar414._16_4_ = 0x3f318000;
      auVar414._20_4_ = 0x3f318000;
      auVar414._24_4_ = 0x3f318000;
      auVar414._28_4_ = 0x3f318000;
      auVar240 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar473._8_4_ = 0x3ab743ce;
      auVar473._0_8_ = 0x3ab743ce3ab743ce;
      auVar473._12_4_ = 0x3ab743ce;
      auVar473._16_4_ = 0x3ab743ce;
      auVar473._20_4_ = 0x3ab743ce;
      auVar473._24_4_ = 0x3ab743ce;
      auVar473._28_4_ = 0x3ab743ce;
      auVar479._8_4_ = 0x3c088908;
      auVar479._0_8_ = 0x3c0889083c088908;
      auVar479._12_4_ = 0x3c088908;
      auVar479._16_4_ = 0x3c088908;
      auVar479._20_4_ = 0x3c088908;
      auVar479._24_4_ = 0x3c088908;
      auVar479._28_4_ = 0x3c088908;
      auVar485._8_4_ = 0x3d2aa9c1;
      auVar485._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar485._12_4_ = 0x3d2aa9c1;
      auVar485._16_4_ = 0x3d2aa9c1;
      auVar485._20_4_ = 0x3d2aa9c1;
      auVar485._24_4_ = 0x3d2aa9c1;
      auVar485._28_4_ = 0x3d2aa9c1;
      auVar491._8_4_ = 0x3e2aaaaa;
      auVar491._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar491._12_4_ = 0x3e2aaaaa;
      auVar491._16_4_ = 0x3e2aaaaa;
      auVar491._20_4_ = 0x3e2aaaaa;
      auVar491._24_4_ = 0x3e2aaaaa;
      auVar491._28_4_ = 0x3e2aaaaa;
      auVar497._8_4_ = 0x3f800000;
      auVar497._0_8_ = 0x3f8000003f800000;
      auVar497._12_4_ = 0x3f800000;
      auVar497._16_4_ = 0x3f800000;
      auVar497._20_4_ = 0x3f800000;
      auVar497._24_4_ = 0x3f800000;
      auVar497._28_4_ = 0x3f800000;
      auVar503._8_4_ = 0xb95e8083;
      auVar503._0_8_ = 0xb95e8083b95e8083;
      auVar503._12_4_ = 0xb95e8083;
      auVar503._16_4_ = 0xb95e8083;
      auVar503._20_4_ = 0xb95e8083;
      auVar503._24_4_ = 0xb95e8083;
      auVar503._28_4_ = 0xb95e8083;
      auVar241 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
      auVar262 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar263 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar264 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar265 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar266 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar267 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar268 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar269 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar270 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar271 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar272 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      do {
        if (0 < local_158.h) {
          iVar155 = bottom_blob->w;
          iVar180 = bottom_blob->h;
          ppp_Var170 = (_func_int ***)
                       ((long)(_func_int ***)local_158.data +
                       local_158.cstep * local_228 * local_158.elemsize);
          uVar164 = bottom_blob->c;
          local_98._0_8_ = local_228 * 0x20;
          iVar151 = 0;
          do {
            if (0 < local_158.w) {
              uVar166 = 0;
              iVar152 = (1 - uVar12) * iVar182;
              do {
                if (lVar175 == 0) {
                  auVar292 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar292 = ZEXT3264(*(undefined1 (*) [32])(lVar175 + local_228 * 0x20));
                }
                if (0 < (int)uVar164) {
                  pvVar179 = (void *)((this->weight_data_tm).cstep * local_228 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  uVar160 = 0;
                  do {
                    if (0 < (int)uVar163) {
                      uVar177 = 0;
                      uVar176 = 0;
                      do {
                        iVar153 = (((int)uVar176 - uVar163) + 1) * iVar11 + iVar151;
                        if ((((-1 < iVar153) &&
                             (iVar154 = iVar153 / iVar181, iVar153 % iVar181 == 0)) &&
                            (iVar154 < iVar180)) && (0 < (int)uVar12)) {
                          uVar171 = uVar177;
                          uVar172 = (ulong)uVar12;
                          iVar153 = iVar152;
                          do {
                            if (((-1 < iVar153) &&
                                (iVar156 = iVar153 / iVar158, iVar153 % iVar158 == 0)) &&
                               (iVar156 < iVar155)) {
                              uVar13 = *(undefined4 *)
                                        ((long)bottom_blob->data +
                                        (long)iVar156 * 4 +
                                        (long)iVar154 * (long)bottom_blob->w * bottom_blob->elemsize
                                        + bottom_blob->cstep * bottom_blob->elemsize * uVar160);
                              auVar440._4_4_ = uVar13;
                              auVar440._0_4_ = uVar13;
                              auVar440._8_4_ = uVar13;
                              auVar440._12_4_ = uVar13;
                              auVar440._16_4_ = uVar13;
                              auVar440._20_4_ = uVar13;
                              auVar440._24_4_ = uVar13;
                              auVar440._28_4_ = uVar13;
                              auVar186 = vfmadd231ps_fma(auVar292._0_32_,auVar440,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar179 +
                                                          (uVar171 & 0xffffffff) * 4));
                              auVar292 = ZEXT1664(auVar186);
                            }
                            uVar171 = uVar171 + 8;
                            iVar153 = iVar153 + iVar182;
                            uVar172 = uVar172 - 1;
                          } while (uVar172 != 0);
                        }
                        uVar176 = uVar176 + 1;
                        uVar177 = uVar177 + (ulong)uVar12 * 8;
                      } while (uVar176 != uVar163);
                    }
                    pvVar179 = (void *)((long)pvVar179 + (long)(int)(uVar12 * uVar163 * 8) * 4);
                    uVar160 = uVar160 + 1;
                  } while (uVar160 != uVar164);
                }
                auVar273 = auVar292._0_32_;
                if (iVar174 - 1U < 6) {
                  auVar242 = ZEXT1632(ZEXT816(0) << 0x40);
                  auVar375._28_36_ = auVar292._28_36_;
                  switch(iVar174) {
                  case 1:
                    auVar273 = vmaxps_avx(auVar273,ZEXT1632(ZEXT816(0) << 0x40));
                    break;
                  case 2:
                    auVar243 = vmaxps_avx(auVar273,auVar242);
                    auVar273 = vminps_avx(auVar273,auVar242);
                    uVar13 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                    auVar121._4_4_ = uVar13;
                    auVar121._0_4_ = uVar13;
                    auVar121._8_4_ = uVar13;
                    auVar121._12_4_ = uVar13;
                    auVar121._16_4_ = uVar13;
                    auVar121._20_4_ = uVar13;
                    auVar121._24_4_ = uVar13;
                    auVar121._28_4_ = uVar13;
                    auVar273 = vfmadd132ps_avx512vl(auVar273,auVar243,auVar121);
                    break;
                  case 3:
                    uVar13 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                    auVar119._4_4_ = uVar13;
                    auVar119._0_4_ = uVar13;
                    auVar119._8_4_ = uVar13;
                    auVar119._12_4_ = uVar13;
                    auVar119._16_4_ = uVar13;
                    auVar119._20_4_ = uVar13;
                    auVar119._24_4_ = uVar13;
                    auVar119._28_4_ = uVar13;
                    auVar273 = vmaxps_avx512vl(auVar273,auVar119);
                    uVar13 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var161))[1];
                    auVar120._4_4_ = uVar13;
                    auVar120._0_4_ = uVar13;
                    auVar120._8_4_ = uVar13;
                    auVar120._12_4_ = uVar13;
                    auVar120._16_4_ = uVar13;
                    auVar120._20_4_ = uVar13;
                    auVar120._24_4_ = uVar13;
                    auVar120._28_4_ = uVar13;
                    auVar273 = vminps_avx512vl(auVar273,auVar120);
                    break;
                  case 4:
                    auVar117._8_4_ = 0x80000000;
                    auVar117._0_8_ = 0x8000000080000000;
                    auVar117._12_4_ = 0x80000000;
                    auVar117._16_4_ = 0x80000000;
                    auVar117._20_4_ = 0x80000000;
                    auVar117._24_4_ = 0x80000000;
                    auVar117._28_4_ = 0x80000000;
                    auVar273 = vxorps_avx512vl(auVar273,auVar117);
                    auVar273 = vminps_avx(auVar273,auVar383);
                    auVar273 = vmaxps_avx(auVar273,auVar390);
                    auVar186 = vfmadd231ps_fma(auVar396,auVar273,auVar402);
                    auVar242 = vrndscaleps_avx512vl(ZEXT1632(auVar186),1);
                    uVar160 = vcmpps_avx512vl(ZEXT1632(auVar186),auVar242,1);
                    auVar243 = vsubps_avx512vl(auVar242,auVar408);
                    bVar24 = (bool)((byte)uVar160 & 1);
                    auVar291._0_4_ = (uint)bVar24 * auVar243._0_4_ | (uint)!bVar24 * auVar242._0_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                    auVar291._4_4_ = (uint)bVar24 * auVar243._4_4_ | (uint)!bVar24 * auVar242._4_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                    auVar291._8_4_ = (uint)bVar24 * auVar243._8_4_ | (uint)!bVar24 * auVar242._8_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                    auVar291._12_4_ =
                         (uint)bVar24 * auVar243._12_4_ | (uint)!bVar24 * auVar242._12_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                    auVar291._16_4_ =
                         (uint)bVar24 * auVar243._16_4_ | (uint)!bVar24 * auVar242._16_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                    auVar291._20_4_ =
                         (uint)bVar24 * auVar243._20_4_ | (uint)!bVar24 * auVar242._20_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                    auVar291._24_4_ =
                         (uint)bVar24 * auVar243._24_4_ | (uint)!bVar24 * auVar242._24_4_;
                    bVar24 = SUB81(uVar160 >> 7,0);
                    auVar291._28_4_ =
                         (uint)bVar24 * auVar243._28_4_ | (uint)!bVar24 * auVar242._28_4_;
                    in_ZMM16 = ZEXT3264(auVar291);
                    auVar273 = vfmsub231ps_avx512vl(auVar273,auVar291,auVar414);
                    auVar118._8_4_ = 0x395e8083;
                    auVar118._0_8_ = 0x395e8083395e8083;
                    auVar118._12_4_ = 0x395e8083;
                    auVar118._16_4_ = 0x395e8083;
                    auVar118._20_4_ = 0x395e8083;
                    auVar118._24_4_ = 0x395e8083;
                    auVar118._28_4_ = 0x395e8083;
                    auVar273 = vfmsub231ps_avx512vl(auVar273,auVar291,auVar118);
                    auVar441._0_4_ = auVar273._0_4_ * auVar273._0_4_;
                    auVar441._4_4_ = auVar273._4_4_ * auVar273._4_4_;
                    auVar441._8_4_ = auVar273._8_4_ * auVar273._8_4_;
                    auVar441._12_4_ = auVar273._12_4_ * auVar273._12_4_;
                    auVar441._16_4_ = auVar273._16_4_ * auVar273._16_4_;
                    auVar441._20_4_ = auVar273._20_4_ * auVar273._20_4_;
                    auVar441._24_4_ = auVar273._24_4_ * auVar273._24_4_;
                    auVar441._28_4_ = 0;
                    auVar186 = vfmadd213ps_fma(auVar240,auVar273,auVar473);
                    auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),auVar273,auVar479);
                    auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),auVar273,auVar485);
                    auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),auVar273,auVar491);
                    auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),auVar273,auVar396);
                    auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),auVar441,auVar273);
                    in_ZMM9 = ZEXT1664(auVar186);
                    auVar442._0_4_ = auVar186._0_4_ + 1.0;
                    auVar442._4_4_ = auVar186._4_4_ + 1.0;
                    auVar442._8_4_ = auVar186._8_4_ + 1.0;
                    auVar442._12_4_ = auVar186._12_4_ + 1.0;
                    auVar442._16_4_ = 0x3f800000;
                    auVar442._20_4_ = 0x3f800000;
                    auVar442._24_4_ = 0x3f800000;
                    auVar442._28_4_ = 0x3f800000;
                    auVar273 = vcvttps2dq_avx512vl(auVar291);
                    auVar273 = vpslld_avx2(auVar273,0x17);
                    auVar273 = vpaddd_avx2(auVar497,auVar273);
                    auVar186 = vfmadd213ps_fma(auVar273,auVar442,auVar408);
                    auVar273 = vrcpps_avx(ZEXT1632(auVar186));
                    auVar186 = vfmsub213ps_fma(ZEXT1632(auVar186),auVar273,auVar408);
                    auVar186 = vfnmadd132ps_fma(ZEXT1632(auVar186),auVar273,auVar273);
                    auVar273 = ZEXT1632(auVar186);
                    break;
                  case 5:
                    auVar273 = vminps_avx(auVar273,auVar383);
                    auVar273 = vmaxps_avx(auVar273,auVar390);
                    auVar186 = vfmadd213ps_fma(auVar402,auVar273,auVar396);
                    auVar243 = vrndscaleps_avx512vl(ZEXT1632(auVar186),1);
                    uVar160 = vcmpps_avx512vl(ZEXT1632(auVar186),auVar243,1);
                    auVar244 = vsubps_avx512vl(auVar243,auVar408);
                    bVar24 = (bool)((byte)uVar160 & 1);
                    auVar286._0_4_ = (uint)bVar24 * auVar244._0_4_ | (uint)!bVar24 * auVar243._0_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                    auVar286._4_4_ = (uint)bVar24 * auVar244._4_4_ | (uint)!bVar24 * auVar243._4_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                    auVar286._8_4_ = (uint)bVar24 * auVar244._8_4_ | (uint)!bVar24 * auVar243._8_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                    auVar286._12_4_ =
                         (uint)bVar24 * auVar244._12_4_ | (uint)!bVar24 * auVar243._12_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                    auVar286._16_4_ =
                         (uint)bVar24 * auVar244._16_4_ | (uint)!bVar24 * auVar243._16_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                    auVar286._20_4_ =
                         (uint)bVar24 * auVar244._20_4_ | (uint)!bVar24 * auVar243._20_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                    auVar286._24_4_ =
                         (uint)bVar24 * auVar244._24_4_ | (uint)!bVar24 * auVar243._24_4_;
                    bVar24 = SUB81(uVar160 >> 7,0);
                    auVar286._28_4_ =
                         (uint)bVar24 * auVar244._28_4_ | (uint)!bVar24 * auVar243._28_4_;
                    auVar273 = vfmsub231ps_avx512vl(auVar273,auVar286,auVar414);
                    auVar273 = vfnmsub231ps_avx512vl(auVar273,auVar286,auVar503);
                    auVar465._0_4_ = auVar273._0_4_ * auVar273._0_4_;
                    auVar465._4_4_ = auVar273._4_4_ * auVar273._4_4_;
                    auVar465._8_4_ = auVar273._8_4_ * auVar273._8_4_;
                    auVar465._12_4_ = auVar273._12_4_ * auVar273._12_4_;
                    auVar465._16_4_ = auVar273._16_4_ * auVar273._16_4_;
                    auVar465._20_4_ = auVar273._20_4_ * auVar273._20_4_;
                    auVar465._24_4_ = auVar273._24_4_ * auVar273._24_4_;
                    auVar465._28_4_ = 0;
                    auVar243 = vfmadd213ps_avx512vl(auVar240,auVar273,auVar473);
                    auVar243 = vfmadd213ps_avx512vl(auVar243,auVar273,auVar479);
                    auVar243 = vfmadd213ps_avx512vl(auVar243,auVar273,auVar485);
                    auVar243 = vfmadd213ps_avx512vl(auVar243,auVar273,auVar491);
                    auVar243 = vfmadd213ps_avx512vl(auVar243,auVar273,auVar396);
                    auVar273 = vfmadd213ps_avx512vl(auVar243,auVar465,auVar273);
                    auVar243 = vaddps_avx512vl(auVar273,auVar408);
                    auVar273 = vcvttps2dq_avx512vl(auVar286);
                    auVar273 = vpslld_avx2(auVar273,0x17);
                    auVar273 = vpaddd_avx2(auVar273,auVar497);
                    auVar186 = vfmadd213ps_fma(auVar273,auVar243,auVar408);
                    uVar160 = vcmpps_avx512vl(ZEXT1632(auVar186),auVar242,2);
                    auVar114._8_4_ = 0x800000;
                    auVar114._0_8_ = 0x80000000800000;
                    auVar114._12_4_ = 0x800000;
                    auVar114._16_4_ = 0x800000;
                    auVar114._20_4_ = 0x800000;
                    auVar114._24_4_ = 0x800000;
                    auVar114._28_4_ = 0x800000;
                    auVar273 = vmaxps_avx512vl(ZEXT1632(auVar186),auVar114);
                    auVar244 = vpsrld_avx2(auVar273,0x17);
                    auVar242 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar115._8_4_ = 0x3f000000;
                    auVar115._0_8_ = 0x3f0000003f000000;
                    auVar115._12_4_ = 0x3f000000;
                    auVar115._16_4_ = 0x3f000000;
                    auVar115._20_4_ = 0x3f000000;
                    auVar115._24_4_ = 0x3f000000;
                    auVar115._28_4_ = 0x3f000000;
                    auVar273 = vpternlogd_avx512vl(auVar273,auVar242,auVar115,0xea);
                    uVar176 = vcmpps_avx512vl(auVar273,auVar241,1);
                    auVar242 = vaddps_avx512vl(auVar273,auVar262);
                    auVar273 = vaddps_avx512vl(auVar242,auVar273);
                    bVar24 = (bool)((byte)uVar176 & 1);
                    auVar287._0_4_ = (uint)bVar24 * auVar273._0_4_ | (uint)!bVar24 * auVar242._0_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 1) & 1);
                    auVar287._4_4_ = (uint)bVar24 * auVar273._4_4_ | (uint)!bVar24 * auVar242._4_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 2) & 1);
                    auVar287._8_4_ = (uint)bVar24 * auVar273._8_4_ | (uint)!bVar24 * auVar242._8_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 3) & 1);
                    auVar287._12_4_ =
                         (uint)bVar24 * auVar273._12_4_ | (uint)!bVar24 * auVar242._12_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 4) & 1);
                    auVar287._16_4_ =
                         (uint)bVar24 * auVar273._16_4_ | (uint)!bVar24 * auVar242._16_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 5) & 1);
                    auVar287._20_4_ =
                         (uint)bVar24 * auVar273._20_4_ | (uint)!bVar24 * auVar242._20_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 6) & 1);
                    auVar287._24_4_ =
                         (uint)bVar24 * auVar273._24_4_ | (uint)!bVar24 * auVar242._24_4_;
                    bVar24 = SUB81(uVar176 >> 7,0);
                    auVar287._28_4_ =
                         (uint)bVar24 * auVar273._28_4_ | (uint)!bVar24 * auVar242._28_4_;
                    auVar242 = vmulps_avx512vl(auVar287,auVar287);
                    auVar273 = vfmadd213ps_avx512vl(auVar263,auVar287,auVar264);
                    auVar273 = vfmadd213ps_avx512vl(auVar273,auVar287,auVar265);
                    auVar273 = vfmadd213ps_avx512vl(auVar273,auVar287,auVar266);
                    auVar273 = vfmadd213ps_avx512vl(auVar273,auVar287,auVar267);
                    auVar273 = vfmadd213ps_avx512vl(auVar273,auVar287,auVar268);
                    auVar273 = vfmadd213ps_avx512vl(auVar273,auVar287,auVar269);
                    auVar273 = vfmadd213ps_avx512vl(auVar273,auVar287,auVar270);
                    auVar273 = vfmadd213ps_avx512vl(auVar273,auVar287,auVar271);
                    auVar243 = vmulps_avx512vl(auVar242,auVar287);
                    auVar243 = vmulps_avx512vl(auVar243,auVar273);
                    auVar116._8_4_ = 0xffffff82;
                    auVar116._0_8_ = 0xffffff82ffffff82;
                    auVar116._12_4_ = 0xffffff82;
                    auVar116._16_4_ = 0xffffff82;
                    auVar116._20_4_ = 0xffffff82;
                    auVar116._24_4_ = 0xffffff82;
                    auVar116._28_4_ = 0xffffff82;
                    auVar273 = vpaddd_avx512vl(auVar244,auVar116);
                    auVar273 = vcvtdq2ps_avx(auVar273);
                    auVar244 = vsubps_avx512vl(auVar273,auVar408);
                    bVar24 = (bool)((byte)uVar176 & 1);
                    auVar288._0_4_ = (uint)bVar24 * auVar244._0_4_ | (uint)!bVar24 * auVar273._0_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 1) & 1);
                    auVar288._4_4_ = (uint)bVar24 * auVar244._4_4_ | (uint)!bVar24 * auVar273._4_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 2) & 1);
                    auVar288._8_4_ = (uint)bVar24 * auVar244._8_4_ | (uint)!bVar24 * auVar273._8_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 3) & 1);
                    auVar288._12_4_ =
                         (uint)bVar24 * auVar244._12_4_ | (uint)!bVar24 * auVar273._12_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 4) & 1);
                    auVar288._16_4_ =
                         (uint)bVar24 * auVar244._16_4_ | (uint)!bVar24 * auVar273._16_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 5) & 1);
                    auVar288._20_4_ =
                         (uint)bVar24 * auVar244._20_4_ | (uint)!bVar24 * auVar273._20_4_;
                    bVar24 = (bool)((byte)(uVar176 >> 6) & 1);
                    auVar288._24_4_ =
                         (uint)bVar24 * auVar244._24_4_ | (uint)!bVar24 * auVar273._24_4_;
                    bVar24 = SUB81(uVar176 >> 7,0);
                    auVar288._28_4_ =
                         (uint)bVar24 * auVar244._28_4_ | (uint)!bVar24 * auVar273._28_4_;
                    auVar273 = vfmadd231ps_avx512vl(auVar243,auVar288,auVar503);
                    auVar273 = vfmsub231ps_avx512vl(auVar273,auVar396,auVar242);
                    auVar273 = vsubps_avx512vl(auVar273,auVar287);
                    auVar186 = vfmsub231ps_fma(auVar273,auVar414,auVar288);
                    auVar273 = vmulps_avx512vl(ZEXT1632(auVar186),auVar272);
                    auVar242 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar24 = (bool)((byte)uVar160 & 1);
                    auVar289._0_4_ = (uint)bVar24 * auVar242._0_4_ | (uint)!bVar24 * auVar273._0_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                    auVar289._4_4_ = (uint)bVar24 * auVar242._4_4_ | (uint)!bVar24 * auVar273._4_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                    auVar289._8_4_ = (uint)bVar24 * auVar242._8_4_ | (uint)!bVar24 * auVar273._8_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                    auVar289._12_4_ =
                         (uint)bVar24 * auVar242._12_4_ | (uint)!bVar24 * auVar273._12_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                    auVar289._16_4_ =
                         (uint)bVar24 * auVar242._16_4_ | (uint)!bVar24 * auVar273._16_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                    auVar289._20_4_ =
                         (uint)bVar24 * auVar242._20_4_ | (uint)!bVar24 * auVar273._20_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                    auVar289._24_4_ =
                         (uint)bVar24 * auVar242._24_4_ | (uint)!bVar24 * auVar273._24_4_;
                    bVar24 = SUB81(uVar160 >> 7,0);
                    auVar289._28_4_ =
                         (uint)bVar24 * auVar242._28_4_ | (uint)!bVar24 * auVar273._28_4_;
                    auVar273 = vminps_avx(auVar289,auVar383);
                    auVar273 = vmaxps_avx(auVar273,auVar390);
                    auVar186 = vfmadd213ps_fma(auVar402,auVar273,auVar396);
                    auVar242 = vrndscaleps_avx512vl(ZEXT1632(auVar186),1);
                    uVar160 = vcmpps_avx512vl(ZEXT1632(auVar186),auVar242,1);
                    auVar243 = vsubps_avx512vl(auVar242,auVar408);
                    bVar24 = (bool)((byte)uVar160 & 1);
                    auVar290._0_4_ = (uint)bVar24 * auVar243._0_4_ | (uint)!bVar24 * auVar242._0_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                    auVar290._4_4_ = (uint)bVar24 * auVar243._4_4_ | (uint)!bVar24 * auVar242._4_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                    auVar290._8_4_ = (uint)bVar24 * auVar243._8_4_ | (uint)!bVar24 * auVar242._8_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                    auVar290._12_4_ =
                         (uint)bVar24 * auVar243._12_4_ | (uint)!bVar24 * auVar242._12_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 4) & 1);
                    auVar290._16_4_ =
                         (uint)bVar24 * auVar243._16_4_ | (uint)!bVar24 * auVar242._16_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 5) & 1);
                    auVar290._20_4_ =
                         (uint)bVar24 * auVar243._20_4_ | (uint)!bVar24 * auVar242._20_4_;
                    bVar24 = (bool)((byte)(uVar160 >> 6) & 1);
                    auVar290._24_4_ =
                         (uint)bVar24 * auVar243._24_4_ | (uint)!bVar24 * auVar242._24_4_;
                    bVar24 = SUB81(uVar160 >> 7,0);
                    auVar290._28_4_ =
                         (uint)bVar24 * auVar243._28_4_ | (uint)!bVar24 * auVar242._28_4_;
                    in_ZMM16 = ZEXT3264(auVar290);
                    auVar273 = vfmsub231ps_avx512vl(auVar273,auVar290,auVar414);
                    auVar273 = vfnmsub231ps_avx512vl(auVar273,auVar290,auVar503);
                    auVar466._0_4_ = auVar273._0_4_ * auVar273._0_4_;
                    auVar466._4_4_ = auVar273._4_4_ * auVar273._4_4_;
                    auVar466._8_4_ = auVar273._8_4_ * auVar273._8_4_;
                    auVar466._12_4_ = auVar273._12_4_ * auVar273._12_4_;
                    auVar466._16_4_ = auVar273._16_4_ * auVar273._16_4_;
                    auVar466._20_4_ = auVar273._20_4_ * auVar273._20_4_;
                    auVar466._24_4_ = auVar273._24_4_ * auVar273._24_4_;
                    auVar466._28_4_ = 0;
                    auVar242 = vfmadd213ps_avx512vl(auVar240,auVar273,auVar473);
                    auVar242 = vfmadd213ps_avx512vl(auVar242,auVar273,auVar479);
                    auVar242 = vfmadd213ps_avx512vl(auVar242,auVar273,auVar485);
                    auVar242 = vfmadd213ps_avx512vl(auVar242,auVar273,auVar491);
                    auVar242 = vfmadd213ps_avx512vl(auVar242,auVar273,auVar396);
                    auVar273 = vfmadd213ps_avx512vl(auVar242,auVar466,auVar273);
                    in_ZMM17 = ZEXT3264(auVar273);
                    auVar242 = vaddps_avx512vl(auVar273,auVar408);
                    auVar273 = vcvttps2dq_avx512vl(auVar290);
                    auVar273 = vpslld_avx2(auVar273,0x17);
                    auVar273 = vpaddd_avx2(auVar273,auVar497);
                    auVar186 = vfmadd213ps_fma(auVar273,auVar242,auVar408);
                    auVar273 = vrcpps_avx(ZEXT1632(auVar186));
                    auVar186 = vfmsub213ps_fma(ZEXT1632(auVar186),auVar273,auVar408);
                    auVar186 = vfnmadd132ps_fma(ZEXT1632(auVar186),auVar273,auVar273);
                    auVar273 = vfnmadd213ps_avx512vl(ZEXT1632(auVar186),auVar272,auVar262);
                    in_ZMM9 = ZEXT3264(auVar273);
                    auVar375._0_4_ = auVar273._0_4_ * auVar292._0_4_;
                    auVar375._4_4_ = auVar273._4_4_ * auVar292._4_4_;
                    auVar375._8_4_ = auVar273._8_4_ * auVar292._8_4_;
                    auVar375._12_4_ = auVar273._12_4_ * auVar292._12_4_;
                    auVar375._16_4_ = auVar273._16_4_ * auVar292._16_4_;
                    auVar375._20_4_ = auVar273._20_4_ * auVar292._20_4_;
                    auVar375._24_4_ = auVar273._24_4_ * auVar292._24_4_;
                    auVar273 = auVar375._0_32_;
                    break;
                  case 6:
                    uVar13 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                    auVar443._4_4_ = uVar13;
                    auVar443._0_4_ = uVar13;
                    auVar443._8_4_ = uVar13;
                    auVar443._12_4_ = uVar13;
                    auVar443._16_4_ = uVar13;
                    auVar443._20_4_ = uVar13;
                    auVar443._24_4_ = uVar13;
                    auVar443._28_4_ = uVar13;
                    uVar13 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var161))[1];
                    auVar113._4_4_ = uVar13;
                    auVar113._0_4_ = uVar13;
                    auVar113._8_4_ = uVar13;
                    auVar113._12_4_ = uVar13;
                    auVar113._16_4_ = uVar13;
                    auVar113._20_4_ = uVar13;
                    auVar113._24_4_ = uVar13;
                    auVar113._28_4_ = uVar13;
                    auVar273 = vfmadd213ps_avx512vl(auVar443,auVar273,auVar113);
                    auVar273 = vmaxps_avx(auVar273,auVar242);
                    auVar273 = vminps_avx(auVar273,auVar408);
                    auVar376._0_4_ = auVar273._0_4_ * auVar292._0_4_;
                    auVar376._4_4_ = auVar273._4_4_ * auVar292._4_4_;
                    auVar376._8_4_ = auVar273._8_4_ * auVar292._8_4_;
                    auVar376._12_4_ = auVar273._12_4_ * auVar292._12_4_;
                    auVar376._16_4_ = auVar273._16_4_ * auVar292._16_4_;
                    auVar376._20_4_ = auVar273._20_4_ * auVar292._20_4_;
                    auVar376._24_4_ = auVar273._24_4_ * auVar292._24_4_;
                    auVar376._28_36_ = auVar375._28_36_;
                    auVar273 = auVar376._0_32_;
                  }
                }
                *(undefined1 (*) [32])ppp_Var170 = auVar273;
                ppp_Var170 = ppp_Var170 + 4;
                uVar166 = uVar166 + 1;
                iVar152 = iVar152 + 1;
              } while (uVar166 != local_158.w);
            }
            iVar151 = iVar151 + 1;
          } while (iVar151 != local_158.h);
        }
        local_228 = local_228 + 1;
      } while (local_228 != local_158.c);
    }
    local_170 = uVar162 ^ 1;
    if ((uVar10 == 8 && uVar162 == 1) && (local_a8 = (long)local_158.c, 0 < local_a8)) {
      p_Var161 = pp_Var168[-3];
      iVar182 = *(int *)(&this->field_0xdc + (long)p_Var161);
      iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var161);
      iVar158 = *(int *)(&this->field_0xe4 + (long)p_Var161);
      iVar181 = *(int *)(&this->field_0xe8 + (long)p_Var161);
      iVar174 = *(int *)(&this->field_0x114 + (long)p_Var161);
      lVar175 = *(long *)(&this->field_0x1a8 + (long)p_Var161);
      uVar162 = *(uint *)(&this->field_0xd4 + (long)p_Var161);
      uVar12 = *(uint *)(&this->field_0xd8 + (long)p_Var161);
      local_50 = (Allocator *)local_158.data;
      local_40 = local_158.elemsize * local_158.cstep;
      iVar155 = bottom_blob->w;
      iVar180 = bottom_blob->h;
      uVar163 = bottom_blob->c;
      local_228 = 0;
      do {
        if (0 < iVar9) {
          local_200 = (_func_int ***)((long)&local_50->_vptr_Allocator + local_40 * local_228);
          local_98._0_8_ =
               (void *)((this->weight_data_tm).cstep * local_228 * (this->weight_data_tm).elemsize +
                       (long)(this->weight_data_tm).data);
          iVar151 = 0;
          do {
            if (0 < iVar8) {
              iVar153 = bottom_blob->w;
              pvVar179 = bottom_blob->data;
              sVar16 = bottom_blob->elemsize;
              sVar17 = bottom_blob->cstep;
              local_e8._0_8_ = *(undefined8 *)(&this->field_0x118 + (long)p_Var161);
              uVar164 = 0;
              iVar152 = (1 - uVar162) * iVar182;
              do {
                if (lVar175 == 0) {
                  fVar362 = 0.0;
                }
                else {
                  fVar362 = *(float *)(lVar175 + local_228 * 4);
                }
                if ((int)uVar163 < 1) {
                  auVar240 = SUB6432(ZEXT864(0),0);
                }
                else {
                  auVar292 = ZEXT864(0);
                  uVar160 = 0;
                  lVar167 = local_98._0_8_;
                  do {
                    if (0 < (int)uVar12) {
                      uVar177 = 0;
                      uVar176 = 0;
                      do {
                        iVar154 = (((int)uVar176 - uVar12) + 1) * iVar11 + iVar151;
                        if ((((-1 < iVar154) &&
                             (iVar156 = iVar154 / iVar181, iVar154 % iVar181 == 0)) &&
                            (0 < (int)uVar162)) && (iVar156 < iVar180)) {
                          uVar171 = (ulong)uVar162;
                          uVar172 = uVar177;
                          iVar154 = iVar152;
                          do {
                            if (((-1 < iVar154) &&
                                (iVar157 = iVar154 / iVar158, iVar154 % iVar158 == 0)) &&
                               (iVar157 < iVar155)) {
                              auVar186 = vfmadd231ps_fma(auVar292._0_32_,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar179 +
                                                          (long)(iVar157 << 3) * 4 +
                                                          (long)iVar156 * (long)iVar153 * sVar16 +
                                                          sVar17 * sVar16 * uVar160),
                                                         *(undefined1 (*) [32])
                                                          (lVar167 + (uVar172 & 0xffffffff) * 4));
                              auVar292 = ZEXT1664(auVar186);
                            }
                            uVar172 = uVar172 + 8;
                            iVar154 = iVar154 + iVar182;
                            uVar171 = uVar171 - 1;
                          } while (uVar171 != 0);
                        }
                        uVar176 = uVar176 + 1;
                        uVar177 = uVar177 + (ulong)uVar162 * 8;
                      } while (uVar176 != uVar12);
                    }
                    auVar240 = auVar292._0_32_;
                    lVar167 = lVar167 + (long)(int)(uVar162 * uVar12 * 8) * 4;
                    uVar160 = uVar160 + 1;
                  } while (uVar160 != uVar163);
                }
                auVar364._0_4_ = auVar240._16_4_ + auVar240._0_4_;
                auVar364._4_4_ = auVar240._20_4_ + auVar240._4_4_;
                auVar364._8_4_ = auVar240._24_4_ + auVar240._8_4_;
                auVar364._12_4_ = auVar240._28_4_ + auVar240._12_4_;
                auVar186 = vshufpd_avx(auVar364,auVar364,1);
                auVar365._0_4_ = auVar186._0_4_ + auVar364._0_4_;
                auVar365._4_4_ = auVar186._4_4_ + auVar364._4_4_;
                auVar365._8_4_ = auVar186._8_4_ + auVar364._8_4_;
                auVar365._12_4_ = auVar186._12_4_ + auVar364._12_4_;
                auVar186 = vmovshdup_avx(auVar365);
                fVar362 = auVar186._0_4_ + fVar362 + auVar365._0_4_;
                auVar186 = ZEXT416((uint)fVar362);
                fVar377 = fVar362;
                if (iVar174 - 1U < 6) {
                  switch(iVar174) {
                  case 1:
                    auVar186 = vmaxss_avx(ZEXT416((uint)fVar362),ZEXT416(0));
                    fVar377 = auVar186._0_4_;
                    break;
                  case 2:
                    uVar165 = vcmpss_avx512f(ZEXT416((uint)fVar362),ZEXT416(0),0xe);
                    bVar24 = (bool)((byte)uVar165 & 1);
                    fVar377 = (float)((uint)bVar24 * 0x3f800000 +
                                     (uint)!bVar24 * (int)*(float *)local_e8._0_8_) * fVar362;
                    break;
                  case 3:
                    auVar186 = vmaxss_avx(auVar186,ZEXT416((uint)*(float *)local_e8._0_8_));
                    fVar377 = auVar186._0_4_;
                    if (*(float *)(local_e8._0_8_ + 4) < auVar186._0_4_) {
                      fVar377 = *(float *)(local_e8._0_8_ + 4);
                    }
                    break;
                  case 4:
                    auVar186 = vminss_avx(auVar186,SUB6416(ZEXT464(0x42b0c0a5),0));
                    auVar64._8_4_ = 0x80000000;
                    auVar64._0_8_ = 0x8000000080000000;
                    auVar64._12_4_ = 0x80000000;
                    auVar187 = vxorps_avx512vl(auVar186,auVar64);
                    uVar165 = vcmpss_avx512f(auVar186,ZEXT416(0xc2b0c0a5),1);
                    bVar24 = (bool)((byte)uVar165 & 1);
                    in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                    fVar362 = expf((float)((uint)bVar24 * 0x42b0c0a5 +
                                          (uint)!bVar24 * auVar187._0_4_));
                    fVar377 = 1.0 / (fVar362 + 1.0);
                    break;
                  case 5:
                    in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                    fVar377 = expf(fVar362);
                    fVar377 = logf(fVar377 + 1.0);
                    fVar377 = tanhf(fVar377);
                    fVar377 = fVar377 * fVar362;
                    break;
                  case 6:
                    fVar3 = *(float *)local_e8._0_8_;
                    auVar63._8_4_ = 0x80000000;
                    auVar63._0_8_ = 0x8000000080000000;
                    auVar63._12_4_ = 0x80000000;
                    auVar187 = vxorps_avx512vl(ZEXT416((uint)*(float *)(local_e8._0_8_ + 4)),auVar63
                                              );
                    fVar384 = auVar187._0_4_ / fVar3;
                    fVar377 = 0.0;
                    if ((fVar384 <= fVar362) &&
                       (fVar377 = fVar362, fVar362 <= fVar384 + 1.0 / fVar3)) {
                      auVar186 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar186,
                                                 ZEXT416((uint)*(float *)(local_e8._0_8_ + 4)));
                      fVar377 = auVar186._0_4_ * fVar362;
                    }
                  }
                }
                *(float *)local_200 = fVar377;
                local_200 = (_func_int ***)((long)local_200 + 4);
                uVar164 = uVar164 + 1;
                iVar152 = iVar152 + 1;
              } while (uVar164 != iVar8);
            }
            iVar151 = iVar151 + 1;
          } while (iVar151 != iVar9);
        }
        local_228 = local_228 + 1;
      } while (local_228 != local_a8);
    }
    iVar9 = local_158.h;
    iVar8 = local_158.w;
    pvVar179 = local_158.data;
    if ((uVar10 == 4 && local_a0 == 0) && (0 < (long)local_158.c)) {
      p_Var161 = pp_Var168[-3];
      iVar182 = *(int *)(&this->field_0xdc + (long)p_Var161);
      iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var161);
      iVar158 = *(int *)(&this->field_0xe4 + (long)p_Var161);
      iVar181 = *(int *)(&this->field_0xe8 + (long)p_Var161);
      uVar13 = *(undefined4 *)(&this->field_0x114 + (long)p_Var161);
      lVar175 = *(long *)(&this->field_0x1a8 + (long)p_Var161);
      uVar162 = *(uint *)(&this->field_0xd4 + (long)p_Var161);
      local_e8._0_8_ = p_Var161;
      uVar12 = *(uint *)(&this->field_0xd8 + (long)p_Var161);
      local_228 = 0;
      auVar217 = ZEXT816(0) << 0x40;
      auVar379._8_4_ = 0x42b0c0a5;
      auVar379._0_8_ = 0x42b0c0a542b0c0a5;
      auVar379._12_4_ = 0x42b0c0a5;
      auVar386._8_4_ = 0xc2b0c0a5;
      auVar386._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar386._12_4_ = 0xc2b0c0a5;
      auVar392._8_4_ = 0x3f000000;
      auVar392._0_8_ = 0x3f0000003f000000;
      auVar392._12_4_ = 0x3f000000;
      auVar398._8_4_ = 0x3fb8aa3b;
      auVar398._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar398._12_4_ = 0x3fb8aa3b;
      auVar404._8_4_ = 0x3f800000;
      auVar404._0_8_ = 0x3f8000003f800000;
      auVar404._12_4_ = 0x3f800000;
      auVar410._8_4_ = 0x3f318000;
      auVar410._0_8_ = 0x3f3180003f318000;
      auVar410._12_4_ = 0x3f318000;
      auVar186 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar469._8_4_ = 0x3ab743ce;
      auVar469._0_8_ = 0x3ab743ce3ab743ce;
      auVar469._12_4_ = 0x3ab743ce;
      auVar475._8_4_ = 0x3c088908;
      auVar475._0_8_ = 0x3c0889083c088908;
      auVar475._12_4_ = 0x3c088908;
      auVar481._8_4_ = 0x3d2aa9c1;
      auVar481._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar481._12_4_ = 0x3d2aa9c1;
      auVar487._8_4_ = 0x3e2aaaaa;
      auVar487._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar487._12_4_ = 0x3e2aaaaa;
      auVar493._8_4_ = 0x3f800000;
      auVar493._0_8_ = 0x3f8000003f800000;
      auVar493._12_4_ = 0x3f800000;
      auVar499._8_4_ = 0xb95e8083;
      auVar499._0_8_ = 0xb95e8083b95e8083;
      auVar499._12_4_ = 0xb95e8083;
      auVar187 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
      auVar188 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar209 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar210 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar211 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar212 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar213 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar214 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar215 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar227 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar220 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar216 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        if (0 < local_158.h) {
          iVar174 = bottom_blob->w;
          iVar155 = bottom_blob->h;
          ppp_Var170 = (_func_int ***)
                       ((long)(_func_int ***)local_158.data +
                       local_158.cstep * local_228 * local_158.elemsize);
          uVar163 = bottom_blob->c;
          local_98._0_8_ = local_228 * 0x10;
          iVar180 = 0;
          do {
            if (0 < local_158.w) {
              uVar164 = 0;
              iVar151 = (1 - uVar162) * iVar182;
              do {
                if (lVar175 == 0) {
                  auVar218 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar218 = *(undefined1 (*) [16])(lVar175 + local_228 * 0x10);
                }
                auVar292 = ZEXT1664(auVar218);
                if (0 < (int)uVar163) {
                  pvVar178 = (void *)((this->weight_data_tm).cstep * local_228 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar15 = bottom_blob->data;
                  uVar160 = 0;
                  do {
                    if (0 < (int)uVar12) {
                      uVar176 = 0;
                      uVar177 = 0;
                      do {
                        iVar152 = (((int)uVar177 - uVar12) + 1) * iVar11 + iVar180;
                        if ((((-1 < iVar152) &&
                             (iVar153 = iVar152 / iVar181, iVar152 % iVar181 == 0)) &&
                            (0 < (int)uVar162)) && (iVar153 < iVar155)) {
                          lVar167 = (long)iVar153 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar160;
                          uVar171 = uVar176;
                          uVar172 = (ulong)uVar162;
                          iVar152 = iVar151;
                          do {
                            if (((-1 < iVar152) &&
                                (iVar153 = iVar152 / iVar158, iVar152 % iVar158 == 0)) &&
                               (iVar153 < iVar174)) {
                              lVar159 = (long)(iVar153 << 2);
                              uVar2 = *(undefined4 *)((long)pvVar15 + lVar159 * 4 + lVar167);
                              auVar422._4_4_ = uVar2;
                              auVar422._0_4_ = uVar2;
                              auVar422._8_4_ = uVar2;
                              auVar422._12_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar15 + lVar159 * 4 + lVar167 + 4);
                              auVar450._4_4_ = uVar2;
                              auVar450._0_4_ = uVar2;
                              auVar450._8_4_ = uVar2;
                              auVar450._12_4_ = uVar2;
                              in_ZMM9 = ZEXT1664(auVar450);
                              auVar219 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 8)));
                              in_ZMM16 = ZEXT1664(auVar219);
                              auVar189 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar15 +
                                                                     lVar159 * 4 + lVar167 + 0xc)));
                              in_ZMM17 = ZEXT1664(auVar189);
                              uVar184 = uVar171 & 0xffffffff;
                              auVar218 = vfmadd231ps_fma(auVar292._0_16_,auVar422,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar178 + uVar184 * 4));
                              auVar218 = vfmadd231ps_fma(auVar218,auVar450,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar178 + uVar184 * 4 + 0x10));
                              auVar218 = vfmadd231ps_avx512vl
                                                   (auVar218,auVar219,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar178 + uVar184 * 4 + 0x20));
                              auVar218 = vfmadd231ps_avx512vl
                                                   (auVar218,auVar189,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar178 + uVar184 * 4 + 0x30));
                              auVar292 = ZEXT1664(auVar218);
                            }
                            uVar171 = uVar171 + 0x10;
                            iVar152 = iVar152 + iVar182;
                            uVar172 = uVar172 - 1;
                          } while (uVar172 != 0);
                        }
                        uVar177 = uVar177 + 1;
                        uVar176 = uVar176 + (ulong)uVar162 * 0x10;
                      } while (uVar177 != uVar12);
                    }
                    auVar218 = auVar292._0_16_;
                    pvVar178 = (void *)((long)pvVar178 + (long)(int)(uVar162 * uVar12 * 0x10) * 4);
                    uVar160 = uVar160 + 1;
                  } while (uVar160 != uVar163);
                }
                switch(uVar13) {
                case 1:
                  auVar218 = vmaxps_avx(auVar218,auVar217);
                  break;
                case 2:
                  auVar219 = vmaxps_avx(auVar218,auVar217);
                  auVar218 = vminps_avx(auVar218,auVar217);
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                  auVar73._4_4_ = uVar2;
                  auVar73._0_4_ = uVar2;
                  auVar73._8_4_ = uVar2;
                  auVar73._12_4_ = uVar2;
                  auVar218 = vfmadd132ps_avx512vl(auVar218,auVar219,auVar73);
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                  auVar71._4_4_ = uVar2;
                  auVar71._0_4_ = uVar2;
                  auVar71._8_4_ = uVar2;
                  auVar71._12_4_ = uVar2;
                  auVar218 = vmaxps_avx512vl(auVar218,auVar71);
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var161))[1];
                  auVar72._4_4_ = uVar2;
                  auVar72._0_4_ = uVar2;
                  auVar72._8_4_ = uVar2;
                  auVar72._12_4_ = uVar2;
                  auVar218 = vminps_avx512vl(auVar218,auVar72);
                  break;
                case 4:
                  auVar69._8_4_ = 0x80000000;
                  auVar69._0_8_ = 0x8000000080000000;
                  auVar69._12_4_ = 0x80000000;
                  auVar218 = vxorps_avx512vl(auVar218,auVar69);
                  auVar218 = vminps_avx(auVar218,auVar379);
                  auVar218 = vmaxps_avx(auVar218,auVar386);
                  auVar219 = vfmadd231ps_fma(auVar392,auVar218,auVar398);
                  auVar189 = vcvttps2dq_avx512vl(auVar219);
                  auVar189 = vcvtdq2ps_avx512vl(auVar189);
                  uVar160 = vcmpps_avx512vl(auVar219,auVar189,1);
                  auVar219 = vsubps_avx512vl(auVar189,auVar404);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar233._0_4_ = (uint)bVar24 * auVar219._0_4_ | (uint)!bVar24 * auVar189._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar233._4_4_ = (uint)bVar24 * auVar219._4_4_ | (uint)!bVar24 * auVar189._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar233._8_4_ = (uint)bVar24 * auVar219._8_4_ | (uint)!bVar24 * auVar189._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar233._12_4_ = (uint)bVar24 * auVar219._12_4_ | (uint)!bVar24 * auVar189._12_4_
                  ;
                  in_ZMM16 = ZEXT1664(auVar233);
                  auVar218 = vfmsub231ps_avx512vl(auVar218,auVar233,auVar410);
                  auVar70._8_4_ = 0x395e8083;
                  auVar70._0_8_ = 0x395e8083395e8083;
                  auVar70._12_4_ = 0x395e8083;
                  auVar219 = vfmsub231ps_avx512vl(auVar218,auVar233,auVar70);
                  auVar423._0_4_ = auVar219._0_4_ * auVar219._0_4_;
                  auVar423._4_4_ = auVar219._4_4_ * auVar219._4_4_;
                  auVar423._8_4_ = auVar219._8_4_ * auVar219._8_4_;
                  auVar423._12_4_ = auVar219._12_4_ * auVar219._12_4_;
                  auVar218 = vfmadd213ps_fma(auVar186,auVar219,auVar469);
                  auVar218 = vfmadd213ps_fma(auVar218,auVar219,auVar475);
                  auVar218 = vfmadd213ps_fma(auVar218,auVar219,auVar481);
                  auVar218 = vfmadd213ps_fma(auVar218,auVar219,auVar487);
                  auVar218 = vfmadd213ps_fma(auVar218,auVar219,auVar392);
                  auVar218 = vfmadd213ps_fma(auVar218,auVar423,auVar219);
                  in_ZMM9 = ZEXT1664(auVar218);
                  auVar424._0_4_ = auVar218._0_4_ + 1.0;
                  auVar424._4_4_ = auVar218._4_4_ + 1.0;
                  auVar424._8_4_ = auVar218._8_4_ + 1.0;
                  auVar424._12_4_ = auVar218._12_4_ + 1.0;
                  auVar218 = vcvttps2dq_avx512vl(auVar233);
                  auVar218 = vpslld_avx(auVar218,0x17);
                  auVar218 = vpaddd_avx(auVar493,auVar218);
                  auVar219 = vfmadd213ps_fma(auVar218,auVar424,auVar404);
                  auVar218 = vrcpps_avx(auVar219);
                  auVar219 = vfmsub213ps_fma(auVar219,auVar218,auVar404);
                  auVar218 = vfnmadd132ps_fma(auVar219,auVar218,auVar218);
                  break;
                case 5:
                  auVar219 = vminps_avx(auVar218,auVar379);
                  auVar219 = vmaxps_avx(auVar219,auVar386);
                  auVar189 = vfmadd213ps_fma(auVar398,auVar219,auVar392);
                  auVar190 = vcvttps2dq_avx512vl(auVar189);
                  auVar190 = vcvtdq2ps_avx512vl(auVar190);
                  uVar160 = vcmpps_avx512vl(auVar189,auVar190,1);
                  auVar189 = vsubps_avx512vl(auVar190,auVar404);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar228._0_4_ = (uint)bVar24 * auVar189._0_4_ | (uint)!bVar24 * auVar190._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar228._4_4_ = (uint)bVar24 * auVar189._4_4_ | (uint)!bVar24 * auVar190._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar228._8_4_ = (uint)bVar24 * auVar189._8_4_ | (uint)!bVar24 * auVar190._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar228._12_4_ = (uint)bVar24 * auVar189._12_4_ | (uint)!bVar24 * auVar190._12_4_
                  ;
                  auVar219 = vfmsub231ps_avx512vl(auVar219,auVar228,auVar410);
                  auVar219 = vfnmsub231ps_avx512vl(auVar219,auVar228,auVar499);
                  auVar451._0_4_ = auVar219._0_4_ * auVar219._0_4_;
                  auVar451._4_4_ = auVar219._4_4_ * auVar219._4_4_;
                  auVar451._8_4_ = auVar219._8_4_ * auVar219._8_4_;
                  auVar451._12_4_ = auVar219._12_4_ * auVar219._12_4_;
                  auVar189 = vfmadd213ps_avx512vl(auVar186,auVar219,auVar469);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar219,auVar475);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar219,auVar481);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar219,auVar487);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar219,auVar392);
                  auVar219 = vfmadd213ps_avx512vl(auVar189,auVar451,auVar219);
                  auVar189 = vaddps_avx512vl(auVar219,auVar404);
                  auVar219 = vcvttps2dq_avx512vl(auVar228);
                  auVar219 = vpslld_avx(auVar219,0x17);
                  auVar219 = vpaddd_avx(auVar219,auVar493);
                  auVar219 = vfmadd213ps_fma(auVar219,auVar189,auVar404);
                  uVar160 = vcmpps_avx512vl(auVar219,auVar217,2);
                  auVar66._8_4_ = 0x800000;
                  auVar66._0_8_ = 0x80000000800000;
                  auVar66._12_4_ = 0x800000;
                  auVar219 = vmaxps_avx512vl(auVar219,auVar66);
                  auVar191 = vpsrld_avx(auVar219,0x17);
                  auVar189 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar67._8_4_ = 0x3f000000;
                  auVar67._0_8_ = 0x3f0000003f000000;
                  auVar67._12_4_ = 0x3f000000;
                  auVar219 = vpternlogd_avx512vl(auVar219,auVar189,auVar67,0xea);
                  uVar176 = vcmpps_avx512vl(auVar219,auVar187,1);
                  auVar189 = vaddps_avx512vl(auVar219,auVar188);
                  auVar219 = vaddps_avx512vl(auVar189,auVar219);
                  bVar24 = (bool)((byte)uVar176 & 1);
                  auVar229._0_4_ = (uint)bVar24 * auVar219._0_4_ | (uint)!bVar24 * auVar189._0_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 1) & 1);
                  auVar229._4_4_ = (uint)bVar24 * auVar219._4_4_ | (uint)!bVar24 * auVar189._4_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 2) & 1);
                  auVar229._8_4_ = (uint)bVar24 * auVar219._8_4_ | (uint)!bVar24 * auVar189._8_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 3) & 1);
                  auVar229._12_4_ = (uint)bVar24 * auVar219._12_4_ | (uint)!bVar24 * auVar189._12_4_
                  ;
                  auVar189 = vmulps_avx512vl(auVar229,auVar229);
                  auVar219 = vfmadd213ps_avx512vl(auVar209,auVar229,auVar210);
                  auVar219 = vfmadd213ps_avx512vl(auVar219,auVar229,auVar211);
                  auVar219 = vfmadd213ps_avx512vl(auVar219,auVar229,auVar212);
                  auVar219 = vfmadd213ps_avx512vl(auVar219,auVar229,auVar213);
                  auVar219 = vfmadd213ps_avx512vl(auVar219,auVar229,auVar214);
                  auVar219 = vfmadd213ps_avx512vl(auVar219,auVar229,auVar215);
                  auVar219 = vfmadd213ps_avx512vl(auVar219,auVar229,auVar227);
                  auVar219 = vfmadd213ps_avx512vl(auVar219,auVar229,auVar220);
                  auVar190 = vmulps_avx512vl(auVar189,auVar229);
                  auVar190 = vmulps_avx512vl(auVar190,auVar219);
                  auVar68._8_4_ = 0xffffff82;
                  auVar68._0_8_ = 0xffffff82ffffff82;
                  auVar68._12_4_ = 0xffffff82;
                  auVar219 = vpaddd_avx512vl(auVar191,auVar68);
                  auVar219 = vcvtdq2ps_avx(auVar219);
                  auVar191 = vsubps_avx512vl(auVar219,auVar404);
                  bVar24 = (bool)((byte)uVar176 & 1);
                  auVar230._0_4_ = (uint)bVar24 * auVar191._0_4_ | (uint)!bVar24 * auVar219._0_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 1) & 1);
                  auVar230._4_4_ = (uint)bVar24 * auVar191._4_4_ | (uint)!bVar24 * auVar219._4_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 2) & 1);
                  auVar230._8_4_ = (uint)bVar24 * auVar191._8_4_ | (uint)!bVar24 * auVar219._8_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 3) & 1);
                  auVar230._12_4_ = (uint)bVar24 * auVar191._12_4_ | (uint)!bVar24 * auVar219._12_4_
                  ;
                  auVar219 = vfmadd231ps_avx512vl(auVar190,auVar230,auVar499);
                  auVar219 = vfmsub231ps_avx512vl(auVar219,auVar392,auVar189);
                  auVar219 = vsubps_avx512vl(auVar219,auVar229);
                  auVar219 = vfnmadd231ps_fma(auVar219,auVar410,auVar230);
                  auVar189 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar231._0_4_ =
                       (uint)bVar24 * auVar189._0_4_ |
                       (uint)!bVar24 * (int)(auVar219._0_4_ + auVar219._0_4_);
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar231._4_4_ =
                       (uint)bVar24 * auVar189._4_4_ |
                       (uint)!bVar24 * (int)(auVar219._4_4_ + auVar219._4_4_);
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar231._8_4_ =
                       (uint)bVar24 * auVar189._8_4_ |
                       (uint)!bVar24 * (int)(auVar219._8_4_ + auVar219._8_4_);
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar231._12_4_ =
                       (uint)bVar24 * auVar189._12_4_ |
                       (uint)!bVar24 * (int)(auVar219._12_4_ + auVar219._12_4_);
                  auVar219 = vminps_avx(auVar231,auVar379);
                  auVar219 = vmaxps_avx(auVar219,auVar386);
                  auVar189 = vfmadd213ps_fma(auVar398,auVar219,auVar392);
                  auVar190 = vcvttps2dq_avx512vl(auVar189);
                  auVar190 = vcvtdq2ps_avx512vl(auVar190);
                  uVar160 = vcmpps_avx512vl(auVar189,auVar190,1);
                  auVar189 = vsubps_avx512vl(auVar190,auVar404);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar232._0_4_ = (uint)bVar24 * auVar189._0_4_ | (uint)!bVar24 * auVar190._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar232._4_4_ = (uint)bVar24 * auVar189._4_4_ | (uint)!bVar24 * auVar190._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar232._8_4_ = (uint)bVar24 * auVar189._8_4_ | (uint)!bVar24 * auVar190._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar232._12_4_ = (uint)bVar24 * auVar189._12_4_ | (uint)!bVar24 * auVar190._12_4_
                  ;
                  auVar219 = vfmsub231ps_avx512vl(auVar219,auVar232,auVar410);
                  auVar219 = vfnmsub231ps_avx512vl(auVar219,auVar232,auVar499);
                  auVar452._0_4_ = auVar219._0_4_ * auVar219._0_4_;
                  auVar452._4_4_ = auVar219._4_4_ * auVar219._4_4_;
                  auVar452._8_4_ = auVar219._8_4_ * auVar219._8_4_;
                  auVar452._12_4_ = auVar219._12_4_ * auVar219._12_4_;
                  auVar189 = vfmadd213ps_avx512vl(auVar186,auVar219,auVar469);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar219,auVar475);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar219,auVar481);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar219,auVar487);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar219,auVar392);
                  auVar219 = vfmadd213ps_avx512vl(auVar189,auVar452,auVar219);
                  in_ZMM17 = ZEXT1664(auVar219);
                  auVar189 = vaddps_avx512vl(auVar219,auVar404);
                  auVar219 = vcvttps2dq_avx512vl(auVar232);
                  auVar219 = vpslld_avx(auVar219,0x17);
                  auVar219 = vpaddd_avx(auVar219,auVar493);
                  auVar189 = vfmadd213ps_fma(auVar219,auVar189,auVar404);
                  auVar219 = vrcpps_avx(auVar189);
                  auVar190 = vaddps_avx512vl(auVar219,auVar219);
                  in_ZMM16 = ZEXT1664(auVar190);
                  auVar189 = vfmsub213ps_avx512vl(auVar189,auVar190,auVar216);
                  auVar219 = vfnmadd213ps_avx512vl(auVar189,auVar219,auVar190);
                  in_ZMM9 = ZEXT1664(auVar219);
                  auVar218 = vfmsub231ps_fma(auVar218,auVar218,auVar219);
                  break;
                case 6:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                  auVar425._4_4_ = uVar2;
                  auVar425._0_4_ = uVar2;
                  auVar425._8_4_ = uVar2;
                  auVar425._12_4_ = uVar2;
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var161))[1];
                  auVar65._4_4_ = uVar2;
                  auVar65._0_4_ = uVar2;
                  auVar65._8_4_ = uVar2;
                  auVar65._12_4_ = uVar2;
                  auVar219 = vfmadd213ps_avx512vl(auVar425,auVar218,auVar65);
                  auVar219 = vmaxps_avx(auVar219,auVar217);
                  auVar219 = vminps_avx(auVar219,auVar404);
                  auVar366._0_4_ = auVar219._0_4_ * auVar218._0_4_;
                  auVar366._4_4_ = auVar219._4_4_ * auVar218._4_4_;
                  auVar366._8_4_ = auVar219._8_4_ * auVar218._8_4_;
                  auVar366._12_4_ = auVar219._12_4_ * auVar218._12_4_;
                  auVar218 = auVar366;
                }
                *(undefined1 (*) [16])ppp_Var170 = auVar218;
                ppp_Var170 = ppp_Var170 + 2;
                uVar164 = uVar164 + 1;
                iVar151 = iVar151 + 1;
              } while (uVar164 != local_158.w);
            }
            iVar180 = iVar180 + 1;
          } while (iVar180 != local_158.h);
        }
        local_228 = local_228 + 1;
      } while (local_228 != local_158.c);
    }
    local_a0 = local_a0 | uVar10 ^ 1;
    if ((local_a0 == 0) && (0 < (long)local_158.c)) {
      p_Var161 = pp_Var168[-3];
      iVar182 = *(int *)(&this->field_0xdc + (long)p_Var161);
      iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var161);
      iVar158 = *(int *)(&this->field_0xe4 + (long)p_Var161);
      iVar181 = *(int *)(&this->field_0xe8 + (long)p_Var161);
      uVar13 = *(undefined4 *)(&this->field_0x114 + (long)p_Var161);
      lVar175 = *(long *)(&this->field_0x1a8 + (long)p_Var161);
      uVar162 = *(uint *)(&this->field_0xd4 + (long)p_Var161);
      local_e8._0_8_ = p_Var161;
      uVar12 = *(uint *)(&this->field_0xd8 + (long)p_Var161);
      local_228 = 0;
      auVar217 = ZEXT816(0) << 0x40;
      auVar380._8_4_ = 0x42b0c0a5;
      auVar380._0_8_ = 0x42b0c0a542b0c0a5;
      auVar380._12_4_ = 0x42b0c0a5;
      auVar387._8_4_ = 0xc2b0c0a5;
      auVar387._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar387._12_4_ = 0xc2b0c0a5;
      auVar393._8_4_ = 0x3f000000;
      auVar393._0_8_ = 0x3f0000003f000000;
      auVar393._12_4_ = 0x3f000000;
      auVar399._8_4_ = 0x3fb8aa3b;
      auVar399._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar399._12_4_ = 0x3fb8aa3b;
      auVar405._8_4_ = 0x3f800000;
      auVar405._0_8_ = 0x3f8000003f800000;
      auVar405._12_4_ = 0x3f800000;
      auVar411._8_4_ = 0x3f318000;
      auVar411._0_8_ = 0x3f3180003f318000;
      auVar411._12_4_ = 0x3f318000;
      auVar186 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar470._8_4_ = 0x3ab743ce;
      auVar470._0_8_ = 0x3ab743ce3ab743ce;
      auVar470._12_4_ = 0x3ab743ce;
      auVar476._8_4_ = 0x3c088908;
      auVar476._0_8_ = 0x3c0889083c088908;
      auVar476._12_4_ = 0x3c088908;
      auVar482._8_4_ = 0x3d2aa9c1;
      auVar482._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar482._12_4_ = 0x3d2aa9c1;
      auVar488._8_4_ = 0x3e2aaaaa;
      auVar488._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar488._12_4_ = 0x3e2aaaaa;
      auVar494._8_4_ = 0x3f800000;
      auVar494._0_8_ = 0x3f8000003f800000;
      auVar494._12_4_ = 0x3f800000;
      auVar500._8_4_ = 0xb95e8083;
      auVar500._0_8_ = 0xb95e8083b95e8083;
      auVar500._12_4_ = 0xb95e8083;
      auVar187 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
      auVar188 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar209 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar210 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar211 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar212 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar213 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar214 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar215 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar227 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar220 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar216 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        if (0 < local_158.h) {
          iVar174 = bottom_blob->w;
          iVar155 = bottom_blob->h;
          ppp_Var170 = (_func_int ***)
                       ((long)(_func_int ***)local_158.data +
                       local_158.cstep * local_228 * local_158.elemsize);
          uVar163 = bottom_blob->c;
          local_98._0_8_ = local_228 * 0x10;
          iVar180 = 0;
          do {
            if (0 < local_158.w) {
              uVar164 = 0;
              iVar151 = (1 - uVar162) * iVar182;
              do {
                if (lVar175 == 0) {
                  auVar218 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar218 = *(undefined1 (*) [16])(lVar175 + local_228 * 0x10);
                }
                auVar292 = ZEXT1664(auVar218);
                if (0 < (int)uVar163) {
                  pvVar178 = (void *)((this->weight_data_tm).cstep * local_228 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  uVar160 = 0;
                  do {
                    if (0 < (int)uVar12) {
                      uVar177 = 0;
                      uVar176 = 0;
                      do {
                        iVar152 = (((int)uVar176 - uVar12) + 1) * iVar11 + iVar180;
                        if ((((-1 < iVar152) &&
                             (iVar153 = iVar152 / iVar181, iVar152 % iVar181 == 0)) &&
                            (iVar153 < iVar155)) && (0 < (int)uVar162)) {
                          uVar171 = uVar177;
                          uVar172 = (ulong)uVar162;
                          iVar152 = iVar151;
                          do {
                            if (((-1 < iVar152) &&
                                (iVar154 = iVar152 / iVar158, iVar152 % iVar158 == 0)) &&
                               (iVar154 < iVar174)) {
                              uVar2 = *(undefined4 *)
                                       ((long)bottom_blob->data +
                                       (long)iVar154 * 4 +
                                       (long)iVar153 * (long)bottom_blob->w * bottom_blob->elemsize
                                       + bottom_blob->cstep * bottom_blob->elemsize * uVar160);
                              auVar426._4_4_ = uVar2;
                              auVar426._0_4_ = uVar2;
                              auVar426._8_4_ = uVar2;
                              auVar426._12_4_ = uVar2;
                              auVar218 = vfmadd231ps_fma(auVar292._0_16_,auVar426,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar178 +
                                                          (uVar171 & 0xffffffff) * 4));
                              auVar292 = ZEXT1664(auVar218);
                            }
                            uVar171 = uVar171 + 4;
                            iVar152 = iVar152 + iVar182;
                            uVar172 = uVar172 - 1;
                          } while (uVar172 != 0);
                        }
                        uVar176 = uVar176 + 1;
                        uVar177 = uVar177 + (ulong)uVar162 * 4;
                      } while (uVar176 != uVar12);
                    }
                    auVar218 = auVar292._0_16_;
                    pvVar178 = (void *)((long)pvVar178 + (long)(int)(uVar162 * uVar12 * 4) * 4);
                    uVar160 = uVar160 + 1;
                  } while (uVar160 != uVar163);
                }
                switch(uVar13) {
                case 1:
                  auVar218 = vmaxps_avx(auVar218,auVar217);
                  break;
                case 2:
                  auVar219 = vmaxps_avx(auVar218,auVar217);
                  auVar218 = vminps_avx(auVar218,auVar217);
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                  auVar82._4_4_ = uVar2;
                  auVar82._0_4_ = uVar2;
                  auVar82._8_4_ = uVar2;
                  auVar82._12_4_ = uVar2;
                  auVar218 = vfmadd132ps_avx512vl(auVar218,auVar219,auVar82);
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                  auVar80._4_4_ = uVar2;
                  auVar80._0_4_ = uVar2;
                  auVar80._8_4_ = uVar2;
                  auVar80._12_4_ = uVar2;
                  auVar218 = vmaxps_avx512vl(auVar218,auVar80);
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var161))[1];
                  auVar81._4_4_ = uVar2;
                  auVar81._0_4_ = uVar2;
                  auVar81._8_4_ = uVar2;
                  auVar81._12_4_ = uVar2;
                  auVar218 = vminps_avx512vl(auVar218,auVar81);
                  break;
                case 4:
                  auVar78._8_4_ = 0x80000000;
                  auVar78._0_8_ = 0x8000000080000000;
                  auVar78._12_4_ = 0x80000000;
                  auVar218 = vxorps_avx512vl(auVar218,auVar78);
                  auVar218 = vminps_avx(auVar218,auVar380);
                  auVar218 = vmaxps_avx(auVar218,auVar387);
                  auVar219 = vfmadd231ps_fma(auVar393,auVar218,auVar399);
                  auVar189 = vcvttps2dq_avx512vl(auVar219);
                  auVar189 = vcvtdq2ps_avx512vl(auVar189);
                  uVar160 = vcmpps_avx512vl(auVar219,auVar189,1);
                  auVar219 = vsubps_avx512vl(auVar189,auVar405);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar239._0_4_ = (uint)bVar24 * auVar219._0_4_ | (uint)!bVar24 * auVar189._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar239._4_4_ = (uint)bVar24 * auVar219._4_4_ | (uint)!bVar24 * auVar189._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar239._8_4_ = (uint)bVar24 * auVar219._8_4_ | (uint)!bVar24 * auVar189._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar239._12_4_ = (uint)bVar24 * auVar219._12_4_ | (uint)!bVar24 * auVar189._12_4_
                  ;
                  in_ZMM16 = ZEXT1664(auVar239);
                  auVar218 = vfmsub231ps_avx512vl(auVar218,auVar239,auVar411);
                  auVar79._8_4_ = 0x395e8083;
                  auVar79._0_8_ = 0x395e8083395e8083;
                  auVar79._12_4_ = 0x395e8083;
                  auVar219 = vfmsub231ps_avx512vl(auVar218,auVar239,auVar79);
                  auVar427._0_4_ = auVar219._0_4_ * auVar219._0_4_;
                  auVar427._4_4_ = auVar219._4_4_ * auVar219._4_4_;
                  auVar427._8_4_ = auVar219._8_4_ * auVar219._8_4_;
                  auVar427._12_4_ = auVar219._12_4_ * auVar219._12_4_;
                  auVar218 = vfmadd213ps_fma(auVar186,auVar219,auVar470);
                  auVar218 = vfmadd213ps_fma(auVar218,auVar219,auVar476);
                  auVar218 = vfmadd213ps_fma(auVar218,auVar219,auVar482);
                  auVar218 = vfmadd213ps_fma(auVar218,auVar219,auVar488);
                  auVar218 = vfmadd213ps_fma(auVar218,auVar219,auVar393);
                  auVar218 = vfmadd213ps_fma(auVar218,auVar427,auVar219);
                  in_ZMM9 = ZEXT1664(auVar218);
                  auVar428._0_4_ = auVar218._0_4_ + 1.0;
                  auVar428._4_4_ = auVar218._4_4_ + 1.0;
                  auVar428._8_4_ = auVar218._8_4_ + 1.0;
                  auVar428._12_4_ = auVar218._12_4_ + 1.0;
                  auVar218 = vcvttps2dq_avx512vl(auVar239);
                  auVar218 = vpslld_avx(auVar218,0x17);
                  auVar218 = vpaddd_avx(auVar494,auVar218);
                  auVar219 = vfmadd213ps_fma(auVar218,auVar428,auVar405);
                  auVar218 = vrcpps_avx(auVar219);
                  auVar219 = vfmsub213ps_fma(auVar219,auVar218,auVar405);
                  auVar218 = vfnmadd132ps_fma(auVar219,auVar218,auVar218);
                  break;
                case 5:
                  auVar219 = vminps_avx(auVar218,auVar380);
                  auVar219 = vmaxps_avx(auVar219,auVar387);
                  auVar189 = vfmadd213ps_fma(auVar399,auVar219,auVar393);
                  auVar190 = vcvttps2dq_avx512vl(auVar189);
                  auVar190 = vcvtdq2ps_avx512vl(auVar190);
                  uVar160 = vcmpps_avx512vl(auVar189,auVar190,1);
                  auVar189 = vsubps_avx512vl(auVar190,auVar405);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar234._0_4_ = (uint)bVar24 * auVar189._0_4_ | (uint)!bVar24 * auVar190._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar234._4_4_ = (uint)bVar24 * auVar189._4_4_ | (uint)!bVar24 * auVar190._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar234._8_4_ = (uint)bVar24 * auVar189._8_4_ | (uint)!bVar24 * auVar190._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar234._12_4_ = (uint)bVar24 * auVar189._12_4_ | (uint)!bVar24 * auVar190._12_4_
                  ;
                  auVar219 = vfmsub231ps_avx512vl(auVar219,auVar234,auVar411);
                  auVar219 = vfnmsub231ps_avx512vl(auVar219,auVar234,auVar500);
                  auVar453._0_4_ = auVar219._0_4_ * auVar219._0_4_;
                  auVar453._4_4_ = auVar219._4_4_ * auVar219._4_4_;
                  auVar453._8_4_ = auVar219._8_4_ * auVar219._8_4_;
                  auVar453._12_4_ = auVar219._12_4_ * auVar219._12_4_;
                  auVar189 = vfmadd213ps_avx512vl(auVar186,auVar219,auVar470);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar219,auVar476);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar219,auVar482);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar219,auVar488);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar219,auVar393);
                  auVar219 = vfmadd213ps_avx512vl(auVar189,auVar453,auVar219);
                  auVar189 = vaddps_avx512vl(auVar219,auVar405);
                  auVar219 = vcvttps2dq_avx512vl(auVar234);
                  auVar219 = vpslld_avx(auVar219,0x17);
                  auVar219 = vpaddd_avx(auVar219,auVar494);
                  auVar219 = vfmadd213ps_fma(auVar219,auVar189,auVar405);
                  uVar160 = vcmpps_avx512vl(auVar219,auVar217,2);
                  auVar75._8_4_ = 0x800000;
                  auVar75._0_8_ = 0x80000000800000;
                  auVar75._12_4_ = 0x800000;
                  auVar219 = vmaxps_avx512vl(auVar219,auVar75);
                  auVar191 = vpsrld_avx(auVar219,0x17);
                  auVar189 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar76._8_4_ = 0x3f000000;
                  auVar76._0_8_ = 0x3f0000003f000000;
                  auVar76._12_4_ = 0x3f000000;
                  auVar219 = vpternlogd_avx512vl(auVar219,auVar189,auVar76,0xea);
                  uVar176 = vcmpps_avx512vl(auVar219,auVar187,1);
                  auVar189 = vaddps_avx512vl(auVar219,auVar188);
                  auVar219 = vaddps_avx512vl(auVar189,auVar219);
                  bVar24 = (bool)((byte)uVar176 & 1);
                  auVar235._0_4_ = (uint)bVar24 * auVar219._0_4_ | (uint)!bVar24 * auVar189._0_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 1) & 1);
                  auVar235._4_4_ = (uint)bVar24 * auVar219._4_4_ | (uint)!bVar24 * auVar189._4_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 2) & 1);
                  auVar235._8_4_ = (uint)bVar24 * auVar219._8_4_ | (uint)!bVar24 * auVar189._8_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 3) & 1);
                  auVar235._12_4_ = (uint)bVar24 * auVar219._12_4_ | (uint)!bVar24 * auVar189._12_4_
                  ;
                  auVar189 = vmulps_avx512vl(auVar235,auVar235);
                  auVar219 = vfmadd213ps_avx512vl(auVar209,auVar235,auVar210);
                  auVar219 = vfmadd213ps_avx512vl(auVar219,auVar235,auVar211);
                  auVar219 = vfmadd213ps_avx512vl(auVar219,auVar235,auVar212);
                  auVar219 = vfmadd213ps_avx512vl(auVar219,auVar235,auVar213);
                  auVar219 = vfmadd213ps_avx512vl(auVar219,auVar235,auVar214);
                  auVar219 = vfmadd213ps_avx512vl(auVar219,auVar235,auVar215);
                  auVar219 = vfmadd213ps_avx512vl(auVar219,auVar235,auVar227);
                  auVar219 = vfmadd213ps_avx512vl(auVar219,auVar235,auVar220);
                  auVar190 = vmulps_avx512vl(auVar189,auVar235);
                  auVar190 = vmulps_avx512vl(auVar190,auVar219);
                  auVar77._8_4_ = 0xffffff82;
                  auVar77._0_8_ = 0xffffff82ffffff82;
                  auVar77._12_4_ = 0xffffff82;
                  auVar219 = vpaddd_avx512vl(auVar191,auVar77);
                  auVar219 = vcvtdq2ps_avx(auVar219);
                  auVar191 = vsubps_avx512vl(auVar219,auVar405);
                  bVar24 = (bool)((byte)uVar176 & 1);
                  auVar236._0_4_ = (uint)bVar24 * auVar191._0_4_ | (uint)!bVar24 * auVar219._0_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 1) & 1);
                  auVar236._4_4_ = (uint)bVar24 * auVar191._4_4_ | (uint)!bVar24 * auVar219._4_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 2) & 1);
                  auVar236._8_4_ = (uint)bVar24 * auVar191._8_4_ | (uint)!bVar24 * auVar219._8_4_;
                  bVar24 = (bool)((byte)(uVar176 >> 3) & 1);
                  auVar236._12_4_ = (uint)bVar24 * auVar191._12_4_ | (uint)!bVar24 * auVar219._12_4_
                  ;
                  auVar219 = vfmadd231ps_avx512vl(auVar190,auVar236,auVar500);
                  auVar219 = vfmsub231ps_avx512vl(auVar219,auVar393,auVar189);
                  auVar219 = vsubps_avx512vl(auVar219,auVar235);
                  auVar219 = vfnmadd231ps_fma(auVar219,auVar411,auVar236);
                  auVar189 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar237._0_4_ =
                       (uint)bVar24 * auVar189._0_4_ |
                       (uint)!bVar24 * (int)(auVar219._0_4_ + auVar219._0_4_);
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar237._4_4_ =
                       (uint)bVar24 * auVar189._4_4_ |
                       (uint)!bVar24 * (int)(auVar219._4_4_ + auVar219._4_4_);
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar237._8_4_ =
                       (uint)bVar24 * auVar189._8_4_ |
                       (uint)!bVar24 * (int)(auVar219._8_4_ + auVar219._8_4_);
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar237._12_4_ =
                       (uint)bVar24 * auVar189._12_4_ |
                       (uint)!bVar24 * (int)(auVar219._12_4_ + auVar219._12_4_);
                  auVar219 = vminps_avx(auVar237,auVar380);
                  auVar219 = vmaxps_avx(auVar219,auVar387);
                  auVar189 = vfmadd213ps_fma(auVar399,auVar219,auVar393);
                  auVar190 = vcvttps2dq_avx512vl(auVar189);
                  auVar190 = vcvtdq2ps_avx512vl(auVar190);
                  uVar160 = vcmpps_avx512vl(auVar189,auVar190,1);
                  auVar189 = vsubps_avx512vl(auVar190,auVar405);
                  bVar24 = (bool)((byte)uVar160 & 1);
                  auVar238._0_4_ = (uint)bVar24 * auVar189._0_4_ | (uint)!bVar24 * auVar190._0_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 1) & 1);
                  auVar238._4_4_ = (uint)bVar24 * auVar189._4_4_ | (uint)!bVar24 * auVar190._4_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 2) & 1);
                  auVar238._8_4_ = (uint)bVar24 * auVar189._8_4_ | (uint)!bVar24 * auVar190._8_4_;
                  bVar24 = (bool)((byte)(uVar160 >> 3) & 1);
                  auVar238._12_4_ = (uint)bVar24 * auVar189._12_4_ | (uint)!bVar24 * auVar190._12_4_
                  ;
                  auVar219 = vfmsub231ps_avx512vl(auVar219,auVar238,auVar411);
                  auVar219 = vfnmsub231ps_avx512vl(auVar219,auVar238,auVar500);
                  auVar454._0_4_ = auVar219._0_4_ * auVar219._0_4_;
                  auVar454._4_4_ = auVar219._4_4_ * auVar219._4_4_;
                  auVar454._8_4_ = auVar219._8_4_ * auVar219._8_4_;
                  auVar454._12_4_ = auVar219._12_4_ * auVar219._12_4_;
                  auVar189 = vfmadd213ps_avx512vl(auVar186,auVar219,auVar470);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar219,auVar476);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar219,auVar482);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar219,auVar488);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar219,auVar393);
                  auVar219 = vfmadd213ps_avx512vl(auVar189,auVar454,auVar219);
                  in_ZMM17 = ZEXT1664(auVar219);
                  auVar189 = vaddps_avx512vl(auVar219,auVar405);
                  auVar219 = vcvttps2dq_avx512vl(auVar238);
                  auVar219 = vpslld_avx(auVar219,0x17);
                  auVar219 = vpaddd_avx(auVar219,auVar494);
                  auVar189 = vfmadd213ps_fma(auVar219,auVar189,auVar405);
                  auVar219 = vrcpps_avx(auVar189);
                  auVar190 = vaddps_avx512vl(auVar219,auVar219);
                  in_ZMM16 = ZEXT1664(auVar190);
                  auVar189 = vfmsub213ps_avx512vl(auVar189,auVar190,auVar216);
                  auVar219 = vfnmadd213ps_avx512vl(auVar189,auVar219,auVar190);
                  in_ZMM9 = ZEXT1664(auVar219);
                  auVar218 = vfmsub231ps_fma(auVar218,auVar218,auVar219);
                  break;
                case 6:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var161);
                  auVar429._4_4_ = uVar2;
                  auVar429._0_4_ = uVar2;
                  auVar429._8_4_ = uVar2;
                  auVar429._12_4_ = uVar2;
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var161))[1];
                  auVar74._4_4_ = uVar2;
                  auVar74._0_4_ = uVar2;
                  auVar74._8_4_ = uVar2;
                  auVar74._12_4_ = uVar2;
                  auVar219 = vfmadd213ps_avx512vl(auVar429,auVar218,auVar74);
                  auVar219 = vmaxps_avx(auVar219,auVar217);
                  auVar219 = vminps_avx(auVar219,auVar405);
                  auVar367._0_4_ = auVar219._0_4_ * auVar218._0_4_;
                  auVar367._4_4_ = auVar219._4_4_ * auVar218._4_4_;
                  auVar367._8_4_ = auVar219._8_4_ * auVar218._8_4_;
                  auVar367._12_4_ = auVar219._12_4_ * auVar218._12_4_;
                  auVar218 = auVar367;
                }
                *(undefined1 (*) [16])ppp_Var170 = auVar218;
                ppp_Var170 = ppp_Var170 + 2;
                uVar164 = uVar164 + 1;
                iVar151 = iVar151 + 1;
              } while (uVar164 != local_158.w);
            }
            iVar180 = iVar180 + 1;
          } while (iVar180 != local_158.h);
        }
        local_228 = local_228 + 1;
      } while (local_228 != local_158.c);
    }
    iVar182 = local_108._0_4_;
    auVar186 = in_ZMM17._0_16_;
    if ((uVar10 == 4 && local_170 == 0) && (local_a8 = (long)local_158.c, 0 < local_a8)) {
      p_Var161 = pp_Var168[-3];
      iVar11 = *(int *)(&this->field_0xdc + (long)p_Var161);
      iVar158 = *(int *)(&this->field_0xe0 + (long)p_Var161);
      iVar181 = *(int *)(&this->field_0xe4 + (long)p_Var161);
      iVar174 = *(int *)(&this->field_0xe8 + (long)p_Var161);
      iVar155 = *(int *)(&this->field_0x114 + (long)p_Var161);
      lVar175 = *(long *)(&this->field_0x1a8 + (long)p_Var161);
      uVar162 = *(uint *)(&this->field_0xd4 + (long)p_Var161);
      uVar12 = *(uint *)(&this->field_0xd8 + (long)p_Var161);
      local_50 = (Allocator *)(local_158.elemsize * local_158.cstep);
      iVar180 = bottom_blob->w;
      iVar151 = bottom_blob->h;
      uVar163 = bottom_blob->c;
      local_228 = 0;
      uVar165 = local_108._0_8_;
      do {
        if (0 < iVar9) {
          local_200 = (_func_int ***)((long)(_func_int ***)pvVar179 + (long)local_50 * local_228);
          local_98._0_8_ =
               (void *)((this->weight_data_tm).cstep * local_228 * (this->weight_data_tm).elemsize +
                       (long)(this->weight_data_tm).data);
          iVar182 = 0;
          do {
            if (0 < iVar8) {
              iVar153 = bottom_blob->w;
              pvVar178 = bottom_blob->data;
              sVar16 = bottom_blob->elemsize;
              sVar17 = bottom_blob->cstep;
              local_e8._0_8_ = *(undefined8 *)(&this->field_0x118 + (long)p_Var161);
              uVar164 = 0;
              uVar165 = local_108._0_8_;
              iVar152 = (1 - uVar162) * iVar11;
              do {
                if (lVar175 == 0) {
                  fVar362 = 0.0;
                }
                else {
                  fVar362 = *(float *)(lVar175 + local_228 * 4);
                }
                if ((int)uVar163 < 1) {
                  auVar186 = SUB6416(ZEXT864(0),0);
                }
                else {
                  auVar292 = ZEXT864(0);
                  uVar160 = 0;
                  lVar167 = local_98._0_8_;
                  do {
                    if (0 < (int)uVar12) {
                      uVar177 = 0;
                      uVar176 = 0;
                      do {
                        iVar154 = (((int)uVar176 - uVar12) + 1) * iVar158 + iVar182;
                        if ((((-1 < iVar154) &&
                             (iVar156 = iVar154 / iVar174, iVar154 % iVar174 == 0)) &&
                            (0 < (int)uVar162)) && (iVar156 < iVar151)) {
                          uVar171 = (ulong)uVar162;
                          uVar172 = uVar177;
                          iVar154 = iVar152;
                          do {
                            if (((-1 < iVar154) &&
                                (iVar157 = iVar154 / iVar181, iVar154 % iVar181 == 0)) &&
                               (iVar157 < iVar180)) {
                              auVar186 = vfmadd231ps_fma(auVar292._0_16_,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar178 +
                                                          (long)(iVar157 << 2) * 4 +
                                                          (long)iVar156 * (long)iVar153 * sVar16 +
                                                          sVar17 * sVar16 * uVar160),
                                                         *(undefined1 (*) [16])
                                                          (lVar167 + (uVar172 & 0xffffffff) * 4));
                              auVar292 = ZEXT1664(auVar186);
                            }
                            uVar172 = uVar172 + 4;
                            iVar154 = iVar154 + iVar11;
                            uVar171 = uVar171 - 1;
                          } while (uVar171 != 0);
                        }
                        uVar176 = uVar176 + 1;
                        uVar177 = uVar177 + (ulong)uVar162 * 4;
                        uVar165 = local_108._0_8_;
                      } while (uVar176 != uVar12);
                    }
                    auVar186 = auVar292._0_16_;
                    lVar167 = lVar167 + (long)(int)(uVar162 * uVar12 * 4) * 4;
                    uVar160 = uVar160 + 1;
                  } while (uVar160 != uVar163);
                }
                auVar187 = vshufpd_avx(auVar186,auVar186,1);
                auVar368._0_4_ = auVar187._0_4_ + auVar186._0_4_;
                auVar368._4_4_ = auVar187._4_4_ + auVar186._4_4_;
                auVar368._8_4_ = auVar187._8_4_ + auVar186._8_4_;
                auVar368._12_4_ = auVar187._12_4_ + auVar186._12_4_;
                auVar186 = vmovshdup_avx(auVar368);
                fVar362 = auVar186._0_4_ + fVar362 + auVar368._0_4_;
                auVar186 = ZEXT416((uint)fVar362);
                fVar377 = fVar362;
                if (iVar155 - 1U < 6) {
                  switch(iVar155) {
                  case 1:
                    auVar186 = vmaxss_avx(ZEXT416((uint)fVar362),ZEXT416(0));
                    fVar377 = auVar186._0_4_;
                    break;
                  case 2:
                    uVar42 = vcmpss_avx512f(ZEXT416((uint)fVar362),ZEXT416(0),0xe);
                    bVar24 = (bool)((byte)uVar42 & 1);
                    fVar377 = (float)((uint)bVar24 * 0x3f800000 +
                                     (uint)!bVar24 * (int)*(float *)local_e8._0_8_) * fVar362;
                    break;
                  case 3:
                    auVar186 = vmaxss_avx(auVar186,ZEXT416((uint)*(float *)local_e8._0_8_));
                    fVar377 = auVar186._0_4_;
                    if (*(float *)(local_e8._0_8_ + 4) < auVar186._0_4_) {
                      fVar377 = *(float *)(local_e8._0_8_ + 4);
                    }
                    break;
                  case 4:
                    auVar186 = vminss_avx(auVar186,SUB6416(ZEXT464(0x42b0c0a5),0));
                    auVar84._8_4_ = 0x80000000;
                    auVar84._0_8_ = 0x8000000080000000;
                    auVar84._12_4_ = 0x80000000;
                    auVar187 = vxorps_avx512vl(auVar186,auVar84);
                    uVar165 = vcmpss_avx512f(auVar186,ZEXT416(0xc2b0c0a5),1);
                    bVar24 = (bool)((byte)uVar165 & 1);
                    in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                    fVar362 = expf((float)((uint)bVar24 * 0x42b0c0a5 +
                                          (uint)!bVar24 * auVar187._0_4_));
                    uVar165 = local_108._0_8_;
                    fVar377 = 1.0 / (fVar362 + 1.0);
                    break;
                  case 5:
                    in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                    fVar377 = expf(fVar362);
                    fVar377 = logf(fVar377 + 1.0);
                    fVar377 = tanhf(fVar377);
                    uVar165 = local_108._0_8_;
                    fVar377 = fVar377 * fVar362;
                    break;
                  case 6:
                    fVar3 = *(float *)local_e8._0_8_;
                    auVar83._8_4_ = 0x80000000;
                    auVar83._0_8_ = 0x8000000080000000;
                    auVar83._12_4_ = 0x80000000;
                    auVar187 = vxorps_avx512vl(ZEXT416((uint)*(float *)(local_e8._0_8_ + 4)),auVar83
                                              );
                    fVar384 = auVar187._0_4_ / fVar3;
                    fVar377 = 0.0;
                    if ((fVar384 <= fVar362) &&
                       (fVar377 = fVar362, fVar362 <= fVar384 + 1.0 / fVar3)) {
                      auVar186 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar186,
                                                 ZEXT416((uint)*(float *)(local_e8._0_8_ + 4)));
                      fVar377 = auVar186._0_4_ * fVar362;
                    }
                  }
                }
                *(float *)local_200 = fVar377;
                local_200 = (_func_int ***)((long)local_200 + 4);
                uVar164 = uVar164 + 1;
                iVar152 = iVar152 + 1;
              } while (uVar164 != iVar8);
            }
            iVar182 = iVar182 + 1;
          } while (iVar182 != iVar9);
        }
        auVar186 = in_ZMM17._0_16_;
        iVar182 = (int)uVar165;
        local_228 = local_228 + 1;
      } while (local_228 != local_a8);
    }
    iVar9 = local_158.h;
    iVar8 = local_158.w;
    pvVar179 = local_158.data;
    pp_Var168 = this->_vptr_Deconvolution_x86_avx512;
    if ((local_170 == 0 && uVar10 == 1) &&
       (p_Var161 = pp_Var168[-3], 0 < *(int *)(&this->field_0xd0 + (long)p_Var161))) {
      iVar182 = iVar182 * (int)local_f0;
      lVar167 = local_158.cstep * local_158.elemsize;
      iVar11 = bottom_blob->h;
      uVar10 = bottom_blob->c;
      uVar160 = (ulong)(uint)local_158.w;
      auVar297 = vpbroadcastd_avx512f(ZEXT416((uint)bottom_blob->w));
      lVar175 = (long)local_158.w;
      local_228 = 0;
      auVar298 = ZEXT1264(ZEXT812(0));
      auVar296 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar295 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar309 = vpmovsxbd_avx512f(_DAT_0051a480);
      auVar294 = vpternlogd_avx512f(in_ZMM16,in_ZMM16,in_ZMM16,0xff);
      auVar186 = vxorps_avx512vl(auVar186,auVar186);
      auVar299 = ZEXT1664(auVar186);
      auVar293 = vpbroadcastq_avx512f(ZEXT816(0x10));
      auVar292 = vpbroadcastd_avx512f(ZEXT416(0x10));
      local_e8 = vmovdqu64_avx512f(auVar297);
      do {
        if (0 < iVar9) {
          local_200 = (_func_int ***)((long)(_func_int ***)pvVar179 + lVar167 * local_228);
          pp_Var21 = this->_vptr_Deconvolution_x86_avx512;
          local_98._0_8_ =
               (void *)((this->weight_data_tm).cstep * (this->weight_data_tm).elemsize * local_228 +
                       (long)(this->weight_data_tm).data);
          iVar158 = 0;
          do {
            if (0 < iVar8) {
              iVar181 = bottom_blob->w;
              pvVar178 = bottom_blob->data;
              sVar16 = bottom_blob->elemsize;
              sVar17 = bottom_blob->cstep;
              pp_Var22 = this->_vptr_Deconvolution_x86_avx512;
              iVar174 = iVar158 - local_9c;
              uVar176 = 0;
              do {
                auVar186 = auVar299._0_16_;
                p_Var161 = pp_Var21[-3];
                if (*(int *)(&this->field_0x10c + (long)p_Var161) == 0) {
                  auVar300 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar300 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var161) +
                                              local_228 * 4));
                }
                auVar187 = auVar300._0_16_;
                if (0 < (int)uVar10) {
                  p_Var169 = pp_Var22[-3];
                  local_f0 = (_func_int *)
                             ((long)&this->_vptr_Deconvolution_x86_avx512 + (long)p_Var169);
                  auVar301 = vpbroadcastd_avx512f();
                  local_198 = local_98._0_8_;
                  uVar177 = 0;
                  do {
                    if (0 < *(int *)(&this->field_0xd8 + (long)p_Var169)) {
                      iVar155 = 0;
                      local_108._0_4_ = *(int *)(local_f0 + 0xe0);
                      do {
                        iVar180 = *(int *)(local_f0 + 0xe0) * iVar155 + iVar174;
                        if ((((-1 < iVar180) &&
                             (iVar151 = iVar180 / *(int *)(local_f0 + 0xe8),
                             iVar180 % *(int *)(local_f0 + 0xe8) == 0)) && (iVar151 < iVar11)) &&
                           (iVar180 = *(int *)(local_f0 + 0xd4), 0 < iVar180)) {
                          uVar172 = (ulong)(iVar180 + 0xfU & 0xfffffff0);
                          auVar415 = ZEXT1664(CONCAT124(auVar298._4_12_,auVar300._0_4_));
                          auVar300 = vpbroadcastq_avx512f();
                          auVar302 = vpbroadcastd_avx512f(ZEXT416(*(uint *)(local_f0 + 0xdc)));
                          uVar171 = 0;
                          auVar303 = vmovdqa64_avx512f(auVar295);
                          auVar304 = vmovdqa64_avx512f(auVar296);
                          auVar305 = vmovdqa64_avx512f(auVar309);
                          do {
                            uVar165 = vpcmpuq_avx512f(auVar303,auVar300,2);
                            uVar42 = vpcmpuq_avx512f(auVar304,auVar300,2);
                            bVar32 = (byte)uVar42;
                            uVar183 = CONCAT11(bVar32,(byte)uVar165);
                            auVar306 = vpmulld_avx512f(auVar302,auVar305);
                            auVar306 = vpaddd_avx512f(auVar301,auVar306);
                            uVar184 = vpcmpgtd_avx512f(auVar306,auVar294);
                            uVar184 = uVar183 & uVar184;
                            auVar307 = vpgatherdd_avx512f(*(undefined4 *)
                                                           (&this->field_0xe4 +
                                                           (long)(p_Var169 + uVar171 * 4)));
                            iVar154 = (uint)((byte)uVar184 & 1) * auVar307._0_4_;
                            iVar152 = (uint)((byte)(uVar184 >> 1) & 1) * auVar307._4_4_;
                            auVar325._4_4_ = iVar152;
                            auVar325._0_4_ = iVar154;
                            iVar156 = (uint)((byte)(uVar184 >> 2) & 1) * auVar307._8_4_;
                            auVar325._8_4_ = iVar156;
                            iVar153 = (uint)((byte)(uVar184 >> 3) & 1) * auVar307._12_4_;
                            auVar325._12_4_ = iVar153;
                            auVar325._16_4_ = (uint)((byte)(uVar184 >> 4) & 1) * auVar307._16_4_;
                            auVar325._20_4_ = (uint)((byte)(uVar184 >> 5) & 1) * auVar307._20_4_;
                            auVar325._24_4_ = (uint)((byte)(uVar184 >> 6) & 1) * auVar307._24_4_;
                            auVar325._28_4_ = (uint)((byte)(uVar184 >> 7) & 1) * auVar307._28_4_;
                            auVar325._32_4_ = (uint)((byte)(uVar184 >> 8) & 1) * auVar307._32_4_;
                            auVar325._36_4_ = (uint)((byte)(uVar184 >> 9) & 1) * auVar307._36_4_;
                            auVar325._40_4_ = (uint)((byte)(uVar184 >> 10) & 1) * auVar307._40_4_;
                            auVar325._44_4_ = (uint)((byte)(uVar184 >> 0xb) & 1) * auVar307._44_4_;
                            auVar325._48_4_ = (uint)((byte)(uVar184 >> 0xc) & 1) * auVar307._48_4_;
                            auVar325._52_4_ = (uint)((byte)(uVar184 >> 0xd) & 1) * auVar307._52_4_;
                            auVar325._56_4_ = (uint)((byte)(uVar184 >> 0xe) & 1) * auVar307._56_4_;
                            auVar325._60_4_ = (uint)(byte)(uVar184 >> 0xf) * auVar307._60_4_;
                            if ((uVar184 & 1) != 0) {
                              in_ZMM9 = ZEXT464((uint)(auVar306._0_4_ % iVar154));
                            }
                            if ((uVar184 & 2) != 0) {
                              auVar187 = vpinsrd_avx(in_ZMM9._0_16_,auVar306._4_4_ % iVar152,1);
                              in_ZMM9 = vinserti32x4_avx512f(in_ZMM9,auVar187,0);
                            }
                            if ((uVar184 & 4) != 0) {
                              auVar187 = vpinsrd_avx(in_ZMM9._0_16_,auVar306._8_4_ % iVar156,2);
                              in_ZMM9 = vinserti32x4_avx512f(in_ZMM9,auVar187,0);
                            }
                            if ((uVar184 & 8) != 0) {
                              auVar187 = vpinsrd_avx(in_ZMM9._0_16_,auVar306._12_4_ % iVar153,3);
                              in_ZMM9 = vinserti32x4_avx512f(in_ZMM9,auVar187,0);
                            }
                            auVar326 = in_ZMM9;
                            if ((uVar184 & 0x10) != 0) {
                              auVar307 = vpbroadcastd_avx512f();
                              auVar326._0_16_ = in_ZMM9._0_16_;
                              auVar326._16_4_ = auVar307._16_4_;
                              auVar326._20_4_ = in_ZMM9._20_4_;
                              auVar326._24_4_ = in_ZMM9._24_4_;
                              auVar326._28_4_ = in_ZMM9._28_4_;
                              auVar326._32_4_ = in_ZMM9._32_4_;
                              auVar326._36_4_ = in_ZMM9._36_4_;
                              auVar326._40_4_ = in_ZMM9._40_4_;
                              auVar326._44_4_ = in_ZMM9._44_4_;
                              auVar326._48_4_ = in_ZMM9._48_4_;
                              auVar326._52_4_ = in_ZMM9._52_4_;
                              auVar326._56_4_ = in_ZMM9._56_4_;
                              auVar326._60_4_ = in_ZMM9._60_4_;
                            }
                            auVar327 = auVar326;
                            if ((uVar184 & 0x20) != 0) {
                              auVar307 = vpbroadcastd_avx512f();
                              auVar327._0_20_ = auVar326._0_20_;
                              auVar327._20_4_ = auVar307._20_4_;
                              auVar327._24_4_ = auVar326._24_4_;
                              auVar327._28_4_ = auVar326._28_4_;
                              auVar327._32_4_ = auVar326._32_4_;
                              auVar327._36_4_ = auVar326._36_4_;
                              auVar327._40_4_ = auVar326._40_4_;
                              auVar327._44_4_ = auVar326._44_4_;
                              auVar327._48_4_ = auVar326._48_4_;
                              auVar327._52_4_ = auVar326._52_4_;
                              auVar327._56_4_ = auVar326._56_4_;
                              auVar327._60_4_ = auVar326._60_4_;
                            }
                            auVar328 = auVar327;
                            if ((uVar184 & 0x40) != 0) {
                              auVar307 = vpbroadcastd_avx512f();
                              auVar328._0_24_ = auVar327._0_24_;
                              auVar328._24_4_ = auVar307._24_4_;
                              auVar328._28_4_ = auVar327._28_4_;
                              auVar328._32_4_ = auVar327._32_4_;
                              auVar328._36_4_ = auVar327._36_4_;
                              auVar328._40_4_ = auVar327._40_4_;
                              auVar328._44_4_ = auVar327._44_4_;
                              auVar328._48_4_ = auVar327._48_4_;
                              auVar328._52_4_ = auVar327._52_4_;
                              auVar328._56_4_ = auVar327._56_4_;
                              auVar328._60_4_ = auVar327._60_4_;
                            }
                            auVar329 = auVar328;
                            if ((uVar184 & 0x80) != 0) {
                              auVar307 = vpbroadcastd_avx512f();
                              auVar329._0_28_ = auVar328._0_28_;
                              auVar329._28_4_ = auVar307._28_4_;
                              auVar329._32_4_ = auVar328._32_4_;
                              auVar329._36_4_ = auVar328._36_4_;
                              auVar329._40_4_ = auVar328._40_4_;
                              auVar329._44_4_ = auVar328._44_4_;
                              auVar329._48_4_ = auVar328._48_4_;
                              auVar329._52_4_ = auVar328._52_4_;
                              auVar329._56_4_ = auVar328._56_4_;
                              auVar329._60_4_ = auVar328._60_4_;
                            }
                            auVar330 = auVar329;
                            if ((uVar184 & 0x100) != 0) {
                              vextracti32x4_avx512f(auVar306,2);
                              vextracti32x4_avx512f(auVar325,2);
                              auVar307 = vpbroadcastd_avx512f();
                              auVar330._0_32_ = auVar329._0_32_;
                              auVar330._32_4_ = auVar307._32_4_;
                              auVar330._36_4_ = auVar329._36_4_;
                              auVar330._40_4_ = auVar329._40_4_;
                              auVar330._44_4_ = auVar329._44_4_;
                              auVar330._48_4_ = auVar329._48_4_;
                              auVar330._52_4_ = auVar329._52_4_;
                              auVar330._56_4_ = auVar329._56_4_;
                              auVar330._60_4_ = auVar329._60_4_;
                            }
                            auVar331 = auVar330;
                            if ((uVar184 & 0x200) != 0) {
                              vextracti32x4_avx512f(auVar306,2);
                              vextracti32x4_avx512f(auVar325,2);
                              auVar307 = vpbroadcastd_avx512f();
                              auVar331._0_36_ = auVar330._0_36_;
                              auVar331._36_4_ = auVar307._36_4_;
                              auVar331._40_4_ = auVar330._40_4_;
                              auVar331._44_4_ = auVar330._44_4_;
                              auVar331._48_4_ = auVar330._48_4_;
                              auVar331._52_4_ = auVar330._52_4_;
                              auVar331._56_4_ = auVar330._56_4_;
                              auVar331._60_4_ = auVar330._60_4_;
                            }
                            auVar332 = auVar331;
                            if ((uVar184 & 0x400) != 0) {
                              vextracti32x4_avx512f(auVar306,2);
                              vextracti32x4_avx512f(auVar325,2);
                              auVar307 = vpbroadcastd_avx512f();
                              auVar332._0_40_ = auVar331._0_40_;
                              auVar332._40_4_ = auVar307._40_4_;
                              auVar332._44_4_ = auVar331._44_4_;
                              auVar332._48_4_ = auVar331._48_4_;
                              auVar332._52_4_ = auVar331._52_4_;
                              auVar332._56_4_ = auVar331._56_4_;
                              auVar332._60_4_ = auVar331._60_4_;
                            }
                            auVar333 = auVar332;
                            if ((uVar184 & 0x800) != 0) {
                              vextracti32x4_avx512f(auVar306,2);
                              vextracti32x4_avx512f(auVar325,2);
                              auVar307 = vpbroadcastd_avx512f();
                              auVar333._0_44_ = auVar332._0_44_;
                              auVar333._44_4_ = auVar307._44_4_;
                              auVar333._48_4_ = auVar332._48_4_;
                              auVar333._52_4_ = auVar332._52_4_;
                              auVar333._56_4_ = auVar332._56_4_;
                              auVar333._60_4_ = auVar332._60_4_;
                            }
                            auVar334 = auVar333;
                            if ((uVar184 & 0x1000) != 0) {
                              vextracti32x4_avx512f(auVar306,3);
                              vextracti32x4_avx512f(auVar325,3);
                              auVar307 = vpbroadcastd_avx512f();
                              auVar334._0_48_ = auVar333._0_48_;
                              auVar334._48_4_ = auVar307._48_4_;
                              auVar334._52_4_ = auVar333._52_4_;
                              auVar334._56_4_ = auVar333._56_4_;
                              auVar334._60_4_ = auVar333._60_4_;
                            }
                            auVar335 = auVar334;
                            if ((uVar184 & 0x2000) != 0) {
                              vextracti32x4_avx512f(auVar306,3);
                              vextracti32x4_avx512f(auVar325,3);
                              auVar307 = vpbroadcastd_avx512f();
                              auVar335._0_52_ = auVar334._0_52_;
                              auVar335._52_4_ = auVar307._52_4_;
                              auVar335._56_4_ = auVar334._56_4_;
                              auVar335._60_4_ = auVar334._60_4_;
                            }
                            auVar336 = auVar335;
                            if ((uVar184 & 0x4000) != 0) {
                              vextracti32x4_avx512f(auVar306,3);
                              vextracti32x4_avx512f(auVar325,3);
                              auVar307 = vpbroadcastd_avx512f();
                              auVar336._0_56_ = auVar335._0_56_;
                              auVar336._56_4_ = auVar307._56_4_;
                              auVar336._60_4_ = auVar335._60_4_;
                            }
                            auVar467 = auVar336;
                            if ((uVar184 & 0x8000) != 0) {
                              vextracti32x4_avx512f(auVar306,3);
                              vextracti32x4_avx512f(auVar325,3);
                              auVar307 = vpbroadcastd_avx512f();
                              auVar467._60_4_ = auVar307._60_4_;
                              auVar467._0_60_ = auVar336._0_60_;
                            }
                            uVar185 = vptestnmd_avx512f(auVar467,auVar467);
                            uVar184 = uVar184 & uVar185;
                            if ((uVar184 & 1) != 0) {
                              auVar467 = ZEXT464((uint)(auVar306._0_4_ / iVar154));
                            }
                            if ((uVar184 & 2) != 0) {
                              auVar187 = vpinsrd_avx(auVar467._0_16_,auVar306._4_4_ / iVar152,1);
                              auVar467 = vinserti32x4_avx512f(auVar467,auVar187,0);
                            }
                            if ((uVar184 & 4) != 0) {
                              auVar187 = vpinsrd_avx(auVar467._0_16_,auVar306._8_4_ / iVar156,2);
                              auVar467 = vinserti32x4_avx512f(auVar467,auVar187,0);
                            }
                            if ((uVar184 & 8) != 0) {
                              auVar187 = vpinsrd_avx(auVar467._0_16_,auVar306._12_4_ / iVar153,3);
                              auVar467 = vinserti32x4_avx512f(auVar467,auVar187,0);
                            }
                            auVar337 = auVar467;
                            if ((uVar184 & 0x10) != 0) {
                              auVar307 = vpbroadcastd_avx512f();
                              auVar337._0_16_ = auVar467._0_16_;
                              auVar337._16_4_ = auVar307._16_4_;
                              auVar337._20_4_ = auVar467._20_4_;
                              auVar337._24_4_ = auVar467._24_4_;
                              auVar337._28_4_ = auVar467._28_4_;
                              auVar337._32_4_ = auVar467._32_4_;
                              auVar337._36_4_ = auVar467._36_4_;
                              auVar337._40_4_ = auVar467._40_4_;
                              auVar337._44_4_ = auVar467._44_4_;
                              auVar337._48_4_ = auVar467._48_4_;
                              auVar337._52_4_ = auVar467._52_4_;
                              auVar337._56_4_ = auVar467._56_4_;
                              auVar337._60_4_ = auVar467._60_4_;
                            }
                            auVar338 = auVar337;
                            if ((uVar184 & 0x20) != 0) {
                              auVar307 = vpbroadcastd_avx512f();
                              auVar338._0_20_ = auVar337._0_20_;
                              auVar338._20_4_ = auVar307._20_4_;
                              auVar338._24_4_ = auVar337._24_4_;
                              auVar338._28_4_ = auVar337._28_4_;
                              auVar338._32_4_ = auVar337._32_4_;
                              auVar338._36_4_ = auVar337._36_4_;
                              auVar338._40_4_ = auVar337._40_4_;
                              auVar338._44_4_ = auVar337._44_4_;
                              auVar338._48_4_ = auVar337._48_4_;
                              auVar338._52_4_ = auVar337._52_4_;
                              auVar338._56_4_ = auVar337._56_4_;
                              auVar338._60_4_ = auVar337._60_4_;
                            }
                            auVar339 = auVar338;
                            if ((uVar184 & 0x40) != 0) {
                              auVar307 = vpbroadcastd_avx512f();
                              auVar339._0_24_ = auVar338._0_24_;
                              auVar339._24_4_ = auVar307._24_4_;
                              auVar339._28_4_ = auVar338._28_4_;
                              auVar339._32_4_ = auVar338._32_4_;
                              auVar339._36_4_ = auVar338._36_4_;
                              auVar339._40_4_ = auVar338._40_4_;
                              auVar339._44_4_ = auVar338._44_4_;
                              auVar339._48_4_ = auVar338._48_4_;
                              auVar339._52_4_ = auVar338._52_4_;
                              auVar339._56_4_ = auVar338._56_4_;
                              auVar339._60_4_ = auVar338._60_4_;
                            }
                            auVar340 = auVar339;
                            if ((uVar184 & 0x80) != 0) {
                              auVar307 = vpbroadcastd_avx512f();
                              auVar340._0_28_ = auVar339._0_28_;
                              auVar340._28_4_ = auVar307._28_4_;
                              auVar340._32_4_ = auVar339._32_4_;
                              auVar340._36_4_ = auVar339._36_4_;
                              auVar340._40_4_ = auVar339._40_4_;
                              auVar340._44_4_ = auVar339._44_4_;
                              auVar340._48_4_ = auVar339._48_4_;
                              auVar340._52_4_ = auVar339._52_4_;
                              auVar340._56_4_ = auVar339._56_4_;
                              auVar340._60_4_ = auVar339._60_4_;
                            }
                            auVar341 = auVar340;
                            if ((uVar184 & 0x100) != 0) {
                              vextracti32x4_avx512f(auVar306,2);
                              vextracti32x4_avx512f(auVar325,2);
                              auVar307 = vpbroadcastd_avx512f();
                              auVar341._0_32_ = auVar340._0_32_;
                              auVar341._32_4_ = auVar307._32_4_;
                              auVar341._36_4_ = auVar340._36_4_;
                              auVar341._40_4_ = auVar340._40_4_;
                              auVar341._44_4_ = auVar340._44_4_;
                              auVar341._48_4_ = auVar340._48_4_;
                              auVar341._52_4_ = auVar340._52_4_;
                              auVar341._56_4_ = auVar340._56_4_;
                              auVar341._60_4_ = auVar340._60_4_;
                            }
                            auVar342 = auVar341;
                            if ((uVar184 & 0x200) != 0) {
                              vextracti32x4_avx512f(auVar306,2);
                              vextracti32x4_avx512f(auVar325,2);
                              auVar307 = vpbroadcastd_avx512f();
                              auVar342._0_36_ = auVar341._0_36_;
                              auVar342._36_4_ = auVar307._36_4_;
                              auVar342._40_4_ = auVar341._40_4_;
                              auVar342._44_4_ = auVar341._44_4_;
                              auVar342._48_4_ = auVar341._48_4_;
                              auVar342._52_4_ = auVar341._52_4_;
                              auVar342._56_4_ = auVar341._56_4_;
                              auVar342._60_4_ = auVar341._60_4_;
                            }
                            auVar343 = auVar342;
                            if ((uVar184 & 0x400) != 0) {
                              vextracti32x4_avx512f(auVar306,2);
                              vextracti32x4_avx512f(auVar325,2);
                              auVar307 = vpbroadcastd_avx512f();
                              auVar343._0_40_ = auVar342._0_40_;
                              auVar343._40_4_ = auVar307._40_4_;
                              auVar343._44_4_ = auVar342._44_4_;
                              auVar343._48_4_ = auVar342._48_4_;
                              auVar343._52_4_ = auVar342._52_4_;
                              auVar343._56_4_ = auVar342._56_4_;
                              auVar343._60_4_ = auVar342._60_4_;
                            }
                            auVar344 = auVar343;
                            if ((uVar184 & 0x800) != 0) {
                              vextracti32x4_avx512f(auVar306,2);
                              vextracti32x4_avx512f(auVar325,2);
                              auVar307 = vpbroadcastd_avx512f();
                              auVar344._0_44_ = auVar343._0_44_;
                              auVar344._44_4_ = auVar307._44_4_;
                              auVar344._48_4_ = auVar343._48_4_;
                              auVar344._52_4_ = auVar343._52_4_;
                              auVar344._56_4_ = auVar343._56_4_;
                              auVar344._60_4_ = auVar343._60_4_;
                            }
                            auVar345 = auVar344;
                            if ((uVar184 & 0x1000) != 0) {
                              vextracti32x4_avx512f(auVar306,3);
                              vextracti32x4_avx512f(auVar325,3);
                              auVar307 = vpbroadcastd_avx512f();
                              auVar345._0_48_ = auVar344._0_48_;
                              auVar345._48_4_ = auVar307._48_4_;
                              auVar345._52_4_ = auVar344._52_4_;
                              auVar345._56_4_ = auVar344._56_4_;
                              auVar345._60_4_ = auVar344._60_4_;
                            }
                            auVar346 = auVar345;
                            if ((uVar184 & 0x2000) != 0) {
                              vextracti32x4_avx512f(auVar306,3);
                              vextracti32x4_avx512f(auVar325,3);
                              auVar307 = vpbroadcastd_avx512f();
                              auVar346._0_52_ = auVar345._0_52_;
                              auVar346._52_4_ = auVar307._52_4_;
                              auVar346._56_4_ = auVar345._56_4_;
                              auVar346._60_4_ = auVar345._60_4_;
                            }
                            auVar347 = auVar346;
                            if ((uVar184 & 0x4000) != 0) {
                              vextracti32x4_avx512f(auVar306,3);
                              vextracti32x4_avx512f(auVar325,3);
                              auVar307 = vpbroadcastd_avx512f();
                              auVar347._0_56_ = auVar346._0_56_;
                              auVar347._56_4_ = auVar307._56_4_;
                              auVar347._60_4_ = auVar346._60_4_;
                            }
                            in_ZMM9 = auVar347;
                            if ((uVar184 & 0x8000) != 0) {
                              vextracti32x4_avx512f(auVar306,3);
                              vextracti32x4_avx512f(auVar325,3);
                              auVar306 = vpbroadcastd_avx512f();
                              in_ZMM9._60_4_ = auVar306._60_4_;
                              in_ZMM9._0_60_ = auVar347._0_60_;
                            }
                            uVar185 = vpcmpgtd_avx512f(auVar297,in_ZMM9);
                            uVar185 = uVar184 & uVar185;
                            auVar306 = vgatherdps_avx512f(*(undefined4 *)
                                                           ((long)pvVar178 +
                                                           uVar172 * 4 +
                                                           (long)iVar151 * (long)iVar181 * sVar16 +
                                                           sVar17 * sVar16 * uVar177));
                            bVar23 = (byte)uVar185;
                            auVar348._4_4_ = (uint)((byte)(uVar185 >> 1) & 1) * auVar306._4_4_;
                            auVar348._0_4_ = (uint)(bVar23 & 1) * auVar306._0_4_;
                            auVar348._8_4_ = (uint)((byte)(uVar185 >> 2) & 1) * auVar306._8_4_;
                            auVar348._12_4_ = (uint)((byte)(uVar185 >> 3) & 1) * auVar306._12_4_;
                            auVar348._16_4_ = (uint)((byte)(uVar185 >> 4) & 1) * auVar306._16_4_;
                            auVar348._20_4_ = (uint)((byte)(uVar185 >> 5) & 1) * auVar306._20_4_;
                            auVar348._24_4_ = (uint)((byte)(uVar185 >> 6) & 1) * auVar306._24_4_;
                            auVar348._28_4_ = (uint)((byte)(uVar185 >> 7) & 1) * auVar306._28_4_;
                            bVar33 = (byte)(uVar185 >> 8);
                            auVar348._32_4_ = (uint)(bVar33 & 1) * auVar306._32_4_;
                            auVar348._36_4_ = (uint)((byte)(uVar185 >> 9) & 1) * auVar306._36_4_;
                            auVar348._40_4_ = (uint)((byte)(uVar185 >> 10) & 1) * auVar306._40_4_;
                            auVar348._44_4_ = (uint)((byte)(uVar185 >> 0xb) & 1) * auVar306._44_4_;
                            auVar348._48_4_ = (uint)((byte)(uVar185 >> 0xc) & 1) * auVar306._48_4_;
                            auVar348._52_4_ = (uint)((byte)(uVar185 >> 0xd) & 1) * auVar306._52_4_;
                            auVar348._56_4_ = (uint)((byte)(uVar185 >> 0xe) & 1) * auVar306._56_4_;
                            auVar348._60_4_ = (uint)(byte)(uVar185 >> 0xf) * auVar306._60_4_;
                            piVar14 = (int *)(local_198 + (ulong)(uint)(iVar180 * iVar155) * 4 +
                                             uVar171 * 4);
                            auVar349._4_4_ = (uint)((byte)(uVar185 >> 1) & 1) * piVar14[1];
                            auVar349._0_4_ = (uint)(bVar23 & 1) * *piVar14;
                            auVar349._8_4_ = (uint)((byte)(uVar185 >> 2) & 1) * piVar14[2];
                            auVar349._12_4_ = (uint)((byte)(uVar185 >> 3) & 1) * piVar14[3];
                            auVar349._16_4_ = (uint)((byte)(uVar185 >> 4) & 1) * piVar14[4];
                            auVar349._20_4_ = (uint)((byte)(uVar185 >> 5) & 1) * piVar14[5];
                            auVar349._24_4_ = (uint)((byte)(uVar185 >> 6) & 1) * piVar14[6];
                            auVar349._28_4_ = (uint)((byte)(uVar185 >> 7) & 1) * piVar14[7];
                            auVar349._32_4_ = (uint)(bVar33 & 1) * piVar14[8];
                            auVar349._36_4_ = (uint)((byte)(uVar185 >> 9) & 1) * piVar14[9];
                            auVar349._40_4_ = (uint)((byte)(uVar185 >> 10) & 1) * piVar14[10];
                            auVar349._44_4_ = (uint)((byte)(uVar185 >> 0xb) & 1) * piVar14[0xb];
                            auVar349._48_4_ = (uint)((byte)(uVar185 >> 0xc) & 1) * piVar14[0xc];
                            auVar349._52_4_ = (uint)((byte)(uVar185 >> 0xd) & 1) * piVar14[0xd];
                            auVar349._56_4_ = (uint)((byte)(uVar185 >> 0xe) & 1) * piVar14[0xe];
                            auVar349._60_4_ = (uint)(byte)(uVar185 >> 0xf) * piVar14[0xf];
                            uVar41 = vpcmpd_avx512f(in_ZMM9,auVar297,5);
                            uVar184 = uVar184 & uVar41;
                            auVar306 = vfmadd231ps_avx512f(auVar415,auVar349,auVar348);
                            iVar152 = auVar415._0_4_;
                            bVar25 = (bool)((byte)(uVar185 >> 1) & 1);
                            iVar153 = auVar415._4_4_;
                            bVar26 = (bool)((byte)(uVar185 >> 2) & 1);
                            iVar154 = auVar415._8_4_;
                            bVar27 = (bool)((byte)(uVar185 >> 3) & 1);
                            iVar156 = auVar415._12_4_;
                            bVar28 = (bool)((byte)(uVar185 >> 4) & 1);
                            iVar157 = auVar415._16_4_;
                            bVar29 = (bool)((byte)(uVar185 >> 5) & 1);
                            iVar351 = auVar415._20_4_;
                            bVar30 = (bool)((byte)(uVar185 >> 6) & 1);
                            iVar352 = auVar415._24_4_;
                            bVar31 = (bool)((byte)(uVar185 >> 7) & 1);
                            iVar353 = auVar415._28_4_;
                            iVar354 = auVar415._32_4_;
                            bVar34 = (bool)((byte)(uVar185 >> 9) & 1);
                            iVar355 = auVar415._36_4_;
                            bVar35 = (bool)((byte)(uVar185 >> 10) & 1);
                            iVar356 = auVar415._40_4_;
                            bVar36 = (bool)((byte)(uVar185 >> 0xb) & 1);
                            iVar357 = auVar415._44_4_;
                            bVar37 = (bool)((byte)(uVar185 >> 0xc) & 1);
                            iVar358 = auVar415._48_4_;
                            bVar38 = (bool)((byte)(uVar185 >> 0xd) & 1);
                            iVar359 = auVar415._52_4_;
                            bVar39 = (bool)((byte)(uVar185 >> 0xe) & 1);
                            iVar360 = auVar415._56_4_;
                            bVar40 = SUB81(uVar185 >> 0xf,0);
                            iVar361 = auVar415._60_4_;
                            bVar24 = (bool)((byte)uVar184 & 1);
                            auVar415._0_4_ =
                                 (uint)bVar24 * iVar152 |
                                 (uint)!bVar24 *
                                 ((uint)(bVar23 & 1) * auVar306._0_4_ |
                                 (uint)!(bool)(bVar23 & 1) * iVar152);
                            bVar24 = (bool)((byte)(uVar184 >> 1) & 1);
                            auVar415._4_4_ =
                                 (uint)bVar24 * iVar153 |
                                 (uint)!bVar24 *
                                 ((uint)bVar25 * auVar306._4_4_ | (uint)!bVar25 * iVar153);
                            bVar24 = (bool)((byte)(uVar184 >> 2) & 1);
                            auVar415._8_4_ =
                                 (uint)bVar24 * iVar154 |
                                 (uint)!bVar24 *
                                 ((uint)bVar26 * auVar306._8_4_ | (uint)!bVar26 * iVar154);
                            bVar24 = (bool)((byte)(uVar184 >> 3) & 1);
                            auVar415._12_4_ =
                                 (uint)bVar24 * iVar156 |
                                 (uint)!bVar24 *
                                 ((uint)bVar27 * auVar306._12_4_ | (uint)!bVar27 * iVar156);
                            bVar24 = (bool)((byte)(uVar184 >> 4) & 1);
                            auVar415._16_4_ =
                                 (uint)bVar24 * iVar157 |
                                 (uint)!bVar24 *
                                 ((uint)bVar28 * auVar306._16_4_ | (uint)!bVar28 * iVar157);
                            bVar24 = (bool)((byte)(uVar184 >> 5) & 1);
                            auVar415._20_4_ =
                                 (uint)bVar24 * iVar351 |
                                 (uint)!bVar24 *
                                 ((uint)bVar29 * auVar306._20_4_ | (uint)!bVar29 * iVar351);
                            bVar24 = (bool)((byte)(uVar184 >> 6) & 1);
                            auVar415._24_4_ =
                                 (uint)bVar24 * iVar352 |
                                 (uint)!bVar24 *
                                 ((uint)bVar30 * auVar306._24_4_ | (uint)!bVar30 * iVar352);
                            bVar24 = (bool)((byte)(uVar184 >> 7) & 1);
                            auVar415._28_4_ =
                                 (uint)bVar24 * iVar353 |
                                 (uint)!bVar24 *
                                 ((uint)bVar31 * auVar306._28_4_ | (uint)!bVar31 * iVar353);
                            bVar24 = (bool)((byte)(uVar184 >> 8) & 1);
                            auVar415._32_4_ =
                                 (uint)bVar24 * iVar354 |
                                 (uint)!bVar24 *
                                 ((uint)(bVar33 & 1) * auVar306._32_4_ |
                                 (uint)!(bool)(bVar33 & 1) * iVar354);
                            bVar24 = (bool)((byte)(uVar184 >> 9) & 1);
                            auVar415._36_4_ =
                                 (uint)bVar24 * iVar355 |
                                 (uint)!bVar24 *
                                 ((uint)bVar34 * auVar306._36_4_ | (uint)!bVar34 * iVar355);
                            bVar24 = (bool)((byte)(uVar184 >> 10) & 1);
                            auVar415._40_4_ =
                                 (uint)bVar24 * iVar356 |
                                 (uint)!bVar24 *
                                 ((uint)bVar35 * auVar306._40_4_ | (uint)!bVar35 * iVar356);
                            bVar24 = (bool)((byte)(uVar184 >> 0xb) & 1);
                            auVar415._44_4_ =
                                 (uint)bVar24 * iVar357 |
                                 (uint)!bVar24 *
                                 ((uint)bVar36 * auVar306._44_4_ | (uint)!bVar36 * iVar357);
                            bVar24 = (bool)((byte)(uVar184 >> 0xc) & 1);
                            auVar415._48_4_ =
                                 (uint)bVar24 * iVar358 |
                                 (uint)!bVar24 *
                                 ((uint)bVar37 * auVar306._48_4_ | (uint)!bVar37 * iVar358);
                            bVar24 = (bool)((byte)(uVar184 >> 0xd) & 1);
                            auVar415._52_4_ =
                                 (uint)bVar24 * iVar359 |
                                 (uint)!bVar24 *
                                 ((uint)bVar38 * auVar306._52_4_ | (uint)!bVar38 * iVar359);
                            bVar24 = (bool)((byte)(uVar184 >> 0xe) & 1);
                            auVar415._56_4_ =
                                 (uint)bVar24 * iVar360 |
                                 (uint)!bVar24 *
                                 ((uint)bVar39 * auVar306._56_4_ | (uint)!bVar39 * iVar360);
                            bVar24 = SUB81(uVar184 >> 0xf,0);
                            auVar415._60_4_ =
                                 (uint)bVar24 * iVar361 |
                                 (uint)!bVar24 *
                                 ((uint)bVar40 * auVar306._60_4_ | (uint)!bVar40 * iVar361);
                            uVar171 = uVar171 + 0x10;
                            auVar303 = vpaddq_avx512f(auVar303,auVar293);
                            auVar304 = vpaddq_avx512f(auVar304,auVar293);
                            auVar305 = vpaddd_avx512f(auVar305,auVar292);
                          } while (uVar172 != uVar171);
                          bVar24 = (bool)((byte)uVar165 & 1);
                          auVar350._0_4_ = bVar24 * auVar415._0_4_ | (uint)!bVar24 * iVar152;
                          bVar24 = (bool)((byte)(uVar183 >> 1) & 1);
                          auVar350._4_4_ = bVar24 * auVar415._4_4_ | (uint)!bVar24 * iVar153;
                          bVar24 = (bool)((byte)(uVar183 >> 2) & 1);
                          auVar350._8_4_ = bVar24 * auVar415._8_4_ | (uint)!bVar24 * iVar154;
                          bVar24 = (bool)((byte)(uVar183 >> 3) & 1);
                          auVar350._12_4_ = bVar24 * auVar415._12_4_ | (uint)!bVar24 * iVar156;
                          bVar24 = (bool)((byte)(uVar183 >> 4) & 1);
                          auVar350._16_4_ = bVar24 * auVar415._16_4_ | (uint)!bVar24 * iVar157;
                          bVar24 = (bool)((byte)(uVar183 >> 5) & 1);
                          auVar350._20_4_ = bVar24 * auVar415._20_4_ | (uint)!bVar24 * iVar351;
                          bVar24 = (bool)((byte)(uVar183 >> 6) & 1);
                          auVar350._24_4_ = bVar24 * auVar415._24_4_ | (uint)!bVar24 * iVar352;
                          bVar24 = (bool)((byte)(uVar183 >> 7) & 1);
                          auVar350._28_4_ = bVar24 * auVar415._28_4_ | (uint)!bVar24 * iVar353;
                          auVar350._32_4_ =
                               (bVar32 & 1) * auVar415._32_4_ | (uint)!(bool)(bVar32 & 1) * iVar354;
                          bVar24 = (bool)(bVar32 >> 1 & 1);
                          auVar350._36_4_ = bVar24 * auVar415._36_4_ | (uint)!bVar24 * iVar355;
                          bVar24 = (bool)(bVar32 >> 2 & 1);
                          auVar350._40_4_ = bVar24 * auVar415._40_4_ | (uint)!bVar24 * iVar356;
                          bVar24 = (bool)(bVar32 >> 3 & 1);
                          auVar350._44_4_ = bVar24 * auVar415._44_4_ | (uint)!bVar24 * iVar357;
                          bVar24 = (bool)(bVar32 >> 4 & 1);
                          auVar350._48_4_ = bVar24 * auVar415._48_4_ | (uint)!bVar24 * iVar358;
                          bVar24 = (bool)(bVar32 >> 5 & 1);
                          auVar350._52_4_ = bVar24 * auVar415._52_4_ | (uint)!bVar24 * iVar359;
                          bVar24 = (bool)(bVar32 >> 6 & 1);
                          auVar350._56_4_ = bVar24 * auVar415._56_4_ | (uint)!bVar24 * iVar360;
                          auVar350._60_4_ =
                               (bVar32 >> 7) * auVar415._60_4_ |
                               (uint)!(bool)(bVar32 >> 7) * iVar361;
                          auVar240 = vextractf64x4_avx512f(auVar350,1);
                          auVar300 = vaddps_avx512f(auVar350,ZEXT3264(auVar240));
                          auVar369._0_4_ = auVar300._0_4_ + auVar300._16_4_;
                          auVar369._4_4_ = auVar300._4_4_ + auVar300._20_4_;
                          auVar369._8_4_ = auVar300._8_4_ + auVar300._24_4_;
                          auVar369._12_4_ = auVar300._12_4_ + auVar300._28_4_;
                          auVar187 = vshufpd_avx(auVar369,auVar369,1);
                          auVar370._0_4_ = auVar369._0_4_ + auVar187._0_4_;
                          auVar370._4_4_ = auVar369._4_4_ + auVar187._4_4_;
                          auVar370._8_4_ = auVar369._8_4_ + auVar187._8_4_;
                          auVar370._12_4_ = auVar369._12_4_ + auVar187._12_4_;
                          auVar187 = vhaddps_avx(auVar370,auVar370);
                          auVar300 = ZEXT1664(auVar187);
                        }
                        iVar155 = iVar155 + 1;
                      } while (iVar155 != *(int *)(&this->field_0xd8 + (long)p_Var169));
                    }
                    auVar187 = auVar300._0_16_;
                    uVar177 = uVar177 + 1;
                    local_198 = local_198 + (long)iVar182 * 4;
                  } while (uVar177 != uVar10);
                }
                fVar377 = auVar187._0_4_;
                fVar362 = fVar377;
                switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var161)) {
                case 1:
                  auVar186 = vmaxss_avx(auVar187,ZEXT416(0));
                  fVar362 = auVar186._0_4_;
                  break;
                case 2:
                  uVar165 = vcmpss_avx512f(auVar187,ZEXT416(0),0xe);
                  bVar24 = (bool)((byte)uVar165 & 1);
                  fVar362 = (float)((uint)bVar24 * 0x3f800000 +
                                   (uint)!bVar24 * **(int **)(&this->field_0x118 + (long)p_Var161))
                            * fVar377;
                  break;
                case 3:
                  fVar377 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var161))[1];
                  auVar186 = vmaxss_avx(auVar187,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                    (long)p_Var161)));
                  fVar362 = auVar186._0_4_;
                  if (fVar377 < auVar186._0_4_) {
                    fVar362 = fVar377;
                  }
                  break;
                case 4:
                  auVar187 = vminss_avx(auVar187,SUB6416(ZEXT464(0x42b0c0a5),0));
                  auVar86._8_4_ = 0x80000000;
                  auVar86._0_8_ = 0x8000000080000000;
                  auVar86._12_4_ = 0x80000000;
                  auVar188 = vxorps_avx512vl(auVar187,auVar86);
                  uVar165 = vcmpss_avx512f(auVar187,ZEXT416(0xc2b0c0a5),1);
                  bVar24 = (bool)((byte)uVar165 & 1);
                  in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                  fVar362 = expf((float)((uint)bVar24 * 0x42b0c0a5 + (uint)!bVar24 * auVar188._0_4_)
                                );
                  auVar292 = vpbroadcastd_avx512f(ZEXT416(0x10));
                  auVar293 = vpbroadcastq_avx512f(ZEXT816(0x10));
                  auVar186 = vxorps_avx512vl(auVar186,auVar186);
                  auVar299 = ZEXT1664(auVar186);
                  auVar294 = vpternlogd_avx512f(auVar294,auVar294,auVar294,0xff);
                  auVar309 = vpmovsxbd_avx512f(_DAT_0051a480);
                  auVar295 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                  auVar296 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                  auVar298 = ZEXT1264(ZEXT812(0));
                  auVar297 = vmovdqu64_avx512f(local_e8);
                  fVar362 = 1.0 / (fVar362 + 1.0);
                  break;
                case 5:
                  in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                  local_108 = auVar187;
                  fVar362 = expf(fVar377);
                  fVar362 = logf(fVar362 + 1.0);
                  fVar362 = tanhf(fVar362);
                  auVar292 = vpbroadcastd_avx512f(ZEXT416(0x10));
                  auVar293 = vpbroadcastq_avx512f(ZEXT816(0x10));
                  auVar186 = vxorps_avx512vl(auVar186,auVar186);
                  auVar299 = ZEXT1664(auVar186);
                  auVar294 = vpternlogd_avx512f(auVar294,auVar294,auVar294,0xff);
                  auVar309 = vpmovsxbd_avx512f(_DAT_0051a480);
                  auVar295 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                  auVar296 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                  auVar298 = ZEXT1264(ZEXT812(0));
                  auVar297 = vmovdqu64_avx512f(local_e8);
                  fVar362 = fVar362 * (float)local_108._0_4_;
                  break;
                case 6:
                  fVar3 = **(float **)(&this->field_0x118 + (long)p_Var161);
                  auVar85._8_4_ = 0x80000000;
                  auVar85._0_8_ = 0x8000000080000000;
                  auVar85._12_4_ = 0x80000000;
                  auVar188 = ZEXT416((uint)(*(float **)(&this->field_0x118 + (long)p_Var161))[1]);
                  auVar186 = vxorps_avx512vl(auVar188,auVar85);
                  fVar384 = auVar186._0_4_ / fVar3;
                  fVar362 = 0.0;
                  if ((fVar384 <= fVar377) && (fVar362 = fVar377, fVar377 <= fVar384 + 1.0 / fVar3))
                  {
                    auVar186 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar187,auVar188);
                    fVar362 = auVar186._0_4_ * fVar377;
                  }
                }
                *(float *)((long)local_200 + uVar176 * 4) = fVar362;
                uVar176 = uVar176 + 1;
              } while (uVar176 != uVar160);
            }
            local_200 = (_func_int ***)((long)local_200 + lVar175 * 4);
            iVar158 = iVar158 + 1;
          } while (iVar158 != iVar9);
          p_Var161 = pp_Var168[-3];
        }
        local_228 = local_228 + 1;
      } while (local_228 < *(int *)(&this->field_0xd0 + (long)p_Var161));
      goto LAB_002a2e50;
    }
  }
  pMVar150 = local_38;
  Deconvolution::cut_padding
            ((Deconvolution *)((long)&this->_vptr_Deconvolution_x86_avx512 + (long)pp_Var168[-3]),
             &local_158,local_38,local_48);
  if ((pMVar150->data == (void *)0x0) || (iVar182 = 0, (long)pMVar150->c * pMVar150->cstep == 0)) {
    iVar182 = -100;
  }
LAB_002a2e9c:
  piVar14 = (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_158.data != (Allocator *)0x0) {
          free(local_158.data);
        }
      }
      else {
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar182;
}

Assistant:

int Deconvolution_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX__

    if (elempack == 4 && out_elempack == 4)
    {
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}